

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution_x86_avx512::forward
          (Deconvolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint *puVar1;
  uint uVar2;
  undefined4 uVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int *piVar14;
  void *pvVar15;
  undefined4 *puVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  void *pvVar20;
  size_t sVar21;
  Layer *pLVar22;
  byte bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  byte bVar32;
  byte bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  ulong uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined4 uVar135;
  undefined4 uVar136;
  Mat *pMVar137;
  int iVar138;
  int iVar139;
  int iVar140;
  int iVar141;
  int iVar142;
  undefined1 (*pauVar143) [64];
  undefined1 (*pauVar144) [32];
  undefined1 (*pauVar145) [16];
  ulong uVar146;
  uint uVar147;
  int iVar148;
  ulong uVar149;
  float *pfVar150;
  int iVar151;
  uint uVar152;
  ulong uVar153;
  void *pvVar154;
  uint uVar155;
  int iVar156;
  long lVar157;
  int y_5;
  ulong uVar158;
  void *pvVar159;
  void *pvVar160;
  int y;
  ulong uVar161;
  undefined1 (*pauVar162) [64];
  undefined1 (*pauVar163) [32];
  undefined1 (*pauVar164) [16];
  int iVar165;
  int iVar166;
  long lVar167;
  undefined1 (*pauVar168) [64];
  float *pfVar169;
  int y_2;
  int iVar170;
  ushort uVar171;
  ulong uVar172;
  ulong uVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar227 [28];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  undefined1 auVar284 [64];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  undefined1 auVar287 [64];
  undefined1 auVar288 [64];
  undefined1 auVar289 [64];
  undefined1 auVar290 [64];
  undefined1 auVar291 [64];
  undefined1 auVar292 [64];
  undefined1 auVar293 [64];
  undefined1 auVar294 [64];
  undefined1 auVar295 [64];
  undefined1 auVar296 [64];
  undefined1 auVar297 [64];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar298 [64];
  undefined1 auVar299 [64];
  undefined1 auVar300 [64];
  undefined1 auVar301 [64];
  undefined1 auVar302 [64];
  undefined1 auVar303 [64];
  undefined1 auVar304 [64];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar305 [64];
  undefined1 auVar306 [64];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar309 [64];
  undefined1 auVar310 [64];
  undefined1 auVar311 [64];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float afVar312 [16];
  float afVar313 [16];
  float afVar314 [16];
  float afVar315 [16];
  float afVar316 [16];
  float afVar317 [16];
  float afVar318 [16];
  float afVar319 [16];
  float afVar320 [16];
  float afVar321 [16];
  float afVar322 [16];
  float afVar323 [16];
  float afVar324 [16];
  float afVar325 [16];
  float afVar326 [16];
  float afVar327 [16];
  float afVar328 [16];
  float afVar329 [16];
  float afVar330 [16];
  float afVar331 [16];
  float afVar332 [16];
  float afVar333 [16];
  undefined1 auVar334 [64];
  undefined1 auVar335 [64];
  undefined1 auVar336 [64];
  undefined1 auVar337 [64];
  undefined1 auVar338 [64];
  undefined1 auVar339 [64];
  undefined1 auVar340 [64];
  undefined1 auVar341 [64];
  undefined1 auVar342 [64];
  int iVar343;
  int iVar344;
  int iVar345;
  int iVar346;
  int iVar347;
  int iVar348;
  int iVar349;
  int iVar350;
  int iVar351;
  int iVar352;
  int iVar353;
  float fVar354;
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  float fVar371;
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [64];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  float fVar378;
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  v4sf one;
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [16];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar411 [64];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar459 [32];
  undefined1 auVar456 [16];
  float in_ZMM10 [16];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  float afVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar468 [32];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [32];
  undefined1 auVar473 [32];
  undefined1 auVar474 [32];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [32];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [32];
  undefined1 auVar485 [32];
  undefined1 auVar486 [32];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [32];
  undefined1 auVar491 [32];
  undefined1 auVar492 [32];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM29 [64];
  int size;
  int outw;
  int h_3;
  int outh;
  int outh_3;
  Option opt_b;
  ulong local_308;
  ulong local_2f8;
  void *local_2f0;
  float *local_2d8;
  Mat local_248;
  ulong local_1f8;
  int local_1ec;
  void *local_1e8;
  void *local_1e0;
  Option *local_1d8;
  int local_1d0;
  int local_1cc;
  undefined1 local_1c8 [72];
  Mat *local_180;
  long *local_178;
  undefined4 uStack_170;
  int iStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  long *local_158;
  undefined4 uStack_150;
  int iStack_14c;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined8 local_138;
  void *local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  int local_110;
  Allocator *local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  int local_f0;
  size_t local_e8;
  undefined1 local_d8 [64];
  long local_90;
  void *local_88;
  long local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  
  iVar9 = bottom_blob->w;
  iVar10 = bottom_blob->h;
  uVar149 = bottom_blob->elemsize;
  local_1cc = ((this->super_Deconvolution).kernel_w + -1) * (this->super_Deconvolution).dilation_w;
  iVar165 = bottom_blob->elempack;
  local_d8._0_8_ = (long)iVar165;
  iVar148 = (this->super_Deconvolution).stride_w;
  local_1d0 = ((this->super_Deconvolution).kernel_h + -1) * (this->super_Deconvolution).dilation_h;
  iVar138 = (this->super_Deconvolution).stride_h;
  iVar170 = (this->super_Deconvolution).output_pad_right;
  iVar156 = (this->super_Deconvolution).output_pad_bottom;
  uVar152 = 1;
  if (opt->use_packing_layout == true) {
    uVar152 = (this->super_Deconvolution).num_output;
    if ((uVar152 & 0xf) == 0) {
      uVar152 = 0x10;
    }
    else if ((uVar152 & 7) == 0) {
      uVar152 = 8;
    }
    else {
      uVar152 = (uint)((uVar152 & 3) == 0) * 3 + 1;
    }
  }
  uVar155 = (this->super_Deconvolution).num_output / (int)uVar152;
  local_248.cstep = 0;
  local_248.data = (void *)0x0;
  local_248.refcount._0_4_ = 0;
  local_248.refcount._4_4_ = 0;
  local_248.elemsize._0_4_ = 0;
  local_248.elemsize._4_4_ = 0;
  local_248.elempack = 0;
  local_248.allocator = (Allocator *)0x0;
  local_248.dims = 0;
  local_248.w = 0;
  local_248.h = 0;
  local_248.d = 0;
  local_248.c = 0;
  auVar174._0_4_ = (this->super_Deconvolution).pad_left;
  auVar174._4_4_ = (this->super_Deconvolution).pad_right;
  auVar174._8_4_ = (this->super_Deconvolution).pad_top;
  auVar174._12_4_ = (this->super_Deconvolution).pad_bottom;
  uVar161 = vpcmpd_avx512vl((undefined1  [16])0x0,auVar174,1);
  lVar167 = 0x10;
  if (((uVar161 & 0xf) == 0) &&
     ((((this->super_Deconvolution).output_w < 1 || ((this->super_Deconvolution).output_h < 1)) &&
      (lVar167 = 8, &local_248 != top_blob)))) {
    piVar14 = top_blob->refcount;
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + 1;
      UNLOCK();
    }
    local_248.data = top_blob->data;
    local_248.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_248.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_248.elemsize._0_4_ = (undefined4)top_blob->elemsize;
    local_248.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
    local_248.elempack = top_blob->elempack;
    local_248.allocator = top_blob->allocator;
    uVar5 = top_blob->dims;
    uVar6 = top_blob->w;
    uVar7 = top_blob->h;
    uVar8 = top_blob->d;
    local_248.c = top_blob->c;
    local_248.cstep = top_blob->cstep;
    local_248.dims = uVar5;
    local_248.w = uVar6;
    local_248.h = uVar7;
    local_248.d = uVar8;
  }
  iVar170 = (iVar9 + -1) * iVar148 + local_1cc + iVar170 + 1;
  local_1d8 = opt;
  local_180 = top_blob;
  Mat::create(&local_248,iVar170,iVar156 + (iVar10 + -1) * iVar138 + local_1d0 + 1,uVar155,
              (uVar149 / (ulong)(long)iVar165) * (ulong)uVar152,uVar152,
              *(Allocator **)(&opt->lightmode + lVar167));
  iVar148 = local_248.h;
  iVar165 = local_248.w;
  afVar321 = ::_ps512_cephes_exp_p5;
  afVar320 = ::_ps512_cephes_exp_p4;
  afVar319 = ::_ps512_cephes_exp_p3;
  afVar318 = ::_ps512_cephes_exp_p2;
  afVar317 = ::_ps512_cephes_exp_p1;
  afVar316 = ::_ps512_cephes_exp_p0;
  afVar315 = ::_ps512_cephes_LOG2EF;
  afVar314 = ::_ps512_exp_lo;
  afVar313 = ::_ps512_exp_hi;
  afVar312 = ::_ps512_1;
  iVar138 = -100;
  if ((local_248.data != (void *)0x0) && ((long)local_248.c * local_248.cstep != 0)) {
    uVar11 = (this->super_Deconvolution).kernel_w;
    uVar12 = (this->super_Deconvolution).kernel_h;
    local_1ec = uVar12 * uVar11;
    if (local_1d8->use_sgemm_convolution == true) {
      piVar14 = bottom_blob->refcount;
      local_128 = bottom_blob->data;
      uStack_120 = SUB84(bottom_blob->refcount,0);
      uStack_11c = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
      local_118 = (undefined4)bottom_blob->elemsize;
      uStack_114 = (undefined4)(bottom_blob->elemsize >> 0x20);
      local_110 = bottom_blob->elempack;
      local_108 = bottom_blob->allocator;
      uVar135 = bottom_blob->dims;
      uVar136 = bottom_blob->d;
      local_f0 = bottom_blob->c;
      local_e8 = bottom_blob->cstep;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      local_100 = CONCAT44(bottom_blob->h * bottom_blob->w,uVar135);
      uStack_f8 = CONCAT44(uVar136,1);
      local_138 = 0;
      local_178 = (long *)0x0;
      uStack_170 = 0;
      iStack_16c = 0;
      local_168 = 0;
      uStack_160 = 0;
      uStack_148 = 0;
      auStack_68 = SUB6448(*local_1d8,0x10);
      local_78 = SUB648(*local_1d8,0);
      pAStack_70 = local_248.allocator;
      uStack_164 = uStack_170;
      local_158 = local_178;
      uStack_150 = uStack_170;
      iStack_14c = iStack_16c;
      local_140 = uStack_160;
      iVar138 = (*this->gemm->_vptr_Layer[7])(this->gemm,&local_128,&local_178);
      if (iVar138 != 0) {
        piVar14 = (int *)CONCAT44(iStack_16c,uStack_170);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            if (local_158 == (long *)0x0) {
              if (local_178 != (long *)0x0) {
                free(local_178);
              }
            }
            else {
              (**(code **)(*local_158 + 0x18))();
            }
          }
        }
        local_138 = 0;
        local_178 = (long *)0x0;
        uStack_170 = 0;
        iStack_16c = 0;
        local_168 = 0;
        uStack_164 = 0;
        uStack_160 = 0;
        uStack_150 = 0;
        iStack_14c = 0;
        uStack_148 = 0;
        local_140 = 0;
        piVar14 = (int *)CONCAT44(uStack_11c,uStack_120);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            if (local_108 == (Allocator *)0x0) {
              if (local_128 != (void *)0x0) {
                free(local_128);
              }
            }
            else {
              (*local_108->_vptr_Allocator[3])();
            }
          }
        }
        local_e8 = 0;
        local_128 = (void *)0x0;
        uStack_120 = 0;
        uStack_11c = 0;
        local_118 = 0;
        uStack_114 = 0;
        local_110 = 0;
        local_100 = 0;
        uStack_f8 = 0;
        local_f0 = 0;
        goto LAB_002a69e5;
      }
      iVar165 = (iVar170 * (this->super_Deconvolution).stride_h -
                (this->super_Deconvolution).stride_w * iVar9) * uVar152;
      if (uVar152 < 8) {
        if (uVar152 == 1) {
          if (0 < (int)uVar155) {
            uVar149 = CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
            lVar167 = (long)local_248.h * (long)local_248.w;
            local_2f8 = 0;
            pvVar20 = (this->super_Deconvolution).bias_data.data;
            iVar148 = (this->super_Deconvolution).bias_data.c;
            sVar21 = (this->super_Deconvolution).bias_data.cstep;
            iVar138 = (int)((uVar149 * lVar167 + 0xf & 0xfffffffffffffff0) / uVar149);
            if (local_248.dims == 4) {
              iVar138 = (int)lVar167;
            }
            uVar152 = (this->super_Deconvolution).kernel_w;
            uVar161 = 1;
            if (1 < (int)uVar155) {
              uVar161 = (ulong)uVar155;
            }
            uVar155 = (this->super_Deconvolution).kernel_h;
            auVar337 = vpbroadcastq_avx512f();
            auVar338 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar339 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            pvVar154 = local_248.data;
            do {
              auVar174 = ZEXT816(0) << 0x40;
              if ((long)iVar148 * sVar21 != 0 && pvVar20 != (void *)0x0) {
                auVar174 = ZEXT416(*(uint *)((long)pvVar20 + local_2f8 * 4));
              }
              if (0 < iVar138 * local_248.d) {
                auVar340 = vbroadcastss_avx512f(auVar174);
                uVar146 = 0;
                do {
                  auVar341 = vpbroadcastq_avx512f();
                  auVar342 = vporq_avx512f(auVar341,auVar338);
                  auVar341 = vporq_avx512f(auVar341,auVar339);
                  uVar42 = vpcmpuq_avx512f(auVar341,auVar337,2);
                  uVar43 = vpcmpuq_avx512f(auVar342,auVar337,2);
                  bVar32 = (byte)uVar43;
                  uVar171 = CONCAT11(bVar32,(byte)uVar42);
                  puVar1 = (uint *)((long)pvVar154 + uVar146 * 4);
                  bVar24 = (bool)((byte)uVar42 & 1);
                  bVar25 = (bool)((byte)(uVar171 >> 1) & 1);
                  bVar26 = (bool)((byte)(uVar171 >> 2) & 1);
                  bVar27 = (bool)((byte)(uVar171 >> 3) & 1);
                  bVar28 = (bool)((byte)(uVar171 >> 4) & 1);
                  bVar29 = (bool)((byte)(uVar171 >> 5) & 1);
                  bVar30 = (bool)((byte)(uVar171 >> 6) & 1);
                  bVar31 = (bool)((byte)(uVar171 >> 7) & 1);
                  bVar34 = (bool)(bVar32 >> 1 & 1);
                  bVar35 = (bool)(bVar32 >> 2 & 1);
                  bVar36 = (bool)(bVar32 >> 3 & 1);
                  bVar37 = (bool)(bVar32 >> 4 & 1);
                  bVar38 = (bool)(bVar32 >> 5 & 1);
                  bVar39 = (bool)(bVar32 >> 6 & 1);
                  *puVar1 = (uint)bVar24 * auVar340._0_4_ | (uint)!bVar24 * *puVar1;
                  puVar1[1] = (uint)bVar25 * auVar340._4_4_ | (uint)!bVar25 * puVar1[1];
                  puVar1[2] = (uint)bVar26 * auVar340._8_4_ | (uint)!bVar26 * puVar1[2];
                  puVar1[3] = (uint)bVar27 * auVar340._12_4_ | (uint)!bVar27 * puVar1[3];
                  puVar1[4] = (uint)bVar28 * auVar340._16_4_ | (uint)!bVar28 * puVar1[4];
                  puVar1[5] = (uint)bVar29 * auVar340._20_4_ | (uint)!bVar29 * puVar1[5];
                  puVar1[6] = (uint)bVar30 * auVar340._24_4_ | (uint)!bVar30 * puVar1[6];
                  puVar1[7] = (uint)bVar31 * auVar340._28_4_ | (uint)!bVar31 * puVar1[7];
                  puVar1[8] = (uint)(bVar32 & 1) * auVar340._32_4_ |
                              (uint)!(bool)(bVar32 & 1) * puVar1[8];
                  puVar1[9] = (uint)bVar34 * auVar340._36_4_ | (uint)!bVar34 * puVar1[9];
                  puVar1[10] = (uint)bVar35 * auVar340._40_4_ | (uint)!bVar35 * puVar1[10];
                  puVar1[0xb] = (uint)bVar36 * auVar340._44_4_ | (uint)!bVar36 * puVar1[0xb];
                  puVar1[0xc] = (uint)bVar37 * auVar340._48_4_ | (uint)!bVar37 * puVar1[0xc];
                  puVar1[0xd] = (uint)bVar38 * auVar340._52_4_ | (uint)!bVar38 * puVar1[0xd];
                  puVar1[0xe] = (uint)bVar39 * auVar340._56_4_ | (uint)!bVar39 * puVar1[0xe];
                  puVar1[0xf] = (uint)(bVar32 >> 7) * auVar340._60_4_ |
                                (uint)!(bool)(bVar32 >> 7) * puVar1[0xf];
                  uVar146 = uVar146 + 0x10;
                } while ((iVar138 * local_248.d + 0xfU & 0xfffffff0) != uVar146);
              }
              if (0 < (int)uVar155) {
                pfVar169 = (float *)(local_2f8 *
                                     (long)local_1ec *
                                     (long)iStack_14c * CONCAT44(uStack_164,local_168) +
                                    (long)local_178);
                iVar170 = (this->super_Deconvolution).dilation_h;
                iVar156 = (this->super_Deconvolution).dilation_w;
                uVar146 = 0;
                do {
                  if (0 < (int)uVar152) {
                    uVar153 = 0;
                    do {
                      if (0 < iVar10) {
                        pfVar150 = (float *)((long)local_248.data +
                                            uVar153 * (long)iVar156 * 4 +
                                            uVar146 * (long)iVar170 * uVar149 * (long)local_248.w +
                                            local_248.cstep * uVar149 * local_2f8);
                        iVar13 = (this->super_Deconvolution).stride_w;
                        iVar151 = 0;
                        do {
                          iVar166 = iVar9;
                          if (0 < iVar9) {
                            do {
                              *pfVar150 = *pfVar150 + *pfVar169;
                              pfVar169 = pfVar169 + 1;
                              pfVar150 = pfVar150 + iVar13;
                              iVar166 = iVar166 + -1;
                            } while (iVar166 != 0);
                          }
                          pfVar150 = pfVar150 + iVar165;
                          iVar151 = iVar151 + 1;
                        } while (iVar151 != iVar10);
                      }
                      uVar153 = uVar153 + 1;
                    } while (uVar153 != uVar152);
                  }
                  uVar146 = uVar146 + 1;
                } while (uVar146 != uVar155);
              }
              local_2f8 = local_2f8 + 1;
              pvVar154 = (void *)((long)pvVar154 + local_248.cstep * uVar149);
            } while (local_2f8 != uVar161);
          }
        }
        else if ((uVar152 == 4) && (0 < (int)uVar155)) {
          lVar167 = (long)local_1ec;
          uVar149 = 0;
          do {
            pfVar169 = (float *)((long)iStack_14c * uVar149 * lVar167 *
                                 CONCAT44(uStack_164,local_168) + (long)local_178);
            lVar157 = (long)local_248.w;
            uVar161 = CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
            pauVar164 = (undefined1 (*) [16])
                        (local_248.cstep * uVar149 * uVar161 + (long)local_248.data);
            uVar153 = local_248.h * lVar157;
            uVar146 = (uVar161 * uVar153 + 0xf & 0xfffffffffffffff0) / uVar161;
            if (local_248.dims == 4) {
              uVar146 = uVar153;
            }
            pvVar20 = (this->super_Deconvolution).bias_data.data;
            if ((pvVar20 == (void *)0x0) ||
               ((long)(this->super_Deconvolution).bias_data.c *
                (this->super_Deconvolution).bias_data.cstep == 0)) {
              uVar152 = local_248.d * (int)uVar146;
              if (0 < (int)uVar152) {
                memset(pauVar164,0,(ulong)uVar152 << 4);
              }
            }
            else {
              iVar148 = local_248.d * (int)uVar146;
              if (0 < iVar148) {
                auVar174 = *(undefined1 (*) [16])((long)pvVar20 + uVar149 * 0x10);
                pauVar145 = pauVar164;
                do {
                  *pauVar145 = auVar174;
                  pauVar145 = pauVar145 + 1;
                  iVar148 = iVar148 + -1;
                } while (iVar148 != 0);
              }
            }
            if (0 < (this->super_Deconvolution).kernel_h) {
              iVar148 = 0;
              do {
                if (0 < (this->super_Deconvolution).kernel_w) {
                  iVar138 = 0;
                  do {
                    if (0 < iVar10) {
                      pauVar145 = (undefined1 (*) [16])
                                  (*pauVar164 +
                                  (long)((this->super_Deconvolution).dilation_w * iVar138 * 4) * 4 +
                                  (long)(this->super_Deconvolution).dilation_h * (long)iVar148 *
                                  uVar161 * lVar157);
                      iVar170 = 0;
                      do {
                        iVar156 = iVar9;
                        if (0 < iVar9) {
                          do {
                            auVar355._0_4_ = *pfVar169 + *(float *)*pauVar145;
                            auVar355._4_4_ = pfVar169[1] + *(float *)(*pauVar145 + 4);
                            auVar355._8_4_ = pfVar169[2] + *(float *)(*pauVar145 + 8);
                            auVar355._12_4_ = pfVar169[3] + *(float *)(*pauVar145 + 0xc);
                            *pauVar145 = auVar355;
                            pauVar145 = pauVar145 + (this->super_Deconvolution).stride_w;
                            pfVar169 = pfVar169 + 4;
                            iVar156 = iVar156 + -1;
                          } while (iVar156 != 0);
                        }
                        pauVar145 = (undefined1 (*) [16])(*pauVar145 + (long)iVar165 * 4);
                        iVar170 = iVar170 + 1;
                      } while (iVar170 != iVar10);
                    }
                    iVar138 = iVar138 + 1;
                  } while (iVar138 < (this->super_Deconvolution).kernel_w);
                }
                iVar148 = iVar148 + 1;
              } while (iVar148 < (this->super_Deconvolution).kernel_h);
            }
            uVar149 = uVar149 + 1;
          } while (uVar149 != uVar155);
        }
      }
      else if (uVar152 == 8) {
        if (0 < (int)uVar155) {
          lVar167 = (long)local_1ec;
          uVar149 = 0;
          do {
            pfVar169 = (float *)((long)iStack_14c * uVar149 * lVar167 *
                                 CONCAT44(uStack_164,local_168) + (long)local_178);
            lVar157 = (long)local_248.w;
            uVar161 = CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
            pauVar163 = (undefined1 (*) [32])
                        (local_248.cstep * uVar149 * uVar161 + (long)local_248.data);
            uVar153 = local_248.h * lVar157;
            uVar146 = (uVar161 * uVar153 + 0xf & 0xfffffffffffffff0) / uVar161;
            if (local_248.dims == 4) {
              uVar146 = uVar153;
            }
            pvVar20 = (this->super_Deconvolution).bias_data.data;
            if ((pvVar20 == (void *)0x0) ||
               ((long)(this->super_Deconvolution).bias_data.c *
                (this->super_Deconvolution).bias_data.cstep == 0)) {
              uVar152 = local_248.d * (int)uVar146;
              if (0 < (int)uVar152) {
                memset(pauVar163,0,(ulong)uVar152 << 5);
              }
            }
            else {
              iVar148 = local_248.d * (int)uVar146;
              if (0 < iVar148) {
                auVar228 = *(undefined1 (*) [32])((long)pvVar20 + uVar149 * 0x20);
                pauVar144 = pauVar163;
                do {
                  *pauVar144 = auVar228;
                  pauVar144 = pauVar144 + 1;
                  iVar148 = iVar148 + -1;
                } while (iVar148 != 0);
              }
            }
            if (0 < (this->super_Deconvolution).kernel_h) {
              iVar148 = 0;
              do {
                if (0 < (this->super_Deconvolution).kernel_w) {
                  iVar138 = 0;
                  do {
                    if (0 < iVar10) {
                      pauVar144 = (undefined1 (*) [32])
                                  (*pauVar163 +
                                  (long)((this->super_Deconvolution).dilation_w * iVar138 * 8) * 4 +
                                  (long)(this->super_Deconvolution).dilation_h * (long)iVar148 *
                                  uVar161 * lVar157);
                      iVar170 = 0;
                      do {
                        iVar156 = iVar9;
                        if (0 < iVar9) {
                          do {
                            auVar228._0_4_ = *pfVar169 + *(float *)*pauVar144;
                            auVar228._4_4_ = pfVar169[1] + *(float *)(*pauVar144 + 4);
                            auVar228._8_4_ = pfVar169[2] + *(float *)(*pauVar144 + 8);
                            auVar228._12_4_ = pfVar169[3] + *(float *)(*pauVar144 + 0xc);
                            auVar228._16_4_ = pfVar169[4] + *(float *)(*pauVar144 + 0x10);
                            auVar228._20_4_ = pfVar169[5] + *(float *)(*pauVar144 + 0x14);
                            auVar228._24_4_ = pfVar169[6] + *(float *)(*pauVar144 + 0x18);
                            auVar228._28_4_ = pfVar169[7] + *(float *)(*pauVar144 + 0x1c);
                            *pauVar144 = auVar228;
                            pauVar144 = pauVar144 + (this->super_Deconvolution).stride_w;
                            pfVar169 = pfVar169 + 8;
                            iVar156 = iVar156 + -1;
                          } while (iVar156 != 0);
                        }
                        pauVar144 = (undefined1 (*) [32])(*pauVar144 + (long)iVar165 * 4);
                        iVar170 = iVar170 + 1;
                      } while (iVar170 != iVar10);
                    }
                    iVar138 = iVar138 + 1;
                  } while (iVar138 < (this->super_Deconvolution).kernel_w);
                }
                iVar148 = iVar148 + 1;
              } while (iVar148 < (this->super_Deconvolution).kernel_h);
            }
            uVar149 = uVar149 + 1;
          } while (uVar149 != uVar155);
        }
      }
      else if ((uVar152 == 0x10) && (0 < (int)uVar155)) {
        lVar167 = (long)local_1ec;
        uVar149 = 0;
        do {
          pauVar168 = (undefined1 (*) [64])
                      ((long)iStack_14c * uVar149 * lVar167 * CONCAT44(uStack_164,local_168) +
                      (long)local_178);
          lVar157 = (long)local_248.w;
          uVar161 = CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
          pauVar162 = (undefined1 (*) [64])
                      (local_248.cstep * uVar149 * uVar161 + (long)local_248.data);
          uVar153 = local_248.h * lVar157;
          uVar146 = (uVar161 * uVar153 + 0xf & 0xfffffffffffffff0) / uVar161;
          if (local_248.dims == 4) {
            uVar146 = uVar153;
          }
          pvVar20 = (this->super_Deconvolution).bias_data.data;
          if ((pvVar20 == (void *)0x0) ||
             ((long)(this->super_Deconvolution).bias_data.c *
              (this->super_Deconvolution).bias_data.cstep == 0)) {
            uVar152 = local_248.d * (int)uVar146;
            if (0 < (int)uVar152) {
              memset(pauVar162,0,(ulong)uVar152 << 6);
            }
          }
          else {
            iVar148 = local_248.d * (int)uVar146;
            if (0 < iVar148) {
              auVar337 = *(undefined1 (*) [64])((long)pvVar20 + uVar149 * 0x40);
              pauVar143 = pauVar162;
              do {
                *pauVar143 = auVar337;
                pauVar143 = pauVar143 + 1;
                iVar148 = iVar148 + -1;
              } while (iVar148 != 0);
            }
          }
          if (0 < (this->super_Deconvolution).kernel_h) {
            iVar148 = 0;
            do {
              if (0 < (this->super_Deconvolution).kernel_w) {
                iVar138 = 0;
                do {
                  if (0 < iVar10) {
                    pauVar143 = (undefined1 (*) [64])
                                (*pauVar162 +
                                (long)((this->super_Deconvolution).dilation_w * iVar138 * 0x10) * 4
                                + (long)(this->super_Deconvolution).dilation_h * (long)iVar148 *
                                  uVar161 * lVar157);
                    iVar170 = 0;
                    do {
                      iVar156 = iVar9;
                      if (0 < iVar9) {
                        do {
                          auVar337 = vaddps_avx512f(*pauVar168,*pauVar143);
                          *pauVar143 = auVar337;
                          pauVar143 = pauVar143 + (this->super_Deconvolution).stride_w;
                          pauVar168 = pauVar168 + 1;
                          iVar156 = iVar156 + -1;
                        } while (iVar156 != 0);
                      }
                      pauVar143 = (undefined1 (*) [64])(*pauVar143 + (long)iVar165 * 4);
                      iVar170 = iVar170 + 1;
                    } while (iVar170 != iVar10);
                  }
                  iVar138 = iVar138 + 1;
                } while (iVar138 < (this->super_Deconvolution).kernel_w);
              }
              iVar148 = iVar148 + 1;
            } while (iVar148 < (this->super_Deconvolution).kernel_h);
          }
          uVar149 = uVar149 + 1;
        } while (uVar149 != uVar155);
      }
      pLVar22 = this->activation;
      if (pLVar22 != (Layer *)0x0) {
        (*pLVar22->_vptr_Layer[9])(pLVar22,&local_248,local_1d8);
      }
      piVar14 = (int *)CONCAT44(iStack_16c,uStack_170);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_158 == (long *)0x0) {
            if (local_178 != (long *)0x0) {
              free(local_178);
            }
          }
          else {
            (**(code **)(*local_158 + 0x18))();
          }
        }
      }
      local_138 = 0;
      local_178 = (long *)0x0;
      uStack_170 = 0;
      iStack_16c = 0;
      local_168 = 0;
      uStack_164 = 0;
      uStack_160 = 0;
      uStack_150 = 0;
      iStack_14c = 0;
      uStack_148 = 0;
      local_140 = 0;
      piVar14 = (int *)CONCAT44(uStack_11c,uStack_120);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_108 == (Allocator *)0x0) {
            if (local_128 != (void *)0x0) {
              free(local_128);
            }
          }
          else {
            (*local_108->_vptr_Allocator[3])();
          }
        }
      }
      local_e8 = 0;
      local_128 = (void *)0x0;
      uStack_120 = 0;
      uStack_11c = 0;
      local_118 = 0;
      uStack_114 = 0;
      local_110 = 0;
      local_100 = 0;
      uStack_f8 = 0;
      local_f0 = 0;
    }
    else {
      if (((local_d8._0_4_ == 0x10) && (uVar152 == 0x10)) &&
         (local_1f8 = (ulong)local_248.c, 0 < (long)local_1f8)) {
        iVar9 = (this->super_Deconvolution).dilation_w;
        iVar10 = (this->super_Deconvolution).dilation_h;
        iVar138 = (this->super_Deconvolution).stride_w;
        iVar170 = (this->super_Deconvolution).stride_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        pvVar20 = (this->super_Deconvolution).bias_data.data;
        auVar337 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar338 = vxorps_avx512dq(auVar337,(undefined1  [64])_ps512_cephes_log_q2);
        auVar339 = vxorps_avx512dq(auVar337,(undefined1  [64])_ps512_cephes_log_q1);
        auVar340 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        local_1c8._0_64_ = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar337);
        local_308 = 0;
        auVar174 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
        in_ZMM29 = ZEXT1664(auVar174);
        auVar337 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        do {
          if (0 < local_248.h) {
            iVar13 = bottom_blob->w;
            iVar151 = bottom_blob->h;
            pauVar162 = (undefined1 (*) [64])
                        (local_248.cstep * local_308 *
                         CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) +
                        (long)local_248.data);
            uVar155 = bottom_blob->c;
            iVar166 = 0;
            do {
              if (0 < local_248.w) {
                uVar147 = 0;
                iVar343 = (1 - uVar11) * iVar9;
                do {
                  if (pvVar20 == (void *)0x0) {
                    auVar341 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar341 = *(undefined1 (*) [64])((long)pvVar20 + local_308 * 0x40);
                  }
                  if (0 < (int)uVar155) {
                    pvVar154 = (void *)((this->weight_data_tm).cstep * local_308 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    pvVar15 = bottom_blob->data;
                    uVar149 = 0;
                    do {
                      if (0 < (int)uVar12) {
                        uVar146 = 0;
                        uVar161 = 0;
                        do {
                          iVar139 = (((int)uVar161 - uVar12) + 1) * iVar10 + iVar166;
                          if ((((-1 < iVar139) &&
                               (iVar140 = iVar139 / iVar170, iVar139 % iVar170 == 0)) &&
                              (0 < (int)uVar11)) && (iVar140 < iVar151)) {
                            lVar167 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                                      bottom_blob->cstep * bottom_blob->elemsize * uVar149;
                            uVar153 = uVar146;
                            uVar158 = (ulong)uVar11;
                            iVar139 = iVar343;
                            do {
                              if (((-1 < iVar139) &&
                                  (iVar140 = iVar139 / iVar138, iVar139 % iVar138 == 0)) &&
                                 (iVar140 < iVar13)) {
                                lVar157 = (long)(iVar140 << 4);
                                auVar342 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167)));
                                auVar280 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 4)));
                                auVar281 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 8)));
                                in_ZMM17 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0xc))
                                                     );
                                auVar282 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x10)
                                                             ));
                                auVar283 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x14)
                                                             ));
                                auVar284 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x18)
                                                             ));
                                auVar285 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x1c)
                                                             ));
                                auVar286 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x20)
                                                             ));
                                auVar287 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x24)
                                                             ));
                                auVar288 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x28)
                                                             ));
                                auVar289 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x2c)
                                                             ));
                                auVar290 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x30)
                                                             ));
                                auVar291 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x34)
                                                             ));
                                auVar292 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x38)
                                                             ));
                                auVar293 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x3c)
                                                             ));
                                uVar172 = uVar153 & 0xffffffff;
                                auVar341 = vfmadd231ps_avx512f(auVar341,auVar342,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 + uVar172 * 4));
                                auVar341 = vfmadd231ps_avx512f(auVar341,auVar280,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 + uVar172 * 4 + 0x40
                                                                ));
                                auVar341 = vfmadd231ps_avx512f(auVar341,auVar281,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 + uVar172 * 4 + 0x80
                                                                ));
                                auVar341 = vfmadd231ps_avx512f(auVar341,in_ZMM17,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 + uVar172 * 4 + 0xc0
                                                                ));
                                auVar341 = vfmadd231ps_avx512f(auVar341,auVar282,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 +
                                                                uVar172 * 4 + 0x100));
                                auVar341 = vfmadd231ps_avx512f(auVar341,auVar283,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 +
                                                                uVar172 * 4 + 0x140));
                                auVar341 = vfmadd231ps_avx512f(auVar341,auVar284,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 +
                                                                uVar172 * 4 + 0x180));
                                auVar341 = vfmadd231ps_avx512f(auVar341,auVar285,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 +
                                                                uVar172 * 4 + 0x1c0));
                                auVar341 = vfmadd231ps_avx512f(auVar341,auVar286,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 +
                                                                uVar172 * 4 + 0x200));
                                auVar341 = vfmadd231ps_avx512f(auVar341,auVar287,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 +
                                                                uVar172 * 4 + 0x240));
                                auVar341 = vfmadd231ps_avx512f(auVar341,auVar288,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 +
                                                                uVar172 * 4 + 0x280));
                                auVar341 = vfmadd231ps_avx512f(auVar341,auVar289,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 +
                                                                uVar172 * 4 + 0x2c0));
                                auVar341 = vfmadd231ps_avx512f(auVar341,auVar290,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 +
                                                                uVar172 * 4 + 0x300));
                                auVar341 = vfmadd231ps_avx512f(auVar341,auVar291,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 +
                                                                uVar172 * 4 + 0x340));
                                auVar341 = vfmadd231ps_avx512f(auVar341,auVar292,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 +
                                                                uVar172 * 4 + 0x380));
                                auVar341 = vfmadd231ps_avx512f(auVar341,auVar293,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 +
                                                                uVar172 * 4 + 0x3c0));
                              }
                              uVar153 = uVar153 + 0x100;
                              iVar139 = iVar139 + iVar9;
                              uVar158 = uVar158 - 1;
                            } while (uVar158 != 0);
                          }
                          uVar161 = uVar161 + 1;
                          uVar146 = uVar146 + (ulong)uVar11 * 0x100;
                        } while (uVar161 != uVar12);
                      }
                      pvVar154 = (void *)((long)pvVar154 + (long)(int)(uVar11 * uVar12 * 0x100) * 4)
                      ;
                      uVar149 = uVar149 + 1;
                    } while (uVar149 != uVar155);
                  }
                  switch(iVar156) {
                  case 1:
                    auVar341 = vmaxps_avx512f(auVar341,in_ZMM29);
                    break;
                  case 2:
                    uVar149 = vcmpps_avx512f(auVar341,in_ZMM29,1);
                    uVar3 = *(this->super_Deconvolution).activation_params.data;
                    auVar288._4_4_ = uVar3;
                    auVar288._0_4_ = uVar3;
                    auVar288._8_4_ = uVar3;
                    auVar288._12_4_ = uVar3;
                    auVar288._16_4_ = uVar3;
                    auVar288._20_4_ = uVar3;
                    auVar288._24_4_ = uVar3;
                    auVar288._28_4_ = uVar3;
                    auVar288._32_4_ = uVar3;
                    auVar288._36_4_ = uVar3;
                    auVar288._40_4_ = uVar3;
                    auVar288._44_4_ = uVar3;
                    auVar288._48_4_ = uVar3;
                    auVar288._52_4_ = uVar3;
                    auVar288._56_4_ = uVar3;
                    auVar288._60_4_ = uVar3;
                    auVar342 = vmulps_avx512f(auVar341,auVar288);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar289._0_4_ = (uint)bVar24 * auVar342._0_4_ | (uint)!bVar24 * auVar341._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar289._4_4_ = (uint)bVar24 * auVar342._4_4_ | (uint)!bVar24 * auVar341._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar289._8_4_ = (uint)bVar24 * auVar342._8_4_ | (uint)!bVar24 * auVar341._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar289._12_4_ =
                         (uint)bVar24 * auVar342._12_4_ | (uint)!bVar24 * auVar341._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar289._16_4_ =
                         (uint)bVar24 * auVar342._16_4_ | (uint)!bVar24 * auVar341._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar289._20_4_ =
                         (uint)bVar24 * auVar342._20_4_ | (uint)!bVar24 * auVar341._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar289._24_4_ =
                         (uint)bVar24 * auVar342._24_4_ | (uint)!bVar24 * auVar341._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar289._28_4_ =
                         (uint)bVar24 * auVar342._28_4_ | (uint)!bVar24 * auVar341._28_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                    auVar289._32_4_ =
                         (uint)bVar24 * auVar342._32_4_ | (uint)!bVar24 * auVar341._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar289._36_4_ =
                         (uint)bVar24 * auVar342._36_4_ | (uint)!bVar24 * auVar341._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar289._40_4_ =
                         (uint)bVar24 * auVar342._40_4_ | (uint)!bVar24 * auVar341._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar289._44_4_ =
                         (uint)bVar24 * auVar342._44_4_ | (uint)!bVar24 * auVar341._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar289._48_4_ =
                         (uint)bVar24 * auVar342._48_4_ | (uint)!bVar24 * auVar341._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar289._52_4_ =
                         (uint)bVar24 * auVar342._52_4_ | (uint)!bVar24 * auVar341._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar289._56_4_ =
                         (uint)bVar24 * auVar342._56_4_ | (uint)!bVar24 * auVar341._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar289._60_4_ =
                         (uint)bVar24 * auVar342._60_4_ | (uint)!bVar24 * auVar341._60_4_;
                    auVar341 = auVar289;
                    break;
                  case 3:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar287._4_4_ = uVar3;
                    auVar287._0_4_ = uVar3;
                    auVar287._8_4_ = uVar3;
                    auVar287._12_4_ = uVar3;
                    auVar287._16_4_ = uVar3;
                    auVar287._20_4_ = uVar3;
                    auVar287._24_4_ = uVar3;
                    auVar287._28_4_ = uVar3;
                    auVar287._32_4_ = uVar3;
                    auVar287._36_4_ = uVar3;
                    auVar287._40_4_ = uVar3;
                    auVar287._44_4_ = uVar3;
                    auVar287._48_4_ = uVar3;
                    auVar287._52_4_ = uVar3;
                    auVar287._56_4_ = uVar3;
                    auVar287._60_4_ = uVar3;
                    auVar342 = vmaxps_avx512f(auVar341,auVar287);
                    uVar3 = puVar16[1];
                    auVar341._4_4_ = uVar3;
                    auVar341._0_4_ = uVar3;
                    auVar341._8_4_ = uVar3;
                    auVar341._12_4_ = uVar3;
                    auVar341._16_4_ = uVar3;
                    auVar341._20_4_ = uVar3;
                    auVar341._24_4_ = uVar3;
                    auVar341._28_4_ = uVar3;
                    auVar341._32_4_ = uVar3;
                    auVar341._36_4_ = uVar3;
                    auVar341._40_4_ = uVar3;
                    auVar341._44_4_ = uVar3;
                    auVar341._48_4_ = uVar3;
                    auVar341._52_4_ = uVar3;
                    auVar341._56_4_ = uVar3;
                    auVar341._60_4_ = uVar3;
                    auVar341 = vminps_avx512f(auVar342,auVar341);
                    break;
                  case 4:
                    auVar281._8_4_ = 0x80000000;
                    auVar281._0_8_ = 0x8000000080000000;
                    auVar281._12_4_ = 0x80000000;
                    auVar281._16_4_ = 0x80000000;
                    auVar281._20_4_ = 0x80000000;
                    auVar281._24_4_ = 0x80000000;
                    auVar281._28_4_ = 0x80000000;
                    auVar281._32_4_ = 0x80000000;
                    auVar281._36_4_ = 0x80000000;
                    auVar281._40_4_ = 0x80000000;
                    auVar281._44_4_ = 0x80000000;
                    auVar281._48_4_ = 0x80000000;
                    auVar281._52_4_ = 0x80000000;
                    auVar281._56_4_ = 0x80000000;
                    auVar281._60_4_ = 0x80000000;
                    auVar341 = vxorps_avx512dq(auVar341,auVar281);
                    auVar341 = vminps_avx512f(auVar341,(undefined1  [64])afVar313);
                    auVar341 = vmaxps_avx512f(auVar341,(undefined1  [64])afVar314);
                    auVar342 = vfmadd213ps_avx512f((undefined1  [64])afVar315,auVar341,
                                                   (undefined1  [64])afVar321);
                    auVar280 = vrndscaleps_avx512f(auVar342,1);
                    uVar149 = vcmpps_avx512f(auVar342,auVar280,1);
                    auVar342 = vsubps_avx512f(auVar280,(undefined1  [64])afVar312);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar286._0_4_ = (uint)bVar24 * auVar342._0_4_ | (uint)!bVar24 * auVar280._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar286._4_4_ = (uint)bVar24 * auVar342._4_4_ | (uint)!bVar24 * auVar280._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar286._8_4_ = (uint)bVar24 * auVar342._8_4_ | (uint)!bVar24 * auVar280._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar286._12_4_ =
                         (uint)bVar24 * auVar342._12_4_ | (uint)!bVar24 * auVar280._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar286._16_4_ =
                         (uint)bVar24 * auVar342._16_4_ | (uint)!bVar24 * auVar280._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar286._20_4_ =
                         (uint)bVar24 * auVar342._20_4_ | (uint)!bVar24 * auVar280._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar286._24_4_ =
                         (uint)bVar24 * auVar342._24_4_ | (uint)!bVar24 * auVar280._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar286._28_4_ =
                         (uint)bVar24 * auVar342._28_4_ | (uint)!bVar24 * auVar280._28_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                    auVar286._32_4_ =
                         (uint)bVar24 * auVar342._32_4_ | (uint)!bVar24 * auVar280._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar286._36_4_ =
                         (uint)bVar24 * auVar342._36_4_ | (uint)!bVar24 * auVar280._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar286._40_4_ =
                         (uint)bVar24 * auVar342._40_4_ | (uint)!bVar24 * auVar280._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar286._44_4_ =
                         (uint)bVar24 * auVar342._44_4_ | (uint)!bVar24 * auVar280._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar286._48_4_ =
                         (uint)bVar24 * auVar342._48_4_ | (uint)!bVar24 * auVar280._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar286._52_4_ =
                         (uint)bVar24 * auVar342._52_4_ | (uint)!bVar24 * auVar280._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar286._56_4_ =
                         (uint)bVar24 * auVar342._56_4_ | (uint)!bVar24 * auVar280._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar286._60_4_ =
                         (uint)bVar24 * auVar342._60_4_ | (uint)!bVar24 * auVar280._60_4_;
                    auVar341 = vfmadd231ps_avx512f(auVar341,auVar286,auVar338);
                    auVar341 = vfmadd231ps_avx512f(auVar341,auVar286,auVar339);
                    auVar342 = vmulps_avx512f(auVar341,auVar341);
                    auVar280 = vfmadd213ps_avx512f(auVar341,(undefined1  [64])afVar316,
                                                   (undefined1  [64])afVar317);
                    auVar280 = vfmadd213ps_avx512f(auVar280,auVar341,(undefined1  [64])afVar318);
                    auVar280 = vfmadd213ps_avx512f(auVar280,auVar341,(undefined1  [64])afVar319);
                    auVar280 = vfmadd213ps_avx512f(auVar280,auVar341,(undefined1  [64])afVar320);
                    auVar280 = vfmadd213ps_avx512f(auVar280,auVar341,(undefined1  [64])afVar321);
                    auVar341 = vfmadd213ps_avx512f(auVar280,auVar342,auVar341);
                    auVar341 = vaddps_avx512f(auVar341,(undefined1  [64])afVar312);
                    auVar342 = vcvttps2dq_avx512f(auVar286);
                    auVar342 = vpaddd_avx512f(auVar342,auVar340);
                    auVar342 = vpslld_avx512f(auVar342,0x17);
                    auVar341 = vfmadd213ps_avx512f(auVar342,auVar341,auVar337);
                    auVar341 = vdivps_avx512f(auVar337,auVar341);
                    break;
                  case 5:
                    auVar342 = vminps_avx512f(auVar341,(undefined1  [64])afVar313);
                    auVar342 = vmaxps_avx512f(auVar342,(undefined1  [64])afVar314);
                    auVar280 = vfmadd213ps_avx512f((undefined1  [64])afVar315,auVar342,
                                                   (undefined1  [64])afVar321);
                    auVar281 = vrndscaleps_avx512f(auVar280,1);
                    uVar149 = vcmpps_avx512f(auVar280,auVar281,1);
                    auVar282 = vsubps_avx512f(auVar281,(undefined1  [64])afVar312);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar280._0_4_ = (uint)bVar24 * auVar282._0_4_ | (uint)!bVar24 * auVar281._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar280._4_4_ = (uint)bVar24 * auVar282._4_4_ | (uint)!bVar24 * auVar281._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar280._8_4_ = (uint)bVar24 * auVar282._8_4_ | (uint)!bVar24 * auVar281._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar280._12_4_ =
                         (uint)bVar24 * auVar282._12_4_ | (uint)!bVar24 * auVar281._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar280._16_4_ =
                         (uint)bVar24 * auVar282._16_4_ | (uint)!bVar24 * auVar281._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar280._20_4_ =
                         (uint)bVar24 * auVar282._20_4_ | (uint)!bVar24 * auVar281._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar280._24_4_ =
                         (uint)bVar24 * auVar282._24_4_ | (uint)!bVar24 * auVar281._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar280._28_4_ =
                         (uint)bVar24 * auVar282._28_4_ | (uint)!bVar24 * auVar281._28_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                    auVar280._32_4_ =
                         (uint)bVar24 * auVar282._32_4_ | (uint)!bVar24 * auVar281._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar280._36_4_ =
                         (uint)bVar24 * auVar282._36_4_ | (uint)!bVar24 * auVar281._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar280._40_4_ =
                         (uint)bVar24 * auVar282._40_4_ | (uint)!bVar24 * auVar281._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar280._44_4_ =
                         (uint)bVar24 * auVar282._44_4_ | (uint)!bVar24 * auVar281._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar280._48_4_ =
                         (uint)bVar24 * auVar282._48_4_ | (uint)!bVar24 * auVar281._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar280._52_4_ =
                         (uint)bVar24 * auVar282._52_4_ | (uint)!bVar24 * auVar281._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar280._56_4_ =
                         (uint)bVar24 * auVar282._56_4_ | (uint)!bVar24 * auVar281._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar280._60_4_ =
                         (uint)bVar24 * auVar282._60_4_ | (uint)!bVar24 * auVar281._60_4_;
                    auVar342 = vfmadd231ps_avx512f(auVar342,auVar280,auVar338);
                    auVar342 = vfmadd231ps_avx512f(auVar342,auVar280,auVar339);
                    auVar281 = vmulps_avx512f(auVar342,auVar342);
                    auVar282 = vfmadd213ps_avx512f(auVar342,(undefined1  [64])afVar316,
                                                   (undefined1  [64])afVar317);
                    auVar282 = vfmadd213ps_avx512f(auVar282,auVar342,(undefined1  [64])afVar318);
                    auVar282 = vfmadd213ps_avx512f(auVar282,auVar342,(undefined1  [64])afVar319);
                    auVar282 = vfmadd213ps_avx512f(auVar282,auVar342,(undefined1  [64])afVar320);
                    auVar282 = vfmadd213ps_avx512f(auVar282,auVar342,(undefined1  [64])afVar321);
                    auVar342 = vfmadd213ps_avx512f(auVar282,auVar281,auVar342);
                    auVar342 = vaddps_avx512f(auVar342,(undefined1  [64])afVar312);
                    auVar280 = vcvttps2dq_avx512f(auVar280);
                    auVar280 = vpaddd_avx512f(auVar280,auVar340);
                    auVar280 = vpslld_avx512f(auVar280,0x17);
                    auVar342 = vfmadd213ps_avx512f(auVar280,auVar342,auVar337);
                    auVar280 = vmaxps_avx512f(auVar342,(undefined1  [64])_ps512_min_norm_pos);
                    auVar281 = vpsrld_avx512f(auVar280,0x17);
                    auVar280 = vpternlogd_avx512f(auVar280,(undefined1  [64])afVar321,
                                                  (undefined1  [64])_ps512_inv_mant_mask,0xec);
                    uVar149 = vcmpps_avx512f(auVar280,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                    auVar282 = vsubps_avx512f(auVar280,(undefined1  [64])afVar312);
                    auVar280 = vaddps_avx512f(auVar282,auVar280);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar283._0_4_ = (uint)bVar24 * auVar280._0_4_ | (uint)!bVar24 * auVar282._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar283._4_4_ = (uint)bVar24 * auVar280._4_4_ | (uint)!bVar24 * auVar282._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar283._8_4_ = (uint)bVar24 * auVar280._8_4_ | (uint)!bVar24 * auVar282._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar283._12_4_ =
                         (uint)bVar24 * auVar280._12_4_ | (uint)!bVar24 * auVar282._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar283._16_4_ =
                         (uint)bVar24 * auVar280._16_4_ | (uint)!bVar24 * auVar282._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar283._20_4_ =
                         (uint)bVar24 * auVar280._20_4_ | (uint)!bVar24 * auVar282._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar283._24_4_ =
                         (uint)bVar24 * auVar280._24_4_ | (uint)!bVar24 * auVar282._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar283._28_4_ =
                         (uint)bVar24 * auVar280._28_4_ | (uint)!bVar24 * auVar282._28_4_;
                    bVar32 = (byte)(uVar149 >> 8);
                    bVar24 = (bool)(bVar32 & 1);
                    auVar283._32_4_ =
                         (uint)bVar24 * auVar280._32_4_ | (uint)!bVar24 * auVar282._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar283._36_4_ =
                         (uint)bVar24 * auVar280._36_4_ | (uint)!bVar24 * auVar282._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar283._40_4_ =
                         (uint)bVar24 * auVar280._40_4_ | (uint)!bVar24 * auVar282._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar283._44_4_ =
                         (uint)bVar24 * auVar280._44_4_ | (uint)!bVar24 * auVar282._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar283._48_4_ =
                         (uint)bVar24 * auVar280._48_4_ | (uint)!bVar24 * auVar282._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar283._52_4_ =
                         (uint)bVar24 * auVar280._52_4_ | (uint)!bVar24 * auVar282._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar283._56_4_ =
                         (uint)bVar24 * auVar280._56_4_ | (uint)!bVar24 * auVar282._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar283._60_4_ =
                         (uint)bVar24 * auVar280._60_4_ | (uint)!bVar24 * auVar282._60_4_;
                    auVar280 = vmulps_avx512f(auVar283,auVar283);
                    auVar282 = vfmadd132ps_avx512f(auVar283,(undefined1  [64])_ps512_cephes_log_p1,
                                                   (undefined1  [64])_ps512_cephes_log_p0);
                    auVar282 = vfmadd213ps_avx512f(auVar282,auVar283,
                                                   (undefined1  [64])_ps512_cephes_log_p2);
                    auVar282 = vfmadd213ps_avx512f(auVar282,auVar283,
                                                   (undefined1  [64])_ps512_cephes_log_p3);
                    auVar282 = vfmadd213ps_avx512f(auVar282,auVar283,
                                                   (undefined1  [64])_ps512_cephes_log_p4);
                    auVar282 = vfmadd213ps_avx512f(auVar282,auVar283,
                                                   (undefined1  [64])_ps512_cephes_log_p5);
                    auVar282 = vfmadd213ps_avx512f(auVar282,auVar283,
                                                   (undefined1  [64])_ps512_cephes_log_p6);
                    auVar282 = vfmadd213ps_avx512f(auVar282,auVar283,
                                                   (undefined1  [64])_ps512_cephes_log_p7);
                    auVar282 = vfmadd213ps_avx512f(auVar282,auVar283,
                                                   (undefined1  [64])_ps512_cephes_log_p8);
                    auVar284 = vmulps_avx512f(auVar280,auVar283);
                    auVar282 = vfmadd213ps_avx512f(auVar284,auVar282,auVar283);
                    uVar161 = vcmpps_avx512f(auVar342,in_ZMM29,2);
                    auVar342 = vpsubd_avx512f(auVar281,auVar340);
                    auVar342 = vcvtdq2ps_avx512f(auVar342);
                    auVar281 = vaddps_avx512f(auVar342,(undefined1  [64])afVar312);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar284._0_4_ = (uint)bVar24 * auVar342._0_4_ | (uint)!bVar24 * auVar281._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar284._4_4_ = (uint)bVar24 * auVar342._4_4_ | (uint)!bVar24 * auVar281._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar284._8_4_ = (uint)bVar24 * auVar342._8_4_ | (uint)!bVar24 * auVar281._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar284._12_4_ =
                         (uint)bVar24 * auVar342._12_4_ | (uint)!bVar24 * auVar281._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar284._16_4_ =
                         (uint)bVar24 * auVar342._16_4_ | (uint)!bVar24 * auVar281._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar284._20_4_ =
                         (uint)bVar24 * auVar342._20_4_ | (uint)!bVar24 * auVar281._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar284._24_4_ =
                         (uint)bVar24 * auVar342._24_4_ | (uint)!bVar24 * auVar281._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar284._28_4_ =
                         (uint)bVar24 * auVar342._28_4_ | (uint)!bVar24 * auVar281._28_4_;
                    bVar24 = (bool)(bVar32 & 1);
                    auVar284._32_4_ =
                         (uint)bVar24 * auVar342._32_4_ | (uint)!bVar24 * auVar281._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar284._36_4_ =
                         (uint)bVar24 * auVar342._36_4_ | (uint)!bVar24 * auVar281._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar284._40_4_ =
                         (uint)bVar24 * auVar342._40_4_ | (uint)!bVar24 * auVar281._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar284._44_4_ =
                         (uint)bVar24 * auVar342._44_4_ | (uint)!bVar24 * auVar281._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar284._48_4_ =
                         (uint)bVar24 * auVar342._48_4_ | (uint)!bVar24 * auVar281._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar284._52_4_ =
                         (uint)bVar24 * auVar342._52_4_ | (uint)!bVar24 * auVar281._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar284._56_4_ =
                         (uint)bVar24 * auVar342._56_4_ | (uint)!bVar24 * auVar281._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar284._60_4_ =
                         (uint)bVar24 * auVar342._60_4_ | (uint)!bVar24 * auVar281._60_4_;
                    auVar342 = vfmadd231ps_avx512f(auVar282,auVar284,
                                                   (undefined1  [64])_ps512_cephes_log_q1);
                    auVar342 = vfmadd231ps_avx512f(auVar342,auVar280,local_1c8._0_64_);
                    auVar342 = vfmadd231ps_avx512f(auVar342,auVar284,
                                                   (undefined1  [64])_ps512_cephes_log_q2);
                    auVar280 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
                    auVar342 = vmulps_avx512f(auVar342,auVar280);
                    auVar281 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar282._0_4_ = (uint)bVar24 * auVar281._0_4_ | (uint)!bVar24 * auVar342._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar282._4_4_ = (uint)bVar24 * auVar281._4_4_ | (uint)!bVar24 * auVar342._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar282._8_4_ = (uint)bVar24 * auVar281._8_4_ | (uint)!bVar24 * auVar342._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar282._12_4_ =
                         (uint)bVar24 * auVar281._12_4_ | (uint)!bVar24 * auVar342._12_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 4) & 1);
                    auVar282._16_4_ =
                         (uint)bVar24 * auVar281._16_4_ | (uint)!bVar24 * auVar342._16_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 5) & 1);
                    auVar282._20_4_ =
                         (uint)bVar24 * auVar281._20_4_ | (uint)!bVar24 * auVar342._20_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 6) & 1);
                    auVar282._24_4_ =
                         (uint)bVar24 * auVar281._24_4_ | (uint)!bVar24 * auVar342._24_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 7) & 1);
                    auVar282._28_4_ =
                         (uint)bVar24 * auVar281._28_4_ | (uint)!bVar24 * auVar342._28_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 8) & 1);
                    auVar282._32_4_ =
                         (uint)bVar24 * auVar281._32_4_ | (uint)!bVar24 * auVar342._32_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 9) & 1);
                    auVar282._36_4_ =
                         (uint)bVar24 * auVar281._36_4_ | (uint)!bVar24 * auVar342._36_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 10) & 1);
                    auVar282._40_4_ =
                         (uint)bVar24 * auVar281._40_4_ | (uint)!bVar24 * auVar342._40_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 0xb) & 1);
                    auVar282._44_4_ =
                         (uint)bVar24 * auVar281._44_4_ | (uint)!bVar24 * auVar342._44_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 0xc) & 1);
                    auVar282._48_4_ =
                         (uint)bVar24 * auVar281._48_4_ | (uint)!bVar24 * auVar342._48_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 0xd) & 1);
                    auVar282._52_4_ =
                         (uint)bVar24 * auVar281._52_4_ | (uint)!bVar24 * auVar342._52_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 0xe) & 1);
                    auVar282._56_4_ =
                         (uint)bVar24 * auVar281._56_4_ | (uint)!bVar24 * auVar342._56_4_;
                    bVar24 = SUB81(uVar161 >> 0xf,0);
                    auVar282._60_4_ =
                         (uint)bVar24 * auVar281._60_4_ | (uint)!bVar24 * auVar342._60_4_;
                    auVar342 = vminps_avx512f(auVar282,(undefined1  [64])afVar313);
                    auVar342 = vmaxps_avx512f(auVar342,(undefined1  [64])afVar314);
                    auVar281 = vfmadd213ps_avx512f((undefined1  [64])afVar315,auVar342,
                                                   (undefined1  [64])afVar321);
                    auVar282 = vrndscaleps_avx512f(auVar281,1);
                    uVar149 = vcmpps_avx512f(auVar281,auVar282,1);
                    auVar281 = vsubps_avx512f(auVar282,(undefined1  [64])afVar312);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar285._0_4_ = (uint)bVar24 * auVar281._0_4_ | (uint)!bVar24 * auVar282._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar285._4_4_ = (uint)bVar24 * auVar281._4_4_ | (uint)!bVar24 * auVar282._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar285._8_4_ = (uint)bVar24 * auVar281._8_4_ | (uint)!bVar24 * auVar282._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar285._12_4_ =
                         (uint)bVar24 * auVar281._12_4_ | (uint)!bVar24 * auVar282._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar285._16_4_ =
                         (uint)bVar24 * auVar281._16_4_ | (uint)!bVar24 * auVar282._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar285._20_4_ =
                         (uint)bVar24 * auVar281._20_4_ | (uint)!bVar24 * auVar282._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar285._24_4_ =
                         (uint)bVar24 * auVar281._24_4_ | (uint)!bVar24 * auVar282._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar285._28_4_ =
                         (uint)bVar24 * auVar281._28_4_ | (uint)!bVar24 * auVar282._28_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                    auVar285._32_4_ =
                         (uint)bVar24 * auVar281._32_4_ | (uint)!bVar24 * auVar282._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar285._36_4_ =
                         (uint)bVar24 * auVar281._36_4_ | (uint)!bVar24 * auVar282._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar285._40_4_ =
                         (uint)bVar24 * auVar281._40_4_ | (uint)!bVar24 * auVar282._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar285._44_4_ =
                         (uint)bVar24 * auVar281._44_4_ | (uint)!bVar24 * auVar282._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar285._48_4_ =
                         (uint)bVar24 * auVar281._48_4_ | (uint)!bVar24 * auVar282._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar285._52_4_ =
                         (uint)bVar24 * auVar281._52_4_ | (uint)!bVar24 * auVar282._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar285._56_4_ =
                         (uint)bVar24 * auVar281._56_4_ | (uint)!bVar24 * auVar282._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar285._60_4_ =
                         (uint)bVar24 * auVar281._60_4_ | (uint)!bVar24 * auVar282._60_4_;
                    auVar342 = vfmadd231ps_avx512f(auVar342,auVar285,auVar338);
                    auVar342 = vfmadd231ps_avx512f(auVar342,auVar285,auVar339);
                    auVar281 = vmulps_avx512f(auVar342,auVar342);
                    auVar282 = vfmadd213ps_avx512f(auVar342,(undefined1  [64])afVar316,
                                                   (undefined1  [64])afVar317);
                    auVar282 = vfmadd213ps_avx512f(auVar282,auVar342,(undefined1  [64])afVar318);
                    auVar282 = vfmadd213ps_avx512f(auVar282,auVar342,(undefined1  [64])afVar319);
                    auVar282 = vfmadd213ps_avx512f(auVar282,auVar342,(undefined1  [64])afVar320);
                    auVar282 = vfmadd213ps_avx512f(auVar282,auVar342,(undefined1  [64])afVar321);
                    in_ZMM17 = vfmadd213ps_avx512f(auVar282,auVar281,auVar342);
                    auVar342 = vaddps_avx512f(in_ZMM17,(undefined1  [64])afVar312);
                    auVar281 = vcvttps2dq_avx512f(auVar285);
                    auVar281 = vpaddd_avx512f(auVar281,auVar340);
                    auVar281 = vpslld_avx512f(auVar281,0x17);
                    auVar342 = vfmadd213ps_avx512f(auVar281,auVar342,auVar337);
                    auVar342 = vdivps_avx512f(auVar337,auVar342);
                    auVar342 = vfnmsub213ps_avx512f(auVar342,auVar280,auVar337);
                    goto LAB_0029f60d;
                  case 6:
                    puVar1 = (uint *)(this->super_Deconvolution).activation_params.data;
                    auVar280 = vbroadcastss_avx512f(ZEXT416(*puVar1));
                    uVar2 = puVar1[1];
                    auVar342._4_4_ = uVar2;
                    auVar342._0_4_ = uVar2;
                    auVar342._8_4_ = uVar2;
                    auVar342._12_4_ = uVar2;
                    auVar342._16_4_ = uVar2;
                    auVar342._20_4_ = uVar2;
                    auVar342._24_4_ = uVar2;
                    auVar342._28_4_ = uVar2;
                    auVar342._32_4_ = uVar2;
                    auVar342._36_4_ = uVar2;
                    auVar342._40_4_ = uVar2;
                    auVar342._44_4_ = uVar2;
                    auVar342._48_4_ = uVar2;
                    auVar342._52_4_ = uVar2;
                    auVar342._56_4_ = uVar2;
                    auVar342._60_4_ = uVar2;
                    auVar342 = vfmadd213ps_avx512f(auVar280,auVar341,auVar342);
                    auVar342 = vmaxps_avx512f(auVar342,in_ZMM29);
                    auVar342 = vminps_avx512f(auVar342,auVar337);
LAB_0029f60d:
                    auVar341 = vmulps_avx512f(auVar342,auVar341);
                  }
                  *pauVar162 = auVar341;
                  pauVar162 = pauVar162 + 1;
                  uVar147 = uVar147 + 1;
                  iVar343 = iVar343 + 1;
                } while (uVar147 != local_248.w);
              }
              iVar166 = iVar166 + 1;
            } while (iVar166 != local_248.h);
          }
          local_308 = local_308 + 1;
          in_ZMM10 = afVar316;
        } while (local_308 != local_1f8);
      }
      afVar325 = _ps512_cephes_log_p8;
      afVar324 = _ps512_cephes_log_p7;
      afVar323 = _ps512_cephes_log_p6;
      afVar462 = _ps512_cephes_log_p5;
      afVar322 = _ps512_cephes_log_p4;
      afVar321 = ::_ps512_cephes_exp_p5;
      afVar320 = ::_ps512_cephes_exp_p4;
      afVar319 = ::_ps512_cephes_exp_p3;
      afVar318 = ::_ps512_cephes_exp_p2;
      afVar317 = ::_ps512_cephes_exp_p1;
      afVar316 = ::_ps512_cephes_exp_p0;
      afVar315 = ::_ps512_cephes_LOG2EF;
      afVar314 = ::_ps512_exp_lo;
      afVar313 = ::_ps512_exp_hi;
      afVar312 = ::_ps512_1;
      if (((local_d8._0_4_ == 8) && (uVar152 == 0x10)) && (0 < (long)local_248.c)) {
        iVar9 = (this->super_Deconvolution).dilation_w;
        iVar10 = (this->super_Deconvolution).dilation_h;
        iVar138 = (this->super_Deconvolution).stride_w;
        iVar170 = (this->super_Deconvolution).stride_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        pvVar20 = (this->super_Deconvolution).bias_data.data;
        uVar155 = (this->super_Deconvolution).kernel_w;
        uVar11 = (this->super_Deconvolution).kernel_h;
        auVar337 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar338 = vxorps_avx512dq(auVar337,(undefined1  [64])_ps512_cephes_log_q2);
        auVar339 = vxorps_avx512dq(auVar337,(undefined1  [64])_ps512_cephes_log_q1);
        auVar340 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar341 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar337);
        local_308 = 0;
        auVar174 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
        in_ZMM29 = ZEXT1664(auVar174);
        auVar342 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar280 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
        do {
          local_1c8._0_4_ = local_248.h;
          if (0 < local_248.h) {
            iVar13 = bottom_blob->w;
            iVar151 = bottom_blob->h;
            pauVar162 = (undefined1 (*) [64])
                        (local_248.cstep * local_308 *
                         CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) +
                        (long)local_248.data);
            uVar12 = bottom_blob->c;
            iVar166 = 0;
            do {
              if (0 < local_248.w) {
                uVar147 = 0;
                iVar343 = (1 - uVar155) * iVar9;
                do {
                  if (pvVar20 == (void *)0x0) {
                    auVar281 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar281 = *(undefined1 (*) [64])((long)pvVar20 + local_308 * 0x40);
                  }
                  if (0 < (int)uVar12) {
                    pvVar154 = (void *)((this->weight_data_tm).cstep * local_308 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    pvVar15 = bottom_blob->data;
                    uVar149 = 0;
                    do {
                      if (0 < (int)uVar11) {
                        uVar146 = 0;
                        uVar161 = 0;
                        do {
                          iVar139 = (((int)uVar161 - uVar11) + 1) * iVar10 + iVar166;
                          if ((((-1 < iVar139) &&
                               (iVar140 = iVar139 / iVar170, iVar139 % iVar170 == 0)) &&
                              (0 < (int)uVar155)) && (iVar140 < iVar151)) {
                            lVar167 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                                      bottom_blob->cstep * bottom_blob->elemsize * uVar149;
                            uVar153 = (ulong)uVar155;
                            uVar158 = uVar146;
                            iVar139 = iVar343;
                            do {
                              if (((-1 < iVar139) &&
                                  (iVar140 = iVar139 / iVar138, iVar139 % iVar138 == 0)) &&
                                 (iVar140 < iVar13)) {
                                lVar157 = (long)(iVar140 << 3);
                                auVar282 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167)));
                                auVar283 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 4)));
                                auVar284 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 8)));
                                in_ZMM17 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0xc))
                                                     );
                                auVar285 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x10)
                                                             ));
                                auVar286 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x14)
                                                             ));
                                auVar287 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x18)
                                                             ));
                                auVar288 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x1c)
                                                             ));
                                uVar172 = uVar158 & 0xffffffff;
                                auVar281 = vfmadd231ps_avx512f(auVar281,auVar282,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 + uVar172 * 4));
                                auVar281 = vfmadd231ps_avx512f(auVar281,auVar283,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 + uVar172 * 4 + 0x40
                                                                ));
                                auVar281 = vfmadd231ps_avx512f(auVar281,auVar284,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 + uVar172 * 4 + 0x80
                                                                ));
                                auVar281 = vfmadd231ps_avx512f(auVar281,in_ZMM17,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 + uVar172 * 4 + 0xc0
                                                                ));
                                auVar281 = vfmadd231ps_avx512f(auVar281,auVar285,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 +
                                                                uVar172 * 4 + 0x100));
                                auVar281 = vfmadd231ps_avx512f(auVar281,auVar286,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 +
                                                                uVar172 * 4 + 0x140));
                                auVar281 = vfmadd231ps_avx512f(auVar281,auVar287,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 +
                                                                uVar172 * 4 + 0x180));
                                auVar281 = vfmadd231ps_avx512f(auVar281,auVar288,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 +
                                                                uVar172 * 4 + 0x1c0));
                              }
                              uVar158 = uVar158 + 0x80;
                              iVar139 = iVar139 + iVar9;
                              uVar153 = uVar153 - 1;
                            } while (uVar153 != 0);
                          }
                          uVar161 = uVar161 + 1;
                          uVar146 = uVar146 + (ulong)uVar155 * 0x80;
                        } while (uVar161 != uVar11);
                      }
                      pvVar154 = (void *)((long)pvVar154 + (long)(int)(uVar155 * uVar11 * 0x80) * 4)
                      ;
                      uVar149 = uVar149 + 1;
                    } while (uVar149 != uVar12);
                  }
                  switch(iVar156) {
                  case 1:
                    auVar281 = vmaxps_avx512f(auVar281,in_ZMM29);
                    break;
                  case 2:
                    uVar149 = vcmpps_avx512f(auVar281,in_ZMM29,1);
                    uVar3 = *(this->super_Deconvolution).activation_params.data;
                    auVar126._4_4_ = uVar3;
                    auVar126._0_4_ = uVar3;
                    auVar126._8_4_ = uVar3;
                    auVar126._12_4_ = uVar3;
                    auVar126._16_4_ = uVar3;
                    auVar126._20_4_ = uVar3;
                    auVar126._24_4_ = uVar3;
                    auVar126._28_4_ = uVar3;
                    auVar126._32_4_ = uVar3;
                    auVar126._36_4_ = uVar3;
                    auVar126._40_4_ = uVar3;
                    auVar126._44_4_ = uVar3;
                    auVar126._48_4_ = uVar3;
                    auVar126._52_4_ = uVar3;
                    auVar126._56_4_ = uVar3;
                    auVar126._60_4_ = uVar3;
                    auVar282 = vmulps_avx512f(auVar281,auVar126);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar297._0_4_ = (uint)bVar24 * auVar282._0_4_ | (uint)!bVar24 * auVar281._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar297._4_4_ = (uint)bVar24 * auVar282._4_4_ | (uint)!bVar24 * auVar281._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar297._8_4_ = (uint)bVar24 * auVar282._8_4_ | (uint)!bVar24 * auVar281._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar297._12_4_ =
                         (uint)bVar24 * auVar282._12_4_ | (uint)!bVar24 * auVar281._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar297._16_4_ =
                         (uint)bVar24 * auVar282._16_4_ | (uint)!bVar24 * auVar281._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar297._20_4_ =
                         (uint)bVar24 * auVar282._20_4_ | (uint)!bVar24 * auVar281._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar297._24_4_ =
                         (uint)bVar24 * auVar282._24_4_ | (uint)!bVar24 * auVar281._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar297._28_4_ =
                         (uint)bVar24 * auVar282._28_4_ | (uint)!bVar24 * auVar281._28_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                    auVar297._32_4_ =
                         (uint)bVar24 * auVar282._32_4_ | (uint)!bVar24 * auVar281._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar297._36_4_ =
                         (uint)bVar24 * auVar282._36_4_ | (uint)!bVar24 * auVar281._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar297._40_4_ =
                         (uint)bVar24 * auVar282._40_4_ | (uint)!bVar24 * auVar281._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar297._44_4_ =
                         (uint)bVar24 * auVar282._44_4_ | (uint)!bVar24 * auVar281._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar297._48_4_ =
                         (uint)bVar24 * auVar282._48_4_ | (uint)!bVar24 * auVar281._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar297._52_4_ =
                         (uint)bVar24 * auVar282._52_4_ | (uint)!bVar24 * auVar281._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar297._56_4_ =
                         (uint)bVar24 * auVar282._56_4_ | (uint)!bVar24 * auVar281._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar297._60_4_ =
                         (uint)bVar24 * auVar282._60_4_ | (uint)!bVar24 * auVar281._60_4_;
                    auVar281 = auVar297;
                    break;
                  case 3:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar124._4_4_ = uVar3;
                    auVar124._0_4_ = uVar3;
                    auVar124._8_4_ = uVar3;
                    auVar124._12_4_ = uVar3;
                    auVar124._16_4_ = uVar3;
                    auVar124._20_4_ = uVar3;
                    auVar124._24_4_ = uVar3;
                    auVar124._28_4_ = uVar3;
                    auVar124._32_4_ = uVar3;
                    auVar124._36_4_ = uVar3;
                    auVar124._40_4_ = uVar3;
                    auVar124._44_4_ = uVar3;
                    auVar124._48_4_ = uVar3;
                    auVar124._52_4_ = uVar3;
                    auVar124._56_4_ = uVar3;
                    auVar124._60_4_ = uVar3;
                    auVar281 = vmaxps_avx512f(auVar281,auVar124);
                    uVar3 = puVar16[1];
                    auVar125._4_4_ = uVar3;
                    auVar125._0_4_ = uVar3;
                    auVar125._8_4_ = uVar3;
                    auVar125._12_4_ = uVar3;
                    auVar125._16_4_ = uVar3;
                    auVar125._20_4_ = uVar3;
                    auVar125._24_4_ = uVar3;
                    auVar125._28_4_ = uVar3;
                    auVar125._32_4_ = uVar3;
                    auVar125._36_4_ = uVar3;
                    auVar125._40_4_ = uVar3;
                    auVar125._44_4_ = uVar3;
                    auVar125._48_4_ = uVar3;
                    auVar125._52_4_ = uVar3;
                    auVar125._56_4_ = uVar3;
                    auVar125._60_4_ = uVar3;
                    auVar281 = vminps_avx512f(auVar281,auVar125);
                    break;
                  case 4:
                    auVar281 = vxorps_avx512dq(auVar281,auVar337);
                    auVar281 = vminps_avx512f(auVar281,(undefined1  [64])afVar313);
                    auVar281 = vmaxps_avx512f(auVar281,(undefined1  [64])afVar314);
                    auVar282 = vfmadd213ps_avx512f((undefined1  [64])afVar315,auVar281,
                                                   (undefined1  [64])afVar321);
                    auVar283 = vrndscaleps_avx512f(auVar282,1);
                    uVar149 = vcmpps_avx512f(auVar282,auVar283,1);
                    auVar282 = vsubps_avx512f(auVar283,(undefined1  [64])afVar312);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar296._0_4_ = (uint)bVar24 * auVar282._0_4_ | (uint)!bVar24 * auVar283._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar296._4_4_ = (uint)bVar24 * auVar282._4_4_ | (uint)!bVar24 * auVar283._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar296._8_4_ = (uint)bVar24 * auVar282._8_4_ | (uint)!bVar24 * auVar283._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar296._12_4_ =
                         (uint)bVar24 * auVar282._12_4_ | (uint)!bVar24 * auVar283._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar296._16_4_ =
                         (uint)bVar24 * auVar282._16_4_ | (uint)!bVar24 * auVar283._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar296._20_4_ =
                         (uint)bVar24 * auVar282._20_4_ | (uint)!bVar24 * auVar283._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar296._24_4_ =
                         (uint)bVar24 * auVar282._24_4_ | (uint)!bVar24 * auVar283._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar296._28_4_ =
                         (uint)bVar24 * auVar282._28_4_ | (uint)!bVar24 * auVar283._28_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                    auVar296._32_4_ =
                         (uint)bVar24 * auVar282._32_4_ | (uint)!bVar24 * auVar283._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar296._36_4_ =
                         (uint)bVar24 * auVar282._36_4_ | (uint)!bVar24 * auVar283._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar296._40_4_ =
                         (uint)bVar24 * auVar282._40_4_ | (uint)!bVar24 * auVar283._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar296._44_4_ =
                         (uint)bVar24 * auVar282._44_4_ | (uint)!bVar24 * auVar283._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar296._48_4_ =
                         (uint)bVar24 * auVar282._48_4_ | (uint)!bVar24 * auVar283._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar296._52_4_ =
                         (uint)bVar24 * auVar282._52_4_ | (uint)!bVar24 * auVar283._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar296._56_4_ =
                         (uint)bVar24 * auVar282._56_4_ | (uint)!bVar24 * auVar283._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar296._60_4_ =
                         (uint)bVar24 * auVar282._60_4_ | (uint)!bVar24 * auVar283._60_4_;
                    auVar281 = vfmadd231ps_avx512f(auVar281,auVar296,auVar338);
                    auVar281 = vfmadd231ps_avx512f(auVar281,auVar296,auVar339);
                    auVar282 = vmulps_avx512f(auVar281,auVar281);
                    auVar283 = vfmadd213ps_avx512f(auVar281,(undefined1  [64])afVar316,
                                                   (undefined1  [64])afVar317);
                    auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar318);
                    auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar319);
                    auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar320);
                    auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar321);
                    auVar281 = vfmadd213ps_avx512f(auVar283,auVar282,auVar281);
                    auVar281 = vaddps_avx512f(auVar281,(undefined1  [64])afVar312);
                    auVar282 = vcvttps2dq_avx512f(auVar296);
                    auVar282 = vpaddd_avx512f(auVar282,auVar340);
                    auVar282 = vpslld_avx512f(auVar282,0x17);
                    auVar281 = vfmadd213ps_avx512f(auVar282,auVar281,auVar342);
                    auVar281 = vdivps_avx512f(auVar342,auVar281);
                    break;
                  case 5:
                    auVar282 = vminps_avx512f(auVar281,(undefined1  [64])afVar313);
                    auVar282 = vmaxps_avx512f(auVar282,(undefined1  [64])afVar314);
                    auVar283 = vfmadd213ps_avx512f((undefined1  [64])afVar315,auVar282,
                                                   (undefined1  [64])afVar321);
                    auVar284 = vrndscaleps_avx512f(auVar283,1);
                    uVar149 = vcmpps_avx512f(auVar283,auVar284,1);
                    auVar283 = vsubps_avx512f(auVar284,(undefined1  [64])afVar312);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar291._0_4_ = (uint)bVar24 * auVar283._0_4_ | (uint)!bVar24 * auVar284._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar291._4_4_ = (uint)bVar24 * auVar283._4_4_ | (uint)!bVar24 * auVar284._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar291._8_4_ = (uint)bVar24 * auVar283._8_4_ | (uint)!bVar24 * auVar284._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar291._12_4_ =
                         (uint)bVar24 * auVar283._12_4_ | (uint)!bVar24 * auVar284._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar291._16_4_ =
                         (uint)bVar24 * auVar283._16_4_ | (uint)!bVar24 * auVar284._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar291._20_4_ =
                         (uint)bVar24 * auVar283._20_4_ | (uint)!bVar24 * auVar284._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar291._24_4_ =
                         (uint)bVar24 * auVar283._24_4_ | (uint)!bVar24 * auVar284._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar291._28_4_ =
                         (uint)bVar24 * auVar283._28_4_ | (uint)!bVar24 * auVar284._28_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                    auVar291._32_4_ =
                         (uint)bVar24 * auVar283._32_4_ | (uint)!bVar24 * auVar284._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar291._36_4_ =
                         (uint)bVar24 * auVar283._36_4_ | (uint)!bVar24 * auVar284._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar291._40_4_ =
                         (uint)bVar24 * auVar283._40_4_ | (uint)!bVar24 * auVar284._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar291._44_4_ =
                         (uint)bVar24 * auVar283._44_4_ | (uint)!bVar24 * auVar284._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar291._48_4_ =
                         (uint)bVar24 * auVar283._48_4_ | (uint)!bVar24 * auVar284._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar291._52_4_ =
                         (uint)bVar24 * auVar283._52_4_ | (uint)!bVar24 * auVar284._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar291._56_4_ =
                         (uint)bVar24 * auVar283._56_4_ | (uint)!bVar24 * auVar284._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar291._60_4_ =
                         (uint)bVar24 * auVar283._60_4_ | (uint)!bVar24 * auVar284._60_4_;
                    auVar282 = vfmadd231ps_avx512f(auVar282,auVar291,auVar338);
                    auVar282 = vfmadd231ps_avx512f(auVar282,auVar291,auVar339);
                    auVar283 = vmulps_avx512f(auVar282,auVar282);
                    auVar284 = vfmadd213ps_avx512f(auVar282,(undefined1  [64])afVar316,
                                                   (undefined1  [64])afVar317);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar318);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar319);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar320);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar321);
                    auVar282 = vfmadd213ps_avx512f(auVar284,auVar283,auVar282);
                    auVar282 = vaddps_avx512f(auVar282,(undefined1  [64])afVar312);
                    auVar283 = vcvttps2dq_avx512f(auVar291);
                    auVar283 = vpaddd_avx512f(auVar283,auVar340);
                    auVar283 = vpslld_avx512f(auVar283,0x17);
                    auVar282 = vfmadd213ps_avx512f(auVar283,auVar282,auVar342);
                    auVar283 = vmaxps_avx512f(auVar282,(undefined1  [64])_ps512_min_norm_pos);
                    auVar284 = vpsrld_avx512f(auVar283,0x17);
                    auVar283 = vpternlogd_avx512f(auVar283,(undefined1  [64])afVar321,
                                                  (undefined1  [64])_ps512_inv_mant_mask,0xec);
                    uVar149 = vcmpps_avx512f(auVar283,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                    auVar285 = vsubps_avx512f(auVar283,(undefined1  [64])afVar312);
                    auVar283 = vaddps_avx512f(auVar285,auVar283);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar292._0_4_ = (uint)bVar24 * auVar283._0_4_ | (uint)!bVar24 * auVar285._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar292._4_4_ = (uint)bVar24 * auVar283._4_4_ | (uint)!bVar24 * auVar285._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar292._8_4_ = (uint)bVar24 * auVar283._8_4_ | (uint)!bVar24 * auVar285._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar292._12_4_ =
                         (uint)bVar24 * auVar283._12_4_ | (uint)!bVar24 * auVar285._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar292._16_4_ =
                         (uint)bVar24 * auVar283._16_4_ | (uint)!bVar24 * auVar285._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar292._20_4_ =
                         (uint)bVar24 * auVar283._20_4_ | (uint)!bVar24 * auVar285._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar292._24_4_ =
                         (uint)bVar24 * auVar283._24_4_ | (uint)!bVar24 * auVar285._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar292._28_4_ =
                         (uint)bVar24 * auVar283._28_4_ | (uint)!bVar24 * auVar285._28_4_;
                    bVar32 = (byte)(uVar149 >> 8);
                    bVar24 = (bool)(bVar32 & 1);
                    auVar292._32_4_ =
                         (uint)bVar24 * auVar283._32_4_ | (uint)!bVar24 * auVar285._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar292._36_4_ =
                         (uint)bVar24 * auVar283._36_4_ | (uint)!bVar24 * auVar285._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar292._40_4_ =
                         (uint)bVar24 * auVar283._40_4_ | (uint)!bVar24 * auVar285._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar292._44_4_ =
                         (uint)bVar24 * auVar283._44_4_ | (uint)!bVar24 * auVar285._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar292._48_4_ =
                         (uint)bVar24 * auVar283._48_4_ | (uint)!bVar24 * auVar285._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar292._52_4_ =
                         (uint)bVar24 * auVar283._52_4_ | (uint)!bVar24 * auVar285._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar292._56_4_ =
                         (uint)bVar24 * auVar283._56_4_ | (uint)!bVar24 * auVar285._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar292._60_4_ =
                         (uint)bVar24 * auVar283._60_4_ | (uint)!bVar24 * auVar285._60_4_;
                    auVar283 = vmulps_avx512f(auVar292,auVar292);
                    auVar285 = vfmadd132ps_avx512f(auVar292,(undefined1  [64])_ps512_cephes_log_p1,
                                                   (undefined1  [64])_ps512_cephes_log_p0);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar292,
                                                   (undefined1  [64])_ps512_cephes_log_p2);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar292,
                                                   (undefined1  [64])_ps512_cephes_log_p3);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar292,(undefined1  [64])afVar322);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar292,(undefined1  [64])afVar462);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar292,(undefined1  [64])afVar323);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar292,(undefined1  [64])afVar324);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar292,(undefined1  [64])afVar325);
                    auVar286 = vmulps_avx512f(auVar283,auVar292);
                    auVar285 = vfmadd213ps_avx512f(auVar286,auVar285,auVar292);
                    uVar161 = vcmpps_avx512f(auVar282,in_ZMM29,2);
                    auVar282 = vpsubd_avx512f(auVar284,auVar340);
                    auVar282 = vcvtdq2ps_avx512f(auVar282);
                    auVar284 = vaddps_avx512f(auVar282,(undefined1  [64])afVar312);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar293._0_4_ = (uint)bVar24 * auVar282._0_4_ | (uint)!bVar24 * auVar284._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar293._4_4_ = (uint)bVar24 * auVar282._4_4_ | (uint)!bVar24 * auVar284._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar293._8_4_ = (uint)bVar24 * auVar282._8_4_ | (uint)!bVar24 * auVar284._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar293._12_4_ =
                         (uint)bVar24 * auVar282._12_4_ | (uint)!bVar24 * auVar284._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar293._16_4_ =
                         (uint)bVar24 * auVar282._16_4_ | (uint)!bVar24 * auVar284._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar293._20_4_ =
                         (uint)bVar24 * auVar282._20_4_ | (uint)!bVar24 * auVar284._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar293._24_4_ =
                         (uint)bVar24 * auVar282._24_4_ | (uint)!bVar24 * auVar284._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar293._28_4_ =
                         (uint)bVar24 * auVar282._28_4_ | (uint)!bVar24 * auVar284._28_4_;
                    bVar24 = (bool)(bVar32 & 1);
                    auVar293._32_4_ =
                         (uint)bVar24 * auVar282._32_4_ | (uint)!bVar24 * auVar284._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar293._36_4_ =
                         (uint)bVar24 * auVar282._36_4_ | (uint)!bVar24 * auVar284._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar293._40_4_ =
                         (uint)bVar24 * auVar282._40_4_ | (uint)!bVar24 * auVar284._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar293._44_4_ =
                         (uint)bVar24 * auVar282._44_4_ | (uint)!bVar24 * auVar284._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar293._48_4_ =
                         (uint)bVar24 * auVar282._48_4_ | (uint)!bVar24 * auVar284._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar293._52_4_ =
                         (uint)bVar24 * auVar282._52_4_ | (uint)!bVar24 * auVar284._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar293._56_4_ =
                         (uint)bVar24 * auVar282._56_4_ | (uint)!bVar24 * auVar284._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar293._60_4_ =
                         (uint)bVar24 * auVar282._60_4_ | (uint)!bVar24 * auVar284._60_4_;
                    auVar282 = vfmadd231ps_avx512f(auVar285,auVar293,
                                                   (undefined1  [64])_ps512_cephes_log_q1);
                    auVar282 = vfmadd231ps_avx512f(auVar282,auVar341,auVar283);
                    auVar282 = vfmadd231ps_avx512f(auVar282,auVar293,
                                                   (undefined1  [64])_ps512_cephes_log_q2);
                    auVar282 = vmulps_avx512f(auVar282,auVar280);
                    auVar283 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar294._0_4_ = (uint)bVar24 * auVar283._0_4_ | (uint)!bVar24 * auVar282._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar294._4_4_ = (uint)bVar24 * auVar283._4_4_ | (uint)!bVar24 * auVar282._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar294._8_4_ = (uint)bVar24 * auVar283._8_4_ | (uint)!bVar24 * auVar282._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar294._12_4_ =
                         (uint)bVar24 * auVar283._12_4_ | (uint)!bVar24 * auVar282._12_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 4) & 1);
                    auVar294._16_4_ =
                         (uint)bVar24 * auVar283._16_4_ | (uint)!bVar24 * auVar282._16_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 5) & 1);
                    auVar294._20_4_ =
                         (uint)bVar24 * auVar283._20_4_ | (uint)!bVar24 * auVar282._20_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 6) & 1);
                    auVar294._24_4_ =
                         (uint)bVar24 * auVar283._24_4_ | (uint)!bVar24 * auVar282._24_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 7) & 1);
                    auVar294._28_4_ =
                         (uint)bVar24 * auVar283._28_4_ | (uint)!bVar24 * auVar282._28_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 8) & 1);
                    auVar294._32_4_ =
                         (uint)bVar24 * auVar283._32_4_ | (uint)!bVar24 * auVar282._32_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 9) & 1);
                    auVar294._36_4_ =
                         (uint)bVar24 * auVar283._36_4_ | (uint)!bVar24 * auVar282._36_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 10) & 1);
                    auVar294._40_4_ =
                         (uint)bVar24 * auVar283._40_4_ | (uint)!bVar24 * auVar282._40_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 0xb) & 1);
                    auVar294._44_4_ =
                         (uint)bVar24 * auVar283._44_4_ | (uint)!bVar24 * auVar282._44_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 0xc) & 1);
                    auVar294._48_4_ =
                         (uint)bVar24 * auVar283._48_4_ | (uint)!bVar24 * auVar282._48_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 0xd) & 1);
                    auVar294._52_4_ =
                         (uint)bVar24 * auVar283._52_4_ | (uint)!bVar24 * auVar282._52_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 0xe) & 1);
                    auVar294._56_4_ =
                         (uint)bVar24 * auVar283._56_4_ | (uint)!bVar24 * auVar282._56_4_;
                    bVar24 = SUB81(uVar161 >> 0xf,0);
                    auVar294._60_4_ =
                         (uint)bVar24 * auVar283._60_4_ | (uint)!bVar24 * auVar282._60_4_;
                    auVar282 = vminps_avx512f(auVar294,(undefined1  [64])afVar313);
                    auVar282 = vmaxps_avx512f(auVar282,(undefined1  [64])afVar314);
                    auVar283 = vfmadd213ps_avx512f((undefined1  [64])afVar315,auVar282,
                                                   (undefined1  [64])afVar321);
                    auVar284 = vrndscaleps_avx512f(auVar283,1);
                    uVar149 = vcmpps_avx512f(auVar283,auVar284,1);
                    auVar283 = vsubps_avx512f(auVar284,(undefined1  [64])afVar312);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar295._0_4_ = (uint)bVar24 * auVar283._0_4_ | (uint)!bVar24 * auVar284._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar295._4_4_ = (uint)bVar24 * auVar283._4_4_ | (uint)!bVar24 * auVar284._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar295._8_4_ = (uint)bVar24 * auVar283._8_4_ | (uint)!bVar24 * auVar284._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar295._12_4_ =
                         (uint)bVar24 * auVar283._12_4_ | (uint)!bVar24 * auVar284._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar295._16_4_ =
                         (uint)bVar24 * auVar283._16_4_ | (uint)!bVar24 * auVar284._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar295._20_4_ =
                         (uint)bVar24 * auVar283._20_4_ | (uint)!bVar24 * auVar284._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar295._24_4_ =
                         (uint)bVar24 * auVar283._24_4_ | (uint)!bVar24 * auVar284._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar295._28_4_ =
                         (uint)bVar24 * auVar283._28_4_ | (uint)!bVar24 * auVar284._28_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                    auVar295._32_4_ =
                         (uint)bVar24 * auVar283._32_4_ | (uint)!bVar24 * auVar284._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar295._36_4_ =
                         (uint)bVar24 * auVar283._36_4_ | (uint)!bVar24 * auVar284._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar295._40_4_ =
                         (uint)bVar24 * auVar283._40_4_ | (uint)!bVar24 * auVar284._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar295._44_4_ =
                         (uint)bVar24 * auVar283._44_4_ | (uint)!bVar24 * auVar284._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar295._48_4_ =
                         (uint)bVar24 * auVar283._48_4_ | (uint)!bVar24 * auVar284._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar295._52_4_ =
                         (uint)bVar24 * auVar283._52_4_ | (uint)!bVar24 * auVar284._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar295._56_4_ =
                         (uint)bVar24 * auVar283._56_4_ | (uint)!bVar24 * auVar284._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar295._60_4_ =
                         (uint)bVar24 * auVar283._60_4_ | (uint)!bVar24 * auVar284._60_4_;
                    auVar282 = vfmadd231ps_avx512f(auVar282,auVar295,auVar338);
                    auVar282 = vfmadd231ps_avx512f(auVar282,auVar295,auVar339);
                    auVar283 = vmulps_avx512f(auVar282,auVar282);
                    auVar284 = vfmadd213ps_avx512f(auVar282,(undefined1  [64])afVar316,
                                                   (undefined1  [64])afVar317);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar318);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar319);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar320);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar321);
                    in_ZMM17 = vfmadd213ps_avx512f(auVar284,auVar283,auVar282);
                    auVar282 = vaddps_avx512f(in_ZMM17,(undefined1  [64])afVar312);
                    auVar283 = vcvttps2dq_avx512f(auVar295);
                    auVar283 = vpaddd_avx512f(auVar283,auVar340);
                    auVar283 = vpslld_avx512f(auVar283,0x17);
                    auVar282 = vfmadd213ps_avx512f(auVar283,auVar282,auVar342);
                    auVar282 = vdivps_avx512f(auVar342,auVar282);
                    auVar282 = vfnmsub213ps_avx512f(auVar282,auVar280,auVar342);
                    goto LAB_0029fda1;
                  case 6:
                    puVar1 = (uint *)(this->super_Deconvolution).activation_params.data;
                    auVar282 = vbroadcastss_avx512f(ZEXT416(*puVar1));
                    uVar2 = puVar1[1];
                    auVar290._4_4_ = uVar2;
                    auVar290._0_4_ = uVar2;
                    auVar290._8_4_ = uVar2;
                    auVar290._12_4_ = uVar2;
                    auVar290._16_4_ = uVar2;
                    auVar290._20_4_ = uVar2;
                    auVar290._24_4_ = uVar2;
                    auVar290._28_4_ = uVar2;
                    auVar290._32_4_ = uVar2;
                    auVar290._36_4_ = uVar2;
                    auVar290._40_4_ = uVar2;
                    auVar290._44_4_ = uVar2;
                    auVar290._48_4_ = uVar2;
                    auVar290._52_4_ = uVar2;
                    auVar290._56_4_ = uVar2;
                    auVar290._60_4_ = uVar2;
                    auVar282 = vfmadd213ps_avx512f(auVar282,auVar281,auVar290);
                    auVar282 = vmaxps_avx512f(auVar282,in_ZMM29);
                    auVar282 = vminps_avx512f(auVar282,auVar342);
LAB_0029fda1:
                    auVar281 = vmulps_avx512f(auVar282,auVar281);
                  }
                  *pauVar162 = auVar281;
                  pauVar162 = pauVar162 + 1;
                  uVar147 = uVar147 + 1;
                  iVar343 = iVar343 + 1;
                } while (uVar147 != local_248.w);
              }
              iVar166 = iVar166 + 1;
            } while (iVar166 != local_248.h);
          }
          local_308 = local_308 + 1;
          in_ZMM10 = afVar316;
        } while (local_308 != (long)local_248.c);
      }
      if (((local_d8._0_4_ == 0x10) && (uVar152 == 8)) && (0 < (long)local_248.c)) {
        iVar9 = (this->super_Deconvolution).dilation_w;
        iVar10 = (this->super_Deconvolution).dilation_h;
        iVar138 = (this->super_Deconvolution).stride_w;
        iVar170 = (this->super_Deconvolution).stride_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        pvVar20 = (this->super_Deconvolution).bias_data.data;
        uVar155 = (this->super_Deconvolution).kernel_w;
        uVar11 = (this->super_Deconvolution).kernel_h;
        local_308 = 0;
        auVar250._8_4_ = 0x42b0c0a5;
        auVar250._0_8_ = 0x42b0c0a542b0c0a5;
        auVar250._12_4_ = 0x42b0c0a5;
        auVar250._16_4_ = 0x42b0c0a5;
        auVar250._20_4_ = 0x42b0c0a5;
        auVar250._24_4_ = 0x42b0c0a5;
        auVar250._28_4_ = 0x42b0c0a5;
        auVar251._8_4_ = 0xc2b0c0a5;
        auVar251._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar251._12_4_ = 0xc2b0c0a5;
        auVar251._16_4_ = 0xc2b0c0a5;
        auVar251._20_4_ = 0xc2b0c0a5;
        auVar251._24_4_ = 0xc2b0c0a5;
        auVar251._28_4_ = 0xc2b0c0a5;
        auVar252._8_4_ = 0x3f000000;
        auVar252._0_8_ = 0x3f0000003f000000;
        auVar252._12_4_ = 0x3f000000;
        auVar252._16_4_ = 0x3f000000;
        auVar252._20_4_ = 0x3f000000;
        auVar252._24_4_ = 0x3f000000;
        auVar252._28_4_ = 0x3f000000;
        auVar253._8_4_ = 0x3fb8aa3b;
        auVar253._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar253._12_4_ = 0x3fb8aa3b;
        auVar253._16_4_ = 0x3fb8aa3b;
        auVar253._20_4_ = 0x3fb8aa3b;
        auVar253._24_4_ = 0x3fb8aa3b;
        auVar253._28_4_ = 0x3fb8aa3b;
        auVar254._8_4_ = 0x3f800000;
        auVar254._0_8_ = 0x3f8000003f800000;
        auVar254._12_4_ = 0x3f800000;
        auVar254._16_4_ = 0x3f800000;
        auVar254._20_4_ = 0x3f800000;
        auVar254._24_4_ = 0x3f800000;
        auVar254._28_4_ = 0x3f800000;
        auVar255._8_4_ = 0x3f318000;
        auVar255._0_8_ = 0x3f3180003f318000;
        auVar255._12_4_ = 0x3f318000;
        auVar255._16_4_ = 0x3f318000;
        auVar255._20_4_ = 0x3f318000;
        auVar255._24_4_ = 0x3f318000;
        auVar255._28_4_ = 0x3f318000;
        auVar228 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar256._8_4_ = 0x3ab743ce;
        auVar256._0_8_ = 0x3ab743ce3ab743ce;
        auVar256._12_4_ = 0x3ab743ce;
        auVar256._16_4_ = 0x3ab743ce;
        auVar256._20_4_ = 0x3ab743ce;
        auVar256._24_4_ = 0x3ab743ce;
        auVar256._28_4_ = 0x3ab743ce;
        in_ZMM10 = (float  [16])ZEXT3264(auVar256);
        auVar257._8_4_ = 0x3c088908;
        auVar257._0_8_ = 0x3c0889083c088908;
        auVar257._12_4_ = 0x3c088908;
        auVar257._16_4_ = 0x3c088908;
        auVar257._20_4_ = 0x3c088908;
        auVar257._24_4_ = 0x3c088908;
        auVar257._28_4_ = 0x3c088908;
        auVar258._8_4_ = 0x3d2aa9c1;
        auVar258._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar258._12_4_ = 0x3d2aa9c1;
        auVar258._16_4_ = 0x3d2aa9c1;
        auVar258._20_4_ = 0x3d2aa9c1;
        auVar258._24_4_ = 0x3d2aa9c1;
        auVar258._28_4_ = 0x3d2aa9c1;
        auVar259._8_4_ = 0x3e2aaaaa;
        auVar259._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar259._12_4_ = 0x3e2aaaaa;
        auVar259._16_4_ = 0x3e2aaaaa;
        auVar259._20_4_ = 0x3e2aaaaa;
        auVar259._24_4_ = 0x3e2aaaaa;
        auVar259._28_4_ = 0x3e2aaaaa;
        auVar260._8_4_ = 0x3f800000;
        auVar260._0_8_ = 0x3f8000003f800000;
        auVar260._12_4_ = 0x3f800000;
        auVar260._16_4_ = 0x3f800000;
        auVar260._20_4_ = 0x3f800000;
        auVar260._24_4_ = 0x3f800000;
        auVar260._28_4_ = 0x3f800000;
        auVar261._8_4_ = 0xb95e8083;
        auVar261._0_8_ = 0xb95e8083b95e8083;
        auVar261._12_4_ = 0xb95e8083;
        auVar261._16_4_ = 0xb95e8083;
        auVar261._20_4_ = 0xb95e8083;
        auVar261._24_4_ = 0xb95e8083;
        auVar261._28_4_ = 0xb95e8083;
        auVar229 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          local_1c8._0_4_ = local_248.h;
          if (0 < local_248.h) {
            iVar13 = bottom_blob->w;
            iVar151 = bottom_blob->h;
            pauVar163 = (undefined1 (*) [32])
                        (local_248.cstep * local_308 *
                         CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) +
                        (long)local_248.data);
            uVar12 = bottom_blob->c;
            iVar166 = 0;
            do {
              if (0 < local_248.w) {
                uVar147 = 0;
                iVar343 = (1 - uVar155) * iVar9;
                do {
                  if (pvVar20 == (void *)0x0) {
                    auVar337 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar337 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar20 + local_308 * 0x20));
                  }
                  if (0 < (int)uVar12) {
                    pvVar154 = (void *)((this->weight_data_tm).cstep * local_308 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    pvVar15 = bottom_blob->data;
                    uVar149 = 0;
                    do {
                      if (0 < (int)uVar11) {
                        uVar161 = 0;
                        uVar146 = 0;
                        do {
                          iVar139 = (((int)uVar146 - uVar11) + 1) * iVar10 + iVar166;
                          if ((((-1 < iVar139) &&
                               (iVar140 = iVar139 / iVar170, iVar139 % iVar170 == 0)) &&
                              (0 < (int)uVar155)) && (iVar140 < iVar151)) {
                            lVar167 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                                      bottom_blob->cstep * bottom_blob->elemsize * uVar149;
                            uVar153 = (ulong)uVar155;
                            uVar158 = uVar161;
                            iVar139 = iVar343;
                            do {
                              if (((-1 < iVar139) &&
                                  (iVar140 = iVar139 / iVar138, iVar139 % iVar138 == 0)) &&
                                 (iVar140 < iVar13)) {
                                lVar157 = (long)(iVar140 << 4);
                                uVar3 = *(undefined4 *)((long)pvVar15 + lVar157 * 4 + lVar167);
                                auVar446._4_4_ = uVar3;
                                auVar446._0_4_ = uVar3;
                                auVar446._8_4_ = uVar3;
                                auVar446._12_4_ = uVar3;
                                auVar446._16_4_ = uVar3;
                                auVar446._20_4_ = uVar3;
                                auVar446._24_4_ = uVar3;
                                auVar446._28_4_ = uVar3;
                                uVar3 = *(undefined4 *)((long)pvVar15 + lVar157 * 4 + lVar167 + 4);
                                auVar444._4_4_ = uVar3;
                                auVar444._0_4_ = uVar3;
                                auVar444._8_4_ = uVar3;
                                auVar444._12_4_ = uVar3;
                                auVar444._16_4_ = uVar3;
                                auVar444._20_4_ = uVar3;
                                auVar444._24_4_ = uVar3;
                                auVar444._28_4_ = uVar3;
                                auVar230 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 8)));
                                auVar231 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0xc))
                                                     );
                                in_ZMM17 = ZEXT3264(auVar231);
                                auVar232 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x10)
                                                             ));
                                auVar233 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x14)
                                                             ));
                                auVar234 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x18)
                                                             ));
                                auVar235 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x1c)
                                                             ));
                                auVar236 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x20)
                                                             ));
                                auVar237 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x24)
                                                             ));
                                auVar238 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x28)
                                                             ));
                                auVar239 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x2c)
                                                             ));
                                auVar240 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x30)
                                                             ));
                                auVar241 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x34)
                                                             ));
                                in_ZMM29 = ZEXT3264(auVar241);
                                auVar242 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x38)
                                                             ));
                                auVar243 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x3c)
                                                             ));
                                uVar172 = uVar158 & 0xffffffff;
                                auVar174 = vfmadd231ps_fma(auVar337._0_32_,auVar446,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar154 + uVar172 * 4));
                                auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar444,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar154 + uVar172 * 4 + 0x20));
                                auVar230 = vfmadd231ps_avx512vl
                                                     (ZEXT1632(auVar174),auVar230,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x40));
                                auVar230 = vfmadd231ps_avx512vl
                                                     (auVar230,auVar231,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x60));
                                auVar230 = vfmadd231ps_avx512vl
                                                     (auVar230,auVar232,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x80));
                                auVar230 = vfmadd231ps_avx512vl
                                                     (auVar230,auVar233,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0xa0));
                                auVar230 = vfmadd231ps_avx512vl
                                                     (auVar230,auVar234,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0xc0));
                                auVar230 = vfmadd231ps_avx512vl
                                                     (auVar230,auVar235,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0xe0));
                                auVar230 = vfmadd231ps_avx512vl
                                                     (auVar230,auVar236,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x100));
                                auVar230 = vfmadd231ps_avx512vl
                                                     (auVar230,auVar237,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x120));
                                auVar230 = vfmadd231ps_avx512vl
                                                     (auVar230,auVar238,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x140));
                                auVar230 = vfmadd231ps_avx512vl
                                                     (auVar230,auVar239,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x160));
                                auVar230 = vfmadd231ps_avx512vl
                                                     (auVar230,auVar240,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x180));
                                auVar230 = vfmadd231ps_avx512vl
                                                     (auVar230,auVar241,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x1a0));
                                auVar230 = vfmadd231ps_avx512vl
                                                     (auVar230,auVar242,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x1c0));
                                auVar230 = vfmadd231ps_avx512vl
                                                     (auVar230,auVar243,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x1e0));
                                auVar337 = ZEXT3264(auVar230);
                              }
                              uVar158 = uVar158 + 0x80;
                              iVar139 = iVar139 + iVar9;
                              uVar153 = uVar153 - 1;
                            } while (uVar153 != 0);
                          }
                          uVar146 = uVar146 + 1;
                          uVar161 = uVar161 + (ulong)uVar155 * 0x80;
                        } while (uVar146 != uVar11);
                      }
                      pvVar154 = (void *)((long)pvVar154 + (long)(int)(uVar155 * uVar11 * 0x80) * 4)
                      ;
                      uVar149 = uVar149 + 1;
                    } while (uVar149 != uVar12);
                  }
                  auVar230 = auVar337._0_32_;
                  auVar231 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                  switch(iVar156) {
                  case 1:
                    auVar230 = vmaxps_avx(auVar230,auVar231);
                    break;
                  case 2:
                    auVar232 = vmaxps_avx(auVar230,auVar231);
                    auVar230 = vminps_avx(auVar230,auVar231);
                    uVar3 = *(this->super_Deconvolution).activation_params.data;
                    auVar93._4_4_ = uVar3;
                    auVar93._0_4_ = uVar3;
                    auVar93._8_4_ = uVar3;
                    auVar93._12_4_ = uVar3;
                    auVar93._16_4_ = uVar3;
                    auVar93._20_4_ = uVar3;
                    auVar93._24_4_ = uVar3;
                    auVar93._28_4_ = uVar3;
                    auVar230 = vfmadd132ps_avx512vl(auVar230,auVar232,auVar93);
                    break;
                  case 3:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar91._4_4_ = uVar3;
                    auVar91._0_4_ = uVar3;
                    auVar91._8_4_ = uVar3;
                    auVar91._12_4_ = uVar3;
                    auVar91._16_4_ = uVar3;
                    auVar91._20_4_ = uVar3;
                    auVar91._24_4_ = uVar3;
                    auVar91._28_4_ = uVar3;
                    auVar230 = vmaxps_avx512vl(auVar230,auVar91);
                    uVar3 = puVar16[1];
                    auVar92._4_4_ = uVar3;
                    auVar92._0_4_ = uVar3;
                    auVar92._8_4_ = uVar3;
                    auVar92._12_4_ = uVar3;
                    auVar92._16_4_ = uVar3;
                    auVar92._20_4_ = uVar3;
                    auVar92._24_4_ = uVar3;
                    auVar92._28_4_ = uVar3;
                    auVar230 = vminps_avx512vl(auVar230,auVar92);
                    break;
                  case 4:
                    auVar89._8_4_ = 0x80000000;
                    auVar89._0_8_ = 0x8000000080000000;
                    auVar89._12_4_ = 0x80000000;
                    auVar89._16_4_ = 0x80000000;
                    auVar89._20_4_ = 0x80000000;
                    auVar89._24_4_ = 0x80000000;
                    auVar89._28_4_ = 0x80000000;
                    auVar230 = vxorps_avx512vl(auVar230,auVar89);
                    auVar230 = vminps_avx(auVar230,auVar250);
                    auVar230 = vmaxps_avx(auVar230,auVar251);
                    auVar174 = vfmadd231ps_fma(auVar252,auVar230,auVar253);
                    auVar231 = vrndscaleps_avx512vl(ZEXT1632(auVar174),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar174),auVar231,1);
                    auVar232 = vsubps_avx512vl(auVar231,auVar254);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar249._0_4_ = (uint)bVar24 * auVar232._0_4_ | (uint)!bVar24 * auVar231._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar249._4_4_ = (uint)bVar24 * auVar232._4_4_ | (uint)!bVar24 * auVar231._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar249._8_4_ = (uint)bVar24 * auVar232._8_4_ | (uint)!bVar24 * auVar231._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar249._12_4_ =
                         (uint)bVar24 * auVar232._12_4_ | (uint)!bVar24 * auVar231._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar249._16_4_ =
                         (uint)bVar24 * auVar232._16_4_ | (uint)!bVar24 * auVar231._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar249._20_4_ =
                         (uint)bVar24 * auVar232._20_4_ | (uint)!bVar24 * auVar231._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar249._24_4_ =
                         (uint)bVar24 * auVar232._24_4_ | (uint)!bVar24 * auVar231._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar249._28_4_ =
                         (uint)bVar24 * auVar232._28_4_ | (uint)!bVar24 * auVar231._28_4_;
                    auVar230 = vfmsub231ps_avx512vl(auVar230,auVar249,auVar255);
                    auVar90._8_4_ = 0x395e8083;
                    auVar90._0_8_ = 0x395e8083395e8083;
                    auVar90._12_4_ = 0x395e8083;
                    auVar90._16_4_ = 0x395e8083;
                    auVar90._20_4_ = 0x395e8083;
                    auVar90._24_4_ = 0x395e8083;
                    auVar90._28_4_ = 0x395e8083;
                    auVar230 = vfmsub231ps_avx512vl(auVar230,auVar249,auVar90);
                    auVar423._0_4_ = auVar230._0_4_ * auVar230._0_4_;
                    auVar423._4_4_ = auVar230._4_4_ * auVar230._4_4_;
                    auVar423._8_4_ = auVar230._8_4_ * auVar230._8_4_;
                    auVar423._12_4_ = auVar230._12_4_ * auVar230._12_4_;
                    auVar423._16_4_ = auVar230._16_4_ * auVar230._16_4_;
                    auVar423._20_4_ = auVar230._20_4_ * auVar230._20_4_;
                    auVar423._24_4_ = auVar230._24_4_ * auVar230._24_4_;
                    auVar423._28_4_ = 0;
                    auVar174 = vfmadd213ps_fma(auVar228,auVar230,auVar256);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar230,auVar257);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar230,auVar258);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar230,auVar259);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar230,auVar252);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar423,auVar230);
                    auVar366._0_4_ = auVar174._0_4_ + 1.0;
                    auVar366._4_4_ = auVar174._4_4_ + 1.0;
                    auVar366._8_4_ = auVar174._8_4_ + 1.0;
                    auVar366._12_4_ = auVar174._12_4_ + 1.0;
                    auVar366._16_4_ = 0x3f800000;
                    auVar366._20_4_ = 0x3f800000;
                    auVar366._24_4_ = 0x3f800000;
                    auVar366._28_4_ = 0x3f800000;
                    auVar230 = vcvttps2dq_avx512vl(auVar249);
                    auVar230 = vpslld_avx2(auVar230,0x17);
                    auVar230 = vpaddd_avx2(auVar230,auVar260);
                    auVar174 = vfmadd213ps_fma(auVar230,auVar366,auVar254);
                    auVar230 = vdivps_avx(auVar254,ZEXT1632(auVar174));
                    break;
                  case 5:
                    auVar230 = vminps_avx(auVar230,auVar250);
                    auVar230 = vmaxps_avx(auVar230,auVar251);
                    auVar174 = vfmadd213ps_fma(auVar253,auVar230,auVar252);
                    auVar232 = vrndscaleps_avx512vl(ZEXT1632(auVar174),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar174),auVar232,1);
                    auVar233 = vsubps_avx512vl(auVar232,auVar254);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar244._0_4_ = (uint)bVar24 * auVar233._0_4_ | (uint)!bVar24 * auVar232._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar244._4_4_ = (uint)bVar24 * auVar233._4_4_ | (uint)!bVar24 * auVar232._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar244._8_4_ = (uint)bVar24 * auVar233._8_4_ | (uint)!bVar24 * auVar232._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar244._12_4_ =
                         (uint)bVar24 * auVar233._12_4_ | (uint)!bVar24 * auVar232._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar244._16_4_ =
                         (uint)bVar24 * auVar233._16_4_ | (uint)!bVar24 * auVar232._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar244._20_4_ =
                         (uint)bVar24 * auVar233._20_4_ | (uint)!bVar24 * auVar232._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar244._24_4_ =
                         (uint)bVar24 * auVar233._24_4_ | (uint)!bVar24 * auVar232._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar244._28_4_ =
                         (uint)bVar24 * auVar233._28_4_ | (uint)!bVar24 * auVar232._28_4_;
                    auVar230 = vfmsub231ps_avx512vl(auVar230,auVar244,auVar255);
                    auVar230 = vfnmsub231ps_avx512vl(auVar230,auVar244,auVar261);
                    auVar445._0_4_ = auVar230._0_4_ * auVar230._0_4_;
                    auVar445._4_4_ = auVar230._4_4_ * auVar230._4_4_;
                    auVar445._8_4_ = auVar230._8_4_ * auVar230._8_4_;
                    auVar445._12_4_ = auVar230._12_4_ * auVar230._12_4_;
                    auVar445._16_4_ = auVar230._16_4_ * auVar230._16_4_;
                    auVar445._20_4_ = auVar230._20_4_ * auVar230._20_4_;
                    auVar445._24_4_ = auVar230._24_4_ * auVar230._24_4_;
                    auVar445._28_4_ = 0;
                    auVar232 = vfmadd213ps_avx512vl(auVar228,auVar230,auVar256);
                    auVar232 = vfmadd213ps_avx512vl(auVar232,auVar230,auVar257);
                    auVar232 = vfmadd213ps_avx512vl(auVar232,auVar230,auVar258);
                    auVar232 = vfmadd213ps_avx512vl(auVar232,auVar230,auVar259);
                    auVar232 = vfmadd213ps_avx512vl(auVar232,auVar230,auVar252);
                    auVar230 = vfmadd213ps_avx512vl(auVar232,auVar445,auVar230);
                    auVar232 = vaddps_avx512vl(auVar230,auVar254);
                    auVar230 = vcvttps2dq_avx512vl(auVar244);
                    auVar230 = vpslld_avx2(auVar230,0x17);
                    auVar230 = vpaddd_avx2(auVar230,auVar260);
                    auVar174 = vfmadd213ps_fma(auVar230,auVar232,auVar254);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar174),auVar231,2);
                    auVar230._8_4_ = 0x800000;
                    auVar230._0_8_ = 0x80000000800000;
                    auVar230._12_4_ = 0x800000;
                    auVar230._16_4_ = 0x800000;
                    auVar230._20_4_ = 0x800000;
                    auVar230._24_4_ = 0x800000;
                    auVar230._28_4_ = 0x800000;
                    auVar230 = vmaxps_avx512vl(ZEXT1632(auVar174),auVar230);
                    auVar446 = vpsrld_avx2(auVar230,0x17);
                    auVar232 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar231._8_4_ = 0x3f000000;
                    auVar231._0_8_ = 0x3f0000003f000000;
                    auVar231._12_4_ = 0x3f000000;
                    auVar231._16_4_ = 0x3f000000;
                    auVar231._20_4_ = 0x3f000000;
                    auVar231._24_4_ = 0x3f000000;
                    auVar231._28_4_ = 0x3f000000;
                    auVar230 = vpternlogd_avx512vl(auVar230,auVar232,auVar231,0xea);
                    auVar234._8_4_ = 0x3f3504f3;
                    auVar234._0_8_ = 0x3f3504f33f3504f3;
                    auVar234._12_4_ = 0x3f3504f3;
                    auVar234._16_4_ = 0x3f3504f3;
                    auVar234._20_4_ = 0x3f3504f3;
                    auVar234._24_4_ = 0x3f3504f3;
                    auVar234._28_4_ = 0x3f3504f3;
                    uVar161 = vcmpps_avx512vl(auVar230,auVar234,1);
                    auVar231 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
                    auVar232 = vaddps_avx512vl(auVar230,auVar231);
                    auVar230 = vaddps_avx512vl(auVar232,auVar230);
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar245._0_4_ = (uint)bVar24 * auVar230._0_4_ | (uint)!bVar24 * auVar232._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar245._4_4_ = (uint)bVar24 * auVar230._4_4_ | (uint)!bVar24 * auVar232._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar245._8_4_ = (uint)bVar24 * auVar230._8_4_ | (uint)!bVar24 * auVar232._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar245._12_4_ =
                         (uint)bVar24 * auVar230._12_4_ | (uint)!bVar24 * auVar232._12_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 4) & 1);
                    auVar245._16_4_ =
                         (uint)bVar24 * auVar230._16_4_ | (uint)!bVar24 * auVar232._16_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 5) & 1);
                    auVar245._20_4_ =
                         (uint)bVar24 * auVar230._20_4_ | (uint)!bVar24 * auVar232._20_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 6) & 1);
                    auVar245._24_4_ =
                         (uint)bVar24 * auVar230._24_4_ | (uint)!bVar24 * auVar232._24_4_;
                    bVar24 = SUB81(uVar161 >> 7,0);
                    auVar245._28_4_ =
                         (uint)bVar24 * auVar230._28_4_ | (uint)!bVar24 * auVar232._28_4_;
                    auVar232 = vmulps_avx512vl(auVar245,auVar245);
                    auVar230 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                    auVar235._8_4_ = 0xbdebd1b8;
                    auVar235._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar235._12_4_ = 0xbdebd1b8;
                    auVar235._16_4_ = 0xbdebd1b8;
                    auVar235._20_4_ = 0xbdebd1b8;
                    auVar235._24_4_ = 0xbdebd1b8;
                    auVar235._28_4_ = 0xbdebd1b8;
                    auVar230 = vfmadd213ps_avx512vl(auVar230,auVar245,auVar235);
                    auVar236._8_4_ = 0x3def251a;
                    auVar236._0_8_ = 0x3def251a3def251a;
                    auVar236._12_4_ = 0x3def251a;
                    auVar236._16_4_ = 0x3def251a;
                    auVar236._20_4_ = 0x3def251a;
                    auVar236._24_4_ = 0x3def251a;
                    auVar236._28_4_ = 0x3def251a;
                    auVar230 = vfmadd213ps_avx512vl(auVar230,auVar245,auVar236);
                    auVar237._8_4_ = 0xbdfe5d4f;
                    auVar237._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar237._12_4_ = 0xbdfe5d4f;
                    auVar237._16_4_ = 0xbdfe5d4f;
                    auVar237._20_4_ = 0xbdfe5d4f;
                    auVar237._24_4_ = 0xbdfe5d4f;
                    auVar237._28_4_ = 0xbdfe5d4f;
                    auVar230 = vfmadd213ps_avx512vl(auVar230,auVar245,auVar237);
                    auVar238._8_4_ = 0x3e11e9bf;
                    auVar238._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar238._12_4_ = 0x3e11e9bf;
                    auVar238._16_4_ = 0x3e11e9bf;
                    auVar238._20_4_ = 0x3e11e9bf;
                    auVar238._24_4_ = 0x3e11e9bf;
                    auVar238._28_4_ = 0x3e11e9bf;
                    auVar230 = vfmadd213ps_avx512vl(auVar230,auVar245,auVar238);
                    auVar239._8_4_ = 0xbe2aae50;
                    auVar239._0_8_ = 0xbe2aae50be2aae50;
                    auVar239._12_4_ = 0xbe2aae50;
                    auVar239._16_4_ = 0xbe2aae50;
                    auVar239._20_4_ = 0xbe2aae50;
                    auVar239._24_4_ = 0xbe2aae50;
                    auVar239._28_4_ = 0xbe2aae50;
                    auVar230 = vfmadd213ps_avx512vl(auVar230,auVar245,auVar239);
                    auVar240._8_4_ = 0x3e4cceac;
                    auVar240._0_8_ = 0x3e4cceac3e4cceac;
                    auVar240._12_4_ = 0x3e4cceac;
                    auVar240._16_4_ = 0x3e4cceac;
                    auVar240._20_4_ = 0x3e4cceac;
                    auVar240._24_4_ = 0x3e4cceac;
                    auVar240._28_4_ = 0x3e4cceac;
                    auVar230 = vfmadd213ps_avx512vl(auVar230,auVar245,auVar240);
                    auVar241._8_4_ = 0xbe7ffffc;
                    auVar241._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar241._12_4_ = 0xbe7ffffc;
                    auVar241._16_4_ = 0xbe7ffffc;
                    auVar241._20_4_ = 0xbe7ffffc;
                    auVar241._24_4_ = 0xbe7ffffc;
                    auVar241._28_4_ = 0xbe7ffffc;
                    auVar230 = vfmadd213ps_avx512vl(auVar230,auVar245,auVar241);
                    auVar242._8_4_ = 0x3eaaaaaa;
                    auVar242._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar242._12_4_ = 0x3eaaaaaa;
                    auVar242._16_4_ = 0x3eaaaaaa;
                    auVar242._20_4_ = 0x3eaaaaaa;
                    auVar242._24_4_ = 0x3eaaaaaa;
                    auVar242._28_4_ = 0x3eaaaaaa;
                    auVar230 = vfmadd213ps_avx512vl(auVar230,auVar245,auVar242);
                    auVar233 = vmulps_avx512vl(auVar232,auVar245);
                    auVar233 = vmulps_avx512vl(auVar233,auVar230);
                    auVar243._8_4_ = 0xffffff82;
                    auVar243._0_8_ = 0xffffff82ffffff82;
                    auVar243._12_4_ = 0xffffff82;
                    auVar243._16_4_ = 0xffffff82;
                    auVar243._20_4_ = 0xffffff82;
                    auVar243._24_4_ = 0xffffff82;
                    auVar243._28_4_ = 0xffffff82;
                    auVar230 = vpaddd_avx512vl(auVar446,auVar243);
                    auVar230 = vcvtdq2ps_avx(auVar230);
                    auVar234 = vsubps_avx512vl(auVar230,auVar254);
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar246._0_4_ = (uint)bVar24 * auVar234._0_4_ | (uint)!bVar24 * auVar230._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar246._4_4_ = (uint)bVar24 * auVar234._4_4_ | (uint)!bVar24 * auVar230._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar246._8_4_ = (uint)bVar24 * auVar234._8_4_ | (uint)!bVar24 * auVar230._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar246._12_4_ =
                         (uint)bVar24 * auVar234._12_4_ | (uint)!bVar24 * auVar230._12_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 4) & 1);
                    auVar246._16_4_ =
                         (uint)bVar24 * auVar234._16_4_ | (uint)!bVar24 * auVar230._16_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 5) & 1);
                    auVar246._20_4_ =
                         (uint)bVar24 * auVar234._20_4_ | (uint)!bVar24 * auVar230._20_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 6) & 1);
                    auVar246._24_4_ =
                         (uint)bVar24 * auVar234._24_4_ | (uint)!bVar24 * auVar230._24_4_;
                    bVar24 = SUB81(uVar161 >> 7,0);
                    auVar246._28_4_ =
                         (uint)bVar24 * auVar234._28_4_ | (uint)!bVar24 * auVar230._28_4_;
                    auVar230 = vfmadd231ps_avx512vl(auVar233,auVar246,auVar261);
                    auVar230 = vfmsub231ps_avx512vl(auVar230,auVar252,auVar232);
                    auVar230 = vsubps_avx512vl(auVar230,auVar245);
                    auVar174 = vfmsub231ps_fma(auVar230,auVar255,auVar246);
                    auVar230 = vmulps_avx512vl(ZEXT1632(auVar174),auVar229);
                    auVar232 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar247._0_4_ = (uint)bVar24 * auVar232._0_4_ | (uint)!bVar24 * auVar230._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar247._4_4_ = (uint)bVar24 * auVar232._4_4_ | (uint)!bVar24 * auVar230._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar247._8_4_ = (uint)bVar24 * auVar232._8_4_ | (uint)!bVar24 * auVar230._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar247._12_4_ =
                         (uint)bVar24 * auVar232._12_4_ | (uint)!bVar24 * auVar230._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar247._16_4_ =
                         (uint)bVar24 * auVar232._16_4_ | (uint)!bVar24 * auVar230._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar247._20_4_ =
                         (uint)bVar24 * auVar232._20_4_ | (uint)!bVar24 * auVar230._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar247._24_4_ =
                         (uint)bVar24 * auVar232._24_4_ | (uint)!bVar24 * auVar230._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar247._28_4_ =
                         (uint)bVar24 * auVar232._28_4_ | (uint)!bVar24 * auVar230._28_4_;
                    auVar230 = vminps_avx(auVar247,auVar250);
                    auVar230 = vmaxps_avx(auVar230,auVar251);
                    auVar174 = vfmadd213ps_fma(auVar253,auVar230,auVar252);
                    auVar232 = vrndscaleps_avx512vl(ZEXT1632(auVar174),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar174),auVar232,1);
                    auVar233 = vsubps_avx512vl(auVar232,auVar254);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar248._0_4_ = (uint)bVar24 * auVar233._0_4_ | (uint)!bVar24 * auVar232._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar248._4_4_ = (uint)bVar24 * auVar233._4_4_ | (uint)!bVar24 * auVar232._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar248._8_4_ = (uint)bVar24 * auVar233._8_4_ | (uint)!bVar24 * auVar232._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar248._12_4_ =
                         (uint)bVar24 * auVar233._12_4_ | (uint)!bVar24 * auVar232._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar248._16_4_ =
                         (uint)bVar24 * auVar233._16_4_ | (uint)!bVar24 * auVar232._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar248._20_4_ =
                         (uint)bVar24 * auVar233._20_4_ | (uint)!bVar24 * auVar232._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar248._24_4_ =
                         (uint)bVar24 * auVar233._24_4_ | (uint)!bVar24 * auVar232._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar248._28_4_ =
                         (uint)bVar24 * auVar233._28_4_ | (uint)!bVar24 * auVar232._28_4_;
                    auVar230 = vfmsub231ps_avx512vl(auVar230,auVar248,auVar255);
                    auVar230 = vfnmsub231ps_avx512vl(auVar230,auVar248,auVar261);
                    auVar447._0_4_ = auVar230._0_4_ * auVar230._0_4_;
                    auVar447._4_4_ = auVar230._4_4_ * auVar230._4_4_;
                    auVar447._8_4_ = auVar230._8_4_ * auVar230._8_4_;
                    auVar447._12_4_ = auVar230._12_4_ * auVar230._12_4_;
                    auVar447._16_4_ = auVar230._16_4_ * auVar230._16_4_;
                    auVar447._20_4_ = auVar230._20_4_ * auVar230._20_4_;
                    auVar447._24_4_ = auVar230._24_4_ * auVar230._24_4_;
                    auVar447._28_4_ = 0;
                    auVar232 = vfmadd213ps_avx512vl(auVar228,auVar230,auVar256);
                    auVar232 = vfmadd213ps_avx512vl(auVar232,auVar230,auVar257);
                    auVar232 = vfmadd213ps_avx512vl(auVar232,auVar230,auVar258);
                    auVar232 = vfmadd213ps_avx512vl(auVar232,auVar230,auVar259);
                    auVar232 = vfmadd213ps_avx512vl(auVar232,auVar230,auVar252);
                    auVar230 = vfmadd213ps_avx512vl(auVar232,auVar447,auVar230);
                    in_ZMM17 = ZEXT3264(auVar230);
                    auVar232 = vaddps_avx512vl(auVar230,auVar254);
                    auVar230 = vcvttps2dq_avx512vl(auVar248);
                    auVar230 = vpslld_avx2(auVar230,0x17);
                    auVar230 = vpaddd_avx2(auVar230,auVar260);
                    auVar174 = vfmadd213ps_fma(auVar230,auVar232,auVar254);
                    auVar230 = vdivps_avx(auVar254,ZEXT1632(auVar174));
                    auVar230 = vfnmadd213ps_avx512vl(auVar230,auVar229,auVar231);
                    auVar227 = auVar230._0_28_;
                    goto LAB_002a0542;
                  case 6:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar233._4_4_ = uVar3;
                    auVar233._0_4_ = uVar3;
                    auVar233._8_4_ = uVar3;
                    auVar233._12_4_ = uVar3;
                    auVar233._16_4_ = uVar3;
                    auVar233._20_4_ = uVar3;
                    auVar233._24_4_ = uVar3;
                    auVar233._28_4_ = uVar3;
                    uVar3 = puVar16[1];
                    auVar232._4_4_ = uVar3;
                    auVar232._0_4_ = uVar3;
                    auVar232._8_4_ = uVar3;
                    auVar232._12_4_ = uVar3;
                    auVar232._16_4_ = uVar3;
                    auVar232._20_4_ = uVar3;
                    auVar232._24_4_ = uVar3;
                    auVar232._28_4_ = uVar3;
                    auVar230 = vfmadd213ps_avx512vl(auVar233,auVar230,auVar232);
                    auVar230 = vmaxps_avx(auVar230,auVar231);
                    auVar230 = vminps_avx(auVar230,auVar254);
                    auVar227 = auVar230._0_28_;
LAB_002a0542:
                    auVar338._0_4_ = auVar227._0_4_ * auVar337._0_4_;
                    auVar338._4_4_ = auVar227._4_4_ * auVar337._4_4_;
                    auVar338._8_4_ = auVar227._8_4_ * auVar337._8_4_;
                    auVar338._12_4_ = auVar227._12_4_ * auVar337._12_4_;
                    auVar338._16_4_ = auVar227._16_4_ * auVar337._16_4_;
                    auVar338._20_4_ = auVar227._20_4_ * auVar337._20_4_;
                    auVar338._28_36_ = auVar337._28_36_;
                    auVar338._24_4_ = auVar227._24_4_ * auVar337._24_4_;
                    auVar230 = auVar338._0_32_;
                  }
                  *pauVar163 = auVar230;
                  pauVar163 = pauVar163 + 1;
                  uVar147 = uVar147 + 1;
                  iVar343 = iVar343 + 1;
                } while (uVar147 != local_248.w);
              }
              iVar166 = iVar166 + 1;
            } while (iVar166 != local_248.h);
          }
          local_308 = local_308 + 1;
        } while (local_308 != (long)local_248.c);
      }
      afVar327 = _ps512_cephes_log_p8;
      afVar326 = _ps512_cephes_log_p7;
      afVar325 = _ps512_cephes_log_p6;
      afVar324 = _ps512_cephes_log_p5;
      afVar323 = _ps512_cephes_log_p4;
      afVar462 = _ps512_cephes_log_p3;
      afVar322 = _ps512_cephes_log_p2;
      afVar321 = ::_ps512_cephes_exp_p5;
      afVar320 = ::_ps512_cephes_exp_p4;
      afVar319 = ::_ps512_cephes_exp_p3;
      afVar318 = ::_ps512_cephes_exp_p2;
      afVar317 = ::_ps512_cephes_exp_p1;
      afVar316 = ::_ps512_cephes_exp_p0;
      afVar315 = ::_ps512_cephes_LOG2EF;
      afVar314 = ::_ps512_exp_lo;
      afVar313 = ::_ps512_exp_hi;
      afVar312 = ::_ps512_1;
      if (((local_d8._0_4_ == 4) && (uVar152 == 0x10)) && (0 < (long)local_248.c)) {
        iVar9 = (this->super_Deconvolution).dilation_w;
        iVar10 = (this->super_Deconvolution).dilation_h;
        iVar138 = (this->super_Deconvolution).stride_w;
        iVar170 = (this->super_Deconvolution).stride_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        pvVar20 = (this->super_Deconvolution).bias_data.data;
        uVar155 = (this->super_Deconvolution).kernel_w;
        uVar11 = (this->super_Deconvolution).kernel_h;
        auVar337 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar338 = vxorps_avx512dq(auVar337,(undefined1  [64])_ps512_cephes_log_q2);
        auVar339 = vxorps_avx512dq(auVar337,(undefined1  [64])_ps512_cephes_log_q1);
        auVar340 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar341 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar337);
        local_308 = 0;
        auVar174 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
        in_ZMM29 = ZEXT1664(auVar174);
        auVar342 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar280 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
        do {
          local_1c8._0_4_ = local_248.h;
          if (0 < local_248.h) {
            iVar13 = bottom_blob->w;
            iVar151 = bottom_blob->h;
            pauVar162 = (undefined1 (*) [64])
                        (local_248.cstep * local_308 *
                         CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) +
                        (long)local_248.data);
            uVar12 = bottom_blob->c;
            iVar166 = 0;
            do {
              if (0 < local_248.w) {
                uVar147 = 0;
                iVar343 = (1 - uVar155) * iVar9;
                do {
                  if (pvVar20 == (void *)0x0) {
                    auVar281 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar281 = *(undefined1 (*) [64])((long)pvVar20 + local_308 * 0x40);
                  }
                  if (0 < (int)uVar12) {
                    pvVar154 = (void *)((this->weight_data_tm).cstep * local_308 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    pvVar15 = bottom_blob->data;
                    uVar149 = 0;
                    do {
                      if (0 < (int)uVar11) {
                        uVar161 = 0;
                        uVar146 = 0;
                        do {
                          iVar139 = (((int)uVar146 - uVar11) + 1) * iVar10 + iVar166;
                          if ((((-1 < iVar139) &&
                               (iVar140 = iVar139 / iVar170, iVar139 % iVar170 == 0)) &&
                              (0 < (int)uVar155)) && (iVar140 < iVar151)) {
                            lVar167 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                                      bottom_blob->cstep * bottom_blob->elemsize * uVar149;
                            uVar153 = (ulong)uVar155;
                            uVar158 = uVar161;
                            iVar139 = iVar343;
                            do {
                              if (((-1 < iVar139) &&
                                  (iVar140 = iVar139 / iVar138, iVar139 % iVar138 == 0)) &&
                                 (iVar140 < iVar13)) {
                                lVar157 = (long)(iVar140 << 2);
                                auVar282 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167)));
                                auVar283 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 4)));
                                auVar284 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 8)));
                                in_ZMM17 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0xc))
                                                     );
                                uVar172 = uVar158 & 0xffffffff;
                                auVar281 = vfmadd231ps_avx512f(auVar281,auVar282,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 + uVar172 * 4));
                                auVar281 = vfmadd231ps_avx512f(auVar281,auVar283,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 + uVar172 * 4 + 0x40
                                                                ));
                                auVar281 = vfmadd231ps_avx512f(auVar281,auVar284,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 + uVar172 * 4 + 0x80
                                                                ));
                                auVar281 = vfmadd231ps_avx512f(auVar281,in_ZMM17,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 + uVar172 * 4 + 0xc0
                                                                ));
                              }
                              uVar158 = uVar158 + 0x40;
                              iVar139 = iVar139 + iVar9;
                              uVar153 = uVar153 - 1;
                            } while (uVar153 != 0);
                          }
                          uVar146 = uVar146 + 1;
                          uVar161 = uVar161 + (ulong)uVar155 * 0x40;
                        } while (uVar146 != uVar11);
                      }
                      pvVar154 = (void *)((long)pvVar154 + (long)(int)(uVar155 * uVar11 * 0x40) * 4)
                      ;
                      uVar149 = uVar149 + 1;
                    } while (uVar149 != uVar12);
                  }
                  switch(iVar156) {
                  case 1:
                    auVar281 = vmaxps_avx512f(auVar281,in_ZMM29);
                    break;
                  case 2:
                    uVar149 = vcmpps_avx512f(auVar281,in_ZMM29,1);
                    uVar3 = *(this->super_Deconvolution).activation_params.data;
                    auVar130._4_4_ = uVar3;
                    auVar130._0_4_ = uVar3;
                    auVar130._8_4_ = uVar3;
                    auVar130._12_4_ = uVar3;
                    auVar130._16_4_ = uVar3;
                    auVar130._20_4_ = uVar3;
                    auVar130._24_4_ = uVar3;
                    auVar130._28_4_ = uVar3;
                    auVar130._32_4_ = uVar3;
                    auVar130._36_4_ = uVar3;
                    auVar130._40_4_ = uVar3;
                    auVar130._44_4_ = uVar3;
                    auVar130._48_4_ = uVar3;
                    auVar130._52_4_ = uVar3;
                    auVar130._56_4_ = uVar3;
                    auVar130._60_4_ = uVar3;
                    auVar282 = vmulps_avx512f(auVar281,auVar130);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar304._0_4_ = (uint)bVar24 * auVar282._0_4_ | (uint)!bVar24 * auVar281._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar304._4_4_ = (uint)bVar24 * auVar282._4_4_ | (uint)!bVar24 * auVar281._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar304._8_4_ = (uint)bVar24 * auVar282._8_4_ | (uint)!bVar24 * auVar281._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar304._12_4_ =
                         (uint)bVar24 * auVar282._12_4_ | (uint)!bVar24 * auVar281._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar304._16_4_ =
                         (uint)bVar24 * auVar282._16_4_ | (uint)!bVar24 * auVar281._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar304._20_4_ =
                         (uint)bVar24 * auVar282._20_4_ | (uint)!bVar24 * auVar281._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar304._24_4_ =
                         (uint)bVar24 * auVar282._24_4_ | (uint)!bVar24 * auVar281._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar304._28_4_ =
                         (uint)bVar24 * auVar282._28_4_ | (uint)!bVar24 * auVar281._28_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                    auVar304._32_4_ =
                         (uint)bVar24 * auVar282._32_4_ | (uint)!bVar24 * auVar281._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar304._36_4_ =
                         (uint)bVar24 * auVar282._36_4_ | (uint)!bVar24 * auVar281._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar304._40_4_ =
                         (uint)bVar24 * auVar282._40_4_ | (uint)!bVar24 * auVar281._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar304._44_4_ =
                         (uint)bVar24 * auVar282._44_4_ | (uint)!bVar24 * auVar281._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar304._48_4_ =
                         (uint)bVar24 * auVar282._48_4_ | (uint)!bVar24 * auVar281._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar304._52_4_ =
                         (uint)bVar24 * auVar282._52_4_ | (uint)!bVar24 * auVar281._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar304._56_4_ =
                         (uint)bVar24 * auVar282._56_4_ | (uint)!bVar24 * auVar281._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar304._60_4_ =
                         (uint)bVar24 * auVar282._60_4_ | (uint)!bVar24 * auVar281._60_4_;
                    auVar281 = auVar304;
                    break;
                  case 3:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar128._4_4_ = uVar3;
                    auVar128._0_4_ = uVar3;
                    auVar128._8_4_ = uVar3;
                    auVar128._12_4_ = uVar3;
                    auVar128._16_4_ = uVar3;
                    auVar128._20_4_ = uVar3;
                    auVar128._24_4_ = uVar3;
                    auVar128._28_4_ = uVar3;
                    auVar128._32_4_ = uVar3;
                    auVar128._36_4_ = uVar3;
                    auVar128._40_4_ = uVar3;
                    auVar128._44_4_ = uVar3;
                    auVar128._48_4_ = uVar3;
                    auVar128._52_4_ = uVar3;
                    auVar128._56_4_ = uVar3;
                    auVar128._60_4_ = uVar3;
                    auVar281 = vmaxps_avx512f(auVar281,auVar128);
                    uVar3 = puVar16[1];
                    auVar129._4_4_ = uVar3;
                    auVar129._0_4_ = uVar3;
                    auVar129._8_4_ = uVar3;
                    auVar129._12_4_ = uVar3;
                    auVar129._16_4_ = uVar3;
                    auVar129._20_4_ = uVar3;
                    auVar129._24_4_ = uVar3;
                    auVar129._28_4_ = uVar3;
                    auVar129._32_4_ = uVar3;
                    auVar129._36_4_ = uVar3;
                    auVar129._40_4_ = uVar3;
                    auVar129._44_4_ = uVar3;
                    auVar129._48_4_ = uVar3;
                    auVar129._52_4_ = uVar3;
                    auVar129._56_4_ = uVar3;
                    auVar129._60_4_ = uVar3;
                    auVar281 = vminps_avx512f(auVar281,auVar129);
                    break;
                  case 4:
                    auVar281 = vxorps_avx512dq(auVar281,auVar337);
                    auVar281 = vminps_avx512f(auVar281,(undefined1  [64])afVar313);
                    auVar281 = vmaxps_avx512f(auVar281,(undefined1  [64])afVar314);
                    auVar282 = vfmadd213ps_avx512f((undefined1  [64])afVar315,auVar281,
                                                   (undefined1  [64])afVar321);
                    auVar283 = vrndscaleps_avx512f(auVar282,1);
                    uVar149 = vcmpps_avx512f(auVar282,auVar283,1);
                    auVar282 = vsubps_avx512f(auVar283,(undefined1  [64])afVar312);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar303._0_4_ = (uint)bVar24 * auVar282._0_4_ | (uint)!bVar24 * auVar283._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar303._4_4_ = (uint)bVar24 * auVar282._4_4_ | (uint)!bVar24 * auVar283._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar303._8_4_ = (uint)bVar24 * auVar282._8_4_ | (uint)!bVar24 * auVar283._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar303._12_4_ =
                         (uint)bVar24 * auVar282._12_4_ | (uint)!bVar24 * auVar283._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar303._16_4_ =
                         (uint)bVar24 * auVar282._16_4_ | (uint)!bVar24 * auVar283._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar303._20_4_ =
                         (uint)bVar24 * auVar282._20_4_ | (uint)!bVar24 * auVar283._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar303._24_4_ =
                         (uint)bVar24 * auVar282._24_4_ | (uint)!bVar24 * auVar283._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar303._28_4_ =
                         (uint)bVar24 * auVar282._28_4_ | (uint)!bVar24 * auVar283._28_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                    auVar303._32_4_ =
                         (uint)bVar24 * auVar282._32_4_ | (uint)!bVar24 * auVar283._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar303._36_4_ =
                         (uint)bVar24 * auVar282._36_4_ | (uint)!bVar24 * auVar283._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar303._40_4_ =
                         (uint)bVar24 * auVar282._40_4_ | (uint)!bVar24 * auVar283._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar303._44_4_ =
                         (uint)bVar24 * auVar282._44_4_ | (uint)!bVar24 * auVar283._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar303._48_4_ =
                         (uint)bVar24 * auVar282._48_4_ | (uint)!bVar24 * auVar283._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar303._52_4_ =
                         (uint)bVar24 * auVar282._52_4_ | (uint)!bVar24 * auVar283._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar303._56_4_ =
                         (uint)bVar24 * auVar282._56_4_ | (uint)!bVar24 * auVar283._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar303._60_4_ =
                         (uint)bVar24 * auVar282._60_4_ | (uint)!bVar24 * auVar283._60_4_;
                    auVar281 = vfmadd231ps_avx512f(auVar281,auVar303,auVar338);
                    auVar281 = vfmadd231ps_avx512f(auVar281,auVar303,auVar339);
                    auVar282 = vmulps_avx512f(auVar281,auVar281);
                    auVar283 = vfmadd213ps_avx512f(auVar281,(undefined1  [64])afVar316,
                                                   (undefined1  [64])afVar317);
                    auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar318);
                    auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar319);
                    auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar320);
                    auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar321);
                    auVar281 = vfmadd213ps_avx512f(auVar283,auVar282,auVar281);
                    auVar281 = vaddps_avx512f(auVar281,(undefined1  [64])afVar312);
                    auVar282 = vcvttps2dq_avx512f(auVar303);
                    auVar282 = vpaddd_avx512f(auVar282,auVar340);
                    auVar282 = vpslld_avx512f(auVar282,0x17);
                    auVar281 = vfmadd213ps_avx512f(auVar282,auVar281,auVar342);
                    auVar281 = vdivps_avx512f(auVar342,auVar281);
                    break;
                  case 5:
                    auVar282 = vminps_avx512f(auVar281,(undefined1  [64])afVar313);
                    auVar282 = vmaxps_avx512f(auVar282,(undefined1  [64])afVar314);
                    auVar283 = vfmadd213ps_avx512f((undefined1  [64])afVar315,auVar282,
                                                   (undefined1  [64])afVar321);
                    auVar284 = vrndscaleps_avx512f(auVar283,1);
                    uVar149 = vcmpps_avx512f(auVar283,auVar284,1);
                    auVar283 = vsubps_avx512f(auVar284,(undefined1  [64])afVar312);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar298._0_4_ = (uint)bVar24 * auVar283._0_4_ | (uint)!bVar24 * auVar284._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar298._4_4_ = (uint)bVar24 * auVar283._4_4_ | (uint)!bVar24 * auVar284._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar298._8_4_ = (uint)bVar24 * auVar283._8_4_ | (uint)!bVar24 * auVar284._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar298._12_4_ =
                         (uint)bVar24 * auVar283._12_4_ | (uint)!bVar24 * auVar284._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar298._16_4_ =
                         (uint)bVar24 * auVar283._16_4_ | (uint)!bVar24 * auVar284._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar298._20_4_ =
                         (uint)bVar24 * auVar283._20_4_ | (uint)!bVar24 * auVar284._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar298._24_4_ =
                         (uint)bVar24 * auVar283._24_4_ | (uint)!bVar24 * auVar284._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar298._28_4_ =
                         (uint)bVar24 * auVar283._28_4_ | (uint)!bVar24 * auVar284._28_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                    auVar298._32_4_ =
                         (uint)bVar24 * auVar283._32_4_ | (uint)!bVar24 * auVar284._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar298._36_4_ =
                         (uint)bVar24 * auVar283._36_4_ | (uint)!bVar24 * auVar284._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar298._40_4_ =
                         (uint)bVar24 * auVar283._40_4_ | (uint)!bVar24 * auVar284._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar298._44_4_ =
                         (uint)bVar24 * auVar283._44_4_ | (uint)!bVar24 * auVar284._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar298._48_4_ =
                         (uint)bVar24 * auVar283._48_4_ | (uint)!bVar24 * auVar284._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar298._52_4_ =
                         (uint)bVar24 * auVar283._52_4_ | (uint)!bVar24 * auVar284._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar298._56_4_ =
                         (uint)bVar24 * auVar283._56_4_ | (uint)!bVar24 * auVar284._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar298._60_4_ =
                         (uint)bVar24 * auVar283._60_4_ | (uint)!bVar24 * auVar284._60_4_;
                    auVar282 = vfmadd231ps_avx512f(auVar282,auVar298,auVar338);
                    auVar282 = vfmadd231ps_avx512f(auVar282,auVar298,auVar339);
                    auVar283 = vmulps_avx512f(auVar282,auVar282);
                    auVar284 = vfmadd213ps_avx512f(auVar282,(undefined1  [64])afVar316,
                                                   (undefined1  [64])afVar317);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar318);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar319);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar320);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar321);
                    auVar282 = vfmadd213ps_avx512f(auVar284,auVar283,auVar282);
                    auVar282 = vaddps_avx512f(auVar282,(undefined1  [64])afVar312);
                    auVar283 = vcvttps2dq_avx512f(auVar298);
                    auVar283 = vpaddd_avx512f(auVar283,auVar340);
                    auVar283 = vpslld_avx512f(auVar283,0x17);
                    auVar282 = vfmadd213ps_avx512f(auVar283,auVar282,auVar342);
                    auVar283 = vmaxps_avx512f(auVar282,(undefined1  [64])_ps512_min_norm_pos);
                    auVar284 = vpsrld_avx512f(auVar283,0x17);
                    auVar283 = vpternlogd_avx512f(auVar283,(undefined1  [64])afVar321,
                                                  (undefined1  [64])_ps512_inv_mant_mask,0xec);
                    uVar149 = vcmpps_avx512f(auVar283,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                    auVar285 = vsubps_avx512f(auVar283,(undefined1  [64])afVar312);
                    auVar283 = vaddps_avx512f(auVar285,auVar283);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar299._0_4_ = (uint)bVar24 * auVar283._0_4_ | (uint)!bVar24 * auVar285._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar299._4_4_ = (uint)bVar24 * auVar283._4_4_ | (uint)!bVar24 * auVar285._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar299._8_4_ = (uint)bVar24 * auVar283._8_4_ | (uint)!bVar24 * auVar285._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar299._12_4_ =
                         (uint)bVar24 * auVar283._12_4_ | (uint)!bVar24 * auVar285._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar299._16_4_ =
                         (uint)bVar24 * auVar283._16_4_ | (uint)!bVar24 * auVar285._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar299._20_4_ =
                         (uint)bVar24 * auVar283._20_4_ | (uint)!bVar24 * auVar285._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar299._24_4_ =
                         (uint)bVar24 * auVar283._24_4_ | (uint)!bVar24 * auVar285._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar299._28_4_ =
                         (uint)bVar24 * auVar283._28_4_ | (uint)!bVar24 * auVar285._28_4_;
                    bVar32 = (byte)(uVar149 >> 8);
                    bVar24 = (bool)(bVar32 & 1);
                    auVar299._32_4_ =
                         (uint)bVar24 * auVar283._32_4_ | (uint)!bVar24 * auVar285._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar299._36_4_ =
                         (uint)bVar24 * auVar283._36_4_ | (uint)!bVar24 * auVar285._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar299._40_4_ =
                         (uint)bVar24 * auVar283._40_4_ | (uint)!bVar24 * auVar285._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar299._44_4_ =
                         (uint)bVar24 * auVar283._44_4_ | (uint)!bVar24 * auVar285._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar299._48_4_ =
                         (uint)bVar24 * auVar283._48_4_ | (uint)!bVar24 * auVar285._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar299._52_4_ =
                         (uint)bVar24 * auVar283._52_4_ | (uint)!bVar24 * auVar285._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar299._56_4_ =
                         (uint)bVar24 * auVar283._56_4_ | (uint)!bVar24 * auVar285._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar299._60_4_ =
                         (uint)bVar24 * auVar283._60_4_ | (uint)!bVar24 * auVar285._60_4_;
                    auVar283 = vmulps_avx512f(auVar299,auVar299);
                    auVar285 = vfmadd132ps_avx512f(auVar299,(undefined1  [64])_ps512_cephes_log_p1,
                                                   (undefined1  [64])_ps512_cephes_log_p0);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar299,(undefined1  [64])afVar322);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar299,(undefined1  [64])afVar462);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar299,(undefined1  [64])afVar323);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar299,(undefined1  [64])afVar324);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar299,(undefined1  [64])afVar325);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar299,(undefined1  [64])afVar326);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar299,(undefined1  [64])afVar327);
                    auVar286 = vmulps_avx512f(auVar283,auVar299);
                    auVar285 = vfmadd213ps_avx512f(auVar286,auVar285,auVar299);
                    uVar161 = vcmpps_avx512f(auVar282,in_ZMM29,2);
                    auVar282 = vpsubd_avx512f(auVar284,auVar340);
                    auVar282 = vcvtdq2ps_avx512f(auVar282);
                    auVar284 = vaddps_avx512f(auVar282,(undefined1  [64])afVar312);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar300._0_4_ = (uint)bVar24 * auVar282._0_4_ | (uint)!bVar24 * auVar284._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar300._4_4_ = (uint)bVar24 * auVar282._4_4_ | (uint)!bVar24 * auVar284._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar300._8_4_ = (uint)bVar24 * auVar282._8_4_ | (uint)!bVar24 * auVar284._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar300._12_4_ =
                         (uint)bVar24 * auVar282._12_4_ | (uint)!bVar24 * auVar284._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar300._16_4_ =
                         (uint)bVar24 * auVar282._16_4_ | (uint)!bVar24 * auVar284._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar300._20_4_ =
                         (uint)bVar24 * auVar282._20_4_ | (uint)!bVar24 * auVar284._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar300._24_4_ =
                         (uint)bVar24 * auVar282._24_4_ | (uint)!bVar24 * auVar284._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar300._28_4_ =
                         (uint)bVar24 * auVar282._28_4_ | (uint)!bVar24 * auVar284._28_4_;
                    bVar24 = (bool)(bVar32 & 1);
                    auVar300._32_4_ =
                         (uint)bVar24 * auVar282._32_4_ | (uint)!bVar24 * auVar284._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar300._36_4_ =
                         (uint)bVar24 * auVar282._36_4_ | (uint)!bVar24 * auVar284._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar300._40_4_ =
                         (uint)bVar24 * auVar282._40_4_ | (uint)!bVar24 * auVar284._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar300._44_4_ =
                         (uint)bVar24 * auVar282._44_4_ | (uint)!bVar24 * auVar284._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar300._48_4_ =
                         (uint)bVar24 * auVar282._48_4_ | (uint)!bVar24 * auVar284._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar300._52_4_ =
                         (uint)bVar24 * auVar282._52_4_ | (uint)!bVar24 * auVar284._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar300._56_4_ =
                         (uint)bVar24 * auVar282._56_4_ | (uint)!bVar24 * auVar284._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar300._60_4_ =
                         (uint)bVar24 * auVar282._60_4_ | (uint)!bVar24 * auVar284._60_4_;
                    auVar282 = vfmadd231ps_avx512f(auVar285,auVar300,
                                                   (undefined1  [64])_ps512_cephes_log_q1);
                    auVar282 = vfmadd231ps_avx512f(auVar282,auVar341,auVar283);
                    auVar282 = vfmadd231ps_avx512f(auVar282,auVar300,
                                                   (undefined1  [64])_ps512_cephes_log_q2);
                    auVar282 = vmulps_avx512f(auVar282,auVar280);
                    auVar283 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar301._0_4_ = (uint)bVar24 * auVar283._0_4_ | (uint)!bVar24 * auVar282._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar301._4_4_ = (uint)bVar24 * auVar283._4_4_ | (uint)!bVar24 * auVar282._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar301._8_4_ = (uint)bVar24 * auVar283._8_4_ | (uint)!bVar24 * auVar282._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar301._12_4_ =
                         (uint)bVar24 * auVar283._12_4_ | (uint)!bVar24 * auVar282._12_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 4) & 1);
                    auVar301._16_4_ =
                         (uint)bVar24 * auVar283._16_4_ | (uint)!bVar24 * auVar282._16_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 5) & 1);
                    auVar301._20_4_ =
                         (uint)bVar24 * auVar283._20_4_ | (uint)!bVar24 * auVar282._20_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 6) & 1);
                    auVar301._24_4_ =
                         (uint)bVar24 * auVar283._24_4_ | (uint)!bVar24 * auVar282._24_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 7) & 1);
                    auVar301._28_4_ =
                         (uint)bVar24 * auVar283._28_4_ | (uint)!bVar24 * auVar282._28_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 8) & 1);
                    auVar301._32_4_ =
                         (uint)bVar24 * auVar283._32_4_ | (uint)!bVar24 * auVar282._32_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 9) & 1);
                    auVar301._36_4_ =
                         (uint)bVar24 * auVar283._36_4_ | (uint)!bVar24 * auVar282._36_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 10) & 1);
                    auVar301._40_4_ =
                         (uint)bVar24 * auVar283._40_4_ | (uint)!bVar24 * auVar282._40_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 0xb) & 1);
                    auVar301._44_4_ =
                         (uint)bVar24 * auVar283._44_4_ | (uint)!bVar24 * auVar282._44_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 0xc) & 1);
                    auVar301._48_4_ =
                         (uint)bVar24 * auVar283._48_4_ | (uint)!bVar24 * auVar282._48_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 0xd) & 1);
                    auVar301._52_4_ =
                         (uint)bVar24 * auVar283._52_4_ | (uint)!bVar24 * auVar282._52_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 0xe) & 1);
                    auVar301._56_4_ =
                         (uint)bVar24 * auVar283._56_4_ | (uint)!bVar24 * auVar282._56_4_;
                    bVar24 = SUB81(uVar161 >> 0xf,0);
                    auVar301._60_4_ =
                         (uint)bVar24 * auVar283._60_4_ | (uint)!bVar24 * auVar282._60_4_;
                    auVar282 = vminps_avx512f(auVar301,(undefined1  [64])afVar313);
                    auVar282 = vmaxps_avx512f(auVar282,(undefined1  [64])afVar314);
                    auVar283 = vfmadd213ps_avx512f((undefined1  [64])afVar315,auVar282,
                                                   (undefined1  [64])afVar321);
                    auVar284 = vrndscaleps_avx512f(auVar283,1);
                    uVar149 = vcmpps_avx512f(auVar283,auVar284,1);
                    auVar283 = vsubps_avx512f(auVar284,(undefined1  [64])afVar312);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar302._0_4_ = (uint)bVar24 * auVar283._0_4_ | (uint)!bVar24 * auVar284._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar302._4_4_ = (uint)bVar24 * auVar283._4_4_ | (uint)!bVar24 * auVar284._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar302._8_4_ = (uint)bVar24 * auVar283._8_4_ | (uint)!bVar24 * auVar284._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar302._12_4_ =
                         (uint)bVar24 * auVar283._12_4_ | (uint)!bVar24 * auVar284._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar302._16_4_ =
                         (uint)bVar24 * auVar283._16_4_ | (uint)!bVar24 * auVar284._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar302._20_4_ =
                         (uint)bVar24 * auVar283._20_4_ | (uint)!bVar24 * auVar284._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar302._24_4_ =
                         (uint)bVar24 * auVar283._24_4_ | (uint)!bVar24 * auVar284._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar302._28_4_ =
                         (uint)bVar24 * auVar283._28_4_ | (uint)!bVar24 * auVar284._28_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                    auVar302._32_4_ =
                         (uint)bVar24 * auVar283._32_4_ | (uint)!bVar24 * auVar284._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar302._36_4_ =
                         (uint)bVar24 * auVar283._36_4_ | (uint)!bVar24 * auVar284._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar302._40_4_ =
                         (uint)bVar24 * auVar283._40_4_ | (uint)!bVar24 * auVar284._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar302._44_4_ =
                         (uint)bVar24 * auVar283._44_4_ | (uint)!bVar24 * auVar284._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar302._48_4_ =
                         (uint)bVar24 * auVar283._48_4_ | (uint)!bVar24 * auVar284._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar302._52_4_ =
                         (uint)bVar24 * auVar283._52_4_ | (uint)!bVar24 * auVar284._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar302._56_4_ =
                         (uint)bVar24 * auVar283._56_4_ | (uint)!bVar24 * auVar284._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar302._60_4_ =
                         (uint)bVar24 * auVar283._60_4_ | (uint)!bVar24 * auVar284._60_4_;
                    auVar282 = vfmadd231ps_avx512f(auVar282,auVar302,auVar338);
                    auVar282 = vfmadd231ps_avx512f(auVar282,auVar302,auVar339);
                    auVar283 = vmulps_avx512f(auVar282,auVar282);
                    auVar284 = vfmadd213ps_avx512f(auVar282,(undefined1  [64])afVar316,
                                                   (undefined1  [64])afVar317);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar318);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar319);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar320);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar321);
                    in_ZMM17 = vfmadd213ps_avx512f(auVar284,auVar283,auVar282);
                    auVar282 = vaddps_avx512f(in_ZMM17,(undefined1  [64])afVar312);
                    auVar283 = vcvttps2dq_avx512f(auVar302);
                    auVar283 = vpaddd_avx512f(auVar283,auVar340);
                    auVar283 = vpslld_avx512f(auVar283,0x17);
                    auVar282 = vfmadd213ps_avx512f(auVar283,auVar282,auVar342);
                    auVar282 = vdivps_avx512f(auVar342,auVar282);
                    auVar282 = vfnmsub213ps_avx512f(auVar282,auVar280,auVar342);
                    goto LAB_002a0c8b;
                  case 6:
                    puVar1 = (uint *)(this->super_Deconvolution).activation_params.data;
                    auVar282 = vbroadcastss_avx512f(ZEXT416(*puVar1));
                    uVar2 = puVar1[1];
                    auVar127._4_4_ = uVar2;
                    auVar127._0_4_ = uVar2;
                    auVar127._8_4_ = uVar2;
                    auVar127._12_4_ = uVar2;
                    auVar127._16_4_ = uVar2;
                    auVar127._20_4_ = uVar2;
                    auVar127._24_4_ = uVar2;
                    auVar127._28_4_ = uVar2;
                    auVar127._32_4_ = uVar2;
                    auVar127._36_4_ = uVar2;
                    auVar127._40_4_ = uVar2;
                    auVar127._44_4_ = uVar2;
                    auVar127._48_4_ = uVar2;
                    auVar127._52_4_ = uVar2;
                    auVar127._56_4_ = uVar2;
                    auVar127._60_4_ = uVar2;
                    auVar282 = vfmadd213ps_avx512f(auVar282,auVar281,auVar127);
                    auVar282 = vmaxps_avx512f(auVar282,in_ZMM29);
                    auVar282 = vminps_avx512f(auVar282,auVar342);
LAB_002a0c8b:
                    auVar281 = vmulps_avx512f(auVar282,auVar281);
                  }
                  *pauVar162 = auVar281;
                  pauVar162 = pauVar162 + 1;
                  uVar147 = uVar147 + 1;
                  iVar343 = iVar343 + 1;
                } while (uVar147 != local_248.w);
              }
              iVar166 = iVar166 + 1;
            } while (iVar166 != local_248.h);
          }
          local_308 = local_308 + 1;
          in_ZMM10 = afVar316;
        } while (local_308 != (long)local_248.c);
      }
      auVar174 = in_ZMM29._0_16_;
      if (((local_d8._0_4_ == 0x10) && (uVar152 == 4)) && (0 < (long)local_248.c)) {
        iVar9 = (this->super_Deconvolution).dilation_w;
        iVar10 = (this->super_Deconvolution).dilation_h;
        iVar138 = (this->super_Deconvolution).stride_w;
        iVar170 = (this->super_Deconvolution).stride_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        pvVar20 = (this->super_Deconvolution).bias_data.data;
        uVar155 = (this->super_Deconvolution).kernel_w;
        uVar11 = (this->super_Deconvolution).kernel_h;
        local_308 = 0;
        auVar197._8_4_ = 0x42b0c0a5;
        auVar197._0_8_ = 0x42b0c0a542b0c0a5;
        auVar197._12_4_ = 0x42b0c0a5;
        auVar198._8_4_ = 0xc2b0c0a5;
        auVar198._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar198._12_4_ = 0xc2b0c0a5;
        auVar199._8_4_ = 0x3f000000;
        auVar199._0_8_ = 0x3f0000003f000000;
        auVar199._12_4_ = 0x3f000000;
        auVar200._8_4_ = 0x3fb8aa3b;
        auVar200._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar200._12_4_ = 0x3fb8aa3b;
        auVar201._8_4_ = 0x3f800000;
        auVar201._0_8_ = 0x3f8000003f800000;
        auVar201._12_4_ = 0x3f800000;
        auVar202._8_4_ = 0x3f318000;
        auVar202._0_8_ = 0x3f3180003f318000;
        auVar202._12_4_ = 0x3f318000;
        auVar175 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar203._8_4_ = 0x3ab743ce;
        auVar203._0_8_ = 0x3ab743ce3ab743ce;
        auVar203._12_4_ = 0x3ab743ce;
        in_ZMM10 = (float  [16])ZEXT1664(auVar203);
        auVar208._8_4_ = 0x3c088908;
        auVar208._0_8_ = 0x3c0889083c088908;
        auVar208._12_4_ = 0x3c088908;
        auVar204._8_4_ = 0x3d2aa9c1;
        auVar204._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar204._12_4_ = 0x3d2aa9c1;
        auVar205._8_4_ = 0x3e2aaaaa;
        auVar205._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar205._12_4_ = 0x3e2aaaaa;
        auVar206._8_4_ = 0x3f800000;
        auVar206._0_8_ = 0x3f8000003f800000;
        auVar206._12_4_ = 0x3f800000;
        auVar207._8_4_ = 0xb95e8083;
        auVar207._0_8_ = 0xb95e8083b95e8083;
        auVar207._12_4_ = 0xb95e8083;
        auVar176 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        do {
          local_1c8._0_4_ = local_248.h;
          if (0 < local_248.h) {
            iVar13 = bottom_blob->w;
            iVar151 = bottom_blob->h;
            pauVar164 = (undefined1 (*) [16])
                        (local_248.cstep * local_308 *
                         CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) +
                        (long)local_248.data);
            uVar12 = bottom_blob->c;
            iVar166 = 0;
            do {
              if (0 < local_248.w) {
                uVar147 = 0;
                iVar343 = (1 - uVar155) * iVar9;
                do {
                  if (pvVar20 == (void *)0x0) {
                    auVar174 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar174 = *(undefined1 (*) [16])((long)pvVar20 + local_308 * 0x10);
                  }
                  auVar337 = ZEXT1664(auVar174);
                  if (0 < (int)uVar12) {
                    pvVar154 = (void *)((this->weight_data_tm).cstep * local_308 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    pvVar15 = bottom_blob->data;
                    uVar149 = 0;
                    do {
                      if (0 < (int)uVar11) {
                        uVar161 = 0;
                        uVar146 = 0;
                        do {
                          iVar139 = (((int)uVar146 - uVar11) + 1) * iVar10 + iVar166;
                          if ((((-1 < iVar139) &&
                               (iVar140 = iVar139 / iVar170, iVar139 % iVar170 == 0)) &&
                              (0 < (int)uVar155)) && (iVar140 < iVar151)) {
                            lVar167 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                                      bottom_blob->cstep * bottom_blob->elemsize * uVar149;
                            uVar153 = (ulong)uVar155;
                            uVar158 = uVar161;
                            iVar139 = iVar343;
                            do {
                              if (((-1 < iVar139) &&
                                  (iVar140 = iVar139 / iVar138, iVar139 % iVar138 == 0)) &&
                                 (iVar140 < iVar13)) {
                                lVar157 = (long)(iVar140 << 4);
                                uVar3 = *(undefined4 *)((long)pvVar15 + lVar157 * 4 + lVar167);
                                auVar412._4_4_ = uVar3;
                                auVar412._0_4_ = uVar3;
                                auVar412._8_4_ = uVar3;
                                auVar412._12_4_ = uVar3;
                                uVar3 = *(undefined4 *)((long)pvVar15 + lVar157 * 4 + lVar167 + 4);
                                auVar433._4_4_ = uVar3;
                                auVar433._0_4_ = uVar3;
                                auVar433._8_4_ = uVar3;
                                auVar433._12_4_ = uVar3;
                                auVar177 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 8)));
                                auVar178 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0xc))
                                                     );
                                in_ZMM17 = ZEXT1664(auVar178);
                                auVar179 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x10)
                                                             ));
                                auVar180 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x14)
                                                             ));
                                auVar181 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x18)
                                                             ));
                                auVar182 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x1c)
                                                             ));
                                auVar183 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x20)
                                                             ));
                                auVar184 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x24)
                                                             ));
                                auVar185 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x28)
                                                             ));
                                auVar186 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x2c)
                                                             ));
                                auVar187 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x30)
                                                             ));
                                auVar188 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x34)
                                                             ));
                                auVar189 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x38)
                                                             ));
                                in_ZMM29 = ZEXT1664(auVar189);
                                auVar190 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x3c)
                                                             ));
                                uVar172 = uVar158 & 0xffffffff;
                                auVar174 = vfmadd231ps_fma(auVar337._0_16_,auVar412,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar154 + uVar172 * 4));
                                auVar174 = vfmadd231ps_fma(auVar174,auVar433,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar154 + uVar172 * 4 + 0x10));
                                auVar174 = vfmadd231ps_avx512vl
                                                     (auVar174,auVar177,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x20));
                                auVar174 = vfmadd231ps_avx512vl
                                                     (auVar174,auVar178,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x30));
                                auVar174 = vfmadd231ps_avx512vl
                                                     (auVar174,auVar179,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x40));
                                auVar174 = vfmadd231ps_avx512vl
                                                     (auVar174,auVar180,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x50));
                                auVar174 = vfmadd231ps_avx512vl
                                                     (auVar174,auVar181,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x60));
                                auVar174 = vfmadd231ps_avx512vl
                                                     (auVar174,auVar182,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x70));
                                auVar174 = vfmadd231ps_avx512vl
                                                     (auVar174,auVar183,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x80));
                                auVar174 = vfmadd231ps_avx512vl
                                                     (auVar174,auVar184,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x90));
                                auVar174 = vfmadd231ps_avx512vl
                                                     (auVar174,auVar185,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0xa0));
                                auVar174 = vfmadd231ps_avx512vl
                                                     (auVar174,auVar186,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0xb0));
                                auVar174 = vfmadd231ps_avx512vl
                                                     (auVar174,auVar187,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0xc0));
                                auVar174 = vfmadd231ps_avx512vl
                                                     (auVar174,auVar188,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0xd0));
                                auVar174 = vfmadd231ps_avx512vl
                                                     (auVar174,auVar189,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0xe0));
                                auVar174 = vfmadd231ps_avx512vl
                                                     (auVar174,auVar190,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0xf0));
                                auVar337 = ZEXT1664(auVar174);
                              }
                              uVar158 = uVar158 + 0x40;
                              iVar139 = iVar139 + iVar9;
                              uVar153 = uVar153 - 1;
                            } while (uVar153 != 0);
                          }
                          uVar146 = uVar146 + 1;
                          uVar161 = uVar161 + (ulong)uVar155 * 0x40;
                        } while (uVar146 != uVar11);
                      }
                      auVar174 = auVar337._0_16_;
                      pvVar154 = (void *)((long)pvVar154 + (long)(int)(uVar155 * uVar11 * 0x40) * 4)
                      ;
                      uVar149 = uVar149 + 1;
                    } while (uVar149 != uVar12);
                  }
                  switch(iVar156) {
                  case 1:
                    auVar174 = vmaxps_avx(auVar174,(undefined1  [16])0x0);
                    break;
                  case 2:
                    auVar177 = vmaxps_avx(auVar174,(undefined1  [16])0x0);
                    auVar174 = vminps_avx(auVar174,(undefined1  [16])0x0);
                    uVar3 = *(this->super_Deconvolution).activation_params.data;
                    auVar50._4_4_ = uVar3;
                    auVar50._0_4_ = uVar3;
                    auVar50._8_4_ = uVar3;
                    auVar50._12_4_ = uVar3;
                    auVar174 = vfmadd132ps_avx512vl(auVar174,auVar177,auVar50);
                    break;
                  case 3:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar48._4_4_ = uVar3;
                    auVar48._0_4_ = uVar3;
                    auVar48._8_4_ = uVar3;
                    auVar48._12_4_ = uVar3;
                    auVar174 = vmaxps_avx512vl(auVar174,auVar48);
                    uVar3 = puVar16[1];
                    auVar49._4_4_ = uVar3;
                    auVar49._0_4_ = uVar3;
                    auVar49._8_4_ = uVar3;
                    auVar49._12_4_ = uVar3;
                    auVar174 = vminps_avx512vl(auVar174,auVar49);
                    break;
                  case 4:
                    auVar46._8_4_ = 0x80000000;
                    auVar46._0_8_ = 0x8000000080000000;
                    auVar46._12_4_ = 0x80000000;
                    auVar174 = vxorps_avx512vl(auVar174,auVar46);
                    auVar174 = vminps_avx(auVar174,auVar197);
                    auVar174 = vmaxps_avx(auVar174,auVar198);
                    auVar177 = vfmadd231ps_fma(auVar199,auVar174,auVar200);
                    auVar178 = vcvttps2dq_avx512vl(auVar177);
                    auVar178 = vcvtdq2ps_avx512vl(auVar178);
                    uVar149 = vcmpps_avx512vl(auVar177,auVar178,1);
                    auVar177 = vsubps_avx512vl(auVar178,auVar201);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar196._0_4_ = (uint)bVar24 * auVar177._0_4_ | (uint)!bVar24 * auVar178._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar196._4_4_ = (uint)bVar24 * auVar177._4_4_ | (uint)!bVar24 * auVar178._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar196._8_4_ = (uint)bVar24 * auVar177._8_4_ | (uint)!bVar24 * auVar178._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar196._12_4_ =
                         (uint)bVar24 * auVar177._12_4_ | (uint)!bVar24 * auVar178._12_4_;
                    auVar174 = vfmsub231ps_avx512vl(auVar174,auVar196,auVar202);
                    auVar47._8_4_ = 0x395e8083;
                    auVar47._0_8_ = 0x395e8083395e8083;
                    auVar47._12_4_ = 0x395e8083;
                    auVar177 = vfmsub231ps_avx512vl(auVar174,auVar196,auVar47);
                    auVar413._0_4_ = auVar177._0_4_ * auVar177._0_4_;
                    auVar413._4_4_ = auVar177._4_4_ * auVar177._4_4_;
                    auVar413._8_4_ = auVar177._8_4_ * auVar177._8_4_;
                    auVar413._12_4_ = auVar177._12_4_ * auVar177._12_4_;
                    auVar174 = vfmadd213ps_fma(auVar175,auVar177,auVar203);
                    auVar174 = vfmadd213ps_fma(auVar174,auVar177,auVar208);
                    auVar174 = vfmadd213ps_fma(auVar174,auVar177,auVar204);
                    auVar174 = vfmadd213ps_fma(auVar174,auVar177,auVar205);
                    auVar174 = vfmadd213ps_fma(auVar174,auVar177,auVar199);
                    auVar174 = vfmadd213ps_fma(auVar174,auVar413,auVar177);
                    auVar356._0_4_ = auVar174._0_4_ + 1.0;
                    auVar356._4_4_ = auVar174._4_4_ + 1.0;
                    auVar356._8_4_ = auVar174._8_4_ + 1.0;
                    auVar356._12_4_ = auVar174._12_4_ + 1.0;
                    auVar174 = vcvttps2dq_avx512vl(auVar196);
                    auVar174 = vpslld_avx(auVar174,0x17);
                    auVar174 = vpaddd_avx(auVar174,auVar206);
                    auVar174 = vfmadd213ps_fma(auVar174,auVar356,auVar201);
                    auVar174 = vdivps_avx(auVar201,auVar174);
                    break;
                  case 5:
                    auVar177 = vminps_avx(auVar174,auVar197);
                    auVar177 = vmaxps_avx(auVar177,auVar198);
                    auVar178 = vfmadd213ps_fma(auVar200,auVar177,auVar199);
                    auVar179 = vcvttps2dq_avx512vl(auVar178);
                    auVar179 = vcvtdq2ps_avx512vl(auVar179);
                    uVar149 = vcmpps_avx512vl(auVar178,auVar179,1);
                    auVar178 = vsubps_avx512vl(auVar179,auVar201);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar191._0_4_ = (uint)bVar24 * auVar178._0_4_ | (uint)!bVar24 * auVar179._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar191._4_4_ = (uint)bVar24 * auVar178._4_4_ | (uint)!bVar24 * auVar179._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar191._8_4_ = (uint)bVar24 * auVar178._8_4_ | (uint)!bVar24 * auVar179._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar191._12_4_ =
                         (uint)bVar24 * auVar178._12_4_ | (uint)!bVar24 * auVar179._12_4_;
                    auVar177 = vfmsub231ps_avx512vl(auVar177,auVar191,auVar202);
                    auVar177 = vfnmsub231ps_avx512vl(auVar177,auVar191,auVar207);
                    auVar434._0_4_ = auVar177._0_4_ * auVar177._0_4_;
                    auVar434._4_4_ = auVar177._4_4_ * auVar177._4_4_;
                    auVar434._8_4_ = auVar177._8_4_ * auVar177._8_4_;
                    auVar434._12_4_ = auVar177._12_4_ * auVar177._12_4_;
                    auVar178 = vfmadd213ps_avx512vl(auVar175,auVar177,auVar203);
                    auVar178 = vfmadd213ps_avx512vl(auVar178,auVar177,auVar208);
                    auVar178 = vfmadd213ps_avx512vl(auVar178,auVar177,auVar204);
                    auVar178 = vfmadd213ps_avx512vl(auVar178,auVar177,auVar205);
                    auVar178 = vfmadd213ps_avx512vl(auVar178,auVar177,auVar199);
                    auVar177 = vfmadd213ps_avx512vl(auVar178,auVar434,auVar177);
                    auVar178 = vaddps_avx512vl(auVar177,auVar201);
                    auVar177 = vcvttps2dq_avx512vl(auVar191);
                    auVar177 = vpslld_avx(auVar177,0x17);
                    auVar177 = vpaddd_avx(auVar177,auVar206);
                    auVar177 = vfmadd213ps_fma(auVar177,auVar178,auVar201);
                    uVar149 = vcmpps_avx512vl(auVar177,(undefined1  [16])0x0,2);
                    auVar180._8_4_ = 0x800000;
                    auVar180._0_8_ = 0x80000000800000;
                    auVar180._12_4_ = 0x800000;
                    auVar177 = vmaxps_avx512vl(auVar177,auVar180);
                    auVar180 = vpsrld_avx(auVar177,0x17);
                    auVar178 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar181._8_4_ = 0x3f000000;
                    auVar181._0_8_ = 0x3f0000003f000000;
                    auVar181._12_4_ = 0x3f000000;
                    auVar177 = vpternlogd_avx512vl(auVar177,auVar178,auVar181,0xea);
                    auVar182._8_4_ = 0x3f3504f3;
                    auVar182._0_8_ = 0x3f3504f33f3504f3;
                    auVar182._12_4_ = 0x3f3504f3;
                    uVar161 = vcmpps_avx512vl(auVar177,auVar182,1);
                    auVar183._8_4_ = 0xbf800000;
                    auVar183._0_8_ = 0xbf800000bf800000;
                    auVar183._12_4_ = 0xbf800000;
                    auVar178 = vaddps_avx512vl(auVar177,auVar183);
                    auVar177 = vaddps_avx512vl(auVar178,auVar177);
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar192._0_4_ = (uint)bVar24 * auVar177._0_4_ | (uint)!bVar24 * auVar178._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar192._4_4_ = (uint)bVar24 * auVar177._4_4_ | (uint)!bVar24 * auVar178._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar192._8_4_ = (uint)bVar24 * auVar177._8_4_ | (uint)!bVar24 * auVar178._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar192._12_4_ =
                         (uint)bVar24 * auVar177._12_4_ | (uint)!bVar24 * auVar178._12_4_;
                    auVar178 = vmulps_avx512vl(auVar192,auVar192);
                    auVar177 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                    auVar184._8_4_ = 0xbdebd1b8;
                    auVar184._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar184._12_4_ = 0xbdebd1b8;
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar192,auVar184);
                    auVar185._8_4_ = 0x3def251a;
                    auVar185._0_8_ = 0x3def251a3def251a;
                    auVar185._12_4_ = 0x3def251a;
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar192,auVar185);
                    auVar186._8_4_ = 0xbdfe5d4f;
                    auVar186._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar186._12_4_ = 0xbdfe5d4f;
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar192,auVar186);
                    auVar187._8_4_ = 0x3e11e9bf;
                    auVar187._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar187._12_4_ = 0x3e11e9bf;
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar192,auVar187);
                    auVar188._8_4_ = 0xbe2aae50;
                    auVar188._0_8_ = 0xbe2aae50be2aae50;
                    auVar188._12_4_ = 0xbe2aae50;
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar192,auVar188);
                    auVar189._8_4_ = 0x3e4cceac;
                    auVar189._0_8_ = 0x3e4cceac3e4cceac;
                    auVar189._12_4_ = 0x3e4cceac;
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar192,auVar189);
                    auVar190._8_4_ = 0xbe7ffffc;
                    auVar190._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar190._12_4_ = 0xbe7ffffc;
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar192,auVar190);
                    auVar44._8_4_ = 0x3eaaaaaa;
                    auVar44._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar44._12_4_ = 0x3eaaaaaa;
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar192,auVar44);
                    auVar179 = vmulps_avx512vl(auVar178,auVar192);
                    auVar179 = vmulps_avx512vl(auVar179,auVar177);
                    auVar45._8_4_ = 0xffffff82;
                    auVar45._0_8_ = 0xffffff82ffffff82;
                    auVar45._12_4_ = 0xffffff82;
                    auVar177 = vpaddd_avx512vl(auVar180,auVar45);
                    auVar177 = vcvtdq2ps_avx(auVar177);
                    auVar180 = vsubps_avx512vl(auVar177,auVar201);
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar193._0_4_ = (uint)bVar24 * auVar180._0_4_ | (uint)!bVar24 * auVar177._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar193._4_4_ = (uint)bVar24 * auVar180._4_4_ | (uint)!bVar24 * auVar177._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar193._8_4_ = (uint)bVar24 * auVar180._8_4_ | (uint)!bVar24 * auVar177._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar193._12_4_ =
                         (uint)bVar24 * auVar180._12_4_ | (uint)!bVar24 * auVar177._12_4_;
                    auVar177 = vfmadd231ps_avx512vl(auVar179,auVar193,auVar207);
                    auVar177 = vfmsub231ps_avx512vl(auVar177,auVar199,auVar178);
                    auVar177 = vsubps_avx512vl(auVar177,auVar192);
                    auVar177 = vfnmadd231ps_fma(auVar177,auVar202,auVar193);
                    auVar178 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar194._0_4_ =
                         (uint)bVar24 * auVar178._0_4_ |
                         (uint)!bVar24 * (int)(auVar177._0_4_ + auVar177._0_4_);
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar194._4_4_ =
                         (uint)bVar24 * auVar178._4_4_ |
                         (uint)!bVar24 * (int)(auVar177._4_4_ + auVar177._4_4_);
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar194._8_4_ =
                         (uint)bVar24 * auVar178._8_4_ |
                         (uint)!bVar24 * (int)(auVar177._8_4_ + auVar177._8_4_);
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar194._12_4_ =
                         (uint)bVar24 * auVar178._12_4_ |
                         (uint)!bVar24 * (int)(auVar177._12_4_ + auVar177._12_4_);
                    auVar177 = vminps_avx(auVar194,auVar197);
                    auVar177 = vmaxps_avx(auVar177,auVar198);
                    auVar178 = vfmadd213ps_fma(auVar200,auVar177,auVar199);
                    auVar179 = vcvttps2dq_avx512vl(auVar178);
                    auVar179 = vcvtdq2ps_avx512vl(auVar179);
                    uVar149 = vcmpps_avx512vl(auVar178,auVar179,1);
                    auVar178 = vsubps_avx512vl(auVar179,auVar201);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar195._0_4_ = (uint)bVar24 * auVar178._0_4_ | (uint)!bVar24 * auVar179._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar195._4_4_ = (uint)bVar24 * auVar178._4_4_ | (uint)!bVar24 * auVar179._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar195._8_4_ = (uint)bVar24 * auVar178._8_4_ | (uint)!bVar24 * auVar179._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar195._12_4_ =
                         (uint)bVar24 * auVar178._12_4_ | (uint)!bVar24 * auVar179._12_4_;
                    auVar177 = vfmsub231ps_avx512vl(auVar177,auVar195,auVar202);
                    auVar177 = vfnmsub231ps_avx512vl(auVar177,auVar195,auVar207);
                    auVar435._0_4_ = auVar177._0_4_ * auVar177._0_4_;
                    auVar435._4_4_ = auVar177._4_4_ * auVar177._4_4_;
                    auVar435._8_4_ = auVar177._8_4_ * auVar177._8_4_;
                    auVar435._12_4_ = auVar177._12_4_ * auVar177._12_4_;
                    auVar178 = vfmadd213ps_avx512vl(auVar175,auVar177,auVar203);
                    auVar178 = vfmadd213ps_avx512vl(auVar178,auVar177,auVar208);
                    auVar178 = vfmadd213ps_avx512vl(auVar178,auVar177,auVar204);
                    auVar178 = vfmadd213ps_avx512vl(auVar178,auVar177,auVar205);
                    auVar178 = vfmadd213ps_avx512vl(auVar178,auVar177,auVar199);
                    auVar177 = vfmadd213ps_avx512vl(auVar178,auVar435,auVar177);
                    in_ZMM17 = ZEXT1664(auVar177);
                    auVar178 = vaddps_avx512vl(auVar177,auVar201);
                    auVar177 = vcvttps2dq_avx512vl(auVar195);
                    auVar177 = vpslld_avx(auVar177,0x17);
                    auVar177 = vpaddd_avx(auVar177,auVar206);
                    auVar177 = vfmadd213ps_fma(auVar177,auVar178,auVar201);
                    auVar177 = vdivps_avx512vl(auVar176,auVar177);
                    auVar174 = vfmsub231ps_fma(auVar174,auVar174,auVar177);
                    break;
                  case 6:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar179._4_4_ = uVar3;
                    auVar179._0_4_ = uVar3;
                    auVar179._8_4_ = uVar3;
                    auVar179._12_4_ = uVar3;
                    uVar3 = puVar16[1];
                    auVar177._4_4_ = uVar3;
                    auVar177._0_4_ = uVar3;
                    auVar177._8_4_ = uVar3;
                    auVar177._12_4_ = uVar3;
                    auVar177 = vfmadd213ps_avx512vl(auVar179,auVar174,auVar177);
                    auVar177 = vmaxps_avx(auVar177,(undefined1  [16])0x0);
                    auVar177 = vminps_avx(auVar177,auVar201);
                    auVar178._0_4_ = auVar177._0_4_ * auVar174._0_4_;
                    auVar178._4_4_ = auVar177._4_4_ * auVar174._4_4_;
                    auVar178._8_4_ = auVar177._8_4_ * auVar174._8_4_;
                    auVar178._12_4_ = auVar177._12_4_ * auVar174._12_4_;
                    auVar174 = auVar178;
                  }
                  *pauVar164 = auVar174;
                  pauVar164 = pauVar164 + 1;
                  uVar147 = uVar147 + 1;
                  iVar343 = iVar343 + 1;
                } while (uVar147 != local_248.w);
              }
              iVar166 = iVar166 + 1;
            } while (iVar166 != local_248.h);
          }
          auVar174 = in_ZMM29._0_16_;
          local_308 = local_308 + 1;
        } while (local_308 != (long)local_248.c);
      }
      afVar327 = _ps512_cephes_log_p8;
      afVar326 = _ps512_cephes_log_p7;
      afVar325 = _ps512_cephes_log_p6;
      afVar324 = _ps512_cephes_log_p5;
      afVar323 = _ps512_cephes_log_p4;
      afVar462 = _ps512_cephes_log_p3;
      afVar322 = _ps512_cephes_log_p2;
      afVar321 = ::_ps512_cephes_exp_p5;
      afVar320 = ::_ps512_cephes_exp_p4;
      afVar319 = ::_ps512_cephes_exp_p3;
      afVar318 = ::_ps512_cephes_exp_p2;
      afVar317 = ::_ps512_cephes_exp_p1;
      afVar316 = ::_ps512_cephes_exp_p0;
      afVar315 = ::_ps512_cephes_LOG2EF;
      afVar314 = ::_ps512_exp_lo;
      afVar313 = ::_ps512_exp_hi;
      afVar312 = ::_ps512_1;
      if (((local_d8._0_4_ == 1) && (uVar152 == 0x10)) && (0 < (long)local_248.c)) {
        iVar9 = (this->super_Deconvolution).dilation_w;
        iVar10 = (this->super_Deconvolution).dilation_h;
        iVar138 = (this->super_Deconvolution).stride_w;
        iVar170 = (this->super_Deconvolution).stride_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        pvVar20 = (this->super_Deconvolution).bias_data.data;
        uVar155 = (this->super_Deconvolution).kernel_w;
        uVar11 = (this->super_Deconvolution).kernel_h;
        auVar337 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar338 = vxorps_avx512dq(auVar337,(undefined1  [64])_ps512_cephes_log_q2);
        auVar339 = vxorps_avx512dq(auVar337,(undefined1  [64])_ps512_cephes_log_q1);
        auVar340 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar341 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar337);
        local_308 = 0;
        auVar174 = vxorps_avx512vl(auVar174,auVar174);
        auVar281 = ZEXT1664(auVar174);
        auVar342 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar280 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
        do {
          local_1c8._0_4_ = local_248.h;
          if (0 < local_248.h) {
            iVar13 = bottom_blob->w;
            iVar151 = bottom_blob->h;
            pauVar162 = (undefined1 (*) [64])
                        (local_248.cstep * local_308 *
                         CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) +
                        (long)local_248.data);
            uVar12 = bottom_blob->c;
            iVar166 = 0;
            do {
              if (0 < local_248.w) {
                uVar147 = 0;
                iVar343 = (1 - uVar155) * iVar9;
                do {
                  if (pvVar20 == (void *)0x0) {
                    auVar282 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar282 = *(undefined1 (*) [64])((long)pvVar20 + local_308 * 0x40);
                  }
                  if (0 < (int)uVar12) {
                    pvVar154 = (void *)((this->weight_data_tm).cstep * local_308 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    uVar149 = 0;
                    do {
                      if (0 < (int)uVar11) {
                        uVar146 = 0;
                        uVar161 = 0;
                        do {
                          iVar139 = (((int)uVar161 - uVar11) + 1) * iVar10 + iVar166;
                          if ((((-1 < iVar139) &&
                               (iVar140 = iVar139 / iVar170, iVar139 % iVar170 == 0)) &&
                              (iVar140 < iVar151)) && (0 < (int)uVar155)) {
                            uVar153 = uVar146;
                            uVar158 = (ulong)uVar155;
                            iVar139 = iVar343;
                            do {
                              if (((-1 < iVar139) &&
                                  (iVar141 = iVar139 / iVar138, iVar139 % iVar138 == 0)) &&
                                 (iVar141 < iVar13)) {
                                auVar283 = vbroadcastss_avx512f
                                                     (ZEXT416(*(uint *)((long)bottom_blob->data +
                                                                       (long)iVar141 * 4 +
                                                                       (long)iVar140 *
                                                                       (long)bottom_blob->w *
                                                                       bottom_blob->elemsize +
                                                                       bottom_blob->cstep *
                                                                       bottom_blob->elemsize *
                                                                       uVar149)));
                                auVar282 = vfmadd231ps_avx512f(auVar282,auVar283,
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar154 +
                                                                (uVar153 & 0xffffffff) * 4));
                              }
                              uVar153 = uVar153 + 0x10;
                              iVar139 = iVar139 + iVar9;
                              uVar158 = uVar158 - 1;
                            } while (uVar158 != 0);
                          }
                          uVar161 = uVar161 + 1;
                          uVar146 = uVar146 + (ulong)uVar155 * 0x10;
                        } while (uVar161 != uVar11);
                      }
                      pvVar154 = (void *)((long)pvVar154 + (long)(int)(uVar155 * uVar11 * 0x10) * 4)
                      ;
                      uVar149 = uVar149 + 1;
                    } while (uVar149 != uVar12);
                  }
                  switch(iVar156) {
                  case 1:
                    auVar282 = vmaxps_avx512f(auVar282,auVar281);
                    break;
                  case 2:
                    uVar149 = vcmpps_avx512f(auVar282,auVar281,1);
                    uVar3 = *(this->super_Deconvolution).activation_params.data;
                    auVar134._4_4_ = uVar3;
                    auVar134._0_4_ = uVar3;
                    auVar134._8_4_ = uVar3;
                    auVar134._12_4_ = uVar3;
                    auVar134._16_4_ = uVar3;
                    auVar134._20_4_ = uVar3;
                    auVar134._24_4_ = uVar3;
                    auVar134._28_4_ = uVar3;
                    auVar134._32_4_ = uVar3;
                    auVar134._36_4_ = uVar3;
                    auVar134._40_4_ = uVar3;
                    auVar134._44_4_ = uVar3;
                    auVar134._48_4_ = uVar3;
                    auVar134._52_4_ = uVar3;
                    auVar134._56_4_ = uVar3;
                    auVar134._60_4_ = uVar3;
                    auVar283 = vmulps_avx512f(auVar282,auVar134);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar311._0_4_ = (uint)bVar24 * auVar283._0_4_ | (uint)!bVar24 * auVar282._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar311._4_4_ = (uint)bVar24 * auVar283._4_4_ | (uint)!bVar24 * auVar282._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar311._8_4_ = (uint)bVar24 * auVar283._8_4_ | (uint)!bVar24 * auVar282._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar311._12_4_ =
                         (uint)bVar24 * auVar283._12_4_ | (uint)!bVar24 * auVar282._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar311._16_4_ =
                         (uint)bVar24 * auVar283._16_4_ | (uint)!bVar24 * auVar282._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar311._20_4_ =
                         (uint)bVar24 * auVar283._20_4_ | (uint)!bVar24 * auVar282._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar311._24_4_ =
                         (uint)bVar24 * auVar283._24_4_ | (uint)!bVar24 * auVar282._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar311._28_4_ =
                         (uint)bVar24 * auVar283._28_4_ | (uint)!bVar24 * auVar282._28_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                    auVar311._32_4_ =
                         (uint)bVar24 * auVar283._32_4_ | (uint)!bVar24 * auVar282._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar311._36_4_ =
                         (uint)bVar24 * auVar283._36_4_ | (uint)!bVar24 * auVar282._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar311._40_4_ =
                         (uint)bVar24 * auVar283._40_4_ | (uint)!bVar24 * auVar282._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar311._44_4_ =
                         (uint)bVar24 * auVar283._44_4_ | (uint)!bVar24 * auVar282._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar311._48_4_ =
                         (uint)bVar24 * auVar283._48_4_ | (uint)!bVar24 * auVar282._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar311._52_4_ =
                         (uint)bVar24 * auVar283._52_4_ | (uint)!bVar24 * auVar282._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar311._56_4_ =
                         (uint)bVar24 * auVar283._56_4_ | (uint)!bVar24 * auVar282._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar311._60_4_ =
                         (uint)bVar24 * auVar283._60_4_ | (uint)!bVar24 * auVar282._60_4_;
                    auVar282 = auVar311;
                    break;
                  case 3:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar132._4_4_ = uVar3;
                    auVar132._0_4_ = uVar3;
                    auVar132._8_4_ = uVar3;
                    auVar132._12_4_ = uVar3;
                    auVar132._16_4_ = uVar3;
                    auVar132._20_4_ = uVar3;
                    auVar132._24_4_ = uVar3;
                    auVar132._28_4_ = uVar3;
                    auVar132._32_4_ = uVar3;
                    auVar132._36_4_ = uVar3;
                    auVar132._40_4_ = uVar3;
                    auVar132._44_4_ = uVar3;
                    auVar132._48_4_ = uVar3;
                    auVar132._52_4_ = uVar3;
                    auVar132._56_4_ = uVar3;
                    auVar132._60_4_ = uVar3;
                    auVar282 = vmaxps_avx512f(auVar282,auVar132);
                    uVar3 = puVar16[1];
                    auVar133._4_4_ = uVar3;
                    auVar133._0_4_ = uVar3;
                    auVar133._8_4_ = uVar3;
                    auVar133._12_4_ = uVar3;
                    auVar133._16_4_ = uVar3;
                    auVar133._20_4_ = uVar3;
                    auVar133._24_4_ = uVar3;
                    auVar133._28_4_ = uVar3;
                    auVar133._32_4_ = uVar3;
                    auVar133._36_4_ = uVar3;
                    auVar133._40_4_ = uVar3;
                    auVar133._44_4_ = uVar3;
                    auVar133._48_4_ = uVar3;
                    auVar133._52_4_ = uVar3;
                    auVar133._56_4_ = uVar3;
                    auVar133._60_4_ = uVar3;
                    auVar282 = vminps_avx512f(auVar282,auVar133);
                    break;
                  case 4:
                    auVar282 = vxorps_avx512dq(auVar282,auVar337);
                    auVar282 = vminps_avx512f(auVar282,(undefined1  [64])afVar313);
                    auVar282 = vmaxps_avx512f(auVar282,(undefined1  [64])afVar314);
                    auVar283 = vfmadd213ps_avx512f((undefined1  [64])afVar315,auVar282,
                                                   (undefined1  [64])afVar321);
                    auVar284 = vrndscaleps_avx512f(auVar283,1);
                    uVar149 = vcmpps_avx512f(auVar283,auVar284,1);
                    auVar283 = vsubps_avx512f(auVar284,(undefined1  [64])afVar312);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar310._0_4_ = (uint)bVar24 * auVar283._0_4_ | (uint)!bVar24 * auVar284._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar310._4_4_ = (uint)bVar24 * auVar283._4_4_ | (uint)!bVar24 * auVar284._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar310._8_4_ = (uint)bVar24 * auVar283._8_4_ | (uint)!bVar24 * auVar284._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar310._12_4_ =
                         (uint)bVar24 * auVar283._12_4_ | (uint)!bVar24 * auVar284._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar310._16_4_ =
                         (uint)bVar24 * auVar283._16_4_ | (uint)!bVar24 * auVar284._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar310._20_4_ =
                         (uint)bVar24 * auVar283._20_4_ | (uint)!bVar24 * auVar284._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar310._24_4_ =
                         (uint)bVar24 * auVar283._24_4_ | (uint)!bVar24 * auVar284._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar310._28_4_ =
                         (uint)bVar24 * auVar283._28_4_ | (uint)!bVar24 * auVar284._28_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                    auVar310._32_4_ =
                         (uint)bVar24 * auVar283._32_4_ | (uint)!bVar24 * auVar284._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar310._36_4_ =
                         (uint)bVar24 * auVar283._36_4_ | (uint)!bVar24 * auVar284._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar310._40_4_ =
                         (uint)bVar24 * auVar283._40_4_ | (uint)!bVar24 * auVar284._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar310._44_4_ =
                         (uint)bVar24 * auVar283._44_4_ | (uint)!bVar24 * auVar284._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar310._48_4_ =
                         (uint)bVar24 * auVar283._48_4_ | (uint)!bVar24 * auVar284._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar310._52_4_ =
                         (uint)bVar24 * auVar283._52_4_ | (uint)!bVar24 * auVar284._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar310._56_4_ =
                         (uint)bVar24 * auVar283._56_4_ | (uint)!bVar24 * auVar284._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar310._60_4_ =
                         (uint)bVar24 * auVar283._60_4_ | (uint)!bVar24 * auVar284._60_4_;
                    auVar282 = vfmadd231ps_avx512f(auVar282,auVar310,auVar338);
                    auVar282 = vfmadd231ps_avx512f(auVar282,auVar310,auVar339);
                    auVar283 = vmulps_avx512f(auVar282,auVar282);
                    auVar284 = vfmadd213ps_avx512f(auVar282,(undefined1  [64])afVar316,
                                                   (undefined1  [64])afVar317);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar318);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar319);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar320);
                    auVar284 = vfmadd213ps_avx512f(auVar284,auVar282,(undefined1  [64])afVar321);
                    auVar282 = vfmadd213ps_avx512f(auVar284,auVar283,auVar282);
                    auVar282 = vaddps_avx512f(auVar282,(undefined1  [64])afVar312);
                    auVar283 = vcvttps2dq_avx512f(auVar310);
                    auVar283 = vpaddd_avx512f(auVar283,auVar340);
                    auVar283 = vpslld_avx512f(auVar283,0x17);
                    auVar282 = vfmadd213ps_avx512f(auVar283,auVar282,auVar342);
                    auVar282 = vdivps_avx512f(auVar342,auVar282);
                    break;
                  case 5:
                    auVar283 = vminps_avx512f(auVar282,(undefined1  [64])afVar313);
                    auVar283 = vmaxps_avx512f(auVar283,(undefined1  [64])afVar314);
                    auVar284 = vfmadd213ps_avx512f((undefined1  [64])afVar315,auVar283,
                                                   (undefined1  [64])afVar321);
                    auVar285 = vrndscaleps_avx512f(auVar284,1);
                    uVar149 = vcmpps_avx512f(auVar284,auVar285,1);
                    auVar284 = vsubps_avx512f(auVar285,(undefined1  [64])afVar312);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar305._0_4_ = (uint)bVar24 * auVar284._0_4_ | (uint)!bVar24 * auVar285._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar305._4_4_ = (uint)bVar24 * auVar284._4_4_ | (uint)!bVar24 * auVar285._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar305._8_4_ = (uint)bVar24 * auVar284._8_4_ | (uint)!bVar24 * auVar285._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar305._12_4_ =
                         (uint)bVar24 * auVar284._12_4_ | (uint)!bVar24 * auVar285._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar305._16_4_ =
                         (uint)bVar24 * auVar284._16_4_ | (uint)!bVar24 * auVar285._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar305._20_4_ =
                         (uint)bVar24 * auVar284._20_4_ | (uint)!bVar24 * auVar285._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar305._24_4_ =
                         (uint)bVar24 * auVar284._24_4_ | (uint)!bVar24 * auVar285._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar305._28_4_ =
                         (uint)bVar24 * auVar284._28_4_ | (uint)!bVar24 * auVar285._28_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                    auVar305._32_4_ =
                         (uint)bVar24 * auVar284._32_4_ | (uint)!bVar24 * auVar285._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar305._36_4_ =
                         (uint)bVar24 * auVar284._36_4_ | (uint)!bVar24 * auVar285._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar305._40_4_ =
                         (uint)bVar24 * auVar284._40_4_ | (uint)!bVar24 * auVar285._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar305._44_4_ =
                         (uint)bVar24 * auVar284._44_4_ | (uint)!bVar24 * auVar285._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar305._48_4_ =
                         (uint)bVar24 * auVar284._48_4_ | (uint)!bVar24 * auVar285._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar305._52_4_ =
                         (uint)bVar24 * auVar284._52_4_ | (uint)!bVar24 * auVar285._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar305._56_4_ =
                         (uint)bVar24 * auVar284._56_4_ | (uint)!bVar24 * auVar285._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar305._60_4_ =
                         (uint)bVar24 * auVar284._60_4_ | (uint)!bVar24 * auVar285._60_4_;
                    auVar283 = vfmadd231ps_avx512f(auVar283,auVar305,auVar338);
                    auVar283 = vfmadd231ps_avx512f(auVar283,auVar305,auVar339);
                    auVar284 = vmulps_avx512f(auVar283,auVar283);
                    auVar285 = vfmadd213ps_avx512f(auVar283,(undefined1  [64])afVar316,
                                                   (undefined1  [64])afVar317);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar283,(undefined1  [64])afVar318);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar283,(undefined1  [64])afVar319);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar283,(undefined1  [64])afVar320);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar283,(undefined1  [64])afVar321);
                    auVar283 = vfmadd213ps_avx512f(auVar285,auVar284,auVar283);
                    auVar283 = vaddps_avx512f(auVar283,(undefined1  [64])afVar312);
                    auVar284 = vcvttps2dq_avx512f(auVar305);
                    auVar284 = vpaddd_avx512f(auVar284,auVar340);
                    auVar284 = vpslld_avx512f(auVar284,0x17);
                    auVar283 = vfmadd213ps_avx512f(auVar284,auVar283,auVar342);
                    auVar284 = vmaxps_avx512f(auVar283,(undefined1  [64])_ps512_min_norm_pos);
                    auVar285 = vpsrld_avx512f(auVar284,0x17);
                    auVar284 = vpternlogd_avx512f(auVar284,(undefined1  [64])afVar321,
                                                  (undefined1  [64])_ps512_inv_mant_mask,0xec);
                    uVar149 = vcmpps_avx512f(auVar284,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                    auVar286 = vsubps_avx512f(auVar284,(undefined1  [64])afVar312);
                    auVar284 = vaddps_avx512f(auVar286,auVar284);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar306._0_4_ = (uint)bVar24 * auVar284._0_4_ | (uint)!bVar24 * auVar286._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar306._4_4_ = (uint)bVar24 * auVar284._4_4_ | (uint)!bVar24 * auVar286._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar306._8_4_ = (uint)bVar24 * auVar284._8_4_ | (uint)!bVar24 * auVar286._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar306._12_4_ =
                         (uint)bVar24 * auVar284._12_4_ | (uint)!bVar24 * auVar286._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar306._16_4_ =
                         (uint)bVar24 * auVar284._16_4_ | (uint)!bVar24 * auVar286._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar306._20_4_ =
                         (uint)bVar24 * auVar284._20_4_ | (uint)!bVar24 * auVar286._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar306._24_4_ =
                         (uint)bVar24 * auVar284._24_4_ | (uint)!bVar24 * auVar286._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar306._28_4_ =
                         (uint)bVar24 * auVar284._28_4_ | (uint)!bVar24 * auVar286._28_4_;
                    bVar32 = (byte)(uVar149 >> 8);
                    bVar24 = (bool)(bVar32 & 1);
                    auVar306._32_4_ =
                         (uint)bVar24 * auVar284._32_4_ | (uint)!bVar24 * auVar286._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar306._36_4_ =
                         (uint)bVar24 * auVar284._36_4_ | (uint)!bVar24 * auVar286._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar306._40_4_ =
                         (uint)bVar24 * auVar284._40_4_ | (uint)!bVar24 * auVar286._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar306._44_4_ =
                         (uint)bVar24 * auVar284._44_4_ | (uint)!bVar24 * auVar286._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar306._48_4_ =
                         (uint)bVar24 * auVar284._48_4_ | (uint)!bVar24 * auVar286._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar306._52_4_ =
                         (uint)bVar24 * auVar284._52_4_ | (uint)!bVar24 * auVar286._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar306._56_4_ =
                         (uint)bVar24 * auVar284._56_4_ | (uint)!bVar24 * auVar286._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar306._60_4_ =
                         (uint)bVar24 * auVar284._60_4_ | (uint)!bVar24 * auVar286._60_4_;
                    auVar284 = vmulps_avx512f(auVar306,auVar306);
                    auVar286 = vfmadd132ps_avx512f(auVar306,(undefined1  [64])_ps512_cephes_log_p1,
                                                   (undefined1  [64])_ps512_cephes_log_p0);
                    auVar286 = vfmadd213ps_avx512f(auVar286,auVar306,(undefined1  [64])afVar322);
                    auVar286 = vfmadd213ps_avx512f(auVar286,auVar306,(undefined1  [64])afVar462);
                    auVar286 = vfmadd213ps_avx512f(auVar286,auVar306,(undefined1  [64])afVar323);
                    auVar286 = vfmadd213ps_avx512f(auVar286,auVar306,(undefined1  [64])afVar324);
                    auVar286 = vfmadd213ps_avx512f(auVar286,auVar306,(undefined1  [64])afVar325);
                    auVar286 = vfmadd213ps_avx512f(auVar286,auVar306,(undefined1  [64])afVar326);
                    auVar286 = vfmadd213ps_avx512f(auVar286,auVar306,(undefined1  [64])afVar327);
                    auVar287 = vmulps_avx512f(auVar284,auVar306);
                    auVar286 = vfmadd213ps_avx512f(auVar287,auVar286,auVar306);
                    uVar161 = vcmpps_avx512f(auVar283,auVar281,2);
                    auVar283 = vpsubd_avx512f(auVar285,auVar340);
                    auVar283 = vcvtdq2ps_avx512f(auVar283);
                    auVar285 = vaddps_avx512f(auVar283,(undefined1  [64])afVar312);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar307._0_4_ = (uint)bVar24 * auVar283._0_4_ | (uint)!bVar24 * auVar285._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar307._4_4_ = (uint)bVar24 * auVar283._4_4_ | (uint)!bVar24 * auVar285._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar307._8_4_ = (uint)bVar24 * auVar283._8_4_ | (uint)!bVar24 * auVar285._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar307._12_4_ =
                         (uint)bVar24 * auVar283._12_4_ | (uint)!bVar24 * auVar285._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar307._16_4_ =
                         (uint)bVar24 * auVar283._16_4_ | (uint)!bVar24 * auVar285._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar307._20_4_ =
                         (uint)bVar24 * auVar283._20_4_ | (uint)!bVar24 * auVar285._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar307._24_4_ =
                         (uint)bVar24 * auVar283._24_4_ | (uint)!bVar24 * auVar285._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar307._28_4_ =
                         (uint)bVar24 * auVar283._28_4_ | (uint)!bVar24 * auVar285._28_4_;
                    bVar24 = (bool)(bVar32 & 1);
                    auVar307._32_4_ =
                         (uint)bVar24 * auVar283._32_4_ | (uint)!bVar24 * auVar285._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar307._36_4_ =
                         (uint)bVar24 * auVar283._36_4_ | (uint)!bVar24 * auVar285._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar307._40_4_ =
                         (uint)bVar24 * auVar283._40_4_ | (uint)!bVar24 * auVar285._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar307._44_4_ =
                         (uint)bVar24 * auVar283._44_4_ | (uint)!bVar24 * auVar285._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar307._48_4_ =
                         (uint)bVar24 * auVar283._48_4_ | (uint)!bVar24 * auVar285._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar307._52_4_ =
                         (uint)bVar24 * auVar283._52_4_ | (uint)!bVar24 * auVar285._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar307._56_4_ =
                         (uint)bVar24 * auVar283._56_4_ | (uint)!bVar24 * auVar285._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar307._60_4_ =
                         (uint)bVar24 * auVar283._60_4_ | (uint)!bVar24 * auVar285._60_4_;
                    auVar283 = vfmadd231ps_avx512f(auVar286,auVar307,
                                                   (undefined1  [64])_ps512_cephes_log_q1);
                    auVar283 = vfmadd231ps_avx512f(auVar283,auVar341,auVar284);
                    auVar283 = vfmadd231ps_avx512f(auVar283,auVar307,
                                                   (undefined1  [64])_ps512_cephes_log_q2);
                    auVar283 = vmulps_avx512f(auVar283,auVar280);
                    auVar284 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar308._0_4_ = (uint)bVar24 * auVar284._0_4_ | (uint)!bVar24 * auVar283._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar308._4_4_ = (uint)bVar24 * auVar284._4_4_ | (uint)!bVar24 * auVar283._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar308._8_4_ = (uint)bVar24 * auVar284._8_4_ | (uint)!bVar24 * auVar283._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar308._12_4_ =
                         (uint)bVar24 * auVar284._12_4_ | (uint)!bVar24 * auVar283._12_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 4) & 1);
                    auVar308._16_4_ =
                         (uint)bVar24 * auVar284._16_4_ | (uint)!bVar24 * auVar283._16_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 5) & 1);
                    auVar308._20_4_ =
                         (uint)bVar24 * auVar284._20_4_ | (uint)!bVar24 * auVar283._20_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 6) & 1);
                    auVar308._24_4_ =
                         (uint)bVar24 * auVar284._24_4_ | (uint)!bVar24 * auVar283._24_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 7) & 1);
                    auVar308._28_4_ =
                         (uint)bVar24 * auVar284._28_4_ | (uint)!bVar24 * auVar283._28_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 8) & 1);
                    auVar308._32_4_ =
                         (uint)bVar24 * auVar284._32_4_ | (uint)!bVar24 * auVar283._32_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 9) & 1);
                    auVar308._36_4_ =
                         (uint)bVar24 * auVar284._36_4_ | (uint)!bVar24 * auVar283._36_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 10) & 1);
                    auVar308._40_4_ =
                         (uint)bVar24 * auVar284._40_4_ | (uint)!bVar24 * auVar283._40_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 0xb) & 1);
                    auVar308._44_4_ =
                         (uint)bVar24 * auVar284._44_4_ | (uint)!bVar24 * auVar283._44_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 0xc) & 1);
                    auVar308._48_4_ =
                         (uint)bVar24 * auVar284._48_4_ | (uint)!bVar24 * auVar283._48_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 0xd) & 1);
                    auVar308._52_4_ =
                         (uint)bVar24 * auVar284._52_4_ | (uint)!bVar24 * auVar283._52_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 0xe) & 1);
                    auVar308._56_4_ =
                         (uint)bVar24 * auVar284._56_4_ | (uint)!bVar24 * auVar283._56_4_;
                    bVar24 = SUB81(uVar161 >> 0xf,0);
                    auVar308._60_4_ =
                         (uint)bVar24 * auVar284._60_4_ | (uint)!bVar24 * auVar283._60_4_;
                    auVar283 = vminps_avx512f(auVar308,(undefined1  [64])afVar313);
                    auVar283 = vmaxps_avx512f(auVar283,(undefined1  [64])afVar314);
                    auVar284 = vfmadd213ps_avx512f((undefined1  [64])afVar315,auVar283,
                                                   (undefined1  [64])afVar321);
                    auVar285 = vrndscaleps_avx512f(auVar284,1);
                    uVar149 = vcmpps_avx512f(auVar284,auVar285,1);
                    auVar284 = vsubps_avx512f(auVar285,(undefined1  [64])afVar312);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar309._0_4_ = (uint)bVar24 * auVar284._0_4_ | (uint)!bVar24 * auVar285._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar309._4_4_ = (uint)bVar24 * auVar284._4_4_ | (uint)!bVar24 * auVar285._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar309._8_4_ = (uint)bVar24 * auVar284._8_4_ | (uint)!bVar24 * auVar285._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar309._12_4_ =
                         (uint)bVar24 * auVar284._12_4_ | (uint)!bVar24 * auVar285._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar309._16_4_ =
                         (uint)bVar24 * auVar284._16_4_ | (uint)!bVar24 * auVar285._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar309._20_4_ =
                         (uint)bVar24 * auVar284._20_4_ | (uint)!bVar24 * auVar285._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar309._24_4_ =
                         (uint)bVar24 * auVar284._24_4_ | (uint)!bVar24 * auVar285._24_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                    auVar309._28_4_ =
                         (uint)bVar24 * auVar284._28_4_ | (uint)!bVar24 * auVar285._28_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                    auVar309._32_4_ =
                         (uint)bVar24 * auVar284._32_4_ | (uint)!bVar24 * auVar285._32_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                    auVar309._36_4_ =
                         (uint)bVar24 * auVar284._36_4_ | (uint)!bVar24 * auVar285._36_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                    auVar309._40_4_ =
                         (uint)bVar24 * auVar284._40_4_ | (uint)!bVar24 * auVar285._40_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                    auVar309._44_4_ =
                         (uint)bVar24 * auVar284._44_4_ | (uint)!bVar24 * auVar285._44_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                    auVar309._48_4_ =
                         (uint)bVar24 * auVar284._48_4_ | (uint)!bVar24 * auVar285._48_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                    auVar309._52_4_ =
                         (uint)bVar24 * auVar284._52_4_ | (uint)!bVar24 * auVar285._52_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                    auVar309._56_4_ =
                         (uint)bVar24 * auVar284._56_4_ | (uint)!bVar24 * auVar285._56_4_;
                    bVar24 = SUB81(uVar149 >> 0xf,0);
                    auVar309._60_4_ =
                         (uint)bVar24 * auVar284._60_4_ | (uint)!bVar24 * auVar285._60_4_;
                    auVar283 = vfmadd231ps_avx512f(auVar283,auVar309,auVar338);
                    auVar283 = vfmadd231ps_avx512f(auVar283,auVar309,auVar339);
                    auVar284 = vmulps_avx512f(auVar283,auVar283);
                    auVar285 = vfmadd213ps_avx512f(auVar283,(undefined1  [64])afVar316,
                                                   (undefined1  [64])afVar317);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar283,(undefined1  [64])afVar318);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar283,(undefined1  [64])afVar319);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar283,(undefined1  [64])afVar320);
                    auVar285 = vfmadd213ps_avx512f(auVar285,auVar283,(undefined1  [64])afVar321);
                    in_ZMM17 = vfmadd213ps_avx512f(auVar285,auVar284,auVar283);
                    auVar283 = vaddps_avx512f(in_ZMM17,(undefined1  [64])afVar312);
                    auVar284 = vcvttps2dq_avx512f(auVar309);
                    auVar284 = vpaddd_avx512f(auVar284,auVar340);
                    auVar284 = vpslld_avx512f(auVar284,0x17);
                    auVar283 = vfmadd213ps_avx512f(auVar284,auVar283,auVar342);
                    auVar283 = vdivps_avx512f(auVar342,auVar283);
                    auVar283 = vfnmsub213ps_avx512f(auVar283,auVar280,auVar342);
                    goto LAB_002a1b3c;
                  case 6:
                    puVar1 = (uint *)(this->super_Deconvolution).activation_params.data;
                    auVar283 = vbroadcastss_avx512f(ZEXT416(*puVar1));
                    uVar2 = puVar1[1];
                    auVar131._4_4_ = uVar2;
                    auVar131._0_4_ = uVar2;
                    auVar131._8_4_ = uVar2;
                    auVar131._12_4_ = uVar2;
                    auVar131._16_4_ = uVar2;
                    auVar131._20_4_ = uVar2;
                    auVar131._24_4_ = uVar2;
                    auVar131._28_4_ = uVar2;
                    auVar131._32_4_ = uVar2;
                    auVar131._36_4_ = uVar2;
                    auVar131._40_4_ = uVar2;
                    auVar131._44_4_ = uVar2;
                    auVar131._48_4_ = uVar2;
                    auVar131._52_4_ = uVar2;
                    auVar131._56_4_ = uVar2;
                    auVar131._60_4_ = uVar2;
                    auVar283 = vfmadd213ps_avx512f(auVar283,auVar282,auVar131);
                    auVar283 = vmaxps_avx512f(auVar283,auVar281);
                    auVar283 = vminps_avx512f(auVar283,auVar342);
LAB_002a1b3c:
                    auVar282 = vmulps_avx512f(auVar283,auVar282);
                  }
                  *pauVar162 = auVar282;
                  pauVar162 = pauVar162 + 1;
                  uVar147 = uVar147 + 1;
                  iVar343 = iVar343 + 1;
                } while (uVar147 != local_248.w);
              }
              iVar166 = iVar166 + 1;
            } while (iVar166 != local_248.h);
          }
          local_308 = local_308 + 1;
          in_ZMM10 = afVar316;
        } while (local_308 != (long)local_248.c);
      }
      if (((local_d8._0_4_ == 0x10) && (uVar152 == 1)) &&
         (local_1f8 = (ulong)local_248.c, 0 < (long)local_1f8)) {
        iVar9 = (this->super_Deconvolution).dilation_w;
        iVar10 = (this->super_Deconvolution).dilation_h;
        iVar138 = (this->super_Deconvolution).stride_w;
        iVar170 = (this->super_Deconvolution).stride_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        pvVar20 = (this->super_Deconvolution).bias_data.data;
        uVar155 = (this->super_Deconvolution).kernel_w;
        uVar11 = (this->super_Deconvolution).kernel_h;
        local_1e8 = (void *)(CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) *
                            local_248.cstep);
        local_1e0 = local_248.data;
        iVar13 = bottom_blob->w;
        iVar151 = bottom_blob->h;
        uVar12 = bottom_blob->c;
        local_308 = 0;
        do {
          if (0 < iVar148) {
            sVar21 = (this->weight_data_tm).cstep;
            sVar17 = (this->weight_data_tm).elemsize;
            local_2d8 = (float *)((long)local_1e8 * local_308 + (long)local_1e0);
            pvVar154 = (this->weight_data_tm).data;
            iVar166 = 0;
            do {
              if (0 < iVar165) {
                iVar139 = bottom_blob->w;
                pvVar15 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                sVar19 = bottom_blob->cstep;
                local_1c8._0_8_ = (this->super_Deconvolution).activation_params.data;
                uVar147 = 0;
                iVar343 = (1 - uVar155) * iVar9;
                do {
                  if (pvVar20 == (void *)0x0) {
                    fVar354 = 0.0;
                  }
                  else {
                    fVar354 = *(float *)((long)pvVar20 + local_308 * 4);
                  }
                  if ((int)uVar12 < 1) {
                    auVar337 = ZEXT864(0);
                  }
                  else {
                    auVar337 = ZEXT864(0);
                    uVar149 = 0;
                    pvVar160 = (void *)(sVar21 * local_308 * sVar17 + (long)pvVar154);
                    do {
                      if (0 < (int)uVar11) {
                        uVar161 = 0;
                        uVar146 = 0;
                        do {
                          iVar140 = (((int)uVar146 - uVar11) + 1) * iVar10 + iVar166;
                          if ((((-1 < iVar140) &&
                               (iVar141 = iVar140 / iVar170, iVar140 % iVar170 == 0)) &&
                              (0 < (int)uVar155)) && (iVar141 < iVar151)) {
                            uVar153 = (ulong)uVar155;
                            uVar158 = uVar161;
                            iVar140 = iVar343;
                            do {
                              if (((-1 < iVar140) &&
                                  (iVar142 = iVar140 / iVar138, iVar140 % iVar138 == 0)) &&
                                 (iVar142 < iVar13)) {
                                auVar337 = vfmadd231ps_avx512f(auVar337,*(undefined1 (*) [64])
                                                                         ((long)pvVar15 +
                                                                         (long)(iVar142 << 4) * 4 +
                                                                         (long)iVar141 *
                                                                         (long)iVar139 * sVar18 +
                                                                         sVar19 * sVar18 * uVar149),
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar160 +
                                                                (uVar158 & 0xffffffff) * 4));
                              }
                              uVar158 = uVar158 + 0x10;
                              iVar140 = iVar140 + iVar9;
                              uVar153 = uVar153 - 1;
                            } while (uVar153 != 0);
                          }
                          uVar146 = uVar146 + 1;
                          uVar161 = uVar161 + (ulong)uVar155 * 0x10;
                        } while (uVar146 != uVar11);
                      }
                      pvVar160 = (void *)((long)pvVar160 + (long)(int)(uVar155 * uVar11 * 0x10) * 4)
                      ;
                      uVar149 = uVar149 + 1;
                    } while (uVar149 != uVar12);
                  }
                  auVar228 = vextractf64x4_avx512f(auVar337,1);
                  fVar371 = auVar337._4_4_ + auVar228._4_4_;
                  auVar175._0_4_ =
                       auVar337._0_4_ + auVar228._0_4_ + auVar337._16_4_ + auVar228._16_4_;
                  auVar175._4_4_ = fVar371 + fVar371;
                  auVar175._8_4_ =
                       auVar337._8_4_ + auVar228._8_4_ + auVar337._24_4_ + auVar228._24_4_;
                  auVar175._12_4_ =
                       auVar337._12_4_ + auVar228._12_4_ + auVar337._28_4_ + auVar228._28_4_;
                  auVar174 = vshufpd_avx(auVar175,auVar175,1);
                  auVar176._0_4_ = auVar174._0_4_ + auVar175._0_4_;
                  auVar176._4_4_ = auVar174._4_4_ + auVar175._4_4_;
                  auVar176._8_4_ = auVar174._8_4_ + auVar175._8_4_;
                  auVar176._12_4_ = auVar174._12_4_ + auVar175._12_4_;
                  auVar174 = vmovshdup_avx(auVar176);
                  fVar354 = auVar174._0_4_ + fVar354 + auVar176._0_4_;
                  auVar174 = ZEXT416((uint)fVar354);
                  fVar371 = fVar354;
                  if (iVar156 - 1U < 6) {
                    switch(iVar156) {
                    case 1:
                      auVar174 = vmaxss_avx(ZEXT416((uint)fVar354),ZEXT416(0));
                      fVar371 = auVar174._0_4_;
                      break;
                    case 2:
                      uVar42 = vcmpss_avx512f(ZEXT416((uint)fVar354),ZEXT416(0),0xe);
                      bVar24 = (bool)((byte)uVar42 & 1);
                      fVar371 = (float)((uint)bVar24 * 0x3f800000 +
                                       (uint)!bVar24 * (int)*(float *)local_1c8._0_8_) * fVar354;
                      break;
                    case 3:
                      auVar174 = vmaxss_avx(auVar174,ZEXT416((uint)*(float *)local_1c8._0_8_));
                      fVar371 = auVar174._0_4_;
                      if (*(float *)(local_1c8._0_8_ + 4) < auVar174._0_4_) {
                        fVar371 = *(float *)(local_1c8._0_8_ + 4);
                      }
                      break;
                    case 4:
                      auVar174 = vminss_avx(auVar174,SUB6416(ZEXT464(0x42b0c0a5),0));
                      auVar52._8_4_ = 0x80000000;
                      auVar52._0_8_ = 0x8000000080000000;
                      auVar52._12_4_ = 0x80000000;
                      auVar175 = vxorps_avx512vl(auVar174,auVar52);
                      uVar42 = vcmpss_avx512f(auVar174,ZEXT416(0xc2b0c0a5),1);
                      bVar24 = (bool)((byte)uVar42 & 1);
                      in_ZMM10 = (float  [16])ZEXT1664(in_ZMM10._0_16_);
                      fVar354 = expf((float)((uint)bVar24 * 0x42b0c0a5 +
                                            (uint)!bVar24 * auVar175._0_4_));
                      fVar371 = 1.0 / (fVar354 + 1.0);
                      break;
                    case 5:
                      in_ZMM10 = (float  [16])ZEXT1664(in_ZMM10._0_16_);
                      fVar371 = expf(fVar354);
                      fVar371 = logf(fVar371 + 1.0);
                      fVar371 = tanhf(fVar371);
                      fVar371 = fVar371 * fVar354;
                      break;
                    case 6:
                      fVar4 = *(float *)local_1c8._0_8_;
                      auVar51._8_4_ = 0x80000000;
                      auVar51._0_8_ = 0x8000000080000000;
                      auVar51._12_4_ = 0x80000000;
                      auVar175 = vxorps_avx512vl(ZEXT416((uint)*(float *)(local_1c8._0_8_ + 4)),
                                                 auVar51);
                      fVar378 = auVar175._0_4_ / fVar4;
                      fVar371 = 0.0;
                      if ((fVar378 <= fVar354) &&
                         (fVar371 = fVar354, fVar354 <= fVar378 + 1.0 / fVar4)) {
                        auVar174 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar174,
                                                   ZEXT416((uint)*(float *)(local_1c8._0_8_ + 4)));
                        fVar371 = auVar174._0_4_ * fVar354;
                      }
                    }
                  }
                  *local_2d8 = fVar371;
                  local_2d8 = local_2d8 + 1;
                  uVar147 = uVar147 + 1;
                  iVar343 = iVar343 + 1;
                } while (uVar147 != iVar165);
              }
              iVar166 = iVar166 + 1;
            } while (iVar166 != iVar148);
          }
          local_308 = local_308 + 1;
        } while (local_308 != local_1f8);
      }
      iVar10 = local_248.h;
      iVar9 = local_248.w;
      if (((local_d8._0_4_ == 8) && (uVar152 == 8)) && (0 < (long)local_248.c)) {
        iVar165 = (this->super_Deconvolution).dilation_w;
        iVar148 = (this->super_Deconvolution).dilation_h;
        iVar138 = (this->super_Deconvolution).stride_w;
        iVar170 = (this->super_Deconvolution).stride_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        pvVar20 = (this->super_Deconvolution).bias_data.data;
        uVar155 = (this->super_Deconvolution).kernel_w;
        uVar11 = (this->super_Deconvolution).kernel_h;
        local_308 = 0;
        auVar375._8_4_ = 0x42b0c0a5;
        auVar375._0_8_ = 0x42b0c0a542b0c0a5;
        auVar375._12_4_ = 0x42b0c0a5;
        auVar375._16_4_ = 0x42b0c0a5;
        auVar375._20_4_ = 0x42b0c0a5;
        auVar375._24_4_ = 0x42b0c0a5;
        auVar375._28_4_ = 0x42b0c0a5;
        auVar384._8_4_ = 0xc2b0c0a5;
        auVar384._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar384._12_4_ = 0xc2b0c0a5;
        auVar384._16_4_ = 0xc2b0c0a5;
        auVar384._20_4_ = 0xc2b0c0a5;
        auVar384._24_4_ = 0xc2b0c0a5;
        auVar384._28_4_ = 0xc2b0c0a5;
        auVar390._8_4_ = 0x3f000000;
        auVar390._0_8_ = 0x3f0000003f000000;
        auVar390._12_4_ = 0x3f000000;
        auVar390._16_4_ = 0x3f000000;
        auVar390._20_4_ = 0x3f000000;
        auVar390._24_4_ = 0x3f000000;
        auVar390._28_4_ = 0x3f000000;
        auVar396._8_4_ = 0x3fb8aa3b;
        auVar396._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar396._12_4_ = 0x3fb8aa3b;
        auVar396._16_4_ = 0x3fb8aa3b;
        auVar396._20_4_ = 0x3fb8aa3b;
        auVar396._24_4_ = 0x3fb8aa3b;
        auVar396._28_4_ = 0x3fb8aa3b;
        auVar402._8_4_ = 0x3f800000;
        auVar402._0_8_ = 0x3f8000003f800000;
        auVar402._12_4_ = 0x3f800000;
        auVar402._16_4_ = 0x3f800000;
        auVar402._20_4_ = 0x3f800000;
        auVar402._24_4_ = 0x3f800000;
        auVar402._28_4_ = 0x3f800000;
        auVar408._8_4_ = 0x3f318000;
        auVar408._0_8_ = 0x3f3180003f318000;
        auVar408._12_4_ = 0x3f318000;
        auVar408._16_4_ = 0x3f318000;
        auVar408._20_4_ = 0x3f318000;
        auVar408._24_4_ = 0x3f318000;
        auVar408._28_4_ = 0x3f318000;
        auVar228 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar459._8_4_ = 0x3ab743ce;
        auVar459._0_8_ = 0x3ab743ce3ab743ce;
        auVar459._12_4_ = 0x3ab743ce;
        auVar459._16_4_ = 0x3ab743ce;
        auVar459._20_4_ = 0x3ab743ce;
        auVar459._24_4_ = 0x3ab743ce;
        auVar459._28_4_ = 0x3ab743ce;
        in_ZMM10 = (float  [16])ZEXT3264(auVar459);
        auVar466._8_4_ = 0x3c088908;
        auVar466._0_8_ = 0x3c0889083c088908;
        auVar466._12_4_ = 0x3c088908;
        auVar466._16_4_ = 0x3c088908;
        auVar466._20_4_ = 0x3c088908;
        auVar466._24_4_ = 0x3c088908;
        auVar466._28_4_ = 0x3c088908;
        auVar472._8_4_ = 0x3d2aa9c1;
        auVar472._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar472._12_4_ = 0x3d2aa9c1;
        auVar472._16_4_ = 0x3d2aa9c1;
        auVar472._20_4_ = 0x3d2aa9c1;
        auVar472._24_4_ = 0x3d2aa9c1;
        auVar472._28_4_ = 0x3d2aa9c1;
        auVar478._8_4_ = 0x3e2aaaaa;
        auVar478._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar478._12_4_ = 0x3e2aaaaa;
        auVar478._16_4_ = 0x3e2aaaaa;
        auVar478._20_4_ = 0x3e2aaaaa;
        auVar478._24_4_ = 0x3e2aaaaa;
        auVar478._28_4_ = 0x3e2aaaaa;
        auVar484._8_4_ = 0x3f800000;
        auVar484._0_8_ = 0x3f8000003f800000;
        auVar484._12_4_ = 0x3f800000;
        auVar484._16_4_ = 0x3f800000;
        auVar484._20_4_ = 0x3f800000;
        auVar484._24_4_ = 0x3f800000;
        auVar484._28_4_ = 0x3f800000;
        auVar490._8_4_ = 0xb95e8083;
        auVar490._0_8_ = 0xb95e8083b95e8083;
        auVar490._12_4_ = 0xb95e8083;
        auVar490._16_4_ = 0xb95e8083;
        auVar490._20_4_ = 0xb95e8083;
        auVar490._24_4_ = 0xb95e8083;
        auVar490._28_4_ = 0xb95e8083;
        auVar229 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar250 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar251 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar252 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar253 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar254 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar255 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar256 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar257 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          local_1c8._0_4_ = local_248.h;
          if (0 < local_248.h) {
            iVar13 = bottom_blob->w;
            iVar151 = bottom_blob->h;
            pauVar163 = (undefined1 (*) [32])
                        (local_248.cstep * local_308 *
                         CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) +
                        (long)local_248.data);
            uVar12 = bottom_blob->c;
            iVar166 = 0;
            do {
              if (0 < local_248.w) {
                uVar147 = 0;
                iVar343 = (1 - uVar155) * iVar165;
                do {
                  if (pvVar20 == (void *)0x0) {
                    auVar337 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar337 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar20 + local_308 * 0x20));
                  }
                  if (0 < (int)uVar12) {
                    pvVar154 = (void *)((this->weight_data_tm).cstep * local_308 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    pvVar15 = bottom_blob->data;
                    uVar149 = 0;
                    do {
                      if (0 < (int)uVar11) {
                        uVar161 = 0;
                        uVar146 = 0;
                        do {
                          iVar139 = (((int)uVar146 - uVar11) + 1) * iVar148 + iVar166;
                          if (((-1 < iVar139) &&
                              (iVar140 = iVar139 / iVar170, iVar139 % iVar170 == 0)) &&
                             ((0 < (int)uVar155 && (iVar140 < iVar151)))) {
                            lVar167 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                                      bottom_blob->cstep * bottom_blob->elemsize * uVar149;
                            uVar153 = (ulong)uVar155;
                            uVar158 = uVar161;
                            iVar139 = iVar343;
                            do {
                              if (((-1 < iVar139) &&
                                  (iVar140 = iVar139 / iVar138, iVar139 % iVar138 == 0)) &&
                                 (iVar140 < iVar13)) {
                                lVar157 = (long)(iVar140 << 3);
                                uVar3 = *(undefined4 *)((long)pvVar15 + lVar157 * 4 + lVar167);
                                auVar424._4_4_ = uVar3;
                                auVar424._0_4_ = uVar3;
                                auVar424._8_4_ = uVar3;
                                auVar424._12_4_ = uVar3;
                                auVar424._16_4_ = uVar3;
                                auVar424._20_4_ = uVar3;
                                auVar424._24_4_ = uVar3;
                                auVar424._28_4_ = uVar3;
                                uVar3 = *(undefined4 *)((long)pvVar15 + lVar157 * 4 + lVar167 + 4);
                                auVar448._4_4_ = uVar3;
                                auVar448._0_4_ = uVar3;
                                auVar448._8_4_ = uVar3;
                                auVar448._12_4_ = uVar3;
                                auVar448._16_4_ = uVar3;
                                auVar448._20_4_ = uVar3;
                                auVar448._24_4_ = uVar3;
                                auVar448._28_4_ = uVar3;
                                auVar258 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 8)));
                                auVar259 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0xc))
                                                     );
                                in_ZMM17 = ZEXT3264(auVar259);
                                auVar260 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x10)
                                                             ));
                                auVar261 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x14)
                                                             ));
                                auVar230 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x18)
                                                             ));
                                auVar231 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x1c)
                                                             ));
                                uVar172 = uVar158 & 0xffffffff;
                                auVar174 = vfmadd231ps_fma(auVar337._0_32_,auVar424,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar154 + uVar172 * 4));
                                auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar448,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar154 + uVar172 * 4 + 0x20));
                                auVar258 = vfmadd231ps_avx512vl
                                                     (ZEXT1632(auVar174),auVar258,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x40));
                                auVar258 = vfmadd231ps_avx512vl
                                                     (auVar258,auVar259,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x60));
                                auVar258 = vfmadd231ps_avx512vl
                                                     (auVar258,auVar260,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x80));
                                auVar258 = vfmadd231ps_avx512vl
                                                     (auVar258,auVar261,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0xa0));
                                auVar258 = vfmadd231ps_avx512vl
                                                     (auVar258,auVar230,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0xc0));
                                auVar258 = vfmadd231ps_avx512vl
                                                     (auVar258,auVar231,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0xe0));
                                auVar337 = ZEXT3264(auVar258);
                              }
                              uVar158 = uVar158 + 0x40;
                              iVar139 = iVar139 + iVar165;
                              uVar153 = uVar153 - 1;
                            } while (uVar153 != 0);
                          }
                          uVar146 = uVar146 + 1;
                          uVar161 = uVar161 + (ulong)uVar155 * 0x40;
                        } while (uVar146 != uVar11);
                      }
                      pvVar154 = (void *)((long)pvVar154 + (long)(int)(uVar155 * uVar11 * 0x40) * 4)
                      ;
                      uVar149 = uVar149 + 1;
                    } while (uVar149 != uVar12);
                  }
                  auVar258 = auVar337._0_32_;
                  auVar259 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                  switch(iVar156) {
                  case 1:
                    auVar258 = vmaxps_avx(auVar258,auVar259);
                    break;
                  case 2:
                    auVar260 = vmaxps_avx(auVar258,auVar259);
                    auVar258 = vminps_avx(auVar258,auVar259);
                    uVar3 = *(this->super_Deconvolution).activation_params.data;
                    auVar105._4_4_ = uVar3;
                    auVar105._0_4_ = uVar3;
                    auVar105._8_4_ = uVar3;
                    auVar105._12_4_ = uVar3;
                    auVar105._16_4_ = uVar3;
                    auVar105._20_4_ = uVar3;
                    auVar105._24_4_ = uVar3;
                    auVar105._28_4_ = uVar3;
                    auVar258 = vfmadd132ps_avx512vl(auVar258,auVar260,auVar105);
                    break;
                  case 3:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar103._4_4_ = uVar3;
                    auVar103._0_4_ = uVar3;
                    auVar103._8_4_ = uVar3;
                    auVar103._12_4_ = uVar3;
                    auVar103._16_4_ = uVar3;
                    auVar103._20_4_ = uVar3;
                    auVar103._24_4_ = uVar3;
                    auVar103._28_4_ = uVar3;
                    auVar258 = vmaxps_avx512vl(auVar258,auVar103);
                    uVar3 = puVar16[1];
                    auVar104._4_4_ = uVar3;
                    auVar104._0_4_ = uVar3;
                    auVar104._8_4_ = uVar3;
                    auVar104._12_4_ = uVar3;
                    auVar104._16_4_ = uVar3;
                    auVar104._20_4_ = uVar3;
                    auVar104._24_4_ = uVar3;
                    auVar104._28_4_ = uVar3;
                    auVar258 = vminps_avx512vl(auVar258,auVar104);
                    break;
                  case 4:
                    auVar101._8_4_ = 0x80000000;
                    auVar101._0_8_ = 0x8000000080000000;
                    auVar101._12_4_ = 0x80000000;
                    auVar101._16_4_ = 0x80000000;
                    auVar101._20_4_ = 0x80000000;
                    auVar101._24_4_ = 0x80000000;
                    auVar101._28_4_ = 0x80000000;
                    auVar258 = vxorps_avx512vl(auVar258,auVar101);
                    auVar258 = vminps_avx(auVar258,auVar375);
                    auVar258 = vmaxps_avx(auVar258,auVar384);
                    auVar174 = vfmadd231ps_fma(auVar390,auVar258,auVar396);
                    auVar259 = vrndscaleps_avx512vl(ZEXT1632(auVar174),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar174),auVar259,1);
                    auVar260 = vsubps_avx512vl(auVar259,auVar402);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar267._0_4_ = (uint)bVar24 * auVar260._0_4_ | (uint)!bVar24 * auVar259._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar267._4_4_ = (uint)bVar24 * auVar260._4_4_ | (uint)!bVar24 * auVar259._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar267._8_4_ = (uint)bVar24 * auVar260._8_4_ | (uint)!bVar24 * auVar259._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar267._12_4_ =
                         (uint)bVar24 * auVar260._12_4_ | (uint)!bVar24 * auVar259._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar267._16_4_ =
                         (uint)bVar24 * auVar260._16_4_ | (uint)!bVar24 * auVar259._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar267._20_4_ =
                         (uint)bVar24 * auVar260._20_4_ | (uint)!bVar24 * auVar259._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar267._24_4_ =
                         (uint)bVar24 * auVar260._24_4_ | (uint)!bVar24 * auVar259._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar267._28_4_ =
                         (uint)bVar24 * auVar260._28_4_ | (uint)!bVar24 * auVar259._28_4_;
                    auVar258 = vfmsub231ps_avx512vl(auVar258,auVar267,auVar408);
                    auVar102._8_4_ = 0x395e8083;
                    auVar102._0_8_ = 0x395e8083395e8083;
                    auVar102._12_4_ = 0x395e8083;
                    auVar102._16_4_ = 0x395e8083;
                    auVar102._20_4_ = 0x395e8083;
                    auVar102._24_4_ = 0x395e8083;
                    auVar102._28_4_ = 0x395e8083;
                    auVar258 = vfmsub231ps_avx512vl(auVar258,auVar267,auVar102);
                    auVar425._0_4_ = auVar258._0_4_ * auVar258._0_4_;
                    auVar425._4_4_ = auVar258._4_4_ * auVar258._4_4_;
                    auVar425._8_4_ = auVar258._8_4_ * auVar258._8_4_;
                    auVar425._12_4_ = auVar258._12_4_ * auVar258._12_4_;
                    auVar425._16_4_ = auVar258._16_4_ * auVar258._16_4_;
                    auVar425._20_4_ = auVar258._20_4_ * auVar258._20_4_;
                    auVar425._24_4_ = auVar258._24_4_ * auVar258._24_4_;
                    auVar425._28_4_ = 0;
                    auVar174 = vfmadd213ps_fma(auVar228,auVar258,auVar459);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar258,auVar466);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar258,auVar472);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar258,auVar478);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar258,auVar390);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar425,auVar258);
                    auVar367._0_4_ = auVar174._0_4_ + 1.0;
                    auVar367._4_4_ = auVar174._4_4_ + 1.0;
                    auVar367._8_4_ = auVar174._8_4_ + 1.0;
                    auVar367._12_4_ = auVar174._12_4_ + 1.0;
                    auVar367._16_4_ = 0x3f800000;
                    auVar367._20_4_ = 0x3f800000;
                    auVar367._24_4_ = 0x3f800000;
                    auVar367._28_4_ = 0x3f800000;
                    auVar258 = vcvttps2dq_avx512vl(auVar267);
                    auVar258 = vpslld_avx2(auVar258,0x17);
                    auVar258 = vpaddd_avx2(auVar258,auVar484);
                    auVar174 = vfmadd213ps_fma(auVar258,auVar367,auVar402);
                    auVar258 = vdivps_avx(auVar402,ZEXT1632(auVar174));
                    break;
                  case 5:
                    auVar258 = vminps_avx(auVar258,auVar375);
                    auVar258 = vmaxps_avx(auVar258,auVar384);
                    auVar174 = vfmadd213ps_fma(auVar396,auVar258,auVar390);
                    auVar260 = vrndscaleps_avx512vl(ZEXT1632(auVar174),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar174),auVar260,1);
                    auVar261 = vsubps_avx512vl(auVar260,auVar402);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar262._0_4_ = (uint)bVar24 * auVar261._0_4_ | (uint)!bVar24 * auVar260._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar262._4_4_ = (uint)bVar24 * auVar261._4_4_ | (uint)!bVar24 * auVar260._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar262._8_4_ = (uint)bVar24 * auVar261._8_4_ | (uint)!bVar24 * auVar260._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar262._12_4_ =
                         (uint)bVar24 * auVar261._12_4_ | (uint)!bVar24 * auVar260._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar262._16_4_ =
                         (uint)bVar24 * auVar261._16_4_ | (uint)!bVar24 * auVar260._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar262._20_4_ =
                         (uint)bVar24 * auVar261._20_4_ | (uint)!bVar24 * auVar260._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar262._24_4_ =
                         (uint)bVar24 * auVar261._24_4_ | (uint)!bVar24 * auVar260._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar262._28_4_ =
                         (uint)bVar24 * auVar261._28_4_ | (uint)!bVar24 * auVar260._28_4_;
                    auVar258 = vfmsub231ps_avx512vl(auVar258,auVar262,auVar408);
                    auVar258 = vfnmsub231ps_avx512vl(auVar258,auVar262,auVar490);
                    auVar449._0_4_ = auVar258._0_4_ * auVar258._0_4_;
                    auVar449._4_4_ = auVar258._4_4_ * auVar258._4_4_;
                    auVar449._8_4_ = auVar258._8_4_ * auVar258._8_4_;
                    auVar449._12_4_ = auVar258._12_4_ * auVar258._12_4_;
                    auVar449._16_4_ = auVar258._16_4_ * auVar258._16_4_;
                    auVar449._20_4_ = auVar258._20_4_ * auVar258._20_4_;
                    auVar449._24_4_ = auVar258._24_4_ * auVar258._24_4_;
                    auVar449._28_4_ = 0;
                    auVar260 = vfmadd213ps_avx512vl(auVar228,auVar258,auVar459);
                    auVar260 = vfmadd213ps_avx512vl(auVar260,auVar258,auVar466);
                    auVar260 = vfmadd213ps_avx512vl(auVar260,auVar258,auVar472);
                    auVar260 = vfmadd213ps_avx512vl(auVar260,auVar258,auVar478);
                    auVar260 = vfmadd213ps_avx512vl(auVar260,auVar258,auVar390);
                    auVar258 = vfmadd213ps_avx512vl(auVar260,auVar449,auVar258);
                    auVar260 = vaddps_avx512vl(auVar258,auVar402);
                    auVar258 = vcvttps2dq_avx512vl(auVar262);
                    auVar258 = vpslld_avx2(auVar258,0x17);
                    auVar258 = vpaddd_avx2(auVar258,auVar484);
                    auVar174 = vfmadd213ps_fma(auVar258,auVar260,auVar402);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar174),auVar259,2);
                    auVar95._8_4_ = 0x800000;
                    auVar95._0_8_ = 0x80000000800000;
                    auVar95._12_4_ = 0x800000;
                    auVar95._16_4_ = 0x800000;
                    auVar95._20_4_ = 0x800000;
                    auVar95._24_4_ = 0x800000;
                    auVar95._28_4_ = 0x800000;
                    auVar258 = vmaxps_avx512vl(ZEXT1632(auVar174),auVar95);
                    auVar261 = vpsrld_avx2(auVar258,0x17);
                    auVar259 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar96._8_4_ = 0x3f000000;
                    auVar96._0_8_ = 0x3f0000003f000000;
                    auVar96._12_4_ = 0x3f000000;
                    auVar96._16_4_ = 0x3f000000;
                    auVar96._20_4_ = 0x3f000000;
                    auVar96._24_4_ = 0x3f000000;
                    auVar96._28_4_ = 0x3f000000;
                    auVar258 = vpternlogd_avx512vl(auVar258,auVar259,auVar96,0xea);
                    auVar97._8_4_ = 0x3f3504f3;
                    auVar97._0_8_ = 0x3f3504f33f3504f3;
                    auVar97._12_4_ = 0x3f3504f3;
                    auVar97._16_4_ = 0x3f3504f3;
                    auVar97._20_4_ = 0x3f3504f3;
                    auVar97._24_4_ = 0x3f3504f3;
                    auVar97._28_4_ = 0x3f3504f3;
                    uVar161 = vcmpps_avx512vl(auVar258,auVar97,1);
                    auVar259 = vaddps_avx512vl(auVar258,auVar229);
                    auVar258 = vaddps_avx512vl(auVar259,auVar258);
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar263._0_4_ = (uint)bVar24 * auVar258._0_4_ | (uint)!bVar24 * auVar259._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar263._4_4_ = (uint)bVar24 * auVar258._4_4_ | (uint)!bVar24 * auVar259._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar263._8_4_ = (uint)bVar24 * auVar258._8_4_ | (uint)!bVar24 * auVar259._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar263._12_4_ =
                         (uint)bVar24 * auVar258._12_4_ | (uint)!bVar24 * auVar259._12_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 4) & 1);
                    auVar263._16_4_ =
                         (uint)bVar24 * auVar258._16_4_ | (uint)!bVar24 * auVar259._16_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 5) & 1);
                    auVar263._20_4_ =
                         (uint)bVar24 * auVar258._20_4_ | (uint)!bVar24 * auVar259._20_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 6) & 1);
                    auVar263._24_4_ =
                         (uint)bVar24 * auVar258._24_4_ | (uint)!bVar24 * auVar259._24_4_;
                    bVar24 = SUB81(uVar161 >> 7,0);
                    auVar263._28_4_ =
                         (uint)bVar24 * auVar258._28_4_ | (uint)!bVar24 * auVar259._28_4_;
                    auVar259 = vmulps_avx512vl(auVar263,auVar263);
                    auVar98._8_4_ = 0xbdebd1b8;
                    auVar98._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar98._12_4_ = 0xbdebd1b8;
                    auVar98._16_4_ = 0xbdebd1b8;
                    auVar98._20_4_ = 0xbdebd1b8;
                    auVar98._24_4_ = 0xbdebd1b8;
                    auVar98._28_4_ = 0xbdebd1b8;
                    auVar258 = vfmadd213ps_avx512vl(auVar250,auVar263,auVar98);
                    auVar99._8_4_ = 0x3def251a;
                    auVar99._0_8_ = 0x3def251a3def251a;
                    auVar99._12_4_ = 0x3def251a;
                    auVar99._16_4_ = 0x3def251a;
                    auVar99._20_4_ = 0x3def251a;
                    auVar99._24_4_ = 0x3def251a;
                    auVar99._28_4_ = 0x3def251a;
                    auVar258 = vfmadd213ps_avx512vl(auVar258,auVar263,auVar99);
                    auVar258 = vfmadd213ps_avx512vl(auVar258,auVar263,auVar251);
                    auVar258 = vfmadd213ps_avx512vl(auVar258,auVar263,auVar252);
                    auVar258 = vfmadd213ps_avx512vl(auVar258,auVar263,auVar253);
                    auVar258 = vfmadd213ps_avx512vl(auVar258,auVar263,auVar254);
                    auVar258 = vfmadd213ps_avx512vl(auVar258,auVar263,auVar255);
                    auVar258 = vfmadd213ps_avx512vl(auVar258,auVar263,auVar256);
                    auVar260 = vmulps_avx512vl(auVar259,auVar263);
                    auVar260 = vmulps_avx512vl(auVar260,auVar258);
                    auVar100._8_4_ = 0xffffff82;
                    auVar100._0_8_ = 0xffffff82ffffff82;
                    auVar100._12_4_ = 0xffffff82;
                    auVar100._16_4_ = 0xffffff82;
                    auVar100._20_4_ = 0xffffff82;
                    auVar100._24_4_ = 0xffffff82;
                    auVar100._28_4_ = 0xffffff82;
                    auVar258 = vpaddd_avx512vl(auVar261,auVar100);
                    auVar258 = vcvtdq2ps_avx(auVar258);
                    auVar261 = vsubps_avx512vl(auVar258,auVar402);
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar264._0_4_ = (uint)bVar24 * auVar261._0_4_ | (uint)!bVar24 * auVar258._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar264._4_4_ = (uint)bVar24 * auVar261._4_4_ | (uint)!bVar24 * auVar258._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar264._8_4_ = (uint)bVar24 * auVar261._8_4_ | (uint)!bVar24 * auVar258._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar264._12_4_ =
                         (uint)bVar24 * auVar261._12_4_ | (uint)!bVar24 * auVar258._12_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 4) & 1);
                    auVar264._16_4_ =
                         (uint)bVar24 * auVar261._16_4_ | (uint)!bVar24 * auVar258._16_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 5) & 1);
                    auVar264._20_4_ =
                         (uint)bVar24 * auVar261._20_4_ | (uint)!bVar24 * auVar258._20_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 6) & 1);
                    auVar264._24_4_ =
                         (uint)bVar24 * auVar261._24_4_ | (uint)!bVar24 * auVar258._24_4_;
                    bVar24 = SUB81(uVar161 >> 7,0);
                    auVar264._28_4_ =
                         (uint)bVar24 * auVar261._28_4_ | (uint)!bVar24 * auVar258._28_4_;
                    auVar258 = vfmadd231ps_avx512vl(auVar260,auVar264,auVar490);
                    auVar258 = vfmsub231ps_avx512vl(auVar258,auVar390,auVar259);
                    auVar258 = vsubps_avx512vl(auVar258,auVar263);
                    auVar174 = vfmsub231ps_fma(auVar258,auVar408,auVar264);
                    auVar258 = vmulps_avx512vl(ZEXT1632(auVar174),auVar257);
                    auVar259 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar265._0_4_ = (uint)bVar24 * auVar259._0_4_ | (uint)!bVar24 * auVar258._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar265._4_4_ = (uint)bVar24 * auVar259._4_4_ | (uint)!bVar24 * auVar258._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar265._8_4_ = (uint)bVar24 * auVar259._8_4_ | (uint)!bVar24 * auVar258._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar265._12_4_ =
                         (uint)bVar24 * auVar259._12_4_ | (uint)!bVar24 * auVar258._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar265._16_4_ =
                         (uint)bVar24 * auVar259._16_4_ | (uint)!bVar24 * auVar258._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar265._20_4_ =
                         (uint)bVar24 * auVar259._20_4_ | (uint)!bVar24 * auVar258._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar265._24_4_ =
                         (uint)bVar24 * auVar259._24_4_ | (uint)!bVar24 * auVar258._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar265._28_4_ =
                         (uint)bVar24 * auVar259._28_4_ | (uint)!bVar24 * auVar258._28_4_;
                    auVar258 = vminps_avx(auVar265,auVar375);
                    auVar258 = vmaxps_avx(auVar258,auVar384);
                    auVar174 = vfmadd213ps_fma(auVar396,auVar258,auVar390);
                    auVar259 = vrndscaleps_avx512vl(ZEXT1632(auVar174),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar174),auVar259,1);
                    auVar260 = vsubps_avx512vl(auVar259,auVar402);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar266._0_4_ = (uint)bVar24 * auVar260._0_4_ | (uint)!bVar24 * auVar259._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar266._4_4_ = (uint)bVar24 * auVar260._4_4_ | (uint)!bVar24 * auVar259._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar266._8_4_ = (uint)bVar24 * auVar260._8_4_ | (uint)!bVar24 * auVar259._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar266._12_4_ =
                         (uint)bVar24 * auVar260._12_4_ | (uint)!bVar24 * auVar259._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar266._16_4_ =
                         (uint)bVar24 * auVar260._16_4_ | (uint)!bVar24 * auVar259._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar266._20_4_ =
                         (uint)bVar24 * auVar260._20_4_ | (uint)!bVar24 * auVar259._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar266._24_4_ =
                         (uint)bVar24 * auVar260._24_4_ | (uint)!bVar24 * auVar259._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar266._28_4_ =
                         (uint)bVar24 * auVar260._28_4_ | (uint)!bVar24 * auVar259._28_4_;
                    auVar258 = vfmsub231ps_avx512vl(auVar258,auVar266,auVar408);
                    auVar258 = vfnmsub231ps_avx512vl(auVar258,auVar266,auVar490);
                    auVar450._0_4_ = auVar258._0_4_ * auVar258._0_4_;
                    auVar450._4_4_ = auVar258._4_4_ * auVar258._4_4_;
                    auVar450._8_4_ = auVar258._8_4_ * auVar258._8_4_;
                    auVar450._12_4_ = auVar258._12_4_ * auVar258._12_4_;
                    auVar450._16_4_ = auVar258._16_4_ * auVar258._16_4_;
                    auVar450._20_4_ = auVar258._20_4_ * auVar258._20_4_;
                    auVar450._24_4_ = auVar258._24_4_ * auVar258._24_4_;
                    auVar450._28_4_ = 0;
                    auVar259 = vfmadd213ps_avx512vl(auVar228,auVar258,auVar459);
                    auVar259 = vfmadd213ps_avx512vl(auVar259,auVar258,auVar466);
                    auVar259 = vfmadd213ps_avx512vl(auVar259,auVar258,auVar472);
                    auVar259 = vfmadd213ps_avx512vl(auVar259,auVar258,auVar478);
                    auVar259 = vfmadd213ps_avx512vl(auVar259,auVar258,auVar390);
                    auVar258 = vfmadd213ps_avx512vl(auVar259,auVar450,auVar258);
                    in_ZMM17 = ZEXT3264(auVar258);
                    auVar259 = vaddps_avx512vl(auVar258,auVar402);
                    auVar258 = vcvttps2dq_avx512vl(auVar266);
                    auVar258 = vpslld_avx2(auVar258,0x17);
                    auVar258 = vpaddd_avx2(auVar258,auVar484);
                    auVar174 = vfmadd213ps_fma(auVar258,auVar259,auVar402);
                    auVar258 = vdivps_avx(auVar402,ZEXT1632(auVar174));
                    auVar258 = vfnmadd213ps_avx512vl(auVar258,auVar257,auVar229);
                    auVar227 = auVar258._0_28_;
                    goto LAB_002a2739;
                  case 6:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar426._4_4_ = uVar3;
                    auVar426._0_4_ = uVar3;
                    auVar426._8_4_ = uVar3;
                    auVar426._12_4_ = uVar3;
                    auVar426._16_4_ = uVar3;
                    auVar426._20_4_ = uVar3;
                    auVar426._24_4_ = uVar3;
                    auVar426._28_4_ = uVar3;
                    uVar3 = puVar16[1];
                    auVar94._4_4_ = uVar3;
                    auVar94._0_4_ = uVar3;
                    auVar94._8_4_ = uVar3;
                    auVar94._12_4_ = uVar3;
                    auVar94._16_4_ = uVar3;
                    auVar94._20_4_ = uVar3;
                    auVar94._24_4_ = uVar3;
                    auVar94._28_4_ = uVar3;
                    auVar258 = vfmadd213ps_avx512vl(auVar426,auVar258,auVar94);
                    auVar258 = vmaxps_avx(auVar258,auVar259);
                    auVar258 = vminps_avx(auVar258,auVar402);
                    auVar227 = auVar258._0_28_;
LAB_002a2739:
                    auVar339._0_4_ = auVar227._0_4_ * auVar337._0_4_;
                    auVar339._4_4_ = auVar227._4_4_ * auVar337._4_4_;
                    auVar339._8_4_ = auVar227._8_4_ * auVar337._8_4_;
                    auVar339._12_4_ = auVar227._12_4_ * auVar337._12_4_;
                    auVar339._16_4_ = auVar227._16_4_ * auVar337._16_4_;
                    auVar339._20_4_ = auVar227._20_4_ * auVar337._20_4_;
                    auVar339._28_36_ = auVar337._28_36_;
                    auVar339._24_4_ = auVar227._24_4_ * auVar337._24_4_;
                    auVar258 = auVar339._0_32_;
                  }
                  *pauVar163 = auVar258;
                  pauVar163 = pauVar163 + 1;
                  uVar147 = uVar147 + 1;
                  iVar343 = iVar343 + 1;
                } while (uVar147 != local_248.w);
              }
              iVar166 = iVar166 + 1;
            } while (iVar166 != local_248.h);
          }
          local_308 = local_308 + 1;
        } while (local_308 != (long)local_248.c);
      }
      if (((local_d8._0_4_ == 4) && (uVar152 == 8)) && (0 < (long)local_248.c)) {
        iVar165 = (this->super_Deconvolution).dilation_w;
        iVar148 = (this->super_Deconvolution).dilation_h;
        iVar138 = (this->super_Deconvolution).stride_w;
        iVar170 = (this->super_Deconvolution).stride_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        pvVar20 = (this->super_Deconvolution).bias_data.data;
        uVar155 = (this->super_Deconvolution).kernel_w;
        uVar11 = (this->super_Deconvolution).kernel_h;
        local_308 = 0;
        auVar376._8_4_ = 0x42b0c0a5;
        auVar376._0_8_ = 0x42b0c0a542b0c0a5;
        auVar376._12_4_ = 0x42b0c0a5;
        auVar376._16_4_ = 0x42b0c0a5;
        auVar376._20_4_ = 0x42b0c0a5;
        auVar376._24_4_ = 0x42b0c0a5;
        auVar376._28_4_ = 0x42b0c0a5;
        auVar385._8_4_ = 0xc2b0c0a5;
        auVar385._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar385._12_4_ = 0xc2b0c0a5;
        auVar385._16_4_ = 0xc2b0c0a5;
        auVar385._20_4_ = 0xc2b0c0a5;
        auVar385._24_4_ = 0xc2b0c0a5;
        auVar385._28_4_ = 0xc2b0c0a5;
        auVar391._8_4_ = 0x3f000000;
        auVar391._0_8_ = 0x3f0000003f000000;
        auVar391._12_4_ = 0x3f000000;
        auVar391._16_4_ = 0x3f000000;
        auVar391._20_4_ = 0x3f000000;
        auVar391._24_4_ = 0x3f000000;
        auVar391._28_4_ = 0x3f000000;
        auVar397._8_4_ = 0x3fb8aa3b;
        auVar397._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar397._12_4_ = 0x3fb8aa3b;
        auVar397._16_4_ = 0x3fb8aa3b;
        auVar397._20_4_ = 0x3fb8aa3b;
        auVar397._24_4_ = 0x3fb8aa3b;
        auVar397._28_4_ = 0x3fb8aa3b;
        auVar403._8_4_ = 0x3f800000;
        auVar403._0_8_ = 0x3f8000003f800000;
        auVar403._12_4_ = 0x3f800000;
        auVar403._16_4_ = 0x3f800000;
        auVar403._20_4_ = 0x3f800000;
        auVar403._24_4_ = 0x3f800000;
        auVar403._28_4_ = 0x3f800000;
        auVar409._8_4_ = 0x3f318000;
        auVar409._0_8_ = 0x3f3180003f318000;
        auVar409._12_4_ = 0x3f318000;
        auVar409._16_4_ = 0x3f318000;
        auVar409._20_4_ = 0x3f318000;
        auVar409._24_4_ = 0x3f318000;
        auVar409._28_4_ = 0x3f318000;
        auVar228 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar460._8_4_ = 0x3ab743ce;
        auVar460._0_8_ = 0x3ab743ce3ab743ce;
        auVar460._12_4_ = 0x3ab743ce;
        auVar460._16_4_ = 0x3ab743ce;
        auVar460._20_4_ = 0x3ab743ce;
        auVar460._24_4_ = 0x3ab743ce;
        auVar460._28_4_ = 0x3ab743ce;
        in_ZMM10 = (float  [16])ZEXT3264(auVar460);
        auVar467._8_4_ = 0x3c088908;
        auVar467._0_8_ = 0x3c0889083c088908;
        auVar467._12_4_ = 0x3c088908;
        auVar467._16_4_ = 0x3c088908;
        auVar467._20_4_ = 0x3c088908;
        auVar467._24_4_ = 0x3c088908;
        auVar467._28_4_ = 0x3c088908;
        auVar473._8_4_ = 0x3d2aa9c1;
        auVar473._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar473._12_4_ = 0x3d2aa9c1;
        auVar473._16_4_ = 0x3d2aa9c1;
        auVar473._20_4_ = 0x3d2aa9c1;
        auVar473._24_4_ = 0x3d2aa9c1;
        auVar473._28_4_ = 0x3d2aa9c1;
        auVar479._8_4_ = 0x3e2aaaaa;
        auVar479._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar479._12_4_ = 0x3e2aaaaa;
        auVar479._16_4_ = 0x3e2aaaaa;
        auVar479._20_4_ = 0x3e2aaaaa;
        auVar479._24_4_ = 0x3e2aaaaa;
        auVar479._28_4_ = 0x3e2aaaaa;
        auVar485._8_4_ = 0x3f800000;
        auVar485._0_8_ = 0x3f8000003f800000;
        auVar485._12_4_ = 0x3f800000;
        auVar485._16_4_ = 0x3f800000;
        auVar485._20_4_ = 0x3f800000;
        auVar485._24_4_ = 0x3f800000;
        auVar485._28_4_ = 0x3f800000;
        auVar491._8_4_ = 0xb95e8083;
        auVar491._0_8_ = 0xb95e8083b95e8083;
        auVar491._12_4_ = 0xb95e8083;
        auVar491._16_4_ = 0xb95e8083;
        auVar491._20_4_ = 0xb95e8083;
        auVar491._24_4_ = 0xb95e8083;
        auVar491._28_4_ = 0xb95e8083;
        auVar229 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar250 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar251 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar252 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar253 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar254 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar255 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar256 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar257 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar258 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar259 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar260 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          local_1c8._0_4_ = local_248.h;
          if (0 < local_248.h) {
            iVar13 = bottom_blob->w;
            iVar151 = bottom_blob->h;
            pauVar163 = (undefined1 (*) [32])
                        (local_248.cstep * local_308 *
                         CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) +
                        (long)local_248.data);
            uVar12 = bottom_blob->c;
            iVar166 = 0;
            do {
              if (0 < local_248.w) {
                uVar147 = 0;
                iVar343 = (1 - uVar155) * iVar165;
                do {
                  if (pvVar20 == (void *)0x0) {
                    auVar337 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar337 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar20 + local_308 * 0x20));
                  }
                  if (0 < (int)uVar12) {
                    pvVar154 = (void *)((this->weight_data_tm).cstep * local_308 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    pvVar15 = bottom_blob->data;
                    uVar149 = 0;
                    do {
                      if (0 < (int)uVar11) {
                        uVar161 = 0;
                        uVar146 = 0;
                        do {
                          iVar139 = (((int)uVar146 - uVar11) + 1) * iVar148 + iVar166;
                          if (((-1 < iVar139) &&
                              (iVar140 = iVar139 / iVar170, iVar139 % iVar170 == 0)) &&
                             ((0 < (int)uVar155 && (iVar140 < iVar151)))) {
                            lVar167 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                                      bottom_blob->cstep * bottom_blob->elemsize * uVar149;
                            uVar153 = (ulong)uVar155;
                            uVar158 = uVar161;
                            iVar139 = iVar343;
                            do {
                              if (((-1 < iVar139) &&
                                  (iVar140 = iVar139 / iVar138, iVar139 % iVar138 == 0)) &&
                                 (iVar140 < iVar13)) {
                                lVar157 = (long)(iVar140 << 2);
                                uVar3 = *(undefined4 *)((long)pvVar15 + lVar157 * 4 + lVar167);
                                auVar427._4_4_ = uVar3;
                                auVar427._0_4_ = uVar3;
                                auVar427._8_4_ = uVar3;
                                auVar427._12_4_ = uVar3;
                                auVar427._16_4_ = uVar3;
                                auVar427._20_4_ = uVar3;
                                auVar427._24_4_ = uVar3;
                                auVar427._28_4_ = uVar3;
                                uVar3 = *(undefined4 *)((long)pvVar15 + lVar157 * 4 + lVar167 + 4);
                                auVar451._4_4_ = uVar3;
                                auVar451._0_4_ = uVar3;
                                auVar451._8_4_ = uVar3;
                                auVar451._12_4_ = uVar3;
                                auVar451._16_4_ = uVar3;
                                auVar451._20_4_ = uVar3;
                                auVar451._24_4_ = uVar3;
                                auVar451._28_4_ = uVar3;
                                auVar261 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 8)));
                                auVar230 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0xc))
                                                     );
                                in_ZMM17 = ZEXT3264(auVar230);
                                uVar172 = uVar158 & 0xffffffff;
                                auVar174 = vfmadd231ps_fma(auVar337._0_32_,auVar427,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar154 + uVar172 * 4));
                                auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar451,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar154 + uVar172 * 4 + 0x20));
                                auVar261 = vfmadd231ps_avx512vl
                                                     (ZEXT1632(auVar174),auVar261,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x40));
                                auVar261 = vfmadd231ps_avx512vl
                                                     (auVar261,auVar230,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x60));
                                auVar337 = ZEXT3264(auVar261);
                              }
                              uVar158 = uVar158 + 0x20;
                              iVar139 = iVar139 + iVar165;
                              uVar153 = uVar153 - 1;
                            } while (uVar153 != 0);
                          }
                          uVar146 = uVar146 + 1;
                          uVar161 = uVar161 + (ulong)uVar155 * 0x20;
                        } while (uVar146 != uVar11);
                      }
                      pvVar154 = (void *)((long)pvVar154 + (long)(int)(uVar155 * uVar11 * 0x20) * 4)
                      ;
                      uVar149 = uVar149 + 1;
                    } while (uVar149 != uVar12);
                  }
                  auVar261 = auVar337._0_32_;
                  auVar230 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                  switch(iVar156) {
                  case 1:
                    auVar261 = vmaxps_avx(auVar261,auVar230);
                    break;
                  case 2:
                    auVar231 = vmaxps_avx(auVar261,auVar230);
                    auVar261 = vminps_avx(auVar261,auVar230);
                    uVar3 = *(this->super_Deconvolution).activation_params.data;
                    auVar114._4_4_ = uVar3;
                    auVar114._0_4_ = uVar3;
                    auVar114._8_4_ = uVar3;
                    auVar114._12_4_ = uVar3;
                    auVar114._16_4_ = uVar3;
                    auVar114._20_4_ = uVar3;
                    auVar114._24_4_ = uVar3;
                    auVar114._28_4_ = uVar3;
                    auVar261 = vfmadd132ps_avx512vl(auVar261,auVar231,auVar114);
                    break;
                  case 3:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar112._4_4_ = uVar3;
                    auVar112._0_4_ = uVar3;
                    auVar112._8_4_ = uVar3;
                    auVar112._12_4_ = uVar3;
                    auVar112._16_4_ = uVar3;
                    auVar112._20_4_ = uVar3;
                    auVar112._24_4_ = uVar3;
                    auVar112._28_4_ = uVar3;
                    auVar261 = vmaxps_avx512vl(auVar261,auVar112);
                    uVar3 = puVar16[1];
                    auVar113._4_4_ = uVar3;
                    auVar113._0_4_ = uVar3;
                    auVar113._8_4_ = uVar3;
                    auVar113._12_4_ = uVar3;
                    auVar113._16_4_ = uVar3;
                    auVar113._20_4_ = uVar3;
                    auVar113._24_4_ = uVar3;
                    auVar113._28_4_ = uVar3;
                    auVar261 = vminps_avx512vl(auVar261,auVar113);
                    break;
                  case 4:
                    auVar110._8_4_ = 0x80000000;
                    auVar110._0_8_ = 0x8000000080000000;
                    auVar110._12_4_ = 0x80000000;
                    auVar110._16_4_ = 0x80000000;
                    auVar110._20_4_ = 0x80000000;
                    auVar110._24_4_ = 0x80000000;
                    auVar110._28_4_ = 0x80000000;
                    auVar261 = vxorps_avx512vl(auVar261,auVar110);
                    auVar261 = vminps_avx(auVar261,auVar376);
                    auVar261 = vmaxps_avx(auVar261,auVar385);
                    auVar174 = vfmadd231ps_fma(auVar391,auVar261,auVar397);
                    auVar230 = vrndscaleps_avx512vl(ZEXT1632(auVar174),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar174),auVar230,1);
                    auVar231 = vsubps_avx512vl(auVar230,auVar403);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar273._0_4_ = (uint)bVar24 * auVar231._0_4_ | (uint)!bVar24 * auVar230._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar273._4_4_ = (uint)bVar24 * auVar231._4_4_ | (uint)!bVar24 * auVar230._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar273._8_4_ = (uint)bVar24 * auVar231._8_4_ | (uint)!bVar24 * auVar230._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar273._12_4_ =
                         (uint)bVar24 * auVar231._12_4_ | (uint)!bVar24 * auVar230._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar273._16_4_ =
                         (uint)bVar24 * auVar231._16_4_ | (uint)!bVar24 * auVar230._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar273._20_4_ =
                         (uint)bVar24 * auVar231._20_4_ | (uint)!bVar24 * auVar230._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar273._24_4_ =
                         (uint)bVar24 * auVar231._24_4_ | (uint)!bVar24 * auVar230._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar273._28_4_ =
                         (uint)bVar24 * auVar231._28_4_ | (uint)!bVar24 * auVar230._28_4_;
                    auVar261 = vfmsub231ps_avx512vl(auVar261,auVar273,auVar409);
                    auVar111._8_4_ = 0x395e8083;
                    auVar111._0_8_ = 0x395e8083395e8083;
                    auVar111._12_4_ = 0x395e8083;
                    auVar111._16_4_ = 0x395e8083;
                    auVar111._20_4_ = 0x395e8083;
                    auVar111._24_4_ = 0x395e8083;
                    auVar111._28_4_ = 0x395e8083;
                    auVar261 = vfmsub231ps_avx512vl(auVar261,auVar273,auVar111);
                    auVar428._0_4_ = auVar261._0_4_ * auVar261._0_4_;
                    auVar428._4_4_ = auVar261._4_4_ * auVar261._4_4_;
                    auVar428._8_4_ = auVar261._8_4_ * auVar261._8_4_;
                    auVar428._12_4_ = auVar261._12_4_ * auVar261._12_4_;
                    auVar428._16_4_ = auVar261._16_4_ * auVar261._16_4_;
                    auVar428._20_4_ = auVar261._20_4_ * auVar261._20_4_;
                    auVar428._24_4_ = auVar261._24_4_ * auVar261._24_4_;
                    auVar428._28_4_ = 0;
                    auVar174 = vfmadd213ps_fma(auVar228,auVar261,auVar460);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar261,auVar467);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar261,auVar473);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar261,auVar479);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar261,auVar391);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar428,auVar261);
                    auVar368._0_4_ = auVar174._0_4_ + 1.0;
                    auVar368._4_4_ = auVar174._4_4_ + 1.0;
                    auVar368._8_4_ = auVar174._8_4_ + 1.0;
                    auVar368._12_4_ = auVar174._12_4_ + 1.0;
                    auVar368._16_4_ = 0x3f800000;
                    auVar368._20_4_ = 0x3f800000;
                    auVar368._24_4_ = 0x3f800000;
                    auVar368._28_4_ = 0x3f800000;
                    auVar261 = vcvttps2dq_avx512vl(auVar273);
                    auVar261 = vpslld_avx2(auVar261,0x17);
                    auVar261 = vpaddd_avx2(auVar261,auVar485);
                    auVar174 = vfmadd213ps_fma(auVar261,auVar368,auVar403);
                    auVar261 = vdivps_avx(auVar403,ZEXT1632(auVar174));
                    break;
                  case 5:
                    auVar261 = vminps_avx(auVar261,auVar376);
                    auVar261 = vmaxps_avx(auVar261,auVar385);
                    auVar174 = vfmadd213ps_fma(auVar397,auVar261,auVar391);
                    auVar231 = vrndscaleps_avx512vl(ZEXT1632(auVar174),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar174),auVar231,1);
                    auVar232 = vsubps_avx512vl(auVar231,auVar403);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar268._0_4_ = (uint)bVar24 * auVar232._0_4_ | (uint)!bVar24 * auVar231._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar268._4_4_ = (uint)bVar24 * auVar232._4_4_ | (uint)!bVar24 * auVar231._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar268._8_4_ = (uint)bVar24 * auVar232._8_4_ | (uint)!bVar24 * auVar231._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar268._12_4_ =
                         (uint)bVar24 * auVar232._12_4_ | (uint)!bVar24 * auVar231._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar268._16_4_ =
                         (uint)bVar24 * auVar232._16_4_ | (uint)!bVar24 * auVar231._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar268._20_4_ =
                         (uint)bVar24 * auVar232._20_4_ | (uint)!bVar24 * auVar231._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar268._24_4_ =
                         (uint)bVar24 * auVar232._24_4_ | (uint)!bVar24 * auVar231._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar268._28_4_ =
                         (uint)bVar24 * auVar232._28_4_ | (uint)!bVar24 * auVar231._28_4_;
                    auVar261 = vfmsub231ps_avx512vl(auVar261,auVar268,auVar409);
                    auVar261 = vfnmsub231ps_avx512vl(auVar261,auVar268,auVar491);
                    auVar452._0_4_ = auVar261._0_4_ * auVar261._0_4_;
                    auVar452._4_4_ = auVar261._4_4_ * auVar261._4_4_;
                    auVar452._8_4_ = auVar261._8_4_ * auVar261._8_4_;
                    auVar452._12_4_ = auVar261._12_4_ * auVar261._12_4_;
                    auVar452._16_4_ = auVar261._16_4_ * auVar261._16_4_;
                    auVar452._20_4_ = auVar261._20_4_ * auVar261._20_4_;
                    auVar452._24_4_ = auVar261._24_4_ * auVar261._24_4_;
                    auVar452._28_4_ = 0;
                    auVar231 = vfmadd213ps_avx512vl(auVar228,auVar261,auVar460);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar261,auVar467);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar261,auVar473);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar261,auVar479);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar261,auVar391);
                    auVar261 = vfmadd213ps_avx512vl(auVar231,auVar452,auVar261);
                    auVar231 = vaddps_avx512vl(auVar261,auVar403);
                    auVar261 = vcvttps2dq_avx512vl(auVar268);
                    auVar261 = vpslld_avx2(auVar261,0x17);
                    auVar261 = vpaddd_avx2(auVar261,auVar485);
                    auVar174 = vfmadd213ps_fma(auVar261,auVar231,auVar403);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar174),auVar230,2);
                    auVar107._8_4_ = 0x800000;
                    auVar107._0_8_ = 0x80000000800000;
                    auVar107._12_4_ = 0x800000;
                    auVar107._16_4_ = 0x800000;
                    auVar107._20_4_ = 0x800000;
                    auVar107._24_4_ = 0x800000;
                    auVar107._28_4_ = 0x800000;
                    auVar261 = vmaxps_avx512vl(ZEXT1632(auVar174),auVar107);
                    auVar232 = vpsrld_avx2(auVar261,0x17);
                    auVar230 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar108._8_4_ = 0x3f000000;
                    auVar108._0_8_ = 0x3f0000003f000000;
                    auVar108._12_4_ = 0x3f000000;
                    auVar108._16_4_ = 0x3f000000;
                    auVar108._20_4_ = 0x3f000000;
                    auVar108._24_4_ = 0x3f000000;
                    auVar108._28_4_ = 0x3f000000;
                    auVar261 = vpternlogd_avx512vl(auVar261,auVar230,auVar108,0xea);
                    uVar161 = vcmpps_avx512vl(auVar261,auVar229,1);
                    auVar230 = vaddps_avx512vl(auVar261,auVar250);
                    auVar261 = vaddps_avx512vl(auVar230,auVar261);
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar269._0_4_ = (uint)bVar24 * auVar261._0_4_ | (uint)!bVar24 * auVar230._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar269._4_4_ = (uint)bVar24 * auVar261._4_4_ | (uint)!bVar24 * auVar230._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar269._8_4_ = (uint)bVar24 * auVar261._8_4_ | (uint)!bVar24 * auVar230._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar269._12_4_ =
                         (uint)bVar24 * auVar261._12_4_ | (uint)!bVar24 * auVar230._12_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 4) & 1);
                    auVar269._16_4_ =
                         (uint)bVar24 * auVar261._16_4_ | (uint)!bVar24 * auVar230._16_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 5) & 1);
                    auVar269._20_4_ =
                         (uint)bVar24 * auVar261._20_4_ | (uint)!bVar24 * auVar230._20_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 6) & 1);
                    auVar269._24_4_ =
                         (uint)bVar24 * auVar261._24_4_ | (uint)!bVar24 * auVar230._24_4_;
                    bVar24 = SUB81(uVar161 >> 7,0);
                    auVar269._28_4_ =
                         (uint)bVar24 * auVar261._28_4_ | (uint)!bVar24 * auVar230._28_4_;
                    auVar230 = vmulps_avx512vl(auVar269,auVar269);
                    auVar261 = vfmadd213ps_avx512vl(auVar251,auVar269,auVar252);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar269,auVar253);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar269,auVar254);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar269,auVar255);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar269,auVar256);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar269,auVar257);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar269,auVar258);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar269,auVar259);
                    auVar231 = vmulps_avx512vl(auVar230,auVar269);
                    auVar231 = vmulps_avx512vl(auVar231,auVar261);
                    auVar109._8_4_ = 0xffffff82;
                    auVar109._0_8_ = 0xffffff82ffffff82;
                    auVar109._12_4_ = 0xffffff82;
                    auVar109._16_4_ = 0xffffff82;
                    auVar109._20_4_ = 0xffffff82;
                    auVar109._24_4_ = 0xffffff82;
                    auVar109._28_4_ = 0xffffff82;
                    auVar261 = vpaddd_avx512vl(auVar232,auVar109);
                    auVar261 = vcvtdq2ps_avx(auVar261);
                    auVar232 = vsubps_avx512vl(auVar261,auVar403);
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar270._0_4_ = (uint)bVar24 * auVar232._0_4_ | (uint)!bVar24 * auVar261._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar270._4_4_ = (uint)bVar24 * auVar232._4_4_ | (uint)!bVar24 * auVar261._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar270._8_4_ = (uint)bVar24 * auVar232._8_4_ | (uint)!bVar24 * auVar261._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar270._12_4_ =
                         (uint)bVar24 * auVar232._12_4_ | (uint)!bVar24 * auVar261._12_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 4) & 1);
                    auVar270._16_4_ =
                         (uint)bVar24 * auVar232._16_4_ | (uint)!bVar24 * auVar261._16_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 5) & 1);
                    auVar270._20_4_ =
                         (uint)bVar24 * auVar232._20_4_ | (uint)!bVar24 * auVar261._20_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 6) & 1);
                    auVar270._24_4_ =
                         (uint)bVar24 * auVar232._24_4_ | (uint)!bVar24 * auVar261._24_4_;
                    bVar24 = SUB81(uVar161 >> 7,0);
                    auVar270._28_4_ =
                         (uint)bVar24 * auVar232._28_4_ | (uint)!bVar24 * auVar261._28_4_;
                    auVar261 = vfmadd231ps_avx512vl(auVar231,auVar270,auVar491);
                    auVar261 = vfmsub231ps_avx512vl(auVar261,auVar391,auVar230);
                    auVar261 = vsubps_avx512vl(auVar261,auVar269);
                    auVar174 = vfmsub231ps_fma(auVar261,auVar409,auVar270);
                    auVar261 = vmulps_avx512vl(ZEXT1632(auVar174),auVar260);
                    auVar230 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar271._0_4_ = (uint)bVar24 * auVar230._0_4_ | (uint)!bVar24 * auVar261._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar271._4_4_ = (uint)bVar24 * auVar230._4_4_ | (uint)!bVar24 * auVar261._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar271._8_4_ = (uint)bVar24 * auVar230._8_4_ | (uint)!bVar24 * auVar261._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar271._12_4_ =
                         (uint)bVar24 * auVar230._12_4_ | (uint)!bVar24 * auVar261._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar271._16_4_ =
                         (uint)bVar24 * auVar230._16_4_ | (uint)!bVar24 * auVar261._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar271._20_4_ =
                         (uint)bVar24 * auVar230._20_4_ | (uint)!bVar24 * auVar261._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar271._24_4_ =
                         (uint)bVar24 * auVar230._24_4_ | (uint)!bVar24 * auVar261._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar271._28_4_ =
                         (uint)bVar24 * auVar230._28_4_ | (uint)!bVar24 * auVar261._28_4_;
                    auVar261 = vminps_avx(auVar271,auVar376);
                    auVar261 = vmaxps_avx(auVar261,auVar385);
                    auVar174 = vfmadd213ps_fma(auVar397,auVar261,auVar391);
                    auVar230 = vrndscaleps_avx512vl(ZEXT1632(auVar174),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar174),auVar230,1);
                    auVar231 = vsubps_avx512vl(auVar230,auVar403);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar272._0_4_ = (uint)bVar24 * auVar231._0_4_ | (uint)!bVar24 * auVar230._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar272._4_4_ = (uint)bVar24 * auVar231._4_4_ | (uint)!bVar24 * auVar230._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar272._8_4_ = (uint)bVar24 * auVar231._8_4_ | (uint)!bVar24 * auVar230._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar272._12_4_ =
                         (uint)bVar24 * auVar231._12_4_ | (uint)!bVar24 * auVar230._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar272._16_4_ =
                         (uint)bVar24 * auVar231._16_4_ | (uint)!bVar24 * auVar230._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar272._20_4_ =
                         (uint)bVar24 * auVar231._20_4_ | (uint)!bVar24 * auVar230._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar272._24_4_ =
                         (uint)bVar24 * auVar231._24_4_ | (uint)!bVar24 * auVar230._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar272._28_4_ =
                         (uint)bVar24 * auVar231._28_4_ | (uint)!bVar24 * auVar230._28_4_;
                    auVar261 = vfmsub231ps_avx512vl(auVar261,auVar272,auVar409);
                    auVar261 = vfnmsub231ps_avx512vl(auVar261,auVar272,auVar491);
                    auVar453._0_4_ = auVar261._0_4_ * auVar261._0_4_;
                    auVar453._4_4_ = auVar261._4_4_ * auVar261._4_4_;
                    auVar453._8_4_ = auVar261._8_4_ * auVar261._8_4_;
                    auVar453._12_4_ = auVar261._12_4_ * auVar261._12_4_;
                    auVar453._16_4_ = auVar261._16_4_ * auVar261._16_4_;
                    auVar453._20_4_ = auVar261._20_4_ * auVar261._20_4_;
                    auVar453._24_4_ = auVar261._24_4_ * auVar261._24_4_;
                    auVar453._28_4_ = 0;
                    auVar230 = vfmadd213ps_avx512vl(auVar228,auVar261,auVar460);
                    auVar230 = vfmadd213ps_avx512vl(auVar230,auVar261,auVar467);
                    auVar230 = vfmadd213ps_avx512vl(auVar230,auVar261,auVar473);
                    auVar230 = vfmadd213ps_avx512vl(auVar230,auVar261,auVar479);
                    auVar230 = vfmadd213ps_avx512vl(auVar230,auVar261,auVar391);
                    auVar261 = vfmadd213ps_avx512vl(auVar230,auVar453,auVar261);
                    in_ZMM17 = ZEXT3264(auVar261);
                    auVar230 = vaddps_avx512vl(auVar261,auVar403);
                    auVar261 = vcvttps2dq_avx512vl(auVar272);
                    auVar261 = vpslld_avx2(auVar261,0x17);
                    auVar261 = vpaddd_avx2(auVar261,auVar485);
                    auVar174 = vfmadd213ps_fma(auVar261,auVar230,auVar403);
                    auVar261 = vdivps_avx(auVar403,ZEXT1632(auVar174));
                    auVar261 = vfnmadd213ps_avx512vl(auVar261,auVar260,auVar250);
                    auVar227 = auVar261._0_28_;
                    goto LAB_002a2e3d;
                  case 6:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar429._4_4_ = uVar3;
                    auVar429._0_4_ = uVar3;
                    auVar429._8_4_ = uVar3;
                    auVar429._12_4_ = uVar3;
                    auVar429._16_4_ = uVar3;
                    auVar429._20_4_ = uVar3;
                    auVar429._24_4_ = uVar3;
                    auVar429._28_4_ = uVar3;
                    uVar3 = puVar16[1];
                    auVar106._4_4_ = uVar3;
                    auVar106._0_4_ = uVar3;
                    auVar106._8_4_ = uVar3;
                    auVar106._12_4_ = uVar3;
                    auVar106._16_4_ = uVar3;
                    auVar106._20_4_ = uVar3;
                    auVar106._24_4_ = uVar3;
                    auVar106._28_4_ = uVar3;
                    auVar261 = vfmadd213ps_avx512vl(auVar429,auVar261,auVar106);
                    auVar261 = vmaxps_avx(auVar261,auVar230);
                    auVar261 = vminps_avx(auVar261,auVar403);
                    auVar227 = auVar261._0_28_;
LAB_002a2e3d:
                    auVar340._0_4_ = auVar227._0_4_ * auVar337._0_4_;
                    auVar340._4_4_ = auVar227._4_4_ * auVar337._4_4_;
                    auVar340._8_4_ = auVar227._8_4_ * auVar337._8_4_;
                    auVar340._12_4_ = auVar227._12_4_ * auVar337._12_4_;
                    auVar340._16_4_ = auVar227._16_4_ * auVar337._16_4_;
                    auVar340._20_4_ = auVar227._20_4_ * auVar337._20_4_;
                    auVar340._28_36_ = auVar337._28_36_;
                    auVar340._24_4_ = auVar227._24_4_ * auVar337._24_4_;
                    auVar261 = auVar340._0_32_;
                  }
                  *pauVar163 = auVar261;
                  pauVar163 = pauVar163 + 1;
                  uVar147 = uVar147 + 1;
                  iVar343 = iVar343 + 1;
                } while (uVar147 != local_248.w);
              }
              iVar166 = iVar166 + 1;
            } while (iVar166 != local_248.h);
          }
          local_308 = local_308 + 1;
        } while (local_308 != (long)local_248.c);
      }
      if (((local_d8._0_4_ == 8) && (uVar152 == 4)) && (0 < (long)local_248.c)) {
        iVar165 = (this->super_Deconvolution).dilation_w;
        iVar148 = (this->super_Deconvolution).dilation_h;
        iVar138 = (this->super_Deconvolution).stride_w;
        iVar170 = (this->super_Deconvolution).stride_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        pvVar20 = (this->super_Deconvolution).bias_data.data;
        uVar155 = (this->super_Deconvolution).kernel_w;
        uVar11 = (this->super_Deconvolution).kernel_h;
        local_308 = 0;
        auVar372._8_4_ = 0x42b0c0a5;
        auVar372._0_8_ = 0x42b0c0a542b0c0a5;
        auVar372._12_4_ = 0x42b0c0a5;
        auVar379._8_4_ = 0xc2b0c0a5;
        auVar379._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar379._12_4_ = 0xc2b0c0a5;
        auVar387._8_4_ = 0x3f000000;
        auVar387._0_8_ = 0x3f0000003f000000;
        auVar387._12_4_ = 0x3f000000;
        auVar393._8_4_ = 0x3fb8aa3b;
        auVar393._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar393._12_4_ = 0x3fb8aa3b;
        auVar399._8_4_ = 0x3f800000;
        auVar399._0_8_ = 0x3f8000003f800000;
        auVar399._12_4_ = 0x3f800000;
        auVar405._8_4_ = 0x3f318000;
        auVar405._0_8_ = 0x3f3180003f318000;
        auVar405._12_4_ = 0x3f318000;
        auVar174 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar456._8_4_ = 0x3ab743ce;
        auVar456._0_8_ = 0x3ab743ce3ab743ce;
        auVar456._12_4_ = 0x3ab743ce;
        in_ZMM10 = (float  [16])ZEXT1664(auVar456);
        auVar463._8_4_ = 0x3c088908;
        auVar463._0_8_ = 0x3c0889083c088908;
        auVar463._12_4_ = 0x3c088908;
        auVar469._8_4_ = 0x3d2aa9c1;
        auVar469._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar469._12_4_ = 0x3d2aa9c1;
        auVar475._8_4_ = 0x3e2aaaaa;
        auVar475._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar475._12_4_ = 0x3e2aaaaa;
        auVar481._8_4_ = 0x3f800000;
        auVar481._0_8_ = 0x3f8000003f800000;
        auVar481._12_4_ = 0x3f800000;
        auVar487._8_4_ = 0xb95e8083;
        auVar487._0_8_ = 0xb95e8083b95e8083;
        auVar487._12_4_ = 0xb95e8083;
        auVar175 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar176 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar197 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar198 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar199 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar200 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar201 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar202 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar203 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        do {
          local_1c8._0_4_ = local_248.h;
          if (0 < local_248.h) {
            iVar13 = bottom_blob->w;
            iVar151 = bottom_blob->h;
            pauVar164 = (undefined1 (*) [16])
                        (local_248.cstep * local_308 *
                         CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) +
                        (long)local_248.data);
            uVar12 = bottom_blob->c;
            iVar166 = 0;
            do {
              if (0 < local_248.w) {
                uVar147 = 0;
                iVar343 = (1 - uVar155) * iVar165;
                do {
                  if (pvVar20 == (void *)0x0) {
                    auVar208 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar208 = *(undefined1 (*) [16])((long)pvVar20 + local_308 * 0x10);
                  }
                  auVar337 = ZEXT1664(auVar208);
                  if (0 < (int)uVar12) {
                    pvVar154 = (void *)((this->weight_data_tm).cstep * local_308 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    pvVar15 = bottom_blob->data;
                    uVar149 = 0;
                    do {
                      if (0 < (int)uVar11) {
                        uVar161 = 0;
                        uVar146 = 0;
                        do {
                          iVar139 = (((int)uVar146 - uVar11) + 1) * iVar148 + iVar166;
                          if (((-1 < iVar139) &&
                              (iVar140 = iVar139 / iVar170, iVar139 % iVar170 == 0)) &&
                             ((0 < (int)uVar155 && (iVar140 < iVar151)))) {
                            lVar167 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                                      bottom_blob->cstep * bottom_blob->elemsize * uVar149;
                            uVar153 = (ulong)uVar155;
                            uVar158 = uVar161;
                            iVar139 = iVar343;
                            do {
                              if (((-1 < iVar139) &&
                                  (iVar140 = iVar139 / iVar138, iVar139 % iVar138 == 0)) &&
                                 (iVar140 < iVar13)) {
                                lVar157 = (long)(iVar140 << 3);
                                uVar3 = *(undefined4 *)((long)pvVar15 + lVar157 * 4 + lVar167);
                                auVar414._4_4_ = uVar3;
                                auVar414._0_4_ = uVar3;
                                auVar414._8_4_ = uVar3;
                                auVar414._12_4_ = uVar3;
                                uVar3 = *(undefined4 *)((long)pvVar15 + lVar157 * 4 + lVar167 + 4);
                                auVar436._4_4_ = uVar3;
                                auVar436._0_4_ = uVar3;
                                auVar436._8_4_ = uVar3;
                                auVar436._12_4_ = uVar3;
                                auVar204 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 8)));
                                auVar205 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0xc))
                                                     );
                                in_ZMM17 = ZEXT1664(auVar205);
                                auVar206 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x10)
                                                             ));
                                auVar207 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x14)
                                                             ));
                                auVar177 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x18)
                                                             ));
                                auVar178 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0x1c)
                                                             ));
                                uVar172 = uVar158 & 0xffffffff;
                                auVar208 = vfmadd231ps_fma(auVar337._0_16_,auVar414,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar154 + uVar172 * 4));
                                auVar208 = vfmadd231ps_fma(auVar208,auVar436,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar154 + uVar172 * 4 + 0x10));
                                auVar208 = vfmadd231ps_avx512vl
                                                     (auVar208,auVar204,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x20));
                                auVar208 = vfmadd231ps_avx512vl
                                                     (auVar208,auVar205,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x30));
                                auVar208 = vfmadd231ps_avx512vl
                                                     (auVar208,auVar206,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x40));
                                auVar208 = vfmadd231ps_avx512vl
                                                     (auVar208,auVar207,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x50));
                                auVar208 = vfmadd231ps_avx512vl
                                                     (auVar208,auVar177,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x60));
                                auVar208 = vfmadd231ps_avx512vl
                                                     (auVar208,auVar178,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x70));
                                auVar337 = ZEXT1664(auVar208);
                              }
                              uVar158 = uVar158 + 0x20;
                              iVar139 = iVar139 + iVar165;
                              uVar153 = uVar153 - 1;
                            } while (uVar153 != 0);
                          }
                          uVar146 = uVar146 + 1;
                          uVar161 = uVar161 + (ulong)uVar155 * 0x20;
                        } while (uVar146 != uVar11);
                      }
                      auVar208 = auVar337._0_16_;
                      pvVar154 = (void *)((long)pvVar154 + (long)(int)(uVar155 * uVar11 * 0x20) * 4)
                      ;
                      uVar149 = uVar149 + 1;
                    } while (uVar149 != uVar12);
                  }
                  switch(iVar156) {
                  case 1:
                    auVar208 = vmaxps_avx(auVar208,(undefined1  [16])0x0);
                    break;
                  case 2:
                    auVar204 = vmaxps_avx(auVar208,(undefined1  [16])0x0);
                    auVar208 = vminps_avx(auVar208,(undefined1  [16])0x0);
                    uVar3 = *(this->super_Deconvolution).activation_params.data;
                    auVar64._4_4_ = uVar3;
                    auVar64._0_4_ = uVar3;
                    auVar64._8_4_ = uVar3;
                    auVar64._12_4_ = uVar3;
                    auVar208 = vfmadd132ps_avx512vl(auVar208,auVar204,auVar64);
                    break;
                  case 3:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar62._4_4_ = uVar3;
                    auVar62._0_4_ = uVar3;
                    auVar62._8_4_ = uVar3;
                    auVar62._12_4_ = uVar3;
                    auVar208 = vmaxps_avx512vl(auVar208,auVar62);
                    uVar3 = puVar16[1];
                    auVar63._4_4_ = uVar3;
                    auVar63._0_4_ = uVar3;
                    auVar63._8_4_ = uVar3;
                    auVar63._12_4_ = uVar3;
                    auVar208 = vminps_avx512vl(auVar208,auVar63);
                    break;
                  case 4:
                    auVar60._8_4_ = 0x80000000;
                    auVar60._0_8_ = 0x8000000080000000;
                    auVar60._12_4_ = 0x80000000;
                    auVar208 = vxorps_avx512vl(auVar208,auVar60);
                    auVar208 = vminps_avx(auVar208,auVar372);
                    auVar208 = vmaxps_avx(auVar208,auVar379);
                    auVar204 = vfmadd231ps_fma(auVar387,auVar208,auVar393);
                    auVar205 = vcvttps2dq_avx512vl(auVar204);
                    auVar205 = vcvtdq2ps_avx512vl(auVar205);
                    uVar149 = vcmpps_avx512vl(auVar204,auVar205,1);
                    auVar204 = vsubps_avx512vl(auVar205,auVar399);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar214._0_4_ = (uint)bVar24 * auVar204._0_4_ | (uint)!bVar24 * auVar205._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar214._4_4_ = (uint)bVar24 * auVar204._4_4_ | (uint)!bVar24 * auVar205._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar214._8_4_ = (uint)bVar24 * auVar204._8_4_ | (uint)!bVar24 * auVar205._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar214._12_4_ =
                         (uint)bVar24 * auVar204._12_4_ | (uint)!bVar24 * auVar205._12_4_;
                    auVar208 = vfmsub231ps_avx512vl(auVar208,auVar214,auVar405);
                    auVar61._8_4_ = 0x395e8083;
                    auVar61._0_8_ = 0x395e8083395e8083;
                    auVar61._12_4_ = 0x395e8083;
                    auVar204 = vfmsub231ps_avx512vl(auVar208,auVar214,auVar61);
                    auVar415._0_4_ = auVar204._0_4_ * auVar204._0_4_;
                    auVar415._4_4_ = auVar204._4_4_ * auVar204._4_4_;
                    auVar415._8_4_ = auVar204._8_4_ * auVar204._8_4_;
                    auVar415._12_4_ = auVar204._12_4_ * auVar204._12_4_;
                    auVar208 = vfmadd213ps_fma(auVar174,auVar204,auVar456);
                    auVar208 = vfmadd213ps_fma(auVar208,auVar204,auVar463);
                    auVar208 = vfmadd213ps_fma(auVar208,auVar204,auVar469);
                    auVar208 = vfmadd213ps_fma(auVar208,auVar204,auVar475);
                    auVar208 = vfmadd213ps_fma(auVar208,auVar204,auVar387);
                    auVar208 = vfmadd213ps_fma(auVar208,auVar415,auVar204);
                    auVar357._0_4_ = auVar208._0_4_ + 1.0;
                    auVar357._4_4_ = auVar208._4_4_ + 1.0;
                    auVar357._8_4_ = auVar208._8_4_ + 1.0;
                    auVar357._12_4_ = auVar208._12_4_ + 1.0;
                    auVar208 = vcvttps2dq_avx512vl(auVar214);
                    auVar208 = vpslld_avx(auVar208,0x17);
                    auVar208 = vpaddd_avx(auVar208,auVar481);
                    auVar208 = vfmadd213ps_fma(auVar208,auVar357,auVar399);
                    auVar208 = vdivps_avx(auVar399,auVar208);
                    break;
                  case 5:
                    auVar204 = vminps_avx(auVar208,auVar372);
                    auVar204 = vmaxps_avx(auVar204,auVar379);
                    auVar205 = vfmadd213ps_fma(auVar393,auVar204,auVar387);
                    auVar206 = vcvttps2dq_avx512vl(auVar205);
                    auVar206 = vcvtdq2ps_avx512vl(auVar206);
                    uVar149 = vcmpps_avx512vl(auVar205,auVar206,1);
                    auVar205 = vsubps_avx512vl(auVar206,auVar399);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar209._0_4_ = (uint)bVar24 * auVar205._0_4_ | (uint)!bVar24 * auVar206._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar209._4_4_ = (uint)bVar24 * auVar205._4_4_ | (uint)!bVar24 * auVar206._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar209._8_4_ = (uint)bVar24 * auVar205._8_4_ | (uint)!bVar24 * auVar206._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar209._12_4_ =
                         (uint)bVar24 * auVar205._12_4_ | (uint)!bVar24 * auVar206._12_4_;
                    auVar204 = vfmsub231ps_avx512vl(auVar204,auVar209,auVar405);
                    auVar204 = vfnmsub231ps_avx512vl(auVar204,auVar209,auVar487);
                    auVar437._0_4_ = auVar204._0_4_ * auVar204._0_4_;
                    auVar437._4_4_ = auVar204._4_4_ * auVar204._4_4_;
                    auVar437._8_4_ = auVar204._8_4_ * auVar204._8_4_;
                    auVar437._12_4_ = auVar204._12_4_ * auVar204._12_4_;
                    auVar205 = vfmadd213ps_avx512vl(auVar174,auVar204,auVar456);
                    auVar205 = vfmadd213ps_avx512vl(auVar205,auVar204,auVar463);
                    auVar205 = vfmadd213ps_avx512vl(auVar205,auVar204,auVar469);
                    auVar205 = vfmadd213ps_avx512vl(auVar205,auVar204,auVar475);
                    auVar205 = vfmadd213ps_avx512vl(auVar205,auVar204,auVar387);
                    auVar204 = vfmadd213ps_avx512vl(auVar205,auVar437,auVar204);
                    auVar205 = vaddps_avx512vl(auVar204,auVar399);
                    auVar204 = vcvttps2dq_avx512vl(auVar209);
                    auVar204 = vpslld_avx(auVar204,0x17);
                    auVar204 = vpaddd_avx(auVar204,auVar481);
                    auVar204 = vfmadd213ps_fma(auVar204,auVar205,auVar399);
                    uVar149 = vcmpps_avx512vl(auVar204,(undefined1  [16])0x0,2);
                    auVar54._8_4_ = 0x800000;
                    auVar54._0_8_ = 0x80000000800000;
                    auVar54._12_4_ = 0x800000;
                    auVar204 = vmaxps_avx512vl(auVar204,auVar54);
                    auVar207 = vpsrld_avx(auVar204,0x17);
                    auVar205 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar55._8_4_ = 0x3f000000;
                    auVar55._0_8_ = 0x3f0000003f000000;
                    auVar55._12_4_ = 0x3f000000;
                    auVar204 = vpternlogd_avx512vl(auVar204,auVar205,auVar55,0xea);
                    auVar56._8_4_ = 0x3f3504f3;
                    auVar56._0_8_ = 0x3f3504f33f3504f3;
                    auVar56._12_4_ = 0x3f3504f3;
                    uVar161 = vcmpps_avx512vl(auVar204,auVar56,1);
                    auVar57._8_4_ = 0xbf800000;
                    auVar57._0_8_ = 0xbf800000bf800000;
                    auVar57._12_4_ = 0xbf800000;
                    auVar205 = vaddps_avx512vl(auVar204,auVar57);
                    auVar204 = vaddps_avx512vl(auVar205,auVar204);
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar210._0_4_ = (uint)bVar24 * auVar204._0_4_ | (uint)!bVar24 * auVar205._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar210._4_4_ = (uint)bVar24 * auVar204._4_4_ | (uint)!bVar24 * auVar205._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar210._8_4_ = (uint)bVar24 * auVar204._8_4_ | (uint)!bVar24 * auVar205._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar210._12_4_ =
                         (uint)bVar24 * auVar204._12_4_ | (uint)!bVar24 * auVar205._12_4_;
                    auVar205 = vmulps_avx512vl(auVar210,auVar210);
                    auVar58._8_4_ = 0xbdebd1b8;
                    auVar58._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar58._12_4_ = 0xbdebd1b8;
                    auVar204 = vfmadd213ps_avx512vl(auVar175,auVar210,auVar58);
                    auVar204 = vfmadd213ps_avx512vl(auVar204,auVar210,auVar176);
                    auVar204 = vfmadd213ps_avx512vl(auVar204,auVar210,auVar197);
                    auVar204 = vfmadd213ps_avx512vl(auVar204,auVar210,auVar198);
                    auVar204 = vfmadd213ps_avx512vl(auVar204,auVar210,auVar199);
                    auVar204 = vfmadd213ps_avx512vl(auVar204,auVar210,auVar200);
                    auVar204 = vfmadd213ps_avx512vl(auVar204,auVar210,auVar201);
                    auVar204 = vfmadd213ps_avx512vl(auVar204,auVar210,auVar202);
                    auVar206 = vmulps_avx512vl(auVar205,auVar210);
                    auVar206 = vmulps_avx512vl(auVar206,auVar204);
                    auVar59._8_4_ = 0xffffff82;
                    auVar59._0_8_ = 0xffffff82ffffff82;
                    auVar59._12_4_ = 0xffffff82;
                    auVar204 = vpaddd_avx512vl(auVar207,auVar59);
                    auVar204 = vcvtdq2ps_avx(auVar204);
                    auVar207 = vsubps_avx512vl(auVar204,auVar399);
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar211._0_4_ = (uint)bVar24 * auVar207._0_4_ | (uint)!bVar24 * auVar204._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar211._4_4_ = (uint)bVar24 * auVar207._4_4_ | (uint)!bVar24 * auVar204._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar211._8_4_ = (uint)bVar24 * auVar207._8_4_ | (uint)!bVar24 * auVar204._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar211._12_4_ =
                         (uint)bVar24 * auVar207._12_4_ | (uint)!bVar24 * auVar204._12_4_;
                    auVar204 = vfmadd231ps_avx512vl(auVar206,auVar211,auVar487);
                    auVar204 = vfmsub231ps_avx512vl(auVar204,auVar387,auVar205);
                    auVar204 = vsubps_avx512vl(auVar204,auVar210);
                    auVar204 = vfnmadd231ps_fma(auVar204,auVar405,auVar211);
                    auVar205 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar212._0_4_ =
                         (uint)bVar24 * auVar205._0_4_ |
                         (uint)!bVar24 * (int)(auVar204._0_4_ + auVar204._0_4_);
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar212._4_4_ =
                         (uint)bVar24 * auVar205._4_4_ |
                         (uint)!bVar24 * (int)(auVar204._4_4_ + auVar204._4_4_);
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar212._8_4_ =
                         (uint)bVar24 * auVar205._8_4_ |
                         (uint)!bVar24 * (int)(auVar204._8_4_ + auVar204._8_4_);
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar212._12_4_ =
                         (uint)bVar24 * auVar205._12_4_ |
                         (uint)!bVar24 * (int)(auVar204._12_4_ + auVar204._12_4_);
                    auVar204 = vminps_avx(auVar212,auVar372);
                    auVar204 = vmaxps_avx(auVar204,auVar379);
                    auVar205 = vfmadd213ps_fma(auVar393,auVar204,auVar387);
                    auVar206 = vcvttps2dq_avx512vl(auVar205);
                    auVar206 = vcvtdq2ps_avx512vl(auVar206);
                    uVar149 = vcmpps_avx512vl(auVar205,auVar206,1);
                    auVar205 = vsubps_avx512vl(auVar206,auVar399);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar213._0_4_ = (uint)bVar24 * auVar205._0_4_ | (uint)!bVar24 * auVar206._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar213._4_4_ = (uint)bVar24 * auVar205._4_4_ | (uint)!bVar24 * auVar206._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar213._8_4_ = (uint)bVar24 * auVar205._8_4_ | (uint)!bVar24 * auVar206._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar213._12_4_ =
                         (uint)bVar24 * auVar205._12_4_ | (uint)!bVar24 * auVar206._12_4_;
                    auVar204 = vfmsub231ps_avx512vl(auVar204,auVar213,auVar405);
                    auVar204 = vfnmsub231ps_avx512vl(auVar204,auVar213,auVar487);
                    auVar438._0_4_ = auVar204._0_4_ * auVar204._0_4_;
                    auVar438._4_4_ = auVar204._4_4_ * auVar204._4_4_;
                    auVar438._8_4_ = auVar204._8_4_ * auVar204._8_4_;
                    auVar438._12_4_ = auVar204._12_4_ * auVar204._12_4_;
                    auVar205 = vfmadd213ps_avx512vl(auVar174,auVar204,auVar456);
                    auVar205 = vfmadd213ps_avx512vl(auVar205,auVar204,auVar463);
                    auVar205 = vfmadd213ps_avx512vl(auVar205,auVar204,auVar469);
                    auVar205 = vfmadd213ps_avx512vl(auVar205,auVar204,auVar475);
                    auVar205 = vfmadd213ps_avx512vl(auVar205,auVar204,auVar387);
                    auVar204 = vfmadd213ps_avx512vl(auVar205,auVar438,auVar204);
                    in_ZMM17 = ZEXT1664(auVar204);
                    auVar205 = vaddps_avx512vl(auVar204,auVar399);
                    auVar204 = vcvttps2dq_avx512vl(auVar213);
                    auVar204 = vpslld_avx(auVar204,0x17);
                    auVar204 = vpaddd_avx(auVar204,auVar481);
                    auVar204 = vfmadd213ps_fma(auVar204,auVar205,auVar399);
                    auVar204 = vdivps_avx512vl(auVar203,auVar204);
                    auVar208 = vfmsub231ps_fma(auVar208,auVar208,auVar204);
                    break;
                  case 6:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar416._4_4_ = uVar3;
                    auVar416._0_4_ = uVar3;
                    auVar416._8_4_ = uVar3;
                    auVar416._12_4_ = uVar3;
                    uVar3 = puVar16[1];
                    auVar53._4_4_ = uVar3;
                    auVar53._0_4_ = uVar3;
                    auVar53._8_4_ = uVar3;
                    auVar53._12_4_ = uVar3;
                    auVar204 = vfmadd213ps_avx512vl(auVar416,auVar208,auVar53);
                    auVar204 = vmaxps_avx(auVar204,(undefined1  [16])0x0);
                    auVar204 = vminps_avx(auVar204,auVar399);
                    auVar358._0_4_ = auVar204._0_4_ * auVar208._0_4_;
                    auVar358._4_4_ = auVar204._4_4_ * auVar208._4_4_;
                    auVar358._8_4_ = auVar204._8_4_ * auVar208._8_4_;
                    auVar358._12_4_ = auVar204._12_4_ * auVar208._12_4_;
                    auVar208 = auVar358;
                  }
                  *pauVar164 = auVar208;
                  pauVar164 = pauVar164 + 1;
                  uVar147 = uVar147 + 1;
                  iVar343 = iVar343 + 1;
                } while (uVar147 != local_248.w);
              }
              iVar166 = iVar166 + 1;
            } while (iVar166 != local_248.h);
          }
          local_308 = local_308 + 1;
        } while (local_308 != (long)local_248.c);
      }
      if (((local_d8._0_4_ == 1) && (uVar152 == 8)) && (0 < (long)local_248.c)) {
        iVar165 = (this->super_Deconvolution).dilation_w;
        iVar148 = (this->super_Deconvolution).dilation_h;
        iVar138 = (this->super_Deconvolution).stride_w;
        iVar170 = (this->super_Deconvolution).stride_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        pvVar20 = (this->super_Deconvolution).bias_data.data;
        uVar155 = (this->super_Deconvolution).kernel_w;
        uVar11 = (this->super_Deconvolution).kernel_h;
        local_308 = 0;
        auVar377._8_4_ = 0x42b0c0a5;
        auVar377._0_8_ = 0x42b0c0a542b0c0a5;
        auVar377._12_4_ = 0x42b0c0a5;
        auVar377._16_4_ = 0x42b0c0a5;
        auVar377._20_4_ = 0x42b0c0a5;
        auVar377._24_4_ = 0x42b0c0a5;
        auVar377._28_4_ = 0x42b0c0a5;
        auVar386._8_4_ = 0xc2b0c0a5;
        auVar386._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar386._12_4_ = 0xc2b0c0a5;
        auVar386._16_4_ = 0xc2b0c0a5;
        auVar386._20_4_ = 0xc2b0c0a5;
        auVar386._24_4_ = 0xc2b0c0a5;
        auVar386._28_4_ = 0xc2b0c0a5;
        auVar392._8_4_ = 0x3f000000;
        auVar392._0_8_ = 0x3f0000003f000000;
        auVar392._12_4_ = 0x3f000000;
        auVar392._16_4_ = 0x3f000000;
        auVar392._20_4_ = 0x3f000000;
        auVar392._24_4_ = 0x3f000000;
        auVar392._28_4_ = 0x3f000000;
        auVar398._8_4_ = 0x3fb8aa3b;
        auVar398._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar398._12_4_ = 0x3fb8aa3b;
        auVar398._16_4_ = 0x3fb8aa3b;
        auVar398._20_4_ = 0x3fb8aa3b;
        auVar398._24_4_ = 0x3fb8aa3b;
        auVar398._28_4_ = 0x3fb8aa3b;
        auVar404._8_4_ = 0x3f800000;
        auVar404._0_8_ = 0x3f8000003f800000;
        auVar404._12_4_ = 0x3f800000;
        auVar404._16_4_ = 0x3f800000;
        auVar404._20_4_ = 0x3f800000;
        auVar404._24_4_ = 0x3f800000;
        auVar404._28_4_ = 0x3f800000;
        auVar410._8_4_ = 0x3f318000;
        auVar410._0_8_ = 0x3f3180003f318000;
        auVar410._12_4_ = 0x3f318000;
        auVar410._16_4_ = 0x3f318000;
        auVar410._20_4_ = 0x3f318000;
        auVar410._24_4_ = 0x3f318000;
        auVar410._28_4_ = 0x3f318000;
        auVar228 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar461._8_4_ = 0x3ab743ce;
        auVar461._0_8_ = 0x3ab743ce3ab743ce;
        auVar461._12_4_ = 0x3ab743ce;
        auVar461._16_4_ = 0x3ab743ce;
        auVar461._20_4_ = 0x3ab743ce;
        auVar461._24_4_ = 0x3ab743ce;
        auVar461._28_4_ = 0x3ab743ce;
        in_ZMM10 = (float  [16])ZEXT3264(auVar461);
        auVar468._8_4_ = 0x3c088908;
        auVar468._0_8_ = 0x3c0889083c088908;
        auVar468._12_4_ = 0x3c088908;
        auVar468._16_4_ = 0x3c088908;
        auVar468._20_4_ = 0x3c088908;
        auVar468._24_4_ = 0x3c088908;
        auVar468._28_4_ = 0x3c088908;
        auVar474._8_4_ = 0x3d2aa9c1;
        auVar474._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar474._12_4_ = 0x3d2aa9c1;
        auVar474._16_4_ = 0x3d2aa9c1;
        auVar474._20_4_ = 0x3d2aa9c1;
        auVar474._24_4_ = 0x3d2aa9c1;
        auVar474._28_4_ = 0x3d2aa9c1;
        auVar480._8_4_ = 0x3e2aaaaa;
        auVar480._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar480._12_4_ = 0x3e2aaaaa;
        auVar480._16_4_ = 0x3e2aaaaa;
        auVar480._20_4_ = 0x3e2aaaaa;
        auVar480._24_4_ = 0x3e2aaaaa;
        auVar480._28_4_ = 0x3e2aaaaa;
        auVar486._8_4_ = 0x3f800000;
        auVar486._0_8_ = 0x3f8000003f800000;
        auVar486._12_4_ = 0x3f800000;
        auVar486._16_4_ = 0x3f800000;
        auVar486._20_4_ = 0x3f800000;
        auVar486._24_4_ = 0x3f800000;
        auVar486._28_4_ = 0x3f800000;
        auVar492._8_4_ = 0xb95e8083;
        auVar492._0_8_ = 0xb95e8083b95e8083;
        auVar492._12_4_ = 0xb95e8083;
        auVar492._16_4_ = 0xb95e8083;
        auVar492._20_4_ = 0xb95e8083;
        auVar492._24_4_ = 0xb95e8083;
        auVar492._28_4_ = 0xb95e8083;
        auVar229 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar250 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar251 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar252 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar253 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar254 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar255 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar256 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar257 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar258 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar259 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar260 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          local_1c8._0_4_ = local_248.h;
          if (0 < local_248.h) {
            iVar13 = bottom_blob->w;
            iVar151 = bottom_blob->h;
            pauVar163 = (undefined1 (*) [32])
                        (local_248.cstep * local_308 *
                         CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) +
                        (long)local_248.data);
            uVar12 = bottom_blob->c;
            iVar166 = 0;
            do {
              if (0 < local_248.w) {
                uVar147 = 0;
                iVar343 = (1 - uVar155) * iVar165;
                do {
                  if (pvVar20 == (void *)0x0) {
                    auVar337 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar337 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar20 + local_308 * 0x20));
                  }
                  if (0 < (int)uVar12) {
                    pvVar154 = (void *)((this->weight_data_tm).cstep * local_308 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    uVar149 = 0;
                    do {
                      if (0 < (int)uVar11) {
                        uVar146 = 0;
                        uVar161 = 0;
                        do {
                          iVar139 = (((int)uVar161 - uVar11) + 1) * iVar148 + iVar166;
                          if (((-1 < iVar139) &&
                              (iVar140 = iVar139 / iVar170, iVar139 % iVar170 == 0)) &&
                             ((iVar140 < iVar151 && (0 < (int)uVar155)))) {
                            uVar153 = uVar146;
                            uVar158 = (ulong)uVar155;
                            iVar139 = iVar343;
                            do {
                              if (((-1 < iVar139) &&
                                  (iVar141 = iVar139 / iVar138, iVar139 % iVar138 == 0)) &&
                                 (iVar141 < iVar13)) {
                                uVar3 = *(undefined4 *)
                                         ((long)bottom_blob->data +
                                         (long)iVar141 * 4 +
                                         (long)iVar140 *
                                         (long)bottom_blob->w * bottom_blob->elemsize +
                                         bottom_blob->cstep * bottom_blob->elemsize * uVar149);
                                auVar430._4_4_ = uVar3;
                                auVar430._0_4_ = uVar3;
                                auVar430._8_4_ = uVar3;
                                auVar430._12_4_ = uVar3;
                                auVar430._16_4_ = uVar3;
                                auVar430._20_4_ = uVar3;
                                auVar430._24_4_ = uVar3;
                                auVar430._28_4_ = uVar3;
                                auVar174 = vfmadd231ps_fma(auVar337._0_32_,auVar430,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar154 +
                                                            (uVar153 & 0xffffffff) * 4));
                                auVar337 = ZEXT1664(auVar174);
                              }
                              uVar153 = uVar153 + 8;
                              iVar139 = iVar139 + iVar165;
                              uVar158 = uVar158 - 1;
                            } while (uVar158 != 0);
                          }
                          uVar161 = uVar161 + 1;
                          uVar146 = uVar146 + (ulong)uVar155 * 8;
                        } while (uVar161 != uVar11);
                      }
                      pvVar154 = (void *)((long)pvVar154 + (long)(int)(uVar155 * uVar11 * 8) * 4);
                      uVar149 = uVar149 + 1;
                    } while (uVar149 != uVar12);
                  }
                  auVar261 = auVar337._0_32_;
                  auVar230 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                  switch(iVar156) {
                  case 1:
                    auVar261 = vmaxps_avx(auVar261,auVar230);
                    break;
                  case 2:
                    auVar231 = vmaxps_avx(auVar261,auVar230);
                    auVar261 = vminps_avx(auVar261,auVar230);
                    uVar3 = *(this->super_Deconvolution).activation_params.data;
                    auVar123._4_4_ = uVar3;
                    auVar123._0_4_ = uVar3;
                    auVar123._8_4_ = uVar3;
                    auVar123._12_4_ = uVar3;
                    auVar123._16_4_ = uVar3;
                    auVar123._20_4_ = uVar3;
                    auVar123._24_4_ = uVar3;
                    auVar123._28_4_ = uVar3;
                    auVar261 = vfmadd132ps_avx512vl(auVar261,auVar231,auVar123);
                    break;
                  case 3:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar121._4_4_ = uVar3;
                    auVar121._0_4_ = uVar3;
                    auVar121._8_4_ = uVar3;
                    auVar121._12_4_ = uVar3;
                    auVar121._16_4_ = uVar3;
                    auVar121._20_4_ = uVar3;
                    auVar121._24_4_ = uVar3;
                    auVar121._28_4_ = uVar3;
                    auVar261 = vmaxps_avx512vl(auVar261,auVar121);
                    uVar3 = puVar16[1];
                    auVar122._4_4_ = uVar3;
                    auVar122._0_4_ = uVar3;
                    auVar122._8_4_ = uVar3;
                    auVar122._12_4_ = uVar3;
                    auVar122._16_4_ = uVar3;
                    auVar122._20_4_ = uVar3;
                    auVar122._24_4_ = uVar3;
                    auVar122._28_4_ = uVar3;
                    auVar261 = vminps_avx512vl(auVar261,auVar122);
                    break;
                  case 4:
                    auVar119._8_4_ = 0x80000000;
                    auVar119._0_8_ = 0x8000000080000000;
                    auVar119._12_4_ = 0x80000000;
                    auVar119._16_4_ = 0x80000000;
                    auVar119._20_4_ = 0x80000000;
                    auVar119._24_4_ = 0x80000000;
                    auVar119._28_4_ = 0x80000000;
                    auVar261 = vxorps_avx512vl(auVar261,auVar119);
                    auVar261 = vminps_avx(auVar261,auVar377);
                    auVar261 = vmaxps_avx(auVar261,auVar386);
                    auVar174 = vfmadd231ps_fma(auVar392,auVar261,auVar398);
                    auVar230 = vrndscaleps_avx512vl(ZEXT1632(auVar174),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar174),auVar230,1);
                    auVar231 = vsubps_avx512vl(auVar230,auVar404);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar279._0_4_ = (uint)bVar24 * auVar231._0_4_ | (uint)!bVar24 * auVar230._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar279._4_4_ = (uint)bVar24 * auVar231._4_4_ | (uint)!bVar24 * auVar230._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar279._8_4_ = (uint)bVar24 * auVar231._8_4_ | (uint)!bVar24 * auVar230._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar279._12_4_ =
                         (uint)bVar24 * auVar231._12_4_ | (uint)!bVar24 * auVar230._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar279._16_4_ =
                         (uint)bVar24 * auVar231._16_4_ | (uint)!bVar24 * auVar230._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar279._20_4_ =
                         (uint)bVar24 * auVar231._20_4_ | (uint)!bVar24 * auVar230._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar279._24_4_ =
                         (uint)bVar24 * auVar231._24_4_ | (uint)!bVar24 * auVar230._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar279._28_4_ =
                         (uint)bVar24 * auVar231._28_4_ | (uint)!bVar24 * auVar230._28_4_;
                    auVar261 = vfmsub231ps_avx512vl(auVar261,auVar279,auVar410);
                    auVar120._8_4_ = 0x395e8083;
                    auVar120._0_8_ = 0x395e8083395e8083;
                    auVar120._12_4_ = 0x395e8083;
                    auVar120._16_4_ = 0x395e8083;
                    auVar120._20_4_ = 0x395e8083;
                    auVar120._24_4_ = 0x395e8083;
                    auVar120._28_4_ = 0x395e8083;
                    auVar261 = vfmsub231ps_avx512vl(auVar261,auVar279,auVar120);
                    auVar431._0_4_ = auVar261._0_4_ * auVar261._0_4_;
                    auVar431._4_4_ = auVar261._4_4_ * auVar261._4_4_;
                    auVar431._8_4_ = auVar261._8_4_ * auVar261._8_4_;
                    auVar431._12_4_ = auVar261._12_4_ * auVar261._12_4_;
                    auVar431._16_4_ = auVar261._16_4_ * auVar261._16_4_;
                    auVar431._20_4_ = auVar261._20_4_ * auVar261._20_4_;
                    auVar431._24_4_ = auVar261._24_4_ * auVar261._24_4_;
                    auVar431._28_4_ = 0;
                    auVar174 = vfmadd213ps_fma(auVar228,auVar261,auVar461);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar261,auVar468);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar261,auVar474);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar261,auVar480);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar261,auVar392);
                    auVar174 = vfmadd213ps_fma(ZEXT1632(auVar174),auVar431,auVar261);
                    auVar369._0_4_ = auVar174._0_4_ + 1.0;
                    auVar369._4_4_ = auVar174._4_4_ + 1.0;
                    auVar369._8_4_ = auVar174._8_4_ + 1.0;
                    auVar369._12_4_ = auVar174._12_4_ + 1.0;
                    auVar369._16_4_ = 0x3f800000;
                    auVar369._20_4_ = 0x3f800000;
                    auVar369._24_4_ = 0x3f800000;
                    auVar369._28_4_ = 0x3f800000;
                    auVar261 = vcvttps2dq_avx512vl(auVar279);
                    auVar261 = vpslld_avx2(auVar261,0x17);
                    auVar261 = vpaddd_avx2(auVar261,auVar486);
                    auVar174 = vfmadd213ps_fma(auVar261,auVar369,auVar404);
                    auVar261 = vdivps_avx(auVar404,ZEXT1632(auVar174));
                    break;
                  case 5:
                    auVar261 = vminps_avx(auVar261,auVar377);
                    auVar261 = vmaxps_avx(auVar261,auVar386);
                    auVar174 = vfmadd213ps_fma(auVar398,auVar261,auVar392);
                    auVar231 = vrndscaleps_avx512vl(ZEXT1632(auVar174),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar174),auVar231,1);
                    auVar232 = vsubps_avx512vl(auVar231,auVar404);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar274._0_4_ = (uint)bVar24 * auVar232._0_4_ | (uint)!bVar24 * auVar231._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar274._4_4_ = (uint)bVar24 * auVar232._4_4_ | (uint)!bVar24 * auVar231._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar274._8_4_ = (uint)bVar24 * auVar232._8_4_ | (uint)!bVar24 * auVar231._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar274._12_4_ =
                         (uint)bVar24 * auVar232._12_4_ | (uint)!bVar24 * auVar231._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar274._16_4_ =
                         (uint)bVar24 * auVar232._16_4_ | (uint)!bVar24 * auVar231._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar274._20_4_ =
                         (uint)bVar24 * auVar232._20_4_ | (uint)!bVar24 * auVar231._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar274._24_4_ =
                         (uint)bVar24 * auVar232._24_4_ | (uint)!bVar24 * auVar231._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar274._28_4_ =
                         (uint)bVar24 * auVar232._28_4_ | (uint)!bVar24 * auVar231._28_4_;
                    auVar261 = vfmsub231ps_avx512vl(auVar261,auVar274,auVar410);
                    auVar261 = vfnmsub231ps_avx512vl(auVar261,auVar274,auVar492);
                    auVar454._0_4_ = auVar261._0_4_ * auVar261._0_4_;
                    auVar454._4_4_ = auVar261._4_4_ * auVar261._4_4_;
                    auVar454._8_4_ = auVar261._8_4_ * auVar261._8_4_;
                    auVar454._12_4_ = auVar261._12_4_ * auVar261._12_4_;
                    auVar454._16_4_ = auVar261._16_4_ * auVar261._16_4_;
                    auVar454._20_4_ = auVar261._20_4_ * auVar261._20_4_;
                    auVar454._24_4_ = auVar261._24_4_ * auVar261._24_4_;
                    auVar454._28_4_ = 0;
                    auVar231 = vfmadd213ps_avx512vl(auVar228,auVar261,auVar461);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar261,auVar468);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar261,auVar474);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar261,auVar480);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar261,auVar392);
                    auVar261 = vfmadd213ps_avx512vl(auVar231,auVar454,auVar261);
                    auVar231 = vaddps_avx512vl(auVar261,auVar404);
                    auVar261 = vcvttps2dq_avx512vl(auVar274);
                    auVar261 = vpslld_avx2(auVar261,0x17);
                    auVar261 = vpaddd_avx2(auVar261,auVar486);
                    auVar174 = vfmadd213ps_fma(auVar261,auVar231,auVar404);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar174),auVar230,2);
                    auVar116._8_4_ = 0x800000;
                    auVar116._0_8_ = 0x80000000800000;
                    auVar116._12_4_ = 0x800000;
                    auVar116._16_4_ = 0x800000;
                    auVar116._20_4_ = 0x800000;
                    auVar116._24_4_ = 0x800000;
                    auVar116._28_4_ = 0x800000;
                    auVar261 = vmaxps_avx512vl(ZEXT1632(auVar174),auVar116);
                    auVar232 = vpsrld_avx2(auVar261,0x17);
                    auVar230 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar117._8_4_ = 0x3f000000;
                    auVar117._0_8_ = 0x3f0000003f000000;
                    auVar117._12_4_ = 0x3f000000;
                    auVar117._16_4_ = 0x3f000000;
                    auVar117._20_4_ = 0x3f000000;
                    auVar117._24_4_ = 0x3f000000;
                    auVar117._28_4_ = 0x3f000000;
                    auVar261 = vpternlogd_avx512vl(auVar261,auVar230,auVar117,0xea);
                    uVar161 = vcmpps_avx512vl(auVar261,auVar229,1);
                    auVar230 = vaddps_avx512vl(auVar261,auVar250);
                    auVar261 = vaddps_avx512vl(auVar230,auVar261);
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar275._0_4_ = (uint)bVar24 * auVar261._0_4_ | (uint)!bVar24 * auVar230._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar275._4_4_ = (uint)bVar24 * auVar261._4_4_ | (uint)!bVar24 * auVar230._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar275._8_4_ = (uint)bVar24 * auVar261._8_4_ | (uint)!bVar24 * auVar230._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar275._12_4_ =
                         (uint)bVar24 * auVar261._12_4_ | (uint)!bVar24 * auVar230._12_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 4) & 1);
                    auVar275._16_4_ =
                         (uint)bVar24 * auVar261._16_4_ | (uint)!bVar24 * auVar230._16_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 5) & 1);
                    auVar275._20_4_ =
                         (uint)bVar24 * auVar261._20_4_ | (uint)!bVar24 * auVar230._20_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 6) & 1);
                    auVar275._24_4_ =
                         (uint)bVar24 * auVar261._24_4_ | (uint)!bVar24 * auVar230._24_4_;
                    bVar24 = SUB81(uVar161 >> 7,0);
                    auVar275._28_4_ =
                         (uint)bVar24 * auVar261._28_4_ | (uint)!bVar24 * auVar230._28_4_;
                    auVar230 = vmulps_avx512vl(auVar275,auVar275);
                    auVar261 = vfmadd213ps_avx512vl(auVar251,auVar275,auVar252);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar275,auVar253);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar275,auVar254);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar275,auVar255);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar275,auVar256);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar275,auVar257);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar275,auVar258);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar275,auVar259);
                    auVar231 = vmulps_avx512vl(auVar230,auVar275);
                    auVar231 = vmulps_avx512vl(auVar231,auVar261);
                    auVar118._8_4_ = 0xffffff82;
                    auVar118._0_8_ = 0xffffff82ffffff82;
                    auVar118._12_4_ = 0xffffff82;
                    auVar118._16_4_ = 0xffffff82;
                    auVar118._20_4_ = 0xffffff82;
                    auVar118._24_4_ = 0xffffff82;
                    auVar118._28_4_ = 0xffffff82;
                    auVar261 = vpaddd_avx512vl(auVar232,auVar118);
                    auVar261 = vcvtdq2ps_avx(auVar261);
                    auVar232 = vsubps_avx512vl(auVar261,auVar404);
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar276._0_4_ = (uint)bVar24 * auVar232._0_4_ | (uint)!bVar24 * auVar261._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar276._4_4_ = (uint)bVar24 * auVar232._4_4_ | (uint)!bVar24 * auVar261._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar276._8_4_ = (uint)bVar24 * auVar232._8_4_ | (uint)!bVar24 * auVar261._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar276._12_4_ =
                         (uint)bVar24 * auVar232._12_4_ | (uint)!bVar24 * auVar261._12_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 4) & 1);
                    auVar276._16_4_ =
                         (uint)bVar24 * auVar232._16_4_ | (uint)!bVar24 * auVar261._16_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 5) & 1);
                    auVar276._20_4_ =
                         (uint)bVar24 * auVar232._20_4_ | (uint)!bVar24 * auVar261._20_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 6) & 1);
                    auVar276._24_4_ =
                         (uint)bVar24 * auVar232._24_4_ | (uint)!bVar24 * auVar261._24_4_;
                    bVar24 = SUB81(uVar161 >> 7,0);
                    auVar276._28_4_ =
                         (uint)bVar24 * auVar232._28_4_ | (uint)!bVar24 * auVar261._28_4_;
                    auVar261 = vfmadd231ps_avx512vl(auVar231,auVar276,auVar492);
                    auVar261 = vfmsub231ps_avx512vl(auVar261,auVar392,auVar230);
                    auVar261 = vsubps_avx512vl(auVar261,auVar275);
                    auVar174 = vfmsub231ps_fma(auVar261,auVar410,auVar276);
                    auVar261 = vmulps_avx512vl(ZEXT1632(auVar174),auVar260);
                    auVar230 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar277._0_4_ = (uint)bVar24 * auVar230._0_4_ | (uint)!bVar24 * auVar261._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar277._4_4_ = (uint)bVar24 * auVar230._4_4_ | (uint)!bVar24 * auVar261._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar277._8_4_ = (uint)bVar24 * auVar230._8_4_ | (uint)!bVar24 * auVar261._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar277._12_4_ =
                         (uint)bVar24 * auVar230._12_4_ | (uint)!bVar24 * auVar261._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar277._16_4_ =
                         (uint)bVar24 * auVar230._16_4_ | (uint)!bVar24 * auVar261._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar277._20_4_ =
                         (uint)bVar24 * auVar230._20_4_ | (uint)!bVar24 * auVar261._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar277._24_4_ =
                         (uint)bVar24 * auVar230._24_4_ | (uint)!bVar24 * auVar261._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar277._28_4_ =
                         (uint)bVar24 * auVar230._28_4_ | (uint)!bVar24 * auVar261._28_4_;
                    auVar261 = vminps_avx(auVar277,auVar377);
                    auVar261 = vmaxps_avx(auVar261,auVar386);
                    auVar174 = vfmadd213ps_fma(auVar398,auVar261,auVar392);
                    auVar230 = vrndscaleps_avx512vl(ZEXT1632(auVar174),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar174),auVar230,1);
                    auVar231 = vsubps_avx512vl(auVar230,auVar404);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar278._0_4_ = (uint)bVar24 * auVar231._0_4_ | (uint)!bVar24 * auVar230._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar278._4_4_ = (uint)bVar24 * auVar231._4_4_ | (uint)!bVar24 * auVar230._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar278._8_4_ = (uint)bVar24 * auVar231._8_4_ | (uint)!bVar24 * auVar230._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar278._12_4_ =
                         (uint)bVar24 * auVar231._12_4_ | (uint)!bVar24 * auVar230._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar278._16_4_ =
                         (uint)bVar24 * auVar231._16_4_ | (uint)!bVar24 * auVar230._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar278._20_4_ =
                         (uint)bVar24 * auVar231._20_4_ | (uint)!bVar24 * auVar230._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar278._24_4_ =
                         (uint)bVar24 * auVar231._24_4_ | (uint)!bVar24 * auVar230._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar278._28_4_ =
                         (uint)bVar24 * auVar231._28_4_ | (uint)!bVar24 * auVar230._28_4_;
                    auVar261 = vfmsub231ps_avx512vl(auVar261,auVar278,auVar410);
                    auVar261 = vfnmsub231ps_avx512vl(auVar261,auVar278,auVar492);
                    auVar455._0_4_ = auVar261._0_4_ * auVar261._0_4_;
                    auVar455._4_4_ = auVar261._4_4_ * auVar261._4_4_;
                    auVar455._8_4_ = auVar261._8_4_ * auVar261._8_4_;
                    auVar455._12_4_ = auVar261._12_4_ * auVar261._12_4_;
                    auVar455._16_4_ = auVar261._16_4_ * auVar261._16_4_;
                    auVar455._20_4_ = auVar261._20_4_ * auVar261._20_4_;
                    auVar455._24_4_ = auVar261._24_4_ * auVar261._24_4_;
                    auVar455._28_4_ = 0;
                    auVar230 = vfmadd213ps_avx512vl(auVar228,auVar261,auVar461);
                    auVar230 = vfmadd213ps_avx512vl(auVar230,auVar261,auVar468);
                    auVar230 = vfmadd213ps_avx512vl(auVar230,auVar261,auVar474);
                    auVar230 = vfmadd213ps_avx512vl(auVar230,auVar261,auVar480);
                    auVar230 = vfmadd213ps_avx512vl(auVar230,auVar261,auVar392);
                    auVar261 = vfmadd213ps_avx512vl(auVar230,auVar455,auVar261);
                    in_ZMM17 = ZEXT3264(auVar261);
                    auVar230 = vaddps_avx512vl(auVar261,auVar404);
                    auVar261 = vcvttps2dq_avx512vl(auVar278);
                    auVar261 = vpslld_avx2(auVar261,0x17);
                    auVar261 = vpaddd_avx2(auVar261,auVar486);
                    auVar174 = vfmadd213ps_fma(auVar261,auVar230,auVar404);
                    auVar261 = vdivps_avx(auVar404,ZEXT1632(auVar174));
                    auVar261 = vfnmadd213ps_avx512vl(auVar261,auVar260,auVar250);
                    auVar227 = auVar261._0_28_;
                    goto LAB_002a3c57;
                  case 6:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar432._4_4_ = uVar3;
                    auVar432._0_4_ = uVar3;
                    auVar432._8_4_ = uVar3;
                    auVar432._12_4_ = uVar3;
                    auVar432._16_4_ = uVar3;
                    auVar432._20_4_ = uVar3;
                    auVar432._24_4_ = uVar3;
                    auVar432._28_4_ = uVar3;
                    uVar3 = puVar16[1];
                    auVar115._4_4_ = uVar3;
                    auVar115._0_4_ = uVar3;
                    auVar115._8_4_ = uVar3;
                    auVar115._12_4_ = uVar3;
                    auVar115._16_4_ = uVar3;
                    auVar115._20_4_ = uVar3;
                    auVar115._24_4_ = uVar3;
                    auVar115._28_4_ = uVar3;
                    auVar261 = vfmadd213ps_avx512vl(auVar432,auVar261,auVar115);
                    auVar261 = vmaxps_avx(auVar261,auVar230);
                    auVar261 = vminps_avx(auVar261,auVar404);
                    auVar227 = auVar261._0_28_;
LAB_002a3c57:
                    auVar370._0_4_ = auVar227._0_4_ * auVar337._0_4_;
                    auVar370._4_4_ = auVar227._4_4_ * auVar337._4_4_;
                    auVar370._8_4_ = auVar227._8_4_ * auVar337._8_4_;
                    auVar370._12_4_ = auVar227._12_4_ * auVar337._12_4_;
                    auVar370._16_4_ = auVar227._16_4_ * auVar337._16_4_;
                    auVar370._20_4_ = auVar227._20_4_ * auVar337._20_4_;
                    auVar370._28_36_ = auVar337._28_36_;
                    auVar370._24_4_ = auVar227._24_4_ * auVar337._24_4_;
                    auVar261 = auVar370._0_32_;
                  }
                  *pauVar163 = auVar261;
                  pauVar163 = pauVar163 + 1;
                  uVar147 = uVar147 + 1;
                  iVar343 = iVar343 + 1;
                } while (uVar147 != local_248.w);
              }
              iVar166 = iVar166 + 1;
            } while (iVar166 != local_248.h);
          }
          local_308 = local_308 + 1;
        } while (local_308 != (long)local_248.c);
      }
      if (((local_d8._0_4_ == 8) && (uVar152 == 1)) &&
         (local_1f8 = (ulong)local_248.c, 0 < (long)local_1f8)) {
        iVar165 = (this->super_Deconvolution).dilation_w;
        iVar148 = (this->super_Deconvolution).dilation_h;
        iVar138 = (this->super_Deconvolution).stride_w;
        iVar170 = (this->super_Deconvolution).stride_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        pvVar20 = (this->super_Deconvolution).bias_data.data;
        uVar155 = (this->super_Deconvolution).kernel_w;
        uVar11 = (this->super_Deconvolution).kernel_h;
        local_1e8 = local_248.data;
        local_1e0 = (void *)(CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) *
                            local_248.cstep);
        iVar13 = bottom_blob->w;
        iVar151 = bottom_blob->h;
        uVar12 = bottom_blob->c;
        local_308 = 0;
        do {
          if (0 < iVar10) {
            sVar21 = (this->weight_data_tm).cstep;
            sVar17 = (this->weight_data_tm).elemsize;
            local_2d8 = (float *)((long)local_1e0 * local_308 + (long)local_1e8);
            pvVar154 = (this->weight_data_tm).data;
            iVar166 = 0;
            do {
              if (0 < iVar9) {
                iVar139 = bottom_blob->w;
                pvVar15 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                sVar19 = bottom_blob->cstep;
                local_1c8._0_8_ = (this->super_Deconvolution).activation_params.data;
                uVar147 = 0;
                iVar343 = (1 - uVar155) * iVar165;
                do {
                  if (pvVar20 == (void *)0x0) {
                    fVar354 = 0.0;
                  }
                  else {
                    fVar354 = *(float *)((long)pvVar20 + local_308 * 4);
                  }
                  if ((int)uVar12 < 1) {
                    auVar228 = SUB6432(ZEXT864(0),0);
                  }
                  else {
                    auVar337 = ZEXT864(0);
                    uVar149 = 0;
                    pvVar160 = (void *)(sVar21 * local_308 * sVar17 + (long)pvVar154);
                    do {
                      if (0 < (int)uVar11) {
                        uVar161 = 0;
                        uVar146 = 0;
                        do {
                          iVar140 = (((int)uVar146 - uVar11) + 1) * iVar148 + iVar166;
                          if (((-1 < iVar140) &&
                              (iVar141 = iVar140 / iVar170, iVar140 % iVar170 == 0)) &&
                             ((0 < (int)uVar155 && (iVar141 < iVar151)))) {
                            uVar153 = (ulong)uVar155;
                            uVar158 = uVar161;
                            iVar140 = iVar343;
                            do {
                              if (((-1 < iVar140) &&
                                  (iVar142 = iVar140 / iVar138, iVar140 % iVar138 == 0)) &&
                                 (iVar142 < iVar13)) {
                                auVar174 = vfmadd231ps_fma(auVar337._0_32_,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar15 +
                                                            (long)(iVar142 << 3) * 4 +
                                                            (long)iVar141 * (long)iVar139 * sVar18 +
                                                            sVar19 * sVar18 * uVar149),
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar160 +
                                                            (uVar158 & 0xffffffff) * 4));
                                auVar337 = ZEXT1664(auVar174);
                              }
                              uVar158 = uVar158 + 8;
                              iVar140 = iVar140 + iVar165;
                              uVar153 = uVar153 - 1;
                            } while (uVar153 != 0);
                          }
                          uVar146 = uVar146 + 1;
                          uVar161 = uVar161 + (ulong)uVar155 * 8;
                        } while (uVar146 != uVar11);
                      }
                      auVar228 = auVar337._0_32_;
                      pvVar160 = (void *)((long)pvVar160 + (long)(int)(uVar155 * uVar11 * 8) * 4);
                      uVar149 = uVar149 + 1;
                    } while (uVar149 != uVar12);
                  }
                  auVar359._0_4_ = auVar228._16_4_ + auVar228._0_4_;
                  auVar359._4_4_ = auVar228._20_4_ + auVar228._4_4_;
                  auVar359._8_4_ = auVar228._24_4_ + auVar228._8_4_;
                  auVar359._12_4_ = auVar228._28_4_ + auVar228._12_4_;
                  auVar174 = vshufpd_avx(auVar359,auVar359,1);
                  auVar360._0_4_ = auVar174._0_4_ + auVar359._0_4_;
                  auVar360._4_4_ = auVar174._4_4_ + auVar359._4_4_;
                  auVar360._8_4_ = auVar174._8_4_ + auVar359._8_4_;
                  auVar360._12_4_ = auVar174._12_4_ + auVar359._12_4_;
                  auVar174 = vmovshdup_avx(auVar360);
                  fVar354 = auVar174._0_4_ + fVar354 + auVar360._0_4_;
                  auVar174 = ZEXT416((uint)fVar354);
                  fVar371 = fVar354;
                  if (iVar156 - 1U < 6) {
                    switch(iVar156) {
                    case 1:
                      auVar174 = vmaxss_avx(ZEXT416((uint)fVar354),ZEXT416(0));
                      fVar371 = auVar174._0_4_;
                      break;
                    case 2:
                      uVar42 = vcmpss_avx512f(ZEXT416((uint)fVar354),ZEXT416(0),0xe);
                      bVar24 = (bool)((byte)uVar42 & 1);
                      fVar371 = (float)((uint)bVar24 * 0x3f800000 +
                                       (uint)!bVar24 * (int)*(float *)local_1c8._0_8_) * fVar354;
                      break;
                    case 3:
                      auVar174 = vmaxss_avx(auVar174,ZEXT416((uint)*(float *)local_1c8._0_8_));
                      fVar371 = auVar174._0_4_;
                      if (*(float *)(local_1c8._0_8_ + 4) < auVar174._0_4_) {
                        fVar371 = *(float *)(local_1c8._0_8_ + 4);
                      }
                      break;
                    case 4:
                      auVar174 = vminss_avx(auVar174,SUB6416(ZEXT464(0x42b0c0a5),0));
                      auVar66._8_4_ = 0x80000000;
                      auVar66._0_8_ = 0x8000000080000000;
                      auVar66._12_4_ = 0x80000000;
                      auVar175 = vxorps_avx512vl(auVar174,auVar66);
                      uVar42 = vcmpss_avx512f(auVar174,ZEXT416(0xc2b0c0a5),1);
                      bVar24 = (bool)((byte)uVar42 & 1);
                      in_ZMM10 = (float  [16])ZEXT1664(in_ZMM10._0_16_);
                      fVar354 = expf((float)((uint)bVar24 * 0x42b0c0a5 +
                                            (uint)!bVar24 * auVar175._0_4_));
                      fVar371 = 1.0 / (fVar354 + 1.0);
                      break;
                    case 5:
                      in_ZMM10 = (float  [16])ZEXT1664(in_ZMM10._0_16_);
                      fVar371 = expf(fVar354);
                      fVar371 = logf(fVar371 + 1.0);
                      fVar371 = tanhf(fVar371);
                      fVar371 = fVar371 * fVar354;
                      break;
                    case 6:
                      fVar4 = *(float *)local_1c8._0_8_;
                      auVar65._8_4_ = 0x80000000;
                      auVar65._0_8_ = 0x8000000080000000;
                      auVar65._12_4_ = 0x80000000;
                      auVar175 = vxorps_avx512vl(ZEXT416((uint)*(float *)(local_1c8._0_8_ + 4)),
                                                 auVar65);
                      fVar378 = auVar175._0_4_ / fVar4;
                      fVar371 = 0.0;
                      if ((fVar378 <= fVar354) &&
                         (fVar371 = fVar354, fVar354 <= fVar378 + 1.0 / fVar4)) {
                        auVar174 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar174,
                                                   ZEXT416((uint)*(float *)(local_1c8._0_8_ + 4)));
                        fVar371 = auVar174._0_4_ * fVar354;
                      }
                    }
                  }
                  *local_2d8 = fVar371;
                  local_2d8 = local_2d8 + 1;
                  uVar147 = uVar147 + 1;
                  iVar343 = iVar343 + 1;
                } while (uVar147 != iVar9);
              }
              iVar166 = iVar166 + 1;
            } while (iVar166 != iVar10);
          }
          local_308 = local_308 + 1;
        } while (local_308 != local_1f8);
      }
      iVar10 = local_248.h;
      iVar9 = local_248.w;
      if (((local_d8._0_4_ == 4) && (uVar152 == 4)) && (0 < (long)local_248.c)) {
        iVar165 = (this->super_Deconvolution).dilation_w;
        iVar148 = (this->super_Deconvolution).dilation_h;
        iVar138 = (this->super_Deconvolution).stride_w;
        iVar170 = (this->super_Deconvolution).stride_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        pvVar20 = (this->super_Deconvolution).bias_data.data;
        uVar155 = (this->super_Deconvolution).kernel_w;
        uVar11 = (this->super_Deconvolution).kernel_h;
        local_308 = 0;
        auVar373._8_4_ = 0x42b0c0a5;
        auVar373._0_8_ = 0x42b0c0a542b0c0a5;
        auVar373._12_4_ = 0x42b0c0a5;
        auVar380._8_4_ = 0xc2b0c0a5;
        auVar380._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar380._12_4_ = 0xc2b0c0a5;
        auVar388._8_4_ = 0x3f000000;
        auVar388._0_8_ = 0x3f0000003f000000;
        auVar388._12_4_ = 0x3f000000;
        auVar394._8_4_ = 0x3fb8aa3b;
        auVar394._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar394._12_4_ = 0x3fb8aa3b;
        auVar400._8_4_ = 0x3f800000;
        auVar400._0_8_ = 0x3f8000003f800000;
        auVar400._12_4_ = 0x3f800000;
        auVar406._8_4_ = 0x3f318000;
        auVar406._0_8_ = 0x3f3180003f318000;
        auVar406._12_4_ = 0x3f318000;
        auVar174 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar457._8_4_ = 0x3ab743ce;
        auVar457._0_8_ = 0x3ab743ce3ab743ce;
        auVar457._12_4_ = 0x3ab743ce;
        in_ZMM10 = (float  [16])ZEXT1664(auVar457);
        auVar464._8_4_ = 0x3c088908;
        auVar464._0_8_ = 0x3c0889083c088908;
        auVar464._12_4_ = 0x3c088908;
        auVar470._8_4_ = 0x3d2aa9c1;
        auVar470._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar470._12_4_ = 0x3d2aa9c1;
        auVar476._8_4_ = 0x3e2aaaaa;
        auVar476._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar476._12_4_ = 0x3e2aaaaa;
        auVar482._8_4_ = 0x3f800000;
        auVar482._0_8_ = 0x3f8000003f800000;
        auVar482._12_4_ = 0x3f800000;
        auVar488._8_4_ = 0xb95e8083;
        auVar488._0_8_ = 0xb95e8083b95e8083;
        auVar488._12_4_ = 0xb95e8083;
        auVar175 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar176 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar197 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar198 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar199 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar200 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar201 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar202 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar203 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar208 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar204 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar205 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        do {
          local_1c8._0_4_ = local_248.h;
          if (0 < local_248.h) {
            iVar13 = bottom_blob->w;
            iVar151 = bottom_blob->h;
            pauVar164 = (undefined1 (*) [16])
                        (local_248.cstep * local_308 *
                         CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) +
                        (long)local_248.data);
            uVar12 = bottom_blob->c;
            iVar166 = 0;
            do {
              if (0 < local_248.w) {
                uVar147 = 0;
                iVar343 = (1 - uVar155) * iVar165;
                do {
                  if (pvVar20 == (void *)0x0) {
                    auVar206 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar206 = *(undefined1 (*) [16])((long)pvVar20 + local_308 * 0x10);
                  }
                  auVar337 = ZEXT1664(auVar206);
                  if (0 < (int)uVar12) {
                    pvVar154 = (void *)((this->weight_data_tm).cstep * local_308 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    pvVar15 = bottom_blob->data;
                    uVar149 = 0;
                    do {
                      if (0 < (int)uVar11) {
                        uVar161 = 0;
                        uVar146 = 0;
                        do {
                          iVar139 = (((int)uVar146 - uVar11) + 1) * iVar148 + iVar166;
                          if (((-1 < iVar139) &&
                              (iVar140 = iVar139 / iVar170, iVar139 % iVar170 == 0)) &&
                             ((0 < (int)uVar155 && (iVar140 < iVar151)))) {
                            lVar167 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                                      bottom_blob->cstep * bottom_blob->elemsize * uVar149;
                            uVar153 = (ulong)uVar155;
                            uVar158 = uVar161;
                            iVar139 = iVar343;
                            do {
                              if (((-1 < iVar139) &&
                                  (iVar140 = iVar139 / iVar138, iVar139 % iVar138 == 0)) &&
                                 (iVar140 < iVar13)) {
                                lVar157 = (long)(iVar140 << 2);
                                uVar3 = *(undefined4 *)((long)pvVar15 + lVar157 * 4 + lVar167);
                                auVar417._4_4_ = uVar3;
                                auVar417._0_4_ = uVar3;
                                auVar417._8_4_ = uVar3;
                                auVar417._12_4_ = uVar3;
                                uVar3 = *(undefined4 *)((long)pvVar15 + lVar157 * 4 + lVar167 + 4);
                                auVar439._4_4_ = uVar3;
                                auVar439._0_4_ = uVar3;
                                auVar439._8_4_ = uVar3;
                                auVar439._12_4_ = uVar3;
                                auVar207 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 8)));
                                auVar177 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar15 +
                                                                       lVar157 * 4 + lVar167 + 0xc))
                                                     );
                                in_ZMM17 = ZEXT1664(auVar177);
                                uVar172 = uVar158 & 0xffffffff;
                                auVar206 = vfmadd231ps_fma(auVar337._0_16_,auVar417,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar154 + uVar172 * 4));
                                auVar206 = vfmadd231ps_fma(auVar206,auVar439,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar154 + uVar172 * 4 + 0x10));
                                auVar206 = vfmadd231ps_avx512vl
                                                     (auVar206,auVar207,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x20));
                                auVar206 = vfmadd231ps_avx512vl
                                                     (auVar206,auVar177,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar154 + uVar172 * 4 + 0x30));
                                auVar337 = ZEXT1664(auVar206);
                              }
                              uVar158 = uVar158 + 0x10;
                              iVar139 = iVar139 + iVar165;
                              uVar153 = uVar153 - 1;
                            } while (uVar153 != 0);
                          }
                          uVar146 = uVar146 + 1;
                          uVar161 = uVar161 + (ulong)uVar155 * 0x10;
                        } while (uVar146 != uVar11);
                      }
                      auVar206 = auVar337._0_16_;
                      pvVar154 = (void *)((long)pvVar154 + (long)(int)(uVar155 * uVar11 * 0x10) * 4)
                      ;
                      uVar149 = uVar149 + 1;
                    } while (uVar149 != uVar12);
                  }
                  switch(iVar156) {
                  case 1:
                    auVar206 = vmaxps_avx(auVar206,(undefined1  [16])0x0);
                    break;
                  case 2:
                    auVar207 = vmaxps_avx(auVar206,(undefined1  [16])0x0);
                    auVar206 = vminps_avx(auVar206,(undefined1  [16])0x0);
                    uVar3 = *(this->super_Deconvolution).activation_params.data;
                    auVar75._4_4_ = uVar3;
                    auVar75._0_4_ = uVar3;
                    auVar75._8_4_ = uVar3;
                    auVar75._12_4_ = uVar3;
                    auVar206 = vfmadd132ps_avx512vl(auVar206,auVar207,auVar75);
                    break;
                  case 3:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar73._4_4_ = uVar3;
                    auVar73._0_4_ = uVar3;
                    auVar73._8_4_ = uVar3;
                    auVar73._12_4_ = uVar3;
                    auVar206 = vmaxps_avx512vl(auVar206,auVar73);
                    uVar3 = puVar16[1];
                    auVar74._4_4_ = uVar3;
                    auVar74._0_4_ = uVar3;
                    auVar74._8_4_ = uVar3;
                    auVar74._12_4_ = uVar3;
                    auVar206 = vminps_avx512vl(auVar206,auVar74);
                    break;
                  case 4:
                    auVar71._8_4_ = 0x80000000;
                    auVar71._0_8_ = 0x8000000080000000;
                    auVar71._12_4_ = 0x80000000;
                    auVar206 = vxorps_avx512vl(auVar206,auVar71);
                    auVar206 = vminps_avx(auVar206,auVar373);
                    auVar206 = vmaxps_avx(auVar206,auVar380);
                    auVar207 = vfmadd231ps_fma(auVar388,auVar206,auVar394);
                    auVar177 = vcvttps2dq_avx512vl(auVar207);
                    auVar177 = vcvtdq2ps_avx512vl(auVar177);
                    uVar149 = vcmpps_avx512vl(auVar207,auVar177,1);
                    auVar207 = vsubps_avx512vl(auVar177,auVar400);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar220._0_4_ = (uint)bVar24 * auVar207._0_4_ | (uint)!bVar24 * auVar177._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar220._4_4_ = (uint)bVar24 * auVar207._4_4_ | (uint)!bVar24 * auVar177._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar220._8_4_ = (uint)bVar24 * auVar207._8_4_ | (uint)!bVar24 * auVar177._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar220._12_4_ =
                         (uint)bVar24 * auVar207._12_4_ | (uint)!bVar24 * auVar177._12_4_;
                    auVar206 = vfmsub231ps_avx512vl(auVar206,auVar220,auVar406);
                    auVar72._8_4_ = 0x395e8083;
                    auVar72._0_8_ = 0x395e8083395e8083;
                    auVar72._12_4_ = 0x395e8083;
                    auVar207 = vfmsub231ps_avx512vl(auVar206,auVar220,auVar72);
                    auVar418._0_4_ = auVar207._0_4_ * auVar207._0_4_;
                    auVar418._4_4_ = auVar207._4_4_ * auVar207._4_4_;
                    auVar418._8_4_ = auVar207._8_4_ * auVar207._8_4_;
                    auVar418._12_4_ = auVar207._12_4_ * auVar207._12_4_;
                    auVar206 = vfmadd213ps_fma(auVar174,auVar207,auVar457);
                    auVar206 = vfmadd213ps_fma(auVar206,auVar207,auVar464);
                    auVar206 = vfmadd213ps_fma(auVar206,auVar207,auVar470);
                    auVar206 = vfmadd213ps_fma(auVar206,auVar207,auVar476);
                    auVar206 = vfmadd213ps_fma(auVar206,auVar207,auVar388);
                    auVar206 = vfmadd213ps_fma(auVar206,auVar418,auVar207);
                    auVar361._0_4_ = auVar206._0_4_ + 1.0;
                    auVar361._4_4_ = auVar206._4_4_ + 1.0;
                    auVar361._8_4_ = auVar206._8_4_ + 1.0;
                    auVar361._12_4_ = auVar206._12_4_ + 1.0;
                    auVar206 = vcvttps2dq_avx512vl(auVar220);
                    auVar206 = vpslld_avx(auVar206,0x17);
                    auVar206 = vpaddd_avx(auVar206,auVar482);
                    auVar206 = vfmadd213ps_fma(auVar206,auVar361,auVar400);
                    auVar206 = vdivps_avx(auVar400,auVar206);
                    break;
                  case 5:
                    auVar207 = vminps_avx(auVar206,auVar373);
                    auVar207 = vmaxps_avx(auVar207,auVar380);
                    auVar177 = vfmadd213ps_fma(auVar394,auVar207,auVar388);
                    auVar178 = vcvttps2dq_avx512vl(auVar177);
                    auVar178 = vcvtdq2ps_avx512vl(auVar178);
                    uVar149 = vcmpps_avx512vl(auVar177,auVar178,1);
                    auVar177 = vsubps_avx512vl(auVar178,auVar400);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar215._0_4_ = (uint)bVar24 * auVar177._0_4_ | (uint)!bVar24 * auVar178._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar215._4_4_ = (uint)bVar24 * auVar177._4_4_ | (uint)!bVar24 * auVar178._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar215._8_4_ = (uint)bVar24 * auVar177._8_4_ | (uint)!bVar24 * auVar178._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar215._12_4_ =
                         (uint)bVar24 * auVar177._12_4_ | (uint)!bVar24 * auVar178._12_4_;
                    auVar207 = vfmsub231ps_avx512vl(auVar207,auVar215,auVar406);
                    auVar207 = vfnmsub231ps_avx512vl(auVar207,auVar215,auVar488);
                    auVar440._0_4_ = auVar207._0_4_ * auVar207._0_4_;
                    auVar440._4_4_ = auVar207._4_4_ * auVar207._4_4_;
                    auVar440._8_4_ = auVar207._8_4_ * auVar207._8_4_;
                    auVar440._12_4_ = auVar207._12_4_ * auVar207._12_4_;
                    auVar177 = vfmadd213ps_avx512vl(auVar174,auVar207,auVar457);
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar207,auVar464);
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar207,auVar470);
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar207,auVar476);
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar207,auVar388);
                    auVar207 = vfmadd213ps_avx512vl(auVar177,auVar440,auVar207);
                    auVar177 = vaddps_avx512vl(auVar207,auVar400);
                    auVar207 = vcvttps2dq_avx512vl(auVar215);
                    auVar207 = vpslld_avx(auVar207,0x17);
                    auVar207 = vpaddd_avx(auVar207,auVar482);
                    auVar207 = vfmadd213ps_fma(auVar207,auVar177,auVar400);
                    uVar149 = vcmpps_avx512vl(auVar207,(undefined1  [16])0x0,2);
                    auVar68._8_4_ = 0x800000;
                    auVar68._0_8_ = 0x80000000800000;
                    auVar68._12_4_ = 0x800000;
                    auVar207 = vmaxps_avx512vl(auVar207,auVar68);
                    auVar179 = vpsrld_avx(auVar207,0x17);
                    auVar177 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar69._8_4_ = 0x3f000000;
                    auVar69._0_8_ = 0x3f0000003f000000;
                    auVar69._12_4_ = 0x3f000000;
                    auVar207 = vpternlogd_avx512vl(auVar207,auVar177,auVar69,0xea);
                    uVar161 = vcmpps_avx512vl(auVar207,auVar175,1);
                    auVar177 = vaddps_avx512vl(auVar207,auVar176);
                    auVar207 = vaddps_avx512vl(auVar177,auVar207);
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar216._0_4_ = (uint)bVar24 * auVar207._0_4_ | (uint)!bVar24 * auVar177._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar216._4_4_ = (uint)bVar24 * auVar207._4_4_ | (uint)!bVar24 * auVar177._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar216._8_4_ = (uint)bVar24 * auVar207._8_4_ | (uint)!bVar24 * auVar177._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar216._12_4_ =
                         (uint)bVar24 * auVar207._12_4_ | (uint)!bVar24 * auVar177._12_4_;
                    auVar177 = vmulps_avx512vl(auVar216,auVar216);
                    auVar207 = vfmadd213ps_avx512vl(auVar197,auVar216,auVar198);
                    auVar207 = vfmadd213ps_avx512vl(auVar207,auVar216,auVar199);
                    auVar207 = vfmadd213ps_avx512vl(auVar207,auVar216,auVar200);
                    auVar207 = vfmadd213ps_avx512vl(auVar207,auVar216,auVar201);
                    auVar207 = vfmadd213ps_avx512vl(auVar207,auVar216,auVar202);
                    auVar207 = vfmadd213ps_avx512vl(auVar207,auVar216,auVar203);
                    auVar207 = vfmadd213ps_avx512vl(auVar207,auVar216,auVar208);
                    auVar207 = vfmadd213ps_avx512vl(auVar207,auVar216,auVar204);
                    auVar178 = vmulps_avx512vl(auVar177,auVar216);
                    auVar178 = vmulps_avx512vl(auVar178,auVar207);
                    auVar70._8_4_ = 0xffffff82;
                    auVar70._0_8_ = 0xffffff82ffffff82;
                    auVar70._12_4_ = 0xffffff82;
                    auVar207 = vpaddd_avx512vl(auVar179,auVar70);
                    auVar207 = vcvtdq2ps_avx(auVar207);
                    auVar179 = vsubps_avx512vl(auVar207,auVar400);
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar217._0_4_ = (uint)bVar24 * auVar179._0_4_ | (uint)!bVar24 * auVar207._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar217._4_4_ = (uint)bVar24 * auVar179._4_4_ | (uint)!bVar24 * auVar207._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar217._8_4_ = (uint)bVar24 * auVar179._8_4_ | (uint)!bVar24 * auVar207._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar217._12_4_ =
                         (uint)bVar24 * auVar179._12_4_ | (uint)!bVar24 * auVar207._12_4_;
                    auVar207 = vfmadd231ps_avx512vl(auVar178,auVar217,auVar488);
                    auVar207 = vfmsub231ps_avx512vl(auVar207,auVar388,auVar177);
                    auVar207 = vsubps_avx512vl(auVar207,auVar216);
                    auVar207 = vfnmadd231ps_fma(auVar207,auVar406,auVar217);
                    auVar177 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar218._0_4_ =
                         (uint)bVar24 * auVar177._0_4_ |
                         (uint)!bVar24 * (int)(auVar207._0_4_ + auVar207._0_4_);
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar218._4_4_ =
                         (uint)bVar24 * auVar177._4_4_ |
                         (uint)!bVar24 * (int)(auVar207._4_4_ + auVar207._4_4_);
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar218._8_4_ =
                         (uint)bVar24 * auVar177._8_4_ |
                         (uint)!bVar24 * (int)(auVar207._8_4_ + auVar207._8_4_);
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar218._12_4_ =
                         (uint)bVar24 * auVar177._12_4_ |
                         (uint)!bVar24 * (int)(auVar207._12_4_ + auVar207._12_4_);
                    auVar207 = vminps_avx(auVar218,auVar373);
                    auVar207 = vmaxps_avx(auVar207,auVar380);
                    auVar177 = vfmadd213ps_fma(auVar394,auVar207,auVar388);
                    auVar178 = vcvttps2dq_avx512vl(auVar177);
                    auVar178 = vcvtdq2ps_avx512vl(auVar178);
                    uVar149 = vcmpps_avx512vl(auVar177,auVar178,1);
                    auVar177 = vsubps_avx512vl(auVar178,auVar400);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar219._0_4_ = (uint)bVar24 * auVar177._0_4_ | (uint)!bVar24 * auVar178._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar219._4_4_ = (uint)bVar24 * auVar177._4_4_ | (uint)!bVar24 * auVar178._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar219._8_4_ = (uint)bVar24 * auVar177._8_4_ | (uint)!bVar24 * auVar178._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar219._12_4_ =
                         (uint)bVar24 * auVar177._12_4_ | (uint)!bVar24 * auVar178._12_4_;
                    auVar207 = vfmsub231ps_avx512vl(auVar207,auVar219,auVar406);
                    auVar207 = vfnmsub231ps_avx512vl(auVar207,auVar219,auVar488);
                    auVar441._0_4_ = auVar207._0_4_ * auVar207._0_4_;
                    auVar441._4_4_ = auVar207._4_4_ * auVar207._4_4_;
                    auVar441._8_4_ = auVar207._8_4_ * auVar207._8_4_;
                    auVar441._12_4_ = auVar207._12_4_ * auVar207._12_4_;
                    auVar177 = vfmadd213ps_avx512vl(auVar174,auVar207,auVar457);
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar207,auVar464);
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar207,auVar470);
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar207,auVar476);
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar207,auVar388);
                    auVar207 = vfmadd213ps_avx512vl(auVar177,auVar441,auVar207);
                    in_ZMM17 = ZEXT1664(auVar207);
                    auVar177 = vaddps_avx512vl(auVar207,auVar400);
                    auVar207 = vcvttps2dq_avx512vl(auVar219);
                    auVar207 = vpslld_avx(auVar207,0x17);
                    auVar207 = vpaddd_avx(auVar207,auVar482);
                    auVar207 = vfmadd213ps_fma(auVar207,auVar177,auVar400);
                    auVar207 = vdivps_avx512vl(auVar205,auVar207);
                    auVar206 = vfmsub231ps_fma(auVar206,auVar206,auVar207);
                    break;
                  case 6:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar419._4_4_ = uVar3;
                    auVar419._0_4_ = uVar3;
                    auVar419._8_4_ = uVar3;
                    auVar419._12_4_ = uVar3;
                    uVar3 = puVar16[1];
                    auVar67._4_4_ = uVar3;
                    auVar67._0_4_ = uVar3;
                    auVar67._8_4_ = uVar3;
                    auVar67._12_4_ = uVar3;
                    auVar207 = vfmadd213ps_avx512vl(auVar419,auVar206,auVar67);
                    auVar207 = vmaxps_avx(auVar207,(undefined1  [16])0x0);
                    auVar207 = vminps_avx(auVar207,auVar400);
                    auVar362._0_4_ = auVar207._0_4_ * auVar206._0_4_;
                    auVar362._4_4_ = auVar207._4_4_ * auVar206._4_4_;
                    auVar362._8_4_ = auVar207._8_4_ * auVar206._8_4_;
                    auVar362._12_4_ = auVar207._12_4_ * auVar206._12_4_;
                    auVar206 = auVar362;
                  }
                  *pauVar164 = auVar206;
                  pauVar164 = pauVar164 + 1;
                  uVar147 = uVar147 + 1;
                  iVar343 = iVar343 + 1;
                } while (uVar147 != local_248.w);
              }
              iVar166 = iVar166 + 1;
            } while (iVar166 != local_248.h);
          }
          local_308 = local_308 + 1;
        } while (local_308 != (long)local_248.c);
      }
      if (((local_d8._0_4_ == 1) && (uVar152 == 4)) && (0 < (long)local_248.c)) {
        iVar165 = (this->super_Deconvolution).dilation_w;
        iVar148 = (this->super_Deconvolution).dilation_h;
        iVar138 = (this->super_Deconvolution).stride_w;
        iVar170 = (this->super_Deconvolution).stride_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        pvVar20 = (this->super_Deconvolution).bias_data.data;
        uVar155 = (this->super_Deconvolution).kernel_w;
        uVar11 = (this->super_Deconvolution).kernel_h;
        local_308 = 0;
        auVar374._8_4_ = 0x42b0c0a5;
        auVar374._0_8_ = 0x42b0c0a542b0c0a5;
        auVar374._12_4_ = 0x42b0c0a5;
        auVar381._8_4_ = 0xc2b0c0a5;
        auVar381._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar381._12_4_ = 0xc2b0c0a5;
        auVar389._8_4_ = 0x3f000000;
        auVar389._0_8_ = 0x3f0000003f000000;
        auVar389._12_4_ = 0x3f000000;
        auVar395._8_4_ = 0x3fb8aa3b;
        auVar395._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar395._12_4_ = 0x3fb8aa3b;
        auVar401._8_4_ = 0x3f800000;
        auVar401._0_8_ = 0x3f8000003f800000;
        auVar401._12_4_ = 0x3f800000;
        auVar407._8_4_ = 0x3f318000;
        auVar407._0_8_ = 0x3f3180003f318000;
        auVar407._12_4_ = 0x3f318000;
        auVar174 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar458._8_4_ = 0x3ab743ce;
        auVar458._0_8_ = 0x3ab743ce3ab743ce;
        auVar458._12_4_ = 0x3ab743ce;
        in_ZMM10 = (float  [16])ZEXT1664(auVar458);
        auVar465._8_4_ = 0x3c088908;
        auVar465._0_8_ = 0x3c0889083c088908;
        auVar465._12_4_ = 0x3c088908;
        auVar471._8_4_ = 0x3d2aa9c1;
        auVar471._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar471._12_4_ = 0x3d2aa9c1;
        auVar477._8_4_ = 0x3e2aaaaa;
        auVar477._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar477._12_4_ = 0x3e2aaaaa;
        auVar483._8_4_ = 0x3f800000;
        auVar483._0_8_ = 0x3f8000003f800000;
        auVar483._12_4_ = 0x3f800000;
        auVar489._8_4_ = 0xb95e8083;
        auVar489._0_8_ = 0xb95e8083b95e8083;
        auVar489._12_4_ = 0xb95e8083;
        auVar175 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar176 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar197 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar198 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar199 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar200 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar201 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar202 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar203 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar208 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar204 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar205 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        do {
          local_1c8._0_4_ = local_248.h;
          if (0 < local_248.h) {
            iVar13 = bottom_blob->w;
            iVar151 = bottom_blob->h;
            pauVar164 = (undefined1 (*) [16])
                        (local_248.cstep * local_308 *
                         CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) +
                        (long)local_248.data);
            uVar12 = bottom_blob->c;
            iVar166 = 0;
            do {
              if (0 < local_248.w) {
                uVar147 = 0;
                iVar343 = (1 - uVar155) * iVar165;
                do {
                  if (pvVar20 == (void *)0x0) {
                    auVar206 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar206 = *(undefined1 (*) [16])((long)pvVar20 + local_308 * 0x10);
                  }
                  auVar337 = ZEXT1664(auVar206);
                  if (0 < (int)uVar12) {
                    pvVar154 = (void *)((this->weight_data_tm).cstep * local_308 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    uVar149 = 0;
                    do {
                      if (0 < (int)uVar11) {
                        uVar146 = 0;
                        uVar161 = 0;
                        do {
                          iVar139 = (((int)uVar161 - uVar11) + 1) * iVar148 + iVar166;
                          if (((-1 < iVar139) &&
                              (iVar140 = iVar139 / iVar170, iVar139 % iVar170 == 0)) &&
                             ((iVar140 < iVar151 && (0 < (int)uVar155)))) {
                            uVar153 = uVar146;
                            uVar158 = (ulong)uVar155;
                            iVar139 = iVar343;
                            do {
                              if (((-1 < iVar139) &&
                                  (iVar141 = iVar139 / iVar138, iVar139 % iVar138 == 0)) &&
                                 (iVar141 < iVar13)) {
                                uVar3 = *(undefined4 *)
                                         ((long)bottom_blob->data +
                                         (long)iVar141 * 4 +
                                         (long)iVar140 *
                                         (long)bottom_blob->w * bottom_blob->elemsize +
                                         bottom_blob->cstep * bottom_blob->elemsize * uVar149);
                                auVar420._4_4_ = uVar3;
                                auVar420._0_4_ = uVar3;
                                auVar420._8_4_ = uVar3;
                                auVar420._12_4_ = uVar3;
                                auVar206 = vfmadd231ps_fma(auVar337._0_16_,auVar420,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar154 +
                                                            (uVar153 & 0xffffffff) * 4));
                                auVar337 = ZEXT1664(auVar206);
                              }
                              uVar153 = uVar153 + 4;
                              iVar139 = iVar139 + iVar165;
                              uVar158 = uVar158 - 1;
                            } while (uVar158 != 0);
                          }
                          uVar161 = uVar161 + 1;
                          uVar146 = uVar146 + (ulong)uVar155 * 4;
                        } while (uVar161 != uVar11);
                      }
                      auVar206 = auVar337._0_16_;
                      pvVar154 = (void *)((long)pvVar154 + (long)(int)(uVar155 * uVar11 * 4) * 4);
                      uVar149 = uVar149 + 1;
                    } while (uVar149 != uVar12);
                  }
                  switch(iVar156) {
                  case 1:
                    auVar206 = vmaxps_avx(auVar206,(undefined1  [16])0x0);
                    break;
                  case 2:
                    auVar207 = vmaxps_avx(auVar206,(undefined1  [16])0x0);
                    auVar206 = vminps_avx(auVar206,(undefined1  [16])0x0);
                    uVar3 = *(this->super_Deconvolution).activation_params.data;
                    auVar84._4_4_ = uVar3;
                    auVar84._0_4_ = uVar3;
                    auVar84._8_4_ = uVar3;
                    auVar84._12_4_ = uVar3;
                    auVar206 = vfmadd132ps_avx512vl(auVar206,auVar207,auVar84);
                    break;
                  case 3:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar82._4_4_ = uVar3;
                    auVar82._0_4_ = uVar3;
                    auVar82._8_4_ = uVar3;
                    auVar82._12_4_ = uVar3;
                    auVar206 = vmaxps_avx512vl(auVar206,auVar82);
                    uVar3 = puVar16[1];
                    auVar83._4_4_ = uVar3;
                    auVar83._0_4_ = uVar3;
                    auVar83._8_4_ = uVar3;
                    auVar83._12_4_ = uVar3;
                    auVar206 = vminps_avx512vl(auVar206,auVar83);
                    break;
                  case 4:
                    auVar80._8_4_ = 0x80000000;
                    auVar80._0_8_ = 0x8000000080000000;
                    auVar80._12_4_ = 0x80000000;
                    auVar206 = vxorps_avx512vl(auVar206,auVar80);
                    auVar206 = vminps_avx(auVar206,auVar374);
                    auVar206 = vmaxps_avx(auVar206,auVar381);
                    auVar207 = vfmadd231ps_fma(auVar389,auVar206,auVar395);
                    auVar177 = vcvttps2dq_avx512vl(auVar207);
                    auVar177 = vcvtdq2ps_avx512vl(auVar177);
                    uVar149 = vcmpps_avx512vl(auVar207,auVar177,1);
                    auVar207 = vsubps_avx512vl(auVar177,auVar401);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar226._0_4_ = (uint)bVar24 * auVar207._0_4_ | (uint)!bVar24 * auVar177._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar226._4_4_ = (uint)bVar24 * auVar207._4_4_ | (uint)!bVar24 * auVar177._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar226._8_4_ = (uint)bVar24 * auVar207._8_4_ | (uint)!bVar24 * auVar177._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar226._12_4_ =
                         (uint)bVar24 * auVar207._12_4_ | (uint)!bVar24 * auVar177._12_4_;
                    auVar206 = vfmsub231ps_avx512vl(auVar206,auVar226,auVar407);
                    auVar81._8_4_ = 0x395e8083;
                    auVar81._0_8_ = 0x395e8083395e8083;
                    auVar81._12_4_ = 0x395e8083;
                    auVar207 = vfmsub231ps_avx512vl(auVar206,auVar226,auVar81);
                    auVar421._0_4_ = auVar207._0_4_ * auVar207._0_4_;
                    auVar421._4_4_ = auVar207._4_4_ * auVar207._4_4_;
                    auVar421._8_4_ = auVar207._8_4_ * auVar207._8_4_;
                    auVar421._12_4_ = auVar207._12_4_ * auVar207._12_4_;
                    auVar206 = vfmadd213ps_fma(auVar174,auVar207,auVar458);
                    auVar206 = vfmadd213ps_fma(auVar206,auVar207,auVar465);
                    auVar206 = vfmadd213ps_fma(auVar206,auVar207,auVar471);
                    auVar206 = vfmadd213ps_fma(auVar206,auVar207,auVar477);
                    auVar206 = vfmadd213ps_fma(auVar206,auVar207,auVar389);
                    auVar206 = vfmadd213ps_fma(auVar206,auVar421,auVar207);
                    auVar363._0_4_ = auVar206._0_4_ + 1.0;
                    auVar363._4_4_ = auVar206._4_4_ + 1.0;
                    auVar363._8_4_ = auVar206._8_4_ + 1.0;
                    auVar363._12_4_ = auVar206._12_4_ + 1.0;
                    auVar206 = vcvttps2dq_avx512vl(auVar226);
                    auVar206 = vpslld_avx(auVar206,0x17);
                    auVar206 = vpaddd_avx(auVar206,auVar483);
                    auVar206 = vfmadd213ps_fma(auVar206,auVar363,auVar401);
                    auVar206 = vdivps_avx(auVar401,auVar206);
                    break;
                  case 5:
                    auVar207 = vminps_avx(auVar206,auVar374);
                    auVar207 = vmaxps_avx(auVar207,auVar381);
                    auVar177 = vfmadd213ps_fma(auVar395,auVar207,auVar389);
                    auVar178 = vcvttps2dq_avx512vl(auVar177);
                    auVar178 = vcvtdq2ps_avx512vl(auVar178);
                    uVar149 = vcmpps_avx512vl(auVar177,auVar178,1);
                    auVar177 = vsubps_avx512vl(auVar178,auVar401);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar221._0_4_ = (uint)bVar24 * auVar177._0_4_ | (uint)!bVar24 * auVar178._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar221._4_4_ = (uint)bVar24 * auVar177._4_4_ | (uint)!bVar24 * auVar178._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar221._8_4_ = (uint)bVar24 * auVar177._8_4_ | (uint)!bVar24 * auVar178._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar221._12_4_ =
                         (uint)bVar24 * auVar177._12_4_ | (uint)!bVar24 * auVar178._12_4_;
                    auVar207 = vfmsub231ps_avx512vl(auVar207,auVar221,auVar407);
                    auVar207 = vfnmsub231ps_avx512vl(auVar207,auVar221,auVar489);
                    auVar442._0_4_ = auVar207._0_4_ * auVar207._0_4_;
                    auVar442._4_4_ = auVar207._4_4_ * auVar207._4_4_;
                    auVar442._8_4_ = auVar207._8_4_ * auVar207._8_4_;
                    auVar442._12_4_ = auVar207._12_4_ * auVar207._12_4_;
                    auVar177 = vfmadd213ps_avx512vl(auVar174,auVar207,auVar458);
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar207,auVar465);
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar207,auVar471);
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar207,auVar477);
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar207,auVar389);
                    auVar207 = vfmadd213ps_avx512vl(auVar177,auVar442,auVar207);
                    auVar177 = vaddps_avx512vl(auVar207,auVar401);
                    auVar207 = vcvttps2dq_avx512vl(auVar221);
                    auVar207 = vpslld_avx(auVar207,0x17);
                    auVar207 = vpaddd_avx(auVar207,auVar483);
                    auVar207 = vfmadd213ps_fma(auVar207,auVar177,auVar401);
                    uVar149 = vcmpps_avx512vl(auVar207,(undefined1  [16])0x0,2);
                    auVar77._8_4_ = 0x800000;
                    auVar77._0_8_ = 0x80000000800000;
                    auVar77._12_4_ = 0x800000;
                    auVar207 = vmaxps_avx512vl(auVar207,auVar77);
                    auVar179 = vpsrld_avx(auVar207,0x17);
                    auVar177 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar78._8_4_ = 0x3f000000;
                    auVar78._0_8_ = 0x3f0000003f000000;
                    auVar78._12_4_ = 0x3f000000;
                    auVar207 = vpternlogd_avx512vl(auVar207,auVar177,auVar78,0xea);
                    uVar161 = vcmpps_avx512vl(auVar207,auVar175,1);
                    auVar177 = vaddps_avx512vl(auVar207,auVar176);
                    auVar207 = vaddps_avx512vl(auVar177,auVar207);
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar222._0_4_ = (uint)bVar24 * auVar207._0_4_ | (uint)!bVar24 * auVar177._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar222._4_4_ = (uint)bVar24 * auVar207._4_4_ | (uint)!bVar24 * auVar177._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar222._8_4_ = (uint)bVar24 * auVar207._8_4_ | (uint)!bVar24 * auVar177._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar222._12_4_ =
                         (uint)bVar24 * auVar207._12_4_ | (uint)!bVar24 * auVar177._12_4_;
                    auVar177 = vmulps_avx512vl(auVar222,auVar222);
                    auVar207 = vfmadd213ps_avx512vl(auVar197,auVar222,auVar198);
                    auVar207 = vfmadd213ps_avx512vl(auVar207,auVar222,auVar199);
                    auVar207 = vfmadd213ps_avx512vl(auVar207,auVar222,auVar200);
                    auVar207 = vfmadd213ps_avx512vl(auVar207,auVar222,auVar201);
                    auVar207 = vfmadd213ps_avx512vl(auVar207,auVar222,auVar202);
                    auVar207 = vfmadd213ps_avx512vl(auVar207,auVar222,auVar203);
                    auVar207 = vfmadd213ps_avx512vl(auVar207,auVar222,auVar208);
                    auVar207 = vfmadd213ps_avx512vl(auVar207,auVar222,auVar204);
                    auVar178 = vmulps_avx512vl(auVar177,auVar222);
                    auVar178 = vmulps_avx512vl(auVar178,auVar207);
                    auVar79._8_4_ = 0xffffff82;
                    auVar79._0_8_ = 0xffffff82ffffff82;
                    auVar79._12_4_ = 0xffffff82;
                    auVar207 = vpaddd_avx512vl(auVar179,auVar79);
                    auVar207 = vcvtdq2ps_avx(auVar207);
                    auVar179 = vsubps_avx512vl(auVar207,auVar401);
                    bVar24 = (bool)((byte)uVar161 & 1);
                    auVar223._0_4_ = (uint)bVar24 * auVar179._0_4_ | (uint)!bVar24 * auVar207._0_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 1) & 1);
                    auVar223._4_4_ = (uint)bVar24 * auVar179._4_4_ | (uint)!bVar24 * auVar207._4_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 2) & 1);
                    auVar223._8_4_ = (uint)bVar24 * auVar179._8_4_ | (uint)!bVar24 * auVar207._8_4_;
                    bVar24 = (bool)((byte)(uVar161 >> 3) & 1);
                    auVar223._12_4_ =
                         (uint)bVar24 * auVar179._12_4_ | (uint)!bVar24 * auVar207._12_4_;
                    auVar207 = vfmadd231ps_avx512vl(auVar178,auVar223,auVar489);
                    auVar207 = vfmsub231ps_avx512vl(auVar207,auVar389,auVar177);
                    auVar207 = vsubps_avx512vl(auVar207,auVar222);
                    auVar207 = vfnmadd231ps_fma(auVar207,auVar407,auVar223);
                    auVar177 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar224._0_4_ =
                         (uint)bVar24 * auVar177._0_4_ |
                         (uint)!bVar24 * (int)(auVar207._0_4_ + auVar207._0_4_);
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar224._4_4_ =
                         (uint)bVar24 * auVar177._4_4_ |
                         (uint)!bVar24 * (int)(auVar207._4_4_ + auVar207._4_4_);
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar224._8_4_ =
                         (uint)bVar24 * auVar177._8_4_ |
                         (uint)!bVar24 * (int)(auVar207._8_4_ + auVar207._8_4_);
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar224._12_4_ =
                         (uint)bVar24 * auVar177._12_4_ |
                         (uint)!bVar24 * (int)(auVar207._12_4_ + auVar207._12_4_);
                    auVar207 = vminps_avx(auVar224,auVar374);
                    auVar207 = vmaxps_avx(auVar207,auVar381);
                    auVar177 = vfmadd213ps_fma(auVar395,auVar207,auVar389);
                    auVar178 = vcvttps2dq_avx512vl(auVar177);
                    auVar178 = vcvtdq2ps_avx512vl(auVar178);
                    uVar149 = vcmpps_avx512vl(auVar177,auVar178,1);
                    auVar177 = vsubps_avx512vl(auVar178,auVar401);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar225._0_4_ = (uint)bVar24 * auVar177._0_4_ | (uint)!bVar24 * auVar178._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar225._4_4_ = (uint)bVar24 * auVar177._4_4_ | (uint)!bVar24 * auVar178._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar225._8_4_ = (uint)bVar24 * auVar177._8_4_ | (uint)!bVar24 * auVar178._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar225._12_4_ =
                         (uint)bVar24 * auVar177._12_4_ | (uint)!bVar24 * auVar178._12_4_;
                    auVar207 = vfmsub231ps_avx512vl(auVar207,auVar225,auVar407);
                    auVar207 = vfnmsub231ps_avx512vl(auVar207,auVar225,auVar489);
                    auVar443._0_4_ = auVar207._0_4_ * auVar207._0_4_;
                    auVar443._4_4_ = auVar207._4_4_ * auVar207._4_4_;
                    auVar443._8_4_ = auVar207._8_4_ * auVar207._8_4_;
                    auVar443._12_4_ = auVar207._12_4_ * auVar207._12_4_;
                    auVar177 = vfmadd213ps_avx512vl(auVar174,auVar207,auVar458);
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar207,auVar465);
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar207,auVar471);
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar207,auVar477);
                    auVar177 = vfmadd213ps_avx512vl(auVar177,auVar207,auVar389);
                    auVar207 = vfmadd213ps_avx512vl(auVar177,auVar443,auVar207);
                    in_ZMM17 = ZEXT1664(auVar207);
                    auVar177 = vaddps_avx512vl(auVar207,auVar401);
                    auVar207 = vcvttps2dq_avx512vl(auVar225);
                    auVar207 = vpslld_avx(auVar207,0x17);
                    auVar207 = vpaddd_avx(auVar207,auVar483);
                    auVar207 = vfmadd213ps_fma(auVar207,auVar177,auVar401);
                    auVar207 = vdivps_avx512vl(auVar205,auVar207);
                    auVar206 = vfmsub231ps_fma(auVar206,auVar206,auVar207);
                    break;
                  case 6:
                    puVar16 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar3 = *puVar16;
                    auVar422._4_4_ = uVar3;
                    auVar422._0_4_ = uVar3;
                    auVar422._8_4_ = uVar3;
                    auVar422._12_4_ = uVar3;
                    uVar3 = puVar16[1];
                    auVar76._4_4_ = uVar3;
                    auVar76._0_4_ = uVar3;
                    auVar76._8_4_ = uVar3;
                    auVar76._12_4_ = uVar3;
                    auVar207 = vfmadd213ps_avx512vl(auVar422,auVar206,auVar76);
                    auVar207 = vmaxps_avx(auVar207,(undefined1  [16])0x0);
                    auVar207 = vminps_avx(auVar207,auVar401);
                    auVar364._0_4_ = auVar207._0_4_ * auVar206._0_4_;
                    auVar364._4_4_ = auVar207._4_4_ * auVar206._4_4_;
                    auVar364._8_4_ = auVar207._8_4_ * auVar206._8_4_;
                    auVar364._12_4_ = auVar207._12_4_ * auVar206._12_4_;
                    auVar206 = auVar364;
                  }
                  *pauVar164 = auVar206;
                  pauVar164 = pauVar164 + 1;
                  uVar147 = uVar147 + 1;
                  iVar343 = iVar343 + 1;
                } while (uVar147 != local_248.w);
              }
              iVar166 = iVar166 + 1;
            } while (iVar166 != local_248.h);
          }
          local_308 = local_308 + 1;
        } while (local_308 != (long)local_248.c);
      }
      if (((local_d8._0_4_ == 4) && (uVar152 == 1)) &&
         (local_1f8 = (ulong)local_248.c, 0 < (long)local_1f8)) {
        iVar165 = (this->super_Deconvolution).dilation_w;
        iVar148 = (this->super_Deconvolution).dilation_h;
        iVar138 = (this->super_Deconvolution).stride_w;
        iVar170 = (this->super_Deconvolution).stride_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        pvVar20 = (this->super_Deconvolution).bias_data.data;
        uVar155 = (this->super_Deconvolution).kernel_w;
        uVar11 = (this->super_Deconvolution).kernel_h;
        local_1e8 = local_248.data;
        local_1e0 = (void *)(CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) *
                            local_248.cstep);
        iVar13 = bottom_blob->w;
        iVar151 = bottom_blob->h;
        uVar12 = bottom_blob->c;
        local_308 = 0;
        do {
          if (0 < iVar10) {
            sVar21 = (this->weight_data_tm).cstep;
            sVar17 = (this->weight_data_tm).elemsize;
            local_2d8 = (float *)((long)local_1e0 * local_308 + (long)local_1e8);
            pvVar154 = (this->weight_data_tm).data;
            iVar166 = 0;
            do {
              if (0 < iVar9) {
                iVar139 = bottom_blob->w;
                pvVar15 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                sVar19 = bottom_blob->cstep;
                local_1c8._0_8_ = (this->super_Deconvolution).activation_params.data;
                uVar147 = 0;
                iVar343 = (1 - uVar155) * iVar165;
                do {
                  if (pvVar20 == (void *)0x0) {
                    fVar354 = 0.0;
                  }
                  else {
                    fVar354 = *(float *)((long)pvVar20 + local_308 * 4);
                  }
                  if ((int)uVar12 < 1) {
                    auVar174 = SUB6416(ZEXT864(0),0);
                  }
                  else {
                    auVar337 = ZEXT864(0);
                    uVar149 = 0;
                    pvVar160 = (void *)(sVar21 * local_308 * sVar17 + (long)pvVar154);
                    do {
                      if (0 < (int)uVar11) {
                        uVar161 = 0;
                        uVar146 = 0;
                        do {
                          iVar140 = (((int)uVar146 - uVar11) + 1) * iVar148 + iVar166;
                          if (((-1 < iVar140) &&
                              (iVar141 = iVar140 / iVar170, iVar140 % iVar170 == 0)) &&
                             ((0 < (int)uVar155 && (iVar141 < iVar151)))) {
                            uVar153 = (ulong)uVar155;
                            uVar158 = uVar161;
                            iVar140 = iVar343;
                            do {
                              if (((-1 < iVar140) &&
                                  (iVar142 = iVar140 / iVar138, iVar140 % iVar138 == 0)) &&
                                 (iVar142 < iVar13)) {
                                auVar174 = vfmadd231ps_fma(auVar337._0_16_,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar15 +
                                                            (long)(iVar142 << 2) * 4 +
                                                            (long)iVar141 * (long)iVar139 * sVar18 +
                                                            sVar19 * sVar18 * uVar149),
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar160 +
                                                            (uVar158 & 0xffffffff) * 4));
                                auVar337 = ZEXT1664(auVar174);
                              }
                              uVar158 = uVar158 + 4;
                              iVar140 = iVar140 + iVar165;
                              uVar153 = uVar153 - 1;
                            } while (uVar153 != 0);
                          }
                          uVar146 = uVar146 + 1;
                          uVar161 = uVar161 + (ulong)uVar155 * 4;
                        } while (uVar146 != uVar11);
                      }
                      auVar174 = auVar337._0_16_;
                      pvVar160 = (void *)((long)pvVar160 + (long)(int)(uVar155 * uVar11 * 4) * 4);
                      uVar149 = uVar149 + 1;
                    } while (uVar149 != uVar12);
                  }
                  auVar175 = vshufpd_avx(auVar174,auVar174,1);
                  auVar365._0_4_ = auVar175._0_4_ + auVar174._0_4_;
                  auVar365._4_4_ = auVar175._4_4_ + auVar174._4_4_;
                  auVar365._8_4_ = auVar175._8_4_ + auVar174._8_4_;
                  auVar365._12_4_ = auVar175._12_4_ + auVar174._12_4_;
                  auVar174 = vmovshdup_avx(auVar365);
                  fVar354 = auVar174._0_4_ + fVar354 + auVar365._0_4_;
                  auVar174 = ZEXT416((uint)fVar354);
                  fVar371 = fVar354;
                  if (iVar156 - 1U < 6) {
                    switch(iVar156) {
                    case 1:
                      auVar174 = vmaxss_avx(ZEXT416((uint)fVar354),ZEXT416(0));
                      fVar371 = auVar174._0_4_;
                      break;
                    case 2:
                      uVar42 = vcmpss_avx512f(ZEXT416((uint)fVar354),ZEXT416(0),0xe);
                      bVar24 = (bool)((byte)uVar42 & 1);
                      fVar371 = (float)((uint)bVar24 * 0x3f800000 +
                                       (uint)!bVar24 * (int)*(float *)local_1c8._0_8_) * fVar354;
                      break;
                    case 3:
                      auVar174 = vmaxss_avx(auVar174,ZEXT416((uint)*(float *)local_1c8._0_8_));
                      fVar371 = auVar174._0_4_;
                      if (*(float *)(local_1c8._0_8_ + 4) < auVar174._0_4_) {
                        fVar371 = *(float *)(local_1c8._0_8_ + 4);
                      }
                      break;
                    case 4:
                      auVar174 = vminss_avx(auVar174,SUB6416(ZEXT464(0x42b0c0a5),0));
                      auVar86._8_4_ = 0x80000000;
                      auVar86._0_8_ = 0x8000000080000000;
                      auVar86._12_4_ = 0x80000000;
                      auVar175 = vxorps_avx512vl(auVar174,auVar86);
                      uVar42 = vcmpss_avx512f(auVar174,ZEXT416(0xc2b0c0a5),1);
                      bVar24 = (bool)((byte)uVar42 & 1);
                      in_ZMM10 = (float  [16])ZEXT1664(in_ZMM10._0_16_);
                      fVar354 = expf((float)((uint)bVar24 * 0x42b0c0a5 +
                                            (uint)!bVar24 * auVar175._0_4_));
                      fVar371 = 1.0 / (fVar354 + 1.0);
                      break;
                    case 5:
                      in_ZMM10 = (float  [16])ZEXT1664(in_ZMM10._0_16_);
                      fVar371 = expf(fVar354);
                      fVar371 = logf(fVar371 + 1.0);
                      fVar371 = tanhf(fVar371);
                      fVar371 = fVar371 * fVar354;
                      break;
                    case 6:
                      fVar4 = *(float *)local_1c8._0_8_;
                      auVar85._8_4_ = 0x80000000;
                      auVar85._0_8_ = 0x8000000080000000;
                      auVar85._12_4_ = 0x80000000;
                      auVar175 = vxorps_avx512vl(ZEXT416((uint)*(float *)(local_1c8._0_8_ + 4)),
                                                 auVar85);
                      fVar378 = auVar175._0_4_ / fVar4;
                      fVar371 = 0.0;
                      if ((fVar378 <= fVar354) &&
                         (fVar371 = fVar354, fVar354 <= fVar378 + 1.0 / fVar4)) {
                        auVar174 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar174,
                                                   ZEXT416((uint)*(float *)(local_1c8._0_8_ + 4)));
                        fVar371 = auVar174._0_4_ * fVar354;
                      }
                    }
                  }
                  *local_2d8 = fVar371;
                  local_2d8 = local_2d8 + 1;
                  uVar147 = uVar147 + 1;
                  iVar343 = iVar343 + 1;
                } while (uVar147 != iVar9);
              }
              iVar166 = iVar166 + 1;
            } while (iVar166 != iVar10);
          }
          local_308 = local_308 + 1;
        } while (local_308 != local_1f8);
      }
      iVar9 = local_248.w;
      if (((local_d8._0_4_ == 1) && (uVar152 == 1)) &&
         (local_80 = (long)(this->super_Deconvolution).num_output, 0 < local_80)) {
        local_88 = local_248.data;
        local_90 = local_248.cstep *
                   CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
        iVar10 = bottom_blob->h;
        uVar152 = bottom_blob->c;
        uVar149 = (ulong)(uint)local_248.w;
        local_1e8 = (void *)CONCAT44(local_1e8._4_4_,local_248.h);
        lVar167 = (long)local_1ec;
        local_1e0 = (void *)(long)local_248.w;
        auVar280 = vpbroadcastd_avx512f(ZEXT416((uint)bottom_blob->w));
        auVar337._56_8_ = 0;
        auVar337._0_56_ = local_1c8._8_56_;
        local_1c8._0_64_ = auVar337 << 0x40;
        auVar281 = ZEXT1264(ZEXT812(0));
        auVar342 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar341 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar340 = vpmovsxbd_avx512f(_DAT_005f4684);
        auVar339 = vpternlogd_avx512f(in_ZMM17,in_ZMM17,in_ZMM17,0xff);
        auVar338 = vpbroadcastq_avx512f(ZEXT816(0x10));
        auVar337 = vpbroadcastd_avx512f(ZEXT416(0x10));
        local_d8 = vmovdqu64_avx512f(auVar280);
        do {
          if (0 < (int)local_1e8) {
            local_2f0 = (void *)(local_90 * local_1c8._0_8_ + (long)local_88);
            iVar165 = (this->super_Deconvolution).bias_term;
            iVar148 = (this->super_Deconvolution).activation_type;
            lVar157 = (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize *
                      local_1c8._0_8_;
            pvVar20 = (this->weight_data_tm).data;
            local_1f8 = local_1f8 & 0xffffffff00000000;
            do {
              if (0 < iVar9) {
                pvVar154 = (this->super_Deconvolution).bias_data.data;
                iVar138 = bottom_blob->w;
                pvVar15 = bottom_blob->data;
                sVar21 = bottom_blob->elemsize;
                sVar17 = bottom_blob->cstep;
                uVar155 = (this->super_Deconvolution).kernel_h;
                iVar170 = (int)local_1f8 - local_1d0;
                pfVar169 = (float *)(this->super_Deconvolution).activation_params.data;
                uVar161 = 0;
                do {
                  if (iVar165 == 0) {
                    auVar282 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar282 = ZEXT464(*(uint *)((long)pvVar154 + local_1c8._0_8_ * 4));
                  }
                  auVar174 = auVar282._0_16_;
                  if (0 < (int)uVar152) {
                    uVar11 = (this->super_Deconvolution).kernel_w;
                    iVar156 = (this->super_Deconvolution).stride_h;
                    iVar13 = (this->super_Deconvolution).stride_w;
                    auVar283 = vpbroadcastq_avx512f();
                    auVar284 = vpbroadcastd_avx512f
                                         (ZEXT416((uint)(this->super_Deconvolution).dilation_w));
                    auVar285 = vpbroadcastd_avx512f();
                    uVar146 = 0;
                    pvVar160 = (void *)(lVar157 + (long)pvVar20);
                    do {
                      if (0 < (int)uVar155) {
                        uVar153 = 0;
                        pvVar159 = pvVar160;
                        do {
                          iVar151 = (this->super_Deconvolution).dilation_h * (int)uVar153 + iVar170;
                          if (((-1 < iVar151) &&
                              (iVar166 = iVar151 / iVar156, iVar151 % iVar156 == 0)) &&
                             ((iVar166 < iVar10 && (0 < (int)uVar11)))) {
                            auVar411 = ZEXT1664(CONCAT124(auVar281._4_12_,auVar282._0_4_));
                            uVar158 = 0;
                            auVar282 = vmovdqa64_avx512f(auVar341);
                            auVar286 = vmovdqa64_avx512f(auVar342);
                            auVar287 = vmovdqa64_avx512f(auVar340);
                            do {
                              uVar42 = vpcmpuq_avx512f(auVar282,auVar283,2);
                              uVar43 = vpcmpuq_avx512f(auVar286,auVar283,2);
                              bVar32 = (byte)uVar43;
                              uVar171 = CONCAT11(bVar32,(byte)uVar42);
                              auVar288 = vpmulld_avx512f(auVar284,auVar287);
                              auVar288 = vpaddd_avx512f(auVar285,auVar288);
                              uVar172 = vpcmpgtd_avx512f(auVar288,auVar339);
                              uVar172 = uVar171 & uVar172;
                              if ((uVar172 & 1) != 0) {
                                in_ZMM10 = (float  [16])ZEXT464((uint)(auVar288._0_4_ % iVar13));
                              }
                              if ((uVar172 & 2) != 0) {
                                auVar174 = vpinsrd_avx(in_ZMM10._0_16_,auVar288._4_4_ % iVar13,1);
                                in_ZMM10 = (float  [16])
                                           vinserti32x4_avx512f
                                                     ((undefined1  [64])in_ZMM10,auVar174,0);
                              }
                              if ((uVar172 & 4) != 0) {
                                auVar174 = vpinsrd_avx(in_ZMM10._0_16_,auVar288._8_4_ % iVar13,2);
                                in_ZMM10 = (float  [16])
                                           vinserti32x4_avx512f
                                                     ((undefined1  [64])in_ZMM10,auVar174,0);
                              }
                              if ((uVar172 & 8) != 0) {
                                auVar174 = vpinsrd_avx(in_ZMM10._0_16_,auVar288._12_4_ % iVar13,3);
                                in_ZMM10 = (float  [16])
                                           vinserti32x4_avx512f
                                                     ((undefined1  [64])in_ZMM10,auVar174,0);
                              }
                              afVar312 = in_ZMM10;
                              if ((uVar172 & 0x10) != 0) {
                                auVar289 = vpbroadcastd_avx512f();
                                afVar312._0_16_ = in_ZMM10._0_16_;
                                afVar312[4] = auVar289._16_4_;
                                afVar312[5] = in_ZMM10[5];
                                afVar312[6] = in_ZMM10[6];
                                afVar312[7] = in_ZMM10[7];
                                afVar312[8] = in_ZMM10[8];
                                afVar312[9] = in_ZMM10[9];
                                afVar312[10] = in_ZMM10[10];
                                afVar312[0xb] = in_ZMM10[0xb];
                                afVar312[0xc] = in_ZMM10[0xc];
                                afVar312[0xd] = in_ZMM10[0xd];
                                afVar312[0xe] = in_ZMM10[0xe];
                                afVar312[0xf] = in_ZMM10[0xf];
                              }
                              afVar313 = afVar312;
                              if ((uVar172 & 0x20) != 0) {
                                auVar289 = vpbroadcastd_avx512f();
                                afVar313._0_20_ = afVar312._0_20_;
                                afVar313[5] = auVar289._20_4_;
                                afVar313[6] = afVar312[6];
                                afVar313[7] = afVar312[7];
                                afVar313[8] = afVar312[8];
                                afVar313[9] = afVar312[9];
                                afVar313[10] = afVar312[10];
                                afVar313[0xb] = afVar312[0xb];
                                afVar313[0xc] = afVar312[0xc];
                                afVar313[0xd] = afVar312[0xd];
                                afVar313[0xe] = afVar312[0xe];
                                afVar313[0xf] = afVar312[0xf];
                              }
                              afVar314 = afVar313;
                              if ((uVar172 & 0x40) != 0) {
                                auVar289 = vpbroadcastd_avx512f();
                                afVar314._0_24_ = afVar313._0_24_;
                                afVar314[6] = auVar289._24_4_;
                                afVar314[7] = afVar313[7];
                                afVar314[8] = afVar313[8];
                                afVar314[9] = afVar313[9];
                                afVar314[10] = afVar313[10];
                                afVar314[0xb] = afVar313[0xb];
                                afVar314[0xc] = afVar313[0xc];
                                afVar314[0xd] = afVar313[0xd];
                                afVar314[0xe] = afVar313[0xe];
                                afVar314[0xf] = afVar313[0xf];
                              }
                              afVar315 = afVar314;
                              if ((uVar172 & 0x80) != 0) {
                                auVar289 = vpbroadcastd_avx512f();
                                afVar315._0_28_ = afVar314._0_28_;
                                afVar315[7] = auVar289._28_4_;
                                afVar315[8] = afVar314[8];
                                afVar315[9] = afVar314[9];
                                afVar315[10] = afVar314[10];
                                afVar315[0xb] = afVar314[0xb];
                                afVar315[0xc] = afVar314[0xc];
                                afVar315[0xd] = afVar314[0xd];
                                afVar315[0xe] = afVar314[0xe];
                                afVar315[0xf] = afVar314[0xf];
                              }
                              vextracti32x4_avx512f(auVar288,2);
                              afVar316 = afVar315;
                              if ((uVar172 & 0x100) != 0) {
                                auVar289 = vpbroadcastd_avx512f();
                                afVar316._0_32_ = afVar315._0_32_;
                                afVar316[8] = auVar289._32_4_;
                                afVar316[9] = afVar315[9];
                                afVar316[10] = afVar315[10];
                                afVar316[0xb] = afVar315[0xb];
                                afVar316[0xc] = afVar315[0xc];
                                afVar316[0xd] = afVar315[0xd];
                                afVar316[0xe] = afVar315[0xe];
                                afVar316[0xf] = afVar315[0xf];
                              }
                              afVar317 = afVar316;
                              if ((uVar172 & 0x200) != 0) {
                                auVar289 = vpbroadcastd_avx512f();
                                afVar317._0_36_ = afVar316._0_36_;
                                afVar317[9] = auVar289._36_4_;
                                afVar317[10] = afVar316[10];
                                afVar317[0xb] = afVar316[0xb];
                                afVar317[0xc] = afVar316[0xc];
                                afVar317[0xd] = afVar316[0xd];
                                afVar317[0xe] = afVar316[0xe];
                                afVar317[0xf] = afVar316[0xf];
                              }
                              afVar318 = afVar317;
                              if ((uVar172 & 0x400) != 0) {
                                auVar289 = vpbroadcastd_avx512f();
                                afVar318._0_40_ = afVar317._0_40_;
                                afVar318[10] = auVar289._40_4_;
                                afVar318[0xb] = afVar317[0xb];
                                afVar318[0xc] = afVar317[0xc];
                                afVar318[0xd] = afVar317[0xd];
                                afVar318[0xe] = afVar317[0xe];
                                afVar318[0xf] = afVar317[0xf];
                              }
                              afVar319 = afVar318;
                              if ((uVar172 & 0x800) != 0) {
                                auVar289 = vpbroadcastd_avx512f();
                                afVar319._0_44_ = afVar318._0_44_;
                                afVar319[0xb] = auVar289._44_4_;
                                afVar319[0xc] = afVar318[0xc];
                                afVar319[0xd] = afVar318[0xd];
                                afVar319[0xe] = afVar318[0xe];
                                afVar319[0xf] = afVar318[0xf];
                              }
                              vextracti32x4_avx512f(auVar288,3);
                              afVar320 = afVar319;
                              if ((uVar172 & 0x1000) != 0) {
                                auVar289 = vpbroadcastd_avx512f();
                                afVar320._0_48_ = afVar319._0_48_;
                                afVar320[0xc] = auVar289._48_4_;
                                afVar320[0xd] = afVar319[0xd];
                                afVar320[0xe] = afVar319[0xe];
                                afVar320[0xf] = afVar319[0xf];
                              }
                              afVar321 = afVar320;
                              if ((uVar172 & 0x2000) != 0) {
                                auVar289 = vpbroadcastd_avx512f();
                                afVar321._0_52_ = afVar320._0_52_;
                                afVar321[0xd] = auVar289._52_4_;
                                afVar321[0xe] = afVar320[0xe];
                                afVar321[0xf] = afVar320[0xf];
                              }
                              afVar322 = afVar321;
                              if ((uVar172 & 0x4000) != 0) {
                                auVar289 = vpbroadcastd_avx512f();
                                afVar322._0_56_ = afVar321._0_56_;
                                afVar322[0xe] = auVar289._56_4_;
                                afVar322[0xf] = afVar321[0xf];
                              }
                              afVar462 = afVar322;
                              if ((uVar172 & 0x8000) != 0) {
                                auVar289 = vpbroadcastd_avx512f();
                                afVar462[0xf] = auVar289._60_4_;
                                afVar462._0_60_ = afVar322._0_60_;
                              }
                              uVar173 = vptestnmd_avx512f((undefined1  [64])afVar462,
                                                          (undefined1  [64])afVar462);
                              uVar172 = uVar172 & uVar173;
                              if ((uVar172 & 1) != 0) {
                                afVar462 = (float  [16])ZEXT464((uint)(auVar288._0_4_ / iVar13));
                              }
                              if ((uVar172 & 2) != 0) {
                                auVar174 = vpinsrd_avx(afVar462._0_16_,auVar288._4_4_ / iVar13,1);
                                afVar462 = (float  [16])
                                           vinserti32x4_avx512f
                                                     ((undefined1  [64])afVar462,auVar174,0);
                              }
                              if ((uVar172 & 4) != 0) {
                                auVar174 = vpinsrd_avx(afVar462._0_16_,auVar288._8_4_ / iVar13,2);
                                afVar462 = (float  [16])
                                           vinserti32x4_avx512f
                                                     ((undefined1  [64])afVar462,auVar174,0);
                              }
                              if ((uVar172 & 8) != 0) {
                                auVar174 = vpinsrd_avx(afVar462._0_16_,auVar288._12_4_ / iVar13,3);
                                afVar462 = (float  [16])
                                           vinserti32x4_avx512f
                                                     ((undefined1  [64])afVar462,auVar174,0);
                              }
                              afVar323 = afVar462;
                              if ((uVar172 & 0x10) != 0) {
                                auVar288 = vpbroadcastd_avx512f();
                                afVar323._0_16_ = afVar462._0_16_;
                                afVar323[4] = auVar288._16_4_;
                                afVar323[5] = afVar462[5];
                                afVar323[6] = afVar462[6];
                                afVar323[7] = afVar462[7];
                                afVar323[8] = afVar462[8];
                                afVar323[9] = afVar462[9];
                                afVar323[10] = afVar462[10];
                                afVar323[0xb] = afVar462[0xb];
                                afVar323[0xc] = afVar462[0xc];
                                afVar323[0xd] = afVar462[0xd];
                                afVar323[0xe] = afVar462[0xe];
                                afVar323[0xf] = afVar462[0xf];
                              }
                              afVar324 = afVar323;
                              if ((uVar172 & 0x20) != 0) {
                                auVar288 = vpbroadcastd_avx512f();
                                afVar324._0_20_ = afVar323._0_20_;
                                afVar324[5] = auVar288._20_4_;
                                afVar324[6] = afVar323[6];
                                afVar324[7] = afVar323[7];
                                afVar324[8] = afVar323[8];
                                afVar324[9] = afVar323[9];
                                afVar324[10] = afVar323[10];
                                afVar324[0xb] = afVar323[0xb];
                                afVar324[0xc] = afVar323[0xc];
                                afVar324[0xd] = afVar323[0xd];
                                afVar324[0xe] = afVar323[0xe];
                                afVar324[0xf] = afVar323[0xf];
                              }
                              afVar325 = afVar324;
                              if ((uVar172 & 0x40) != 0) {
                                auVar288 = vpbroadcastd_avx512f();
                                afVar325._0_24_ = afVar324._0_24_;
                                afVar325[6] = auVar288._24_4_;
                                afVar325[7] = afVar324[7];
                                afVar325[8] = afVar324[8];
                                afVar325[9] = afVar324[9];
                                afVar325[10] = afVar324[10];
                                afVar325[0xb] = afVar324[0xb];
                                afVar325[0xc] = afVar324[0xc];
                                afVar325[0xd] = afVar324[0xd];
                                afVar325[0xe] = afVar324[0xe];
                                afVar325[0xf] = afVar324[0xf];
                              }
                              afVar326 = afVar325;
                              if ((uVar172 & 0x80) != 0) {
                                auVar288 = vpbroadcastd_avx512f();
                                afVar326._0_28_ = afVar325._0_28_;
                                afVar326[7] = auVar288._28_4_;
                                afVar326[8] = afVar325[8];
                                afVar326[9] = afVar325[9];
                                afVar326[10] = afVar325[10];
                                afVar326[0xb] = afVar325[0xb];
                                afVar326[0xc] = afVar325[0xc];
                                afVar326[0xd] = afVar325[0xd];
                                afVar326[0xe] = afVar325[0xe];
                                afVar326[0xf] = afVar325[0xf];
                              }
                              afVar327 = afVar326;
                              if ((uVar172 & 0x100) != 0) {
                                auVar288 = vpbroadcastd_avx512f();
                                afVar327._0_32_ = afVar326._0_32_;
                                afVar327[8] = auVar288._32_4_;
                                afVar327[9] = afVar326[9];
                                afVar327[10] = afVar326[10];
                                afVar327[0xb] = afVar326[0xb];
                                afVar327[0xc] = afVar326[0xc];
                                afVar327[0xd] = afVar326[0xd];
                                afVar327[0xe] = afVar326[0xe];
                                afVar327[0xf] = afVar326[0xf];
                              }
                              afVar328 = afVar327;
                              if ((uVar172 & 0x200) != 0) {
                                auVar288 = vpbroadcastd_avx512f();
                                afVar328._0_36_ = afVar327._0_36_;
                                afVar328[9] = auVar288._36_4_;
                                afVar328[10] = afVar327[10];
                                afVar328[0xb] = afVar327[0xb];
                                afVar328[0xc] = afVar327[0xc];
                                afVar328[0xd] = afVar327[0xd];
                                afVar328[0xe] = afVar327[0xe];
                                afVar328[0xf] = afVar327[0xf];
                              }
                              afVar329 = afVar328;
                              if ((uVar172 & 0x400) != 0) {
                                auVar288 = vpbroadcastd_avx512f();
                                afVar329._0_40_ = afVar328._0_40_;
                                afVar329[10] = auVar288._40_4_;
                                afVar329[0xb] = afVar328[0xb];
                                afVar329[0xc] = afVar328[0xc];
                                afVar329[0xd] = afVar328[0xd];
                                afVar329[0xe] = afVar328[0xe];
                                afVar329[0xf] = afVar328[0xf];
                              }
                              afVar330 = afVar329;
                              if ((uVar172 & 0x800) != 0) {
                                auVar288 = vpbroadcastd_avx512f();
                                afVar330._0_44_ = afVar329._0_44_;
                                afVar330[0xb] = auVar288._44_4_;
                                afVar330[0xc] = afVar329[0xc];
                                afVar330[0xd] = afVar329[0xd];
                                afVar330[0xe] = afVar329[0xe];
                                afVar330[0xf] = afVar329[0xf];
                              }
                              afVar331 = afVar330;
                              if ((uVar172 & 0x1000) != 0) {
                                auVar288 = vpbroadcastd_avx512f();
                                afVar331._0_48_ = afVar330._0_48_;
                                afVar331[0xc] = auVar288._48_4_;
                                afVar331[0xd] = afVar330[0xd];
                                afVar331[0xe] = afVar330[0xe];
                                afVar331[0xf] = afVar330[0xf];
                              }
                              afVar332 = afVar331;
                              if ((uVar172 & 0x2000) != 0) {
                                auVar288 = vpbroadcastd_avx512f();
                                afVar332._0_52_ = afVar331._0_52_;
                                afVar332[0xd] = auVar288._52_4_;
                                afVar332[0xe] = afVar331[0xe];
                                afVar332[0xf] = afVar331[0xf];
                              }
                              afVar333 = afVar332;
                              if ((uVar172 & 0x4000) != 0) {
                                auVar288 = vpbroadcastd_avx512f();
                                afVar333._0_56_ = afVar332._0_56_;
                                afVar333[0xe] = auVar288._56_4_;
                                afVar333[0xf] = afVar332[0xf];
                              }
                              in_ZMM10 = afVar333;
                              if ((uVar172 & 0x8000) != 0) {
                                auVar288 = vpbroadcastd_avx512f();
                                in_ZMM10[0xf] = auVar288._60_4_;
                                in_ZMM10._0_60_ = afVar333._0_60_;
                              }
                              uVar173 = vpcmpgtd_avx512f(auVar280,(undefined1  [64])in_ZMM10);
                              uVar173 = uVar172 & uVar173;
                              auVar288 = vgatherdps_avx512f(*(undefined4 *)
                                                             ((long)pvVar15 +
                                                             (ulong)uVar11 * 0x10 +
                                                             (long)iVar166 * (long)iVar138 * sVar21
                                                             + sVar17 * sVar21 * uVar146));
                              bVar23 = (byte)uVar173;
                              auVar334._4_4_ = (uint)((byte)(uVar173 >> 1) & 1) * auVar288._4_4_;
                              auVar334._0_4_ = (uint)(bVar23 & 1) * auVar288._0_4_;
                              auVar334._8_4_ = (uint)((byte)(uVar173 >> 2) & 1) * auVar288._8_4_;
                              auVar334._12_4_ = (uint)((byte)(uVar173 >> 3) & 1) * auVar288._12_4_;
                              auVar334._16_4_ = (uint)((byte)(uVar173 >> 4) & 1) * auVar288._16_4_;
                              auVar334._20_4_ = (uint)((byte)(uVar173 >> 5) & 1) * auVar288._20_4_;
                              auVar334._24_4_ = (uint)((byte)(uVar173 >> 6) & 1) * auVar288._24_4_;
                              auVar334._28_4_ = (uint)((byte)(uVar173 >> 7) & 1) * auVar288._28_4_;
                              bVar33 = (byte)(uVar173 >> 8);
                              auVar334._32_4_ = (uint)(bVar33 & 1) * auVar288._32_4_;
                              auVar334._36_4_ = (uint)((byte)(uVar173 >> 9) & 1) * auVar288._36_4_;
                              auVar334._40_4_ = (uint)((byte)(uVar173 >> 10) & 1) * auVar288._40_4_;
                              auVar334._44_4_ = (uint)((byte)(uVar173 >> 0xb) & 1) * auVar288._44_4_
                              ;
                              auVar334._48_4_ = (uint)((byte)(uVar173 >> 0xc) & 1) * auVar288._48_4_
                              ;
                              auVar334._52_4_ = (uint)((byte)(uVar173 >> 0xd) & 1) * auVar288._52_4_
                              ;
                              auVar334._56_4_ = (uint)((byte)(uVar173 >> 0xe) & 1) * auVar288._56_4_
                              ;
                              auVar334._60_4_ = (uint)(byte)(uVar173 >> 0xf) * auVar288._60_4_;
                              piVar14 = (int *)((long)pvVar159 + uVar158 * 4);
                              auVar335._4_4_ = (uint)((byte)(uVar173 >> 1) & 1) * piVar14[1];
                              auVar335._0_4_ = (uint)(bVar23 & 1) * *piVar14;
                              auVar335._8_4_ = (uint)((byte)(uVar173 >> 2) & 1) * piVar14[2];
                              auVar335._12_4_ = (uint)((byte)(uVar173 >> 3) & 1) * piVar14[3];
                              auVar335._16_4_ = (uint)((byte)(uVar173 >> 4) & 1) * piVar14[4];
                              auVar335._20_4_ = (uint)((byte)(uVar173 >> 5) & 1) * piVar14[5];
                              auVar335._24_4_ = (uint)((byte)(uVar173 >> 6) & 1) * piVar14[6];
                              auVar335._28_4_ = (uint)((byte)(uVar173 >> 7) & 1) * piVar14[7];
                              auVar335._32_4_ = (uint)(bVar33 & 1) * piVar14[8];
                              auVar335._36_4_ = (uint)((byte)(uVar173 >> 9) & 1) * piVar14[9];
                              auVar335._40_4_ = (uint)((byte)(uVar173 >> 10) & 1) * piVar14[10];
                              auVar335._44_4_ = (uint)((byte)(uVar173 >> 0xb) & 1) * piVar14[0xb];
                              auVar335._48_4_ = (uint)((byte)(uVar173 >> 0xc) & 1) * piVar14[0xc];
                              auVar335._52_4_ = (uint)((byte)(uVar173 >> 0xd) & 1) * piVar14[0xd];
                              auVar335._56_4_ = (uint)((byte)(uVar173 >> 0xe) & 1) * piVar14[0xe];
                              auVar335._60_4_ = (uint)(byte)(uVar173 >> 0xf) * piVar14[0xf];
                              uVar41 = vpcmpd_avx512f((undefined1  [64])in_ZMM10,auVar280,5);
                              uVar172 = uVar172 & uVar41;
                              auVar288 = vfmadd231ps_avx512f(auVar411,auVar335,auVar334);
                              iVar151 = auVar411._0_4_;
                              bVar25 = (bool)((byte)(uVar173 >> 1) & 1);
                              iVar343 = auVar411._4_4_;
                              bVar26 = (bool)((byte)(uVar173 >> 2) & 1);
                              iVar139 = auVar411._8_4_;
                              bVar27 = (bool)((byte)(uVar173 >> 3) & 1);
                              iVar140 = auVar411._12_4_;
                              bVar28 = (bool)((byte)(uVar173 >> 4) & 1);
                              iVar141 = auVar411._16_4_;
                              bVar29 = (bool)((byte)(uVar173 >> 5) & 1);
                              iVar142 = auVar411._20_4_;
                              bVar30 = (bool)((byte)(uVar173 >> 6) & 1);
                              iVar344 = auVar411._24_4_;
                              bVar31 = (bool)((byte)(uVar173 >> 7) & 1);
                              iVar345 = auVar411._28_4_;
                              iVar346 = auVar411._32_4_;
                              bVar34 = (bool)((byte)(uVar173 >> 9) & 1);
                              iVar347 = auVar411._36_4_;
                              bVar35 = (bool)((byte)(uVar173 >> 10) & 1);
                              iVar348 = auVar411._40_4_;
                              bVar36 = (bool)((byte)(uVar173 >> 0xb) & 1);
                              iVar349 = auVar411._44_4_;
                              bVar37 = (bool)((byte)(uVar173 >> 0xc) & 1);
                              iVar350 = auVar411._48_4_;
                              bVar38 = (bool)((byte)(uVar173 >> 0xd) & 1);
                              iVar351 = auVar411._52_4_;
                              bVar39 = (bool)((byte)(uVar173 >> 0xe) & 1);
                              iVar352 = auVar411._56_4_;
                              bVar40 = SUB81(uVar173 >> 0xf,0);
                              iVar353 = auVar411._60_4_;
                              bVar24 = (bool)((byte)uVar172 & 1);
                              auVar411._0_4_ =
                                   (uint)bVar24 * iVar151 |
                                   (uint)!bVar24 *
                                   ((uint)(bVar23 & 1) * auVar288._0_4_ |
                                   (uint)!(bool)(bVar23 & 1) * iVar151);
                              bVar24 = (bool)((byte)(uVar172 >> 1) & 1);
                              auVar411._4_4_ =
                                   (uint)bVar24 * iVar343 |
                                   (uint)!bVar24 *
                                   ((uint)bVar25 * auVar288._4_4_ | (uint)!bVar25 * iVar343);
                              bVar24 = (bool)((byte)(uVar172 >> 2) & 1);
                              auVar411._8_4_ =
                                   (uint)bVar24 * iVar139 |
                                   (uint)!bVar24 *
                                   ((uint)bVar26 * auVar288._8_4_ | (uint)!bVar26 * iVar139);
                              bVar24 = (bool)((byte)(uVar172 >> 3) & 1);
                              auVar411._12_4_ =
                                   (uint)bVar24 * iVar140 |
                                   (uint)!bVar24 *
                                   ((uint)bVar27 * auVar288._12_4_ | (uint)!bVar27 * iVar140);
                              bVar24 = (bool)((byte)(uVar172 >> 4) & 1);
                              auVar411._16_4_ =
                                   (uint)bVar24 * iVar141 |
                                   (uint)!bVar24 *
                                   ((uint)bVar28 * auVar288._16_4_ | (uint)!bVar28 * iVar141);
                              bVar24 = (bool)((byte)(uVar172 >> 5) & 1);
                              auVar411._20_4_ =
                                   (uint)bVar24 * iVar142 |
                                   (uint)!bVar24 *
                                   ((uint)bVar29 * auVar288._20_4_ | (uint)!bVar29 * iVar142);
                              bVar24 = (bool)((byte)(uVar172 >> 6) & 1);
                              auVar411._24_4_ =
                                   (uint)bVar24 * iVar344 |
                                   (uint)!bVar24 *
                                   ((uint)bVar30 * auVar288._24_4_ | (uint)!bVar30 * iVar344);
                              bVar24 = (bool)((byte)(uVar172 >> 7) & 1);
                              auVar411._28_4_ =
                                   (uint)bVar24 * iVar345 |
                                   (uint)!bVar24 *
                                   ((uint)bVar31 * auVar288._28_4_ | (uint)!bVar31 * iVar345);
                              bVar24 = (bool)((byte)(uVar172 >> 8) & 1);
                              auVar411._32_4_ =
                                   (uint)bVar24 * iVar346 |
                                   (uint)!bVar24 *
                                   ((uint)(bVar33 & 1) * auVar288._32_4_ |
                                   (uint)!(bool)(bVar33 & 1) * iVar346);
                              bVar24 = (bool)((byte)(uVar172 >> 9) & 1);
                              auVar411._36_4_ =
                                   (uint)bVar24 * iVar347 |
                                   (uint)!bVar24 *
                                   ((uint)bVar34 * auVar288._36_4_ | (uint)!bVar34 * iVar347);
                              bVar24 = (bool)((byte)(uVar172 >> 10) & 1);
                              auVar411._40_4_ =
                                   (uint)bVar24 * iVar348 |
                                   (uint)!bVar24 *
                                   ((uint)bVar35 * auVar288._40_4_ | (uint)!bVar35 * iVar348);
                              bVar24 = (bool)((byte)(uVar172 >> 0xb) & 1);
                              auVar411._44_4_ =
                                   (uint)bVar24 * iVar349 |
                                   (uint)!bVar24 *
                                   ((uint)bVar36 * auVar288._44_4_ | (uint)!bVar36 * iVar349);
                              bVar24 = (bool)((byte)(uVar172 >> 0xc) & 1);
                              auVar411._48_4_ =
                                   (uint)bVar24 * iVar350 |
                                   (uint)!bVar24 *
                                   ((uint)bVar37 * auVar288._48_4_ | (uint)!bVar37 * iVar350);
                              bVar24 = (bool)((byte)(uVar172 >> 0xd) & 1);
                              auVar411._52_4_ =
                                   (uint)bVar24 * iVar351 |
                                   (uint)!bVar24 *
                                   ((uint)bVar38 * auVar288._52_4_ | (uint)!bVar38 * iVar351);
                              bVar24 = (bool)((byte)(uVar172 >> 0xe) & 1);
                              auVar411._56_4_ =
                                   (uint)bVar24 * iVar352 |
                                   (uint)!bVar24 *
                                   ((uint)bVar39 * auVar288._56_4_ | (uint)!bVar39 * iVar352);
                              bVar24 = SUB81(uVar172 >> 0xf,0);
                              auVar411._60_4_ =
                                   (uint)bVar24 * iVar353 |
                                   (uint)!bVar24 *
                                   ((uint)bVar40 * auVar288._60_4_ | (uint)!bVar40 * iVar353);
                              uVar158 = uVar158 + 0x10;
                              auVar282 = vpaddq_avx512f(auVar282,auVar338);
                              auVar286 = vpaddq_avx512f(auVar286,auVar338);
                              auVar287 = vpaddd_avx512f(auVar287,auVar337);
                            } while ((uVar11 + 0xf & 0xfffffff0) != uVar158);
                            bVar24 = (bool)((byte)uVar42 & 1);
                            auVar336._0_4_ = bVar24 * auVar411._0_4_ | (uint)!bVar24 * iVar151;
                            bVar24 = (bool)((byte)(uVar171 >> 1) & 1);
                            auVar336._4_4_ = bVar24 * auVar411._4_4_ | (uint)!bVar24 * iVar343;
                            bVar24 = (bool)((byte)(uVar171 >> 2) & 1);
                            auVar336._8_4_ = bVar24 * auVar411._8_4_ | (uint)!bVar24 * iVar139;
                            bVar24 = (bool)((byte)(uVar171 >> 3) & 1);
                            auVar336._12_4_ = bVar24 * auVar411._12_4_ | (uint)!bVar24 * iVar140;
                            bVar24 = (bool)((byte)(uVar171 >> 4) & 1);
                            auVar336._16_4_ = bVar24 * auVar411._16_4_ | (uint)!bVar24 * iVar141;
                            bVar24 = (bool)((byte)(uVar171 >> 5) & 1);
                            auVar336._20_4_ = bVar24 * auVar411._20_4_ | (uint)!bVar24 * iVar142;
                            bVar24 = (bool)((byte)(uVar171 >> 6) & 1);
                            auVar336._24_4_ = bVar24 * auVar411._24_4_ | (uint)!bVar24 * iVar344;
                            bVar24 = (bool)((byte)(uVar171 >> 7) & 1);
                            auVar336._28_4_ = bVar24 * auVar411._28_4_ | (uint)!bVar24 * iVar345;
                            auVar336._32_4_ =
                                 (bVar32 & 1) * auVar411._32_4_ |
                                 (uint)!(bool)(bVar32 & 1) * iVar346;
                            bVar24 = (bool)(bVar32 >> 1 & 1);
                            auVar336._36_4_ = bVar24 * auVar411._36_4_ | (uint)!bVar24 * iVar347;
                            bVar24 = (bool)(bVar32 >> 2 & 1);
                            auVar336._40_4_ = bVar24 * auVar411._40_4_ | (uint)!bVar24 * iVar348;
                            bVar24 = (bool)(bVar32 >> 3 & 1);
                            auVar336._44_4_ = bVar24 * auVar411._44_4_ | (uint)!bVar24 * iVar349;
                            bVar24 = (bool)(bVar32 >> 4 & 1);
                            auVar336._48_4_ = bVar24 * auVar411._48_4_ | (uint)!bVar24 * iVar350;
                            bVar24 = (bool)(bVar32 >> 5 & 1);
                            auVar336._52_4_ = bVar24 * auVar411._52_4_ | (uint)!bVar24 * iVar351;
                            bVar24 = (bool)(bVar32 >> 6 & 1);
                            auVar336._56_4_ = bVar24 * auVar411._56_4_ | (uint)!bVar24 * iVar352;
                            auVar336._60_4_ =
                                 (bVar32 >> 7) * auVar411._60_4_ |
                                 (uint)!(bool)(bVar32 >> 7) * iVar353;
                            auVar228 = vextractf64x4_avx512f(auVar336,1);
                            auVar282 = vaddps_avx512f(auVar336,ZEXT3264(auVar228));
                            auVar382._0_4_ = auVar282._0_4_ + auVar282._16_4_;
                            auVar382._4_4_ = auVar282._4_4_ + auVar282._20_4_;
                            auVar382._8_4_ = auVar282._8_4_ + auVar282._24_4_;
                            auVar382._12_4_ = auVar282._12_4_ + auVar282._28_4_;
                            auVar174 = vshufpd_avx(auVar382,auVar382,1);
                            auVar383._0_4_ = auVar382._0_4_ + auVar174._0_4_;
                            auVar383._4_4_ = auVar382._4_4_ + auVar174._4_4_;
                            auVar383._8_4_ = auVar382._8_4_ + auVar174._8_4_;
                            auVar383._12_4_ = auVar382._12_4_ + auVar174._12_4_;
                            auVar174 = vhaddps_avx(auVar383,auVar383);
                            auVar282 = ZEXT1664(auVar174);
                          }
                          uVar153 = uVar153 + 1;
                          pvVar159 = (void *)((long)pvVar159 + (ulong)uVar11 * 4);
                        } while (uVar153 != uVar155);
                      }
                      auVar174 = auVar282._0_16_;
                      uVar146 = uVar146 + 1;
                      pvVar160 = (void *)((long)pvVar160 + lVar167 * 4);
                    } while (uVar146 != uVar152);
                  }
                  fVar371 = auVar174._0_4_;
                  fVar354 = fVar371;
                  switch(iVar148) {
                  case 1:
                    auVar174 = vmaxss_avx(auVar174,ZEXT416(0));
                    fVar354 = auVar174._0_4_;
                    break;
                  case 2:
                    uVar42 = vcmpss_avx512f(auVar174,ZEXT416(0),0xe);
                    bVar24 = (bool)((byte)uVar42 & 1);
                    fVar354 = (float)((uint)bVar24 * 0x3f800000 + (uint)!bVar24 * (int)*pfVar169) *
                              fVar371;
                    break;
                  case 3:
                    auVar174 = vmaxss_avx(auVar174,ZEXT416((uint)*pfVar169));
                    fVar354 = auVar174._0_4_;
                    if (pfVar169[1] < auVar174._0_4_) {
                      fVar354 = pfVar169[1];
                    }
                    break;
                  case 4:
                    auVar174 = vminss_avx(auVar174,SUB6416(ZEXT464(0x42b0c0a5),0));
                    auVar88._8_4_ = 0x80000000;
                    auVar88._0_8_ = 0x8000000080000000;
                    auVar88._12_4_ = 0x80000000;
                    auVar175 = vxorps_avx512vl(auVar174,auVar88);
                    uVar42 = vcmpss_avx512f(auVar174,ZEXT416(0xc2b0c0a5),1);
                    bVar24 = (bool)((byte)uVar42 & 1);
                    in_ZMM10 = (float  [16])ZEXT1664(in_ZMM10._0_16_);
                    fVar354 = expf((float)((uint)bVar24 * 0x42b0c0a5 +
                                          (uint)!bVar24 * auVar175._0_4_));
                    auVar337 = vpbroadcastd_avx512f(ZEXT416(0x10));
                    auVar338 = vpbroadcastq_avx512f(ZEXT816(0x10));
                    auVar339 = vpternlogd_avx512f(auVar339,auVar339,auVar339,0xff);
                    auVar340 = vpmovsxbd_avx512f(_DAT_005f4684);
                    auVar341 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                    auVar342 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                    auVar281 = ZEXT1264(ZEXT812(0));
                    auVar280 = vmovdqu64_avx512f(local_d8);
                    fVar354 = 1.0 / (fVar354 + 1.0);
                    break;
                  case 5:
                    in_ZMM10 = (float  [16])ZEXT1664(in_ZMM10._0_16_);
                    fVar354 = expf(fVar371);
                    fVar354 = logf(fVar354 + 1.0);
                    fVar354 = tanhf(fVar354);
                    auVar337 = vpbroadcastd_avx512f(ZEXT416(0x10));
                    auVar338 = vpbroadcastq_avx512f(ZEXT816(0x10));
                    auVar339 = vpternlogd_avx512f(auVar339,auVar339,auVar339,0xff);
                    auVar340 = vpmovsxbd_avx512f(_DAT_005f4684);
                    auVar341 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                    auVar342 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                    auVar281 = ZEXT1264(ZEXT812(0));
                    auVar280 = vmovdqu64_avx512f(local_d8);
                    fVar354 = fVar354 * fVar371;
                    break;
                  case 6:
                    fVar4 = *pfVar169;
                    auVar87._8_4_ = 0x80000000;
                    auVar87._0_8_ = 0x8000000080000000;
                    auVar87._12_4_ = 0x80000000;
                    auVar175 = vxorps_avx512vl(ZEXT416((uint)pfVar169[1]),auVar87);
                    fVar378 = auVar175._0_4_ / fVar4;
                    fVar354 = 0.0;
                    if ((fVar378 <= fVar371) &&
                       (fVar354 = fVar371, fVar371 <= fVar378 + 1.0 / fVar4)) {
                      auVar174 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar174,
                                                 ZEXT416((uint)pfVar169[1]));
                      fVar354 = auVar174._0_4_ * fVar371;
                    }
                  }
                  *(float *)((long)local_2f0 + uVar161 * 4) = fVar354;
                  uVar161 = uVar161 + 1;
                } while (uVar161 != uVar149);
              }
              local_2f0 = (void *)((long)local_2f0 + (long)local_1e0 * 4);
              iVar138 = (int)local_1f8 + 1;
              local_1f8 = CONCAT44(local_1f8._4_4_,iVar138);
            } while (iVar138 != (int)local_1e8);
          }
          lVar157 = local_1c8._0_8_ + 1;
          local_1c8._0_8_ = lVar157;
        } while (lVar157 != local_80);
      }
    }
    pMVar137 = local_180;
    Deconvolution::cut_padding(&this->super_Deconvolution,&local_248,local_180,local_1d8);
    iVar138 = -100;
    if ((pMVar137->data != (void *)0x0) &&
       (iVar138 = -100, (long)pMVar137->c * pMVar137->cstep != 0)) {
      iVar138 = 0;
    }
  }
LAB_002a69e5:
  piVar14 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_248.allocator == (Allocator *)0x0) {
        if (local_248.data != (void *)0x0) {
          free(local_248.data);
        }
      }
      else {
        (*(local_248.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar138;
}

Assistant:

int Deconvolution_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        int ret = gemm->forward(bottom_blob_2, top_col2im, opt_b);
        if (ret != 0)
            return ret;

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_loadu_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_loadu_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_loadu_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}